

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_sse41.cpp
# Opt level: O3

void sha256d64_sse41::Transform_4way(uchar *out,uchar *in)

{
  long lVar1;
  long in_FS_OFFSET;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar3 [16];
  uint uVar9;
  uint uVar10;
  uint uVar18;
  uint uVar19;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar20;
  uint uVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar22;
  uint uVar29;
  uint uVar30;
  uint uVar33;
  undefined1 auVar24 [16];
  uint uVar23;
  uint uVar31;
  uint uVar34;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 uVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar35;
  int iVar40;
  int iVar41;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar43;
  uint uVar44;
  uint uVar45;
  int iVar49;
  uint uVar50;
  uint uVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  uint uVar56;
  uint uVar57;
  undefined1 auVar46 [16];
  uint uVar58;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined1 auVar63 [16];
  int iVar73;
  int iVar79;
  int iVar81;
  int iVar83;
  undefined1 auVar75 [16];
  uint uVar74;
  uint uVar80;
  uint uVar82;
  uint uVar84;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar85;
  uint uVar86;
  uint uVar87;
  int iVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  int iVar94;
  uint uVar95;
  uint uVar96;
  int iVar97;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar104;
  uint uVar105;
  uint uVar106;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar107;
  int iVar110;
  uint uVar111;
  uint uVar112;
  int iVar113;
  uint uVar114;
  uint uVar115;
  uint uVar116;
  int iVar117;
  uint uVar118;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  uint uVar119;
  uint uVar120;
  uint uVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  undefined1 auVar121 [16];
  uint uVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  uint uVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  uint uVar154;
  uint uVar155;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  uint uVar162;
  uint uVar163;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  uint uVar168;
  uint uVar169;
  uint uVar170;
  uint uVar171;
  uint uVar174;
  uint uVar177;
  undefined1 auVar172 [16];
  uint uVar175;
  uint uVar176;
  uint uVar178;
  uint uVar179;
  uint uVar180;
  uint uVar181;
  uint uVar182;
  undefined1 auVar173 [16];
  uint uVar183;
  uint uVar184;
  uint uVar185;
  uint uVar186;
  uint uVar187;
  uint uVar188;
  
  auVar3 = _DAT_01158440;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar77._4_4_ = *(undefined4 *)(in + 0x80);
  auVar77._0_4_ = *(undefined4 *)(in + 0xc0);
  auVar77._12_4_ = *(undefined4 *)in;
  auVar77._8_4_ = *(undefined4 *)(in + 0x40);
  auVar11 = pshufb(auVar77,_DAT_01158440);
  iVar35 = auVar11._0_4_;
  uVar22 = iVar35 + 0x98c7e2a2;
  iVar40 = auVar11._4_4_;
  uVar29 = iVar40 + 0x98c7e2a2;
  iVar41 = auVar11._8_4_;
  iVar42 = auVar11._12_4_;
  uVar30 = iVar41 + 0x98c7e2a2;
  uVar33 = iVar42 + 0x98c7e2a2;
  auVar102._4_4_ = *(undefined4 *)(in + 0x84);
  auVar102._0_4_ = *(undefined4 *)(in + 0xc4);
  uVar59 = iVar35 + 0xfc08884d;
  uVar64 = iVar40 + 0xfc08884d;
  uVar67 = iVar41 + 0xfc08884d;
  uVar70 = iVar42 + 0xfc08884d;
  auVar102._12_4_ = *(undefined4 *)(in + 4);
  auVar102._8_4_ = *(undefined4 *)(in + 0x44);
  auVar11 = pshufb(auVar102,_DAT_01158440);
  uVar58 = auVar11._0_4_;
  uVar61 = auVar11._4_4_;
  uVar62 = auVar11._8_4_;
  uVar66 = auVar11._12_4_;
  iVar43 = (uVar22 & 0xca0b3af3 ^ 0x9b05688c) + uVar58 +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
  iVar49 = (uVar29 & 0xca0b3af3 ^ 0x9b05688c) + uVar61 +
           ((uVar29 * 0x80 | uVar29 >> 0x19) ^
           (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6));
  iVar52 = (uVar30 & 0xca0b3af3 ^ 0x9b05688c) + uVar62 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6));
  iVar55 = (uVar33 & 0xca0b3af3 ^ 0x9b05688c) + uVar66 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  uVar44 = iVar43 + 0xcd2a11ae;
  uVar50 = iVar49 + 0xcd2a11ae;
  uVar53 = iVar52 + 0xcd2a11ae;
  uVar56 = iVar55 + 0xcd2a11ae;
  iVar43 = iVar43 + -0x6f44e1c4;
  iVar49 = iVar49 + -0x6f44e1c4;
  iVar52 = iVar52 + -0x6f44e1c4;
  iVar55 = iVar55 + -0x6f44e1c4;
  uVar2 = (uVar59 & 0xd16e48e2) +
          ((uVar59 * 0x400 | uVar59 >> 0x16) ^
          (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar43 +
          0x2a01a605;
  uVar4 = (uVar64 & 0xd16e48e2) +
          ((uVar64 * 0x400 | uVar64 >> 0x16) ^
          (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar49 +
          0x2a01a605;
  uVar5 = (uVar67 & 0xd16e48e2) +
          ((uVar67 * 0x400 | uVar67 >> 0x16) ^
          (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar52 +
          0x2a01a605;
  uVar7 = (uVar70 & 0xd16e48e2) +
          ((uVar70 * 0x400 | uVar70 >> 0x16) ^
          (uVar70 * 0x80000 | uVar70 >> 0xd) ^ (uVar70 * 0x40000000 | uVar70 >> 2)) + iVar55 +
          0x2a01a605;
  auVar12._4_4_ = *(undefined4 *)(in + 0x88);
  auVar12._0_4_ = *(undefined4 *)(in + 200);
  auVar12._12_4_ = *(undefined4 *)(in + 8);
  auVar12._8_4_ = *(undefined4 *)(in + 0x48);
  auVar11 = pshufb(auVar12,_DAT_01158440);
  uVar69 = auVar11._0_4_;
  uVar72 = auVar11._4_4_;
  uVar93 = auVar11._8_4_;
  uVar100 = auVar11._12_4_;
  iVar85 = ((uVar22 ^ 0x510e527f) & uVar44 ^ 0x510e527f) + uVar69 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar90 = ((uVar29 ^ 0x510e527f) & uVar50 ^ 0x510e527f) + uVar72 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  iVar94 = ((uVar30 ^ 0x510e527f) & uVar53 ^ 0x510e527f) + uVar93 +
           ((uVar53 * 0x80 | uVar53 >> 0x19) ^
           (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6));
  iVar97 = ((uVar33 ^ 0x510e527f) & uVar56 ^ 0x510e527f) + uVar100 +
           ((uVar56 * 0x80 | uVar56 >> 0x19) ^
           (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6));
  iVar73 = iVar85 + 0x50c6645b;
  iVar79 = iVar90 + 0x50c6645b;
  iVar81 = iVar94 + 0x50c6645b;
  iVar83 = iVar97 + 0x50c6645b;
  uVar9 = ((uVar2 | uVar59) & 0x6a09e667 | uVar2 & uVar59) + iVar73 +
          ((uVar2 * 0x400 | uVar2 >> 0x16) ^
          (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2));
  uVar18 = ((uVar4 | uVar64) & 0x6a09e667 | uVar4 & uVar64) + iVar79 +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2));
  uVar19 = ((uVar5 | uVar67) & 0x6a09e667 | uVar5 & uVar67) + iVar81 +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2));
  uVar21 = ((uVar7 | uVar70) & 0x6a09e667 | uVar7 & uVar70) + iVar83 +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2));
  uVar86 = iVar85 + 0xc2e12e0;
  uVar91 = iVar90 + 0xc2e12e0;
  uVar95 = iVar94 + 0xc2e12e0;
  uVar98 = iVar97 + 0xc2e12e0;
  auVar24._4_4_ = *(undefined4 *)(in + 0x8c);
  auVar24._0_4_ = *(undefined4 *)(in + 0xcc);
  auVar24._12_4_ = *(undefined4 *)(in + 0xc);
  auVar24._8_4_ = *(undefined4 *)(in + 0x4c);
  auVar11 = pshufb(auVar24,_DAT_01158440);
  uVar8 = auVar11._0_4_;
  uVar10 = auVar11._4_4_;
  uVar20 = auVar11._8_4_;
  uVar23 = auVar11._12_4_;
  iVar107 = (uVar44 & uVar86 | ~uVar86 & uVar22) + uVar8 +
            ((uVar86 * 0x80 | uVar86 >> 0x19) ^
            (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  iVar110 = (uVar50 & uVar91 | ~uVar91 & uVar29) + uVar10 +
            ((uVar91 * 0x80 | uVar91 >> 0x19) ^
            (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  iVar113 = (uVar53 & uVar95 | ~uVar95 & uVar30) + uVar20 +
            ((uVar95 * 0x80 | uVar95 >> 0x19) ^
            (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar117 = (uVar56 & uVar98 | ~uVar98 & uVar33) + uVar23 +
            ((uVar98 * 0x80 | uVar98 >> 0x19) ^
            (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6));
  iVar85 = iVar107 + 0x3ac42e24;
  iVar90 = iVar110 + 0x3ac42e24;
  iVar94 = iVar113 + 0x3ac42e24;
  iVar97 = iVar117 + 0x3ac42e24;
  uVar30 = ((uVar9 | uVar2) & uVar59 | uVar9 & uVar2) + iVar85 +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2));
  uVar33 = ((uVar18 | uVar4) & uVar64 | uVar18 & uVar4) + iVar90 +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2));
  uVar31 = ((uVar19 | uVar5) & uVar67 | uVar19 & uVar5) + iVar94 +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2));
  uVar34 = ((uVar21 | uVar7) & uVar70 | uVar21 & uVar7) + iVar97 +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2));
  uVar22 = iVar107 + 0xa4ce148b;
  uVar29 = iVar110 + 0xa4ce148b;
  uVar114 = iVar113 + 0xa4ce148b;
  uVar118 = iVar117 + 0xa4ce148b;
  auVar140._4_4_ = *(undefined4 *)(in + 0x90);
  auVar140._0_4_ = *(undefined4 *)(in + 0xd0);
  auVar140._12_4_ = *(undefined4 *)(in + 0x10);
  auVar140._8_4_ = *(undefined4 *)(in + 0x50);
  auVar11 = pshufb(auVar140,_DAT_01158440);
  uVar111 = auVar11._0_4_;
  uVar145 = auVar11._4_4_;
  uVar153 = auVar11._8_4_;
  uVar150 = auVar11._12_4_;
  iVar107 = iVar35 + uVar111 + (uVar86 & uVar22 | ~uVar22 & uVar44) +
            ((uVar22 * 0x80 | uVar22 >> 0x19) ^
            (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) + -0x2de15b03;
  iVar110 = iVar40 + uVar145 + (uVar91 & uVar29 | ~uVar29 & uVar50) +
            ((uVar29 * 0x80 | uVar29 >> 0x19) ^
            (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) + -0x2de15b03;
  iVar113 = iVar41 + uVar153 + (uVar95 & uVar114 | ~uVar114 & uVar53) +
            ((uVar114 * 0x80 | uVar114 >> 0x19) ^
            (uVar114 * 0x200000 | uVar114 >> 0xb) ^ (uVar114 * 0x4000000 | uVar114 >> 6)) +
            -0x2de15b03;
  iVar117 = iVar42 + uVar150 + (uVar98 & uVar118 | ~uVar118 & uVar56) +
            ((uVar118 * 0x80 | uVar118 >> 0x19) ^
            (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6)) +
            -0x2de15b03;
  uVar59 = uVar59 + iVar107;
  uVar64 = uVar64 + iVar110;
  uVar67 = uVar67 + iVar113;
  uVar70 = uVar70 + iVar117;
  uVar45 = ((uVar30 | uVar9) & uVar2 | uVar30 & uVar9) +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar107;
  uVar51 = ((uVar33 | uVar18) & uVar4 | uVar33 & uVar18) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar110;
  uVar54 = ((uVar31 | uVar19) & uVar5 | uVar31 & uVar19) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar113;
  uVar57 = ((uVar34 | uVar21) & uVar7 | uVar34 & uVar21) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar117;
  auVar141._4_4_ = *(undefined4 *)(in + 0x94);
  auVar141._0_4_ = *(undefined4 *)(in + 0xd4);
  auVar141._12_4_ = *(undefined4 *)(in + 0x14);
  auVar141._8_4_ = *(undefined4 *)(in + 0x54);
  auVar11 = pshufb(auVar141,_DAT_01158440);
  uVar115 = auVar11._0_4_;
  uVar146 = auVar11._4_4_;
  uVar149 = auVar11._8_4_;
  uVar151 = auVar11._12_4_;
  iVar43 = iVar43 + uVar115 + (uVar22 & uVar59 | ~uVar59 & uVar86) +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) + -0x699ffa9d;
  iVar49 = iVar49 + uVar146 + (uVar29 & uVar64 | ~uVar64 & uVar91) +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6)) + -0x699ffa9d;
  iVar52 = iVar52 + uVar149 + (uVar114 & uVar67 | ~uVar67 & uVar95) +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6)) + -0x699ffa9d;
  iVar55 = iVar55 + uVar151 + (uVar118 & uVar70 | ~uVar70 & uVar98) +
           ((uVar70 * 0x80 | uVar70 >> 0x19) ^
           (uVar70 * 0x200000 | uVar70 >> 0xb) ^ (uVar70 * 0x4000000 | uVar70 >> 6)) + -0x699ffa9d;
  uVar2 = uVar2 + iVar43;
  uVar4 = uVar4 + iVar49;
  uVar5 = uVar5 + iVar52;
  uVar7 = uVar7 + iVar55;
  uVar120 = ((uVar45 | uVar30) & uVar9 | uVar45 & uVar30) +
            ((uVar45 * 0x400 | uVar45 >> 0x16) ^
            (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar43;
  uVar122 = ((uVar51 | uVar33) & uVar18 | uVar51 & uVar33) +
            ((uVar51 * 0x400 | uVar51 >> 0x16) ^
            (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar124 = ((uVar54 | uVar31) & uVar19 | uVar54 & uVar31) +
            ((uVar54 * 0x400 | uVar54 >> 0x16) ^
            (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar52;
  uVar126 = ((uVar57 | uVar34) & uVar21 | uVar57 & uVar34) +
            ((uVar57 * 0x400 | uVar57 >> 0x16) ^
            (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar55;
  auVar36._4_4_ = *(undefined4 *)(in + 0x98);
  auVar36._0_4_ = *(undefined4 *)(in + 0xd8);
  auVar36._12_4_ = *(undefined4 *)(in + 0x18);
  auVar36._8_4_ = *(undefined4 *)(in + 0x58);
  auVar11 = pshufb(auVar36,_DAT_01158440);
  uVar44 = auVar11._0_4_;
  uVar56 = auVar11._4_4_;
  uVar91 = auVar11._8_4_;
  uVar98 = auVar11._12_4_;
  iVar43 = iVar73 + uVar44 + (uVar59 & uVar2 | ~uVar2 & uVar22) +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6)) + 0x4da73129;
  iVar49 = iVar79 + uVar56 + (uVar64 & uVar4 | ~uVar4 & uVar29) +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + 0x4da73129;
  iVar52 = iVar81 + uVar91 + (uVar67 & uVar5 | ~uVar5 & uVar114) +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + 0x4da73129;
  iVar55 = iVar83 + uVar98 + (uVar70 & uVar7 | ~uVar7 & uVar118) +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) + 0x4da73129;
  uVar9 = uVar9 + iVar43;
  uVar18 = uVar18 + iVar49;
  uVar19 = uVar19 + iVar52;
  uVar21 = uVar21 + iVar55;
  uVar139 = ((uVar120 | uVar45) & uVar30 | uVar120 & uVar45) +
            ((uVar120 * 0x400 | uVar120 >> 0x16) ^
            (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar43;
  uVar142 = ((uVar122 | uVar51) & uVar33 | uVar122 & uVar51) +
            ((uVar122 * 0x400 | uVar122 >> 0x16) ^
            (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar49;
  uVar144 = ((uVar124 | uVar54) & uVar31 | uVar124 & uVar54) +
            ((uVar124 * 0x400 | uVar124 >> 0x16) ^
            (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar52;
  uVar148 = ((uVar126 | uVar57) & uVar34 | uVar126 & uVar57) +
            ((uVar126 * 0x400 | uVar126 >> 0x16) ^
            (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar55;
  auVar108._4_4_ = *(undefined4 *)(in + 0x9c);
  auVar108._0_4_ = *(undefined4 *)(in + 0xdc);
  auVar108._12_4_ = *(undefined4 *)(in + 0x1c);
  auVar108._8_4_ = *(undefined4 *)(in + 0x5c);
  auVar11 = pshufb(auVar108,_DAT_01158440);
  uVar112 = auVar11._0_4_;
  uVar116 = auVar11._4_4_;
  uVar119 = auVar11._8_4_;
  uVar137 = auVar11._12_4_;
  iVar43 = iVar85 + uVar112 + (uVar2 & uVar9 | ~uVar9 & uVar59) +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x1526453c;
  iVar49 = iVar90 + uVar116 + (uVar4 & uVar18 | ~uVar18 & uVar64) +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) + 0x1526453c;
  iVar52 = iVar94 + uVar119 + (uVar5 & uVar19 | ~uVar19 & uVar67) +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + 0x1526453c;
  iVar55 = iVar97 + uVar137 + (uVar7 & uVar21 | ~uVar21 & uVar70) +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + 0x1526453c;
  uVar30 = uVar30 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar31 = uVar31 + iVar52;
  uVar34 = uVar34 + iVar55;
  uVar87 = ((uVar139 | uVar120) & uVar45 | uVar139 & uVar120) +
           ((uVar139 * 0x400 | uVar139 >> 0x16) ^
           (uVar139 * 0x80000 | uVar139 >> 0xd) ^ (uVar139 * 0x40000000 | uVar139 >> 2)) + iVar43;
  uVar92 = ((uVar142 | uVar122) & uVar51 | uVar142 & uVar122) +
           ((uVar142 * 0x400 | uVar142 >> 0x16) ^
           (uVar142 * 0x80000 | uVar142 >> 0xd) ^ (uVar142 * 0x40000000 | uVar142 >> 2)) + iVar49;
  uVar96 = ((uVar144 | uVar124) & uVar54 | uVar144 & uVar124) +
           ((uVar144 * 0x400 | uVar144 >> 0x16) ^
           (uVar144 * 0x80000 | uVar144 >> 0xd) ^ (uVar144 * 0x40000000 | uVar144 >> 2)) + iVar52;
  uVar99 = ((uVar148 | uVar126) & uVar57 | uVar148 & uVar126) +
           ((uVar148 * 0x400 | uVar148 >> 0x16) ^
           (uVar148 * 0x80000 | uVar148 >> 0xd) ^ (uVar148 * 0x40000000 | uVar148 >> 2)) + iVar55;
  auVar37._4_4_ = *(undefined4 *)(in + 0xa0);
  auVar37._0_4_ = *(undefined4 *)(in + 0xe0);
  auVar37._12_4_ = *(undefined4 *)(in + 0x20);
  auVar37._8_4_ = *(undefined4 *)(in + 0x60);
  auVar11 = pshufb(auVar37,_DAT_01158440);
  uVar50 = auVar11._0_4_;
  uVar86 = auVar11._4_4_;
  uVar95 = auVar11._8_4_;
  uVar114 = auVar11._12_4_;
  iVar43 = uVar59 + uVar50 + (uVar9 & uVar30 | ~uVar30 & uVar2) + -0x27f85568 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6));
  iVar49 = uVar64 + uVar86 + (uVar18 & uVar33 | ~uVar33 & uVar4) + -0x27f85568 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar52 = uVar67 + uVar95 + (uVar19 & uVar31 | ~uVar31 & uVar5) + -0x27f85568 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  iVar55 = uVar70 + uVar114 + (uVar21 & uVar34 | ~uVar34 & uVar7) + -0x27f85568 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  uVar45 = uVar45 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar54 = uVar54 + iVar52;
  uVar57 = uVar57 + iVar55;
  uVar53 = ((uVar87 | uVar139) & uVar120 | uVar87 & uVar139) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar43;
  uVar59 = ((uVar92 | uVar142) & uVar122 | uVar92 & uVar142) +
           ((uVar92 * 0x400 | uVar92 >> 0x16) ^
           (uVar92 * 0x80000 | uVar92 >> 0xd) ^ (uVar92 * 0x40000000 | uVar92 >> 2)) + iVar49;
  uVar64 = ((uVar96 | uVar144) & uVar124 | uVar96 & uVar144) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar52;
  uVar67 = ((uVar99 | uVar148) & uVar126 | uVar99 & uVar148) +
           ((uVar99 * 0x400 | uVar99 >> 0x16) ^
           (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar55;
  auVar109._4_4_ = *(undefined4 *)(in + 0xa4);
  auVar109._0_4_ = *(undefined4 *)(in + 0xe4);
  auVar109._12_4_ = *(undefined4 *)(in + 0x24);
  auVar109._8_4_ = *(undefined4 *)(in + 100);
  auVar11 = pshufb(auVar109,_DAT_01158440);
  uVar128 = auVar11._0_4_;
  uVar132 = auVar11._4_4_;
  uVar135 = auVar11._8_4_;
  uVar138 = auVar11._12_4_;
  iVar43 = uVar2 + uVar128 + (uVar30 & uVar45 | ~uVar45 & uVar9) + 0x12835b01 +
           ((uVar45 * 0x80 | uVar45 >> 0x19) ^
           (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6));
  iVar49 = uVar4 + uVar132 + (uVar33 & uVar51 | ~uVar51 & uVar18) + 0x12835b01 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  iVar52 = uVar5 + uVar135 + (uVar31 & uVar54 | ~uVar54 & uVar19) + 0x12835b01 +
           ((uVar54 * 0x80 | uVar54 >> 0x19) ^
           (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6));
  iVar55 = uVar7 + uVar138 + (uVar34 & uVar57 | ~uVar57 & uVar21) + 0x12835b01 +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  uVar120 = uVar120 + iVar43;
  uVar122 = uVar122 + iVar49;
  uVar124 = uVar124 + iVar52;
  uVar126 = uVar126 + iVar55;
  uVar129 = ((uVar53 | uVar87) & uVar139 | uVar53 & uVar87) +
            ((uVar53 * 0x400 | uVar53 >> 0x16) ^
            (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar43;
  uVar130 = ((uVar59 | uVar92) & uVar142 | uVar59 & uVar92) +
            ((uVar59 * 0x400 | uVar59 >> 0x16) ^
            (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar49;
  uVar133 = ((uVar64 | uVar96) & uVar144 | uVar64 & uVar96) +
            ((uVar64 * 0x400 | uVar64 >> 0x16) ^
            (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar52;
  uVar136 = ((uVar67 | uVar99) & uVar148 | uVar67 & uVar99) +
            ((uVar67 * 0x400 | uVar67 >> 0x16) ^
            (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar55;
  auVar11._4_4_ = *(undefined4 *)(in + 0xa8);
  auVar11._0_4_ = *(undefined4 *)(in + 0xe8);
  auVar11._12_4_ = *(undefined4 *)(in + 0x28);
  auVar11._8_4_ = *(undefined4 *)(in + 0x68);
  auVar11 = pshufb(auVar11,_DAT_01158440);
  uVar2 = auVar11._0_4_;
  uVar7 = auVar11._4_4_;
  uVar22 = auVar11._8_4_;
  uVar29 = auVar11._12_4_;
  iVar43 = uVar9 + uVar2 + (uVar45 & uVar120 | ~uVar120 & uVar30) + 0x243185be +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  iVar49 = uVar18 + uVar7 + (uVar51 & uVar122 | ~uVar122 & uVar33) + 0x243185be +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6));
  iVar52 = uVar19 + uVar22 + (uVar54 & uVar124 | ~uVar124 & uVar31) + 0x243185be +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6));
  iVar55 = uVar21 + uVar29 + (uVar57 & uVar126 | ~uVar126 & uVar34) + 0x243185be +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6));
  uVar139 = uVar139 + iVar43;
  uVar142 = uVar142 + iVar49;
  uVar144 = uVar144 + iVar52;
  uVar148 = uVar148 + iVar55;
  uVar70 = ((uVar129 | uVar53) & uVar87 | uVar129 & uVar53) +
           ((uVar129 * 0x400 | uVar129 >> 0x16) ^
           (uVar129 * 0x80000 | uVar129 >> 0xd) ^ (uVar129 * 0x40000000 | uVar129 >> 2)) + iVar43;
  uVar104 = ((uVar130 | uVar59) & uVar92 | uVar130 & uVar59) +
            ((uVar130 * 0x400 | uVar130 >> 0x16) ^
            (uVar130 * 0x80000 | uVar130 >> 0xd) ^ (uVar130 * 0x40000000 | uVar130 >> 2)) + iVar49;
  uVar105 = ((uVar133 | uVar64) & uVar96 | uVar133 & uVar64) +
            ((uVar133 * 0x400 | uVar133 >> 0x16) ^
            (uVar133 * 0x80000 | uVar133 >> 0xd) ^ (uVar133 * 0x40000000 | uVar133 >> 2)) + iVar52;
  uVar106 = ((uVar136 | uVar67) & uVar99 | uVar136 & uVar67) +
            ((uVar136 * 0x400 | uVar136 >> 0x16) ^
            (uVar136 * 0x80000 | uVar136 >> 0xd) ^ (uVar136 * 0x40000000 | uVar136 >> 2)) + iVar55;
  auVar75._4_4_ = *(undefined4 *)(in + 0xac);
  auVar75._0_4_ = *(undefined4 *)(in + 0xec);
  auVar75._12_4_ = *(undefined4 *)(in + 0x2c);
  auVar75._8_4_ = *(undefined4 *)(in + 0x6c);
  auVar11 = pshufb(auVar75,_DAT_01158440);
  uVar155 = auVar11._0_4_;
  uVar131 = auVar11._4_4_;
  uVar160 = auVar11._8_4_;
  uVar134 = auVar11._12_4_;
  iVar43 = uVar30 + uVar155 + (uVar120 & uVar139 | ~uVar139 & uVar45) + 0x550c7dc3 +
           ((uVar139 * 0x80 | uVar139 >> 0x19) ^
           (uVar139 * 0x200000 | uVar139 >> 0xb) ^ (uVar139 * 0x4000000 | uVar139 >> 6));
  iVar49 = uVar33 + uVar131 + (uVar122 & uVar142 | ~uVar142 & uVar51) + 0x550c7dc3 +
           ((uVar142 * 0x80 | uVar142 >> 0x19) ^
           (uVar142 * 0x200000 | uVar142 >> 0xb) ^ (uVar142 * 0x4000000 | uVar142 >> 6));
  iVar52 = uVar31 + uVar160 + (uVar124 & uVar144 | ~uVar144 & uVar54) + 0x550c7dc3 +
           ((uVar144 * 0x80 | uVar144 >> 0x19) ^
           (uVar144 * 0x200000 | uVar144 >> 0xb) ^ (uVar144 * 0x4000000 | uVar144 >> 6));
  iVar55 = uVar34 + uVar134 + (uVar126 & uVar148 | ~uVar148 & uVar57) + 0x550c7dc3 +
           ((uVar148 * 0x80 | uVar148 >> 0x19) ^
           (uVar148 * 0x200000 | uVar148 >> 0xb) ^ (uVar148 * 0x4000000 | uVar148 >> 6));
  uVar87 = uVar87 + iVar43;
  uVar92 = uVar92 + iVar49;
  uVar96 = uVar96 + iVar52;
  uVar99 = uVar99 + iVar55;
  uVar60 = ((uVar70 | uVar129) & uVar53 | uVar70 & uVar129) +
           ((uVar70 * 0x400 | uVar70 >> 0x16) ^
           (uVar70 * 0x80000 | uVar70 >> 0xd) ^ (uVar70 * 0x40000000 | uVar70 >> 2)) + iVar43;
  uVar65 = ((uVar104 | uVar130) & uVar59 | uVar104 & uVar130) +
           ((uVar104 * 0x400 | uVar104 >> 0x16) ^
           (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar49;
  uVar68 = ((uVar105 | uVar133) & uVar64 | uVar105 & uVar133) +
           ((uVar105 * 0x400 | uVar105 >> 0x16) ^
           (uVar105 * 0x80000 | uVar105 >> 0xd) ^ (uVar105 * 0x40000000 | uVar105 >> 2)) + iVar52;
  uVar71 = ((uVar106 | uVar136) & uVar67 | uVar106 & uVar136) +
           ((uVar106 * 0x400 | uVar106 >> 0x16) ^
           (uVar106 * 0x80000 | uVar106 >> 0xd) ^ (uVar106 * 0x40000000 | uVar106 >> 2)) + iVar55;
  auVar26._4_4_ = *(undefined4 *)(in + 0xb0);
  auVar26._0_4_ = *(undefined4 *)(in + 0xf0);
  auVar26._12_4_ = *(undefined4 *)(in + 0x30);
  auVar26._8_4_ = *(undefined4 *)(in + 0x70);
  auVar11 = pshufb(auVar26,_DAT_01158440);
  uVar4 = auVar11._0_4_;
  uVar9 = auVar11._4_4_;
  uVar19 = auVar11._8_4_;
  uVar30 = auVar11._12_4_;
  iVar43 = uVar45 + uVar4 + (uVar139 & uVar87 | ~uVar87 & uVar120) + 0x72be5d74 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar49 = uVar51 + uVar9 + (uVar142 & uVar92 | ~uVar92 & uVar122) + 0x72be5d74 +
           ((uVar92 * 0x80 | uVar92 >> 0x19) ^
           (uVar92 * 0x200000 | uVar92 >> 0xb) ^ (uVar92 * 0x4000000 | uVar92 >> 6));
  iVar52 = uVar54 + uVar19 + (uVar144 & uVar96 | ~uVar96 & uVar124) + 0x72be5d74 +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6));
  iVar55 = uVar57 + uVar30 + (uVar148 & uVar99 | ~uVar99 & uVar126) + 0x72be5d74 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6));
  uVar53 = uVar53 + iVar43;
  uVar59 = uVar59 + iVar49;
  uVar64 = uVar64 + iVar52;
  uVar67 = uVar67 + iVar55;
  uVar5 = ((uVar60 | uVar70) & uVar129 | uVar60 & uVar70) +
          ((uVar60 * 0x400 | uVar60 >> 0x16) ^
          (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar43;
  uVar18 = ((uVar65 | uVar104) & uVar130 | uVar65 & uVar104) +
           ((uVar65 * 0x400 | uVar65 >> 0x16) ^
           (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar49;
  uVar21 = ((uVar68 | uVar105) & uVar133 | uVar68 & uVar105) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar33 = ((uVar71 | uVar106) & uVar136 | uVar71 & uVar106) +
           ((uVar71 * 0x400 | uVar71 >> 0x16) ^
           (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar55;
  auVar46._4_4_ = *(undefined4 *)(in + 0xb4);
  auVar46._0_4_ = *(undefined4 *)(in + 0xf4);
  auVar46._12_4_ = *(undefined4 *)(in + 0x34);
  auVar46._8_4_ = *(undefined4 *)(in + 0x74);
  auVar11 = pshufb(auVar46,_DAT_01158440);
  uVar45 = auVar11._0_4_;
  uVar51 = auVar11._4_4_;
  uVar54 = auVar11._8_4_;
  uVar118 = auVar11._12_4_;
  iVar43 = uVar120 + uVar45 + (uVar87 & uVar53 | ~uVar53 & uVar139) + -0x7f214e02 +
           ((uVar53 * 0x80 | uVar53 >> 0x19) ^
           (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6));
  iVar49 = uVar122 + uVar51 + (uVar92 & uVar59 | ~uVar59 & uVar142) + -0x7f214e02 +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6));
  iVar52 = uVar124 + uVar54 + (uVar96 & uVar64 | ~uVar64 & uVar144) + -0x7f214e02 +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar55 = uVar126 + uVar118 + (uVar99 & uVar67 | ~uVar67 & uVar148) + -0x7f214e02 +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  uVar129 = uVar129 + iVar43;
  uVar130 = uVar130 + iVar49;
  uVar133 = uVar133 + iVar52;
  uVar136 = uVar136 + iVar55;
  uVar74 = ((uVar5 | uVar60) & uVar70 | uVar5 & uVar60) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar43;
  uVar80 = ((uVar18 | uVar65) & uVar104 | uVar18 & uVar65) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar49;
  uVar82 = ((uVar21 | uVar68) & uVar105 | uVar21 & uVar68) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar52;
  uVar84 = ((uVar33 | uVar71) & uVar106 | uVar33 & uVar71) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar55;
  auVar172._4_4_ = *(undefined4 *)(in + 0xb8);
  auVar172._0_4_ = *(undefined4 *)(in + 0xf8);
  auVar172._12_4_ = *(undefined4 *)(in + 0x38);
  auVar172._8_4_ = *(undefined4 *)(in + 0x78);
  auVar11 = pshufb(auVar172,_DAT_01158440);
  uVar170 = auVar11._0_4_;
  uVar171 = auVar11._4_4_;
  uVar176 = auVar11._8_4_;
  uVar179 = auVar11._12_4_;
  iVar43 = uVar139 + uVar170 + (uVar53 & uVar129 | ~uVar129 & uVar87) + -0x6423f959 +
           ((uVar129 * 0x80 | uVar129 >> 0x19) ^
           (uVar129 * 0x200000 | uVar129 >> 0xb) ^ (uVar129 * 0x4000000 | uVar129 >> 6));
  iVar49 = uVar142 + uVar171 + (uVar59 & uVar130 | ~uVar130 & uVar92) + -0x6423f959 +
           ((uVar130 * 0x80 | uVar130 >> 0x19) ^
           (uVar130 * 0x200000 | uVar130 >> 0xb) ^ (uVar130 * 0x4000000 | uVar130 >> 6));
  iVar52 = uVar144 + uVar176 + (uVar64 & uVar133 | ~uVar133 & uVar96) + -0x6423f959 +
           ((uVar133 * 0x80 | uVar133 >> 0x19) ^
           (uVar133 * 0x200000 | uVar133 >> 0xb) ^ (uVar133 * 0x4000000 | uVar133 >> 6));
  iVar55 = uVar148 + uVar179 + (uVar67 & uVar136 | ~uVar136 & uVar99) + -0x6423f959 +
           ((uVar136 * 0x80 | uVar136 >> 0x19) ^
           (uVar136 * 0x200000 | uVar136 >> 0xb) ^ (uVar136 * 0x4000000 | uVar136 >> 6));
  uVar70 = uVar70 + iVar43;
  uVar104 = uVar104 + iVar49;
  uVar105 = uVar105 + iVar52;
  uVar106 = uVar106 + iVar55;
  uVar31 = ((uVar74 | uVar5) & uVar60 | uVar74 & uVar5) +
           ((uVar74 * 0x400 | uVar74 >> 0x16) ^
           (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar43;
  uVar34 = ((uVar80 | uVar18) & uVar65 | uVar80 & uVar18) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar49;
  uVar57 = ((uVar82 | uVar21) & uVar68 | uVar82 & uVar21) +
           ((uVar82 * 0x400 | uVar82 >> 0x16) ^
           (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar52;
  uVar120 = ((uVar84 | uVar33) & uVar71 | uVar84 & uVar33) +
            ((uVar84 * 0x400 | uVar84 >> 0x16) ^
            (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar55;
  auVar121._4_4_ = *(undefined4 *)(in + 0xbc);
  auVar121._0_4_ = *(undefined4 *)(in + 0xfc);
  auVar121._12_4_ = *(undefined4 *)(in + 0x3c);
  auVar121._8_4_ = *(undefined4 *)(in + 0x7c);
  auVar11 = pshufb(auVar121,_DAT_01158440);
  uVar142 = auVar11._0_4_;
  uVar148 = auVar11._4_4_;
  uVar147 = auVar11._8_4_;
  uVar143 = auVar11._12_4_;
  iVar43 = uVar87 + uVar142 + (uVar129 & uVar70 | ~uVar70 & uVar53) +
           ((uVar70 * 0x80 | uVar70 >> 0x19) ^
           (uVar70 * 0x200000 | uVar70 >> 0xb) ^ (uVar70 * 0x4000000 | uVar70 >> 6)) + -0x3e640e8c;
  iVar49 = uVar92 + uVar148 + (uVar130 & uVar104 | ~uVar104 & uVar59) +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6)) +
           -0x3e640e8c;
  iVar52 = uVar96 + uVar147 + (uVar133 & uVar105 | ~uVar105 & uVar64) +
           ((uVar105 * 0x80 | uVar105 >> 0x19) ^
           (uVar105 * 0x200000 | uVar105 >> 0xb) ^ (uVar105 * 0x4000000 | uVar105 >> 6)) +
           -0x3e640e8c;
  iVar55 = uVar99 + uVar143 + (uVar136 & uVar106 | ~uVar106 & uVar67) +
           ((uVar106 * 0x80 | uVar106 >> 0x19) ^
           (uVar106 * 0x200000 | uVar106 >> 0xb) ^ (uVar106 * 0x4000000 | uVar106 >> 6)) +
           -0x3e640e8c;
  uVar60 = uVar60 + iVar43;
  uVar65 = uVar65 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar71 = uVar71 + iVar55;
  uVar144 = ((uVar31 | uVar74) & uVar5 | uVar31 & uVar74) +
            ((uVar31 * 0x400 | uVar31 >> 0x16) ^
            (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar43;
  uVar123 = ((uVar34 | uVar80) & uVar18 | uVar34 & uVar80) +
            ((uVar34 * 0x400 | uVar34 >> 0x16) ^
            (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar125 = ((uVar57 | uVar82) & uVar21 | uVar57 & uVar82) +
            ((uVar57 * 0x400 | uVar57 >> 0x16) ^
            (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar52;
  uVar127 = ((uVar120 | uVar84) & uVar33 | uVar120 & uVar84) +
            ((uVar120 * 0x400 | uVar120 >> 0x16) ^
            (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar55;
  uVar152 = iVar35 + uVar128 +
            (uVar58 >> 3 ^ (uVar58 << 0xe | uVar58 >> 0x12) ^ (uVar58 << 0x19 | uVar58 >> 7)) +
            (uVar170 >> 10 ^ (uVar170 << 0xd | uVar170 >> 0x13) ^ (uVar170 << 0xf | uVar170 >> 0x11)
            );
  uVar156 = iVar40 + uVar132 +
            (uVar61 >> 3 ^ (uVar61 << 0xe | uVar61 >> 0x12) ^ (uVar61 << 0x19 | uVar61 >> 7)) +
            (uVar171 >> 10 ^ (uVar171 << 0xd | uVar171 >> 0x13) ^ (uVar171 << 0xf | uVar171 >> 0x11)
            );
  uVar161 = iVar41 + uVar135 +
            (uVar62 >> 3 ^ (uVar62 << 0xe | uVar62 >> 0x12) ^ (uVar62 << 0x19 | uVar62 >> 7)) +
            (uVar176 >> 10 ^ (uVar176 << 0xd | uVar176 >> 0x13) ^ (uVar176 << 0xf | uVar176 >> 0x11)
            );
  uVar165 = iVar42 + uVar138 +
            (uVar66 >> 3 ^ (uVar66 << 0xe | uVar66 >> 0x12) ^ (uVar66 << 0x19 | uVar66 >> 7)) +
            (uVar179 >> 10 ^ (uVar179 << 0xd | uVar179 >> 0x13) ^ (uVar179 << 0xf | uVar179 >> 0x11)
            );
  iVar43 = uVar53 + uVar152 + (uVar70 & uVar60 | ~uVar60 & uVar129) + -0x1b64963f +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar49 = uVar59 + uVar156 + (uVar104 & uVar65 | ~uVar65 & uVar130) + -0x1b64963f +
           ((uVar65 * 0x80 | uVar65 >> 0x19) ^
           (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6));
  iVar52 = uVar64 + uVar161 + (uVar105 & uVar68 | ~uVar68 & uVar133) + -0x1b64963f +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6));
  iVar55 = uVar67 + uVar165 + (uVar106 & uVar71 | ~uVar71 & uVar136) + -0x1b64963f +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  uVar5 = uVar5 + iVar43;
  uVar18 = uVar18 + iVar49;
  uVar21 = uVar21 + iVar52;
  uVar33 = uVar33 + iVar55;
  uVar87 = ((uVar144 | uVar31) & uVar74 | uVar144 & uVar31) +
           ((uVar144 * 0x400 | uVar144 >> 0x16) ^
           (uVar144 * 0x80000 | uVar144 >> 0xd) ^ (uVar144 * 0x40000000 | uVar144 >> 2)) + iVar43;
  uVar92 = ((uVar123 | uVar34) & uVar80 | uVar123 & uVar34) +
           ((uVar123 * 0x400 | uVar123 >> 0x16) ^
           (uVar123 * 0x80000 | uVar123 >> 0xd) ^ (uVar123 * 0x40000000 | uVar123 >> 2)) + iVar49;
  uVar99 = ((uVar125 | uVar57) & uVar82 | uVar125 & uVar57) +
           ((uVar125 * 0x400 | uVar125 >> 0x16) ^
           (uVar125 * 0x80000 | uVar125 >> 0xd) ^ (uVar125 * 0x40000000 | uVar125 >> 2)) + iVar52;
  uVar124 = ((uVar127 | uVar120) & uVar84 | uVar127 & uVar120) +
            ((uVar127 * 0x400 | uVar127 >> 0x16) ^
            (uVar127 * 0x80000 | uVar127 >> 0xd) ^ (uVar127 * 0x40000000 | uVar127 >> 2)) + iVar55;
  uVar169 = uVar58 + uVar2 +
            (uVar69 >> 3 ^ (uVar69 << 0xe | uVar69 >> 0x12) ^ (uVar69 << 0x19 | uVar69 >> 7)) +
            (uVar142 >> 10 ^ (uVar142 << 0xd | uVar142 >> 0x13) ^ (uVar142 << 0xf | uVar142 >> 0x11)
            );
  uVar174 = uVar61 + uVar7 +
            (uVar72 >> 3 ^ (uVar72 << 0xe | uVar72 >> 0x12) ^ (uVar72 << 0x19 | uVar72 >> 7)) +
            (uVar148 >> 10 ^ (uVar148 << 0xd | uVar148 >> 0x13) ^ (uVar148 << 0xf | uVar148 >> 0x11)
            );
  uVar177 = uVar62 + uVar22 +
            (uVar93 >> 3 ^ (uVar93 << 0xe | uVar93 >> 0x12) ^ (uVar93 << 0x19 | uVar93 >> 7)) +
            (uVar147 >> 10 ^ (uVar147 << 0xd | uVar147 >> 0x13) ^ (uVar147 << 0xf | uVar147 >> 0x11)
            );
  uVar180 = uVar66 + uVar29 +
            (uVar100 >> 3 ^ (uVar100 << 0xe | uVar100 >> 0x12) ^ (uVar100 << 0x19 | uVar100 >> 7)) +
            (uVar143 >> 10 ^ (uVar143 << 0xd | uVar143 >> 0x13) ^ (uVar143 << 0xf | uVar143 >> 0x11)
            );
  iVar43 = uVar129 + uVar169 + (uVar60 & uVar5 | ~uVar5 & uVar70) + -0x1041b87a +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
  iVar49 = uVar130 + uVar174 + (uVar65 & uVar18 | ~uVar18 & uVar104) + -0x1041b87a +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
  iVar52 = uVar133 + uVar177 + (uVar68 & uVar21 | ~uVar21 & uVar105) + -0x1041b87a +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6));
  iVar55 = uVar136 + uVar180 + (uVar71 & uVar33 | ~uVar33 & uVar106) + -0x1041b87a +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  uVar74 = uVar74 + iVar43;
  uVar80 = uVar80 + iVar49;
  uVar82 = uVar82 + iVar52;
  uVar84 = uVar84 + iVar55;
  uVar61 = ((uVar87 | uVar144) & uVar31 | uVar87 & uVar144) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar43;
  uVar66 = ((uVar92 | uVar123) & uVar34 | uVar92 & uVar123) +
           ((uVar92 * 0x400 | uVar92 >> 0x16) ^
           (uVar92 * 0x80000 | uVar92 >> 0xd) ^ (uVar92 * 0x40000000 | uVar92 >> 2)) + iVar49;
  uVar122 = ((uVar99 | uVar125) & uVar57 | uVar99 & uVar125) +
            ((uVar99 * 0x400 | uVar99 >> 0x16) ^
            (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar52;
  uVar126 = ((uVar124 | uVar127) & uVar120 | uVar124 & uVar127) +
            ((uVar124 * 0x400 | uVar124 >> 0x16) ^
            (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar55;
  uVar62 = uVar69 + uVar155 +
           (uVar8 >> 3 ^ (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7)) +
           (uVar152 >> 10 ^
           (uVar152 * 0x2000 | uVar152 >> 0x13) ^ (uVar152 * 0x8000 | uVar152 >> 0x11));
  uVar96 = uVar72 + uVar131 +
           (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7)) +
           (uVar156 >> 10 ^
           (uVar156 * 0x2000 | uVar156 >> 0x13) ^ (uVar156 * 0x8000 | uVar156 >> 0x11));
  uVar69 = uVar93 + uVar160 +
           (uVar20 >> 3 ^ (uVar20 << 0xe | uVar20 >> 0x12) ^ (uVar20 << 0x19 | uVar20 >> 7)) +
           (uVar161 >> 10 ^
           (uVar161 * 0x2000 | uVar161 >> 0x13) ^ (uVar161 * 0x8000 | uVar161 >> 0x11));
  uVar72 = uVar100 + uVar134 +
           (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7)) +
           (uVar165 >> 10 ^
           (uVar165 * 0x2000 | uVar165 >> 0x13) ^ (uVar165 * 0x8000 | uVar165 >> 0x11));
  iVar43 = uVar70 + uVar62 + (uVar5 & uVar74 | ~uVar74 & uVar60) + 0xfc19dc6 +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6));
  iVar49 = uVar104 + uVar96 + (uVar18 & uVar80 | ~uVar80 & uVar65) + 0xfc19dc6 +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6));
  iVar52 = uVar105 + uVar69 + (uVar21 & uVar82 | ~uVar82 & uVar68) + 0xfc19dc6 +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6));
  iVar55 = uVar106 + uVar72 + (uVar33 & uVar84 | ~uVar84 & uVar71) + 0xfc19dc6 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6));
  uVar31 = uVar31 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar57 = uVar57 + iVar52;
  uVar120 = uVar120 + iVar55;
  uVar64 = ((uVar61 | uVar87) & uVar144 | uVar61 & uVar87) +
           ((uVar61 * 0x400 | uVar61 >> 0x16) ^
           (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar43;
  uVar67 = ((uVar66 | uVar92) & uVar123 | uVar66 & uVar92) +
           ((uVar66 * 0x400 | uVar66 >> 0x16) ^
           (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar49;
  uVar70 = ((uVar122 | uVar99) & uVar125 | uVar122 & uVar99) +
           ((uVar122 * 0x400 | uVar122 >> 0x16) ^
           (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar52;
  uVar58 = ((uVar126 | uVar124) & uVar127 | uVar126 & uVar124) +
           ((uVar126 * 0x400 | uVar126 >> 0x16) ^
           (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar55;
  uVar106 = uVar8 + uVar4 +
            (uVar111 >> 3 ^ (uVar111 << 0xe | uVar111 >> 0x12) ^ (uVar111 << 0x19 | uVar111 >> 7)) +
            (uVar169 >> 10 ^
            (uVar169 * 0x2000 | uVar169 >> 0x13) ^ (uVar169 * 0x8000 | uVar169 >> 0x11));
  uVar129 = uVar10 + uVar9 +
            (uVar145 >> 3 ^ (uVar145 << 0xe | uVar145 >> 0x12) ^ (uVar145 << 0x19 | uVar145 >> 7)) +
            (uVar174 >> 10 ^
            (uVar174 * 0x2000 | uVar174 >> 0x13) ^ (uVar174 * 0x8000 | uVar174 >> 0x11));
  uVar130 = uVar20 + uVar19 +
            (uVar153 >> 3 ^ (uVar153 << 0xe | uVar153 >> 0x12) ^ (uVar153 << 0x19 | uVar153 >> 7)) +
            (uVar177 >> 10 ^
            (uVar177 * 0x2000 | uVar177 >> 0x13) ^ (uVar177 * 0x8000 | uVar177 >> 0x11));
  uVar133 = uVar23 + uVar30 +
            (uVar150 >> 3 ^ (uVar150 << 0xe | uVar150 >> 0x12) ^ (uVar150 << 0x19 | uVar150 >> 7)) +
            (uVar180 >> 10 ^
            (uVar180 * 0x2000 | uVar180 >> 0x13) ^ (uVar180 * 0x8000 | uVar180 >> 0x11));
  iVar43 = uVar60 + uVar106 + (uVar74 & uVar31 | ~uVar31 & uVar5) + 0x240ca1cc +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  iVar49 = uVar65 + uVar129 + (uVar80 & uVar34 | ~uVar34 & uVar18) + 0x240ca1cc +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar52 = uVar68 + uVar130 + (uVar82 & uVar57 | ~uVar57 & uVar21) + 0x240ca1cc +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  iVar55 = uVar71 + uVar133 + (uVar84 & uVar120 | ~uVar120 & uVar33) + 0x240ca1cc +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  uVar144 = uVar144 + iVar43;
  uVar123 = uVar123 + iVar49;
  uVar125 = uVar125 + iVar52;
  uVar127 = uVar127 + iVar55;
  uVar104 = ((uVar64 | uVar61) & uVar87 | uVar64 & uVar61) +
            ((uVar64 * 0x400 | uVar64 >> 0x16) ^
            (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar43;
  uVar93 = ((uVar67 | uVar66) & uVar92 | uVar67 & uVar66) +
           ((uVar67 * 0x400 | uVar67 >> 0x16) ^
           (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar49;
  uVar105 = ((uVar70 | uVar122) & uVar99 | uVar70 & uVar122) +
            ((uVar70 * 0x400 | uVar70 >> 0x16) ^
            (uVar70 * 0x80000 | uVar70 >> 0xd) ^ (uVar70 * 0x40000000 | uVar70 >> 2)) + iVar52;
  uVar100 = ((uVar58 | uVar126) & uVar124 | uVar58 & uVar126) +
            ((uVar58 * 0x400 | uVar58 >> 0x16) ^
            (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar55;
  uVar183 = uVar111 + uVar45 +
            (uVar115 >> 3 ^ (uVar115 << 0xe | uVar115 >> 0x12) ^ (uVar115 << 0x19 | uVar115 >> 7)) +
            (uVar62 >> 10 ^ (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11))
  ;
  uVar184 = uVar145 + uVar51 +
            (uVar146 >> 3 ^ (uVar146 << 0xe | uVar146 >> 0x12) ^ (uVar146 << 0x19 | uVar146 >> 7)) +
            (uVar96 >> 10 ^ (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11))
  ;
  uVar185 = uVar153 + uVar54 +
            (uVar149 >> 3 ^ (uVar149 << 0xe | uVar149 >> 0x12) ^ (uVar149 << 0x19 | uVar149 >> 7)) +
            (uVar69 >> 10 ^ (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11))
  ;
  uVar186 = uVar150 + uVar118 +
            (uVar151 >> 3 ^ (uVar151 << 0xe | uVar151 >> 0x12) ^ (uVar151 << 0x19 | uVar151 >> 7)) +
            (uVar72 >> 10 ^ (uVar72 * 0x2000 | uVar72 >> 0x13) ^ (uVar72 * 0x8000 | uVar72 >> 0x11))
  ;
  iVar43 = uVar5 + uVar183 + (uVar31 & uVar144 | ~uVar144 & uVar74) + 0x2de92c6f +
           ((uVar144 * 0x80 | uVar144 >> 0x19) ^
           (uVar144 * 0x200000 | uVar144 >> 0xb) ^ (uVar144 * 0x4000000 | uVar144 >> 6));
  iVar49 = uVar18 + uVar184 + (uVar34 & uVar123 | ~uVar123 & uVar80) + 0x2de92c6f +
           ((uVar123 * 0x80 | uVar123 >> 0x19) ^
           (uVar123 * 0x200000 | uVar123 >> 0xb) ^ (uVar123 * 0x4000000 | uVar123 >> 6));
  iVar52 = uVar21 + uVar185 + (uVar57 & uVar125 | ~uVar125 & uVar82) + 0x2de92c6f +
           ((uVar125 * 0x80 | uVar125 >> 0x19) ^
           (uVar125 * 0x200000 | uVar125 >> 0xb) ^ (uVar125 * 0x4000000 | uVar125 >> 6));
  iVar55 = uVar33 + uVar186 + (uVar120 & uVar127 | ~uVar127 & uVar84) + 0x2de92c6f +
           ((uVar127 * 0x80 | uVar127 >> 0x19) ^
           (uVar127 * 0x200000 | uVar127 >> 0xb) ^ (uVar127 * 0x4000000 | uVar127 >> 6));
  uVar87 = uVar87 + iVar43;
  uVar92 = uVar92 + iVar49;
  uVar99 = uVar99 + iVar52;
  uVar124 = uVar124 + iVar55;
  uVar60 = ((uVar104 | uVar64) & uVar61 | uVar104 & uVar64) +
           ((uVar104 * 0x400 | uVar104 >> 0x16) ^
           (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar43;
  uVar65 = ((uVar93 | uVar67) & uVar66 | uVar93 & uVar67) +
           ((uVar93 * 0x400 | uVar93 >> 0x16) ^
           (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar49;
  uVar68 = ((uVar105 | uVar70) & uVar122 | uVar105 & uVar70) +
           ((uVar105 * 0x400 | uVar105 >> 0x16) ^
           (uVar105 * 0x80000 | uVar105 >> 0xd) ^ (uVar105 * 0x40000000 | uVar105 >> 2)) + iVar52;
  uVar71 = ((uVar100 | uVar58) & uVar126 | uVar100 & uVar58) +
           ((uVar100 * 0x400 | uVar100 >> 0x16) ^
           (uVar100 * 0x80000 | uVar100 >> 0xd) ^ (uVar100 * 0x40000000 | uVar100 >> 2)) + iVar55;
  uVar136 = uVar115 + uVar170 +
            (uVar44 >> 3 ^ (uVar44 << 0xe | uVar44 >> 0x12) ^ (uVar44 << 0x19 | uVar44 >> 7)) +
            (uVar106 >> 10 ^
            (uVar106 * 0x2000 | uVar106 >> 0x13) ^ (uVar106 * 0x8000 | uVar106 >> 0x11));
  uVar111 = uVar146 + uVar171 +
            (uVar56 >> 3 ^ (uVar56 << 0xe | uVar56 >> 0x12) ^ (uVar56 << 0x19 | uVar56 >> 7)) +
            (uVar129 >> 10 ^
            (uVar129 * 0x2000 | uVar129 >> 0x13) ^ (uVar129 * 0x8000 | uVar129 >> 0x11));
  uVar115 = uVar149 + uVar176 +
            (uVar91 >> 3 ^ (uVar91 << 0xe | uVar91 >> 0x12) ^ (uVar91 << 0x19 | uVar91 >> 7)) +
            (uVar130 >> 10 ^
            (uVar130 * 0x2000 | uVar130 >> 0x13) ^ (uVar130 * 0x8000 | uVar130 >> 0x11));
  uVar139 = uVar151 + uVar179 +
            (uVar98 >> 3 ^ (uVar98 << 0xe | uVar98 >> 0x12) ^ (uVar98 << 0x19 | uVar98 >> 7)) +
            (uVar133 >> 10 ^
            (uVar133 * 0x2000 | uVar133 >> 0x13) ^ (uVar133 * 0x8000 | uVar133 >> 0x11));
  iVar43 = uVar74 + uVar136 + (uVar144 & uVar87 | ~uVar87 & uVar31) + 0x4a7484aa +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar49 = uVar80 + uVar111 + (uVar123 & uVar92 | ~uVar92 & uVar34) + 0x4a7484aa +
           ((uVar92 * 0x80 | uVar92 >> 0x19) ^
           (uVar92 * 0x200000 | uVar92 >> 0xb) ^ (uVar92 * 0x4000000 | uVar92 >> 6));
  iVar52 = uVar82 + uVar115 + (uVar125 & uVar99 | ~uVar99 & uVar57) + 0x4a7484aa +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6));
  iVar55 = uVar84 + uVar139 + (uVar127 & uVar124 | ~uVar124 & uVar120) + 0x4a7484aa +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6));
  uVar61 = uVar61 + iVar43;
  uVar66 = uVar66 + iVar49;
  uVar122 = uVar122 + iVar52;
  uVar126 = uVar126 + iVar55;
  uVar74 = ((uVar60 | uVar104) & uVar64 | uVar60 & uVar104) +
           ((uVar60 * 0x400 | uVar60 >> 0x16) ^
           (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar43;
  uVar80 = ((uVar65 | uVar93) & uVar67 | uVar65 & uVar93) +
           ((uVar65 * 0x400 | uVar65 >> 0x16) ^
           (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar49;
  uVar82 = ((uVar68 | uVar105) & uVar70 | uVar68 & uVar105) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar84 = ((uVar71 | uVar100) & uVar58 | uVar71 & uVar100) +
           ((uVar71 * 0x400 | uVar71 >> 0x16) ^
           (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar55;
  uVar153 = uVar44 + uVar142 +
            (uVar112 >> 3 ^ (uVar112 << 0xe | uVar112 >> 0x12) ^ (uVar112 << 0x19 | uVar112 >> 7)) +
            (uVar183 >> 10 ^
            (uVar183 * 0x2000 | uVar183 >> 0x13) ^ (uVar183 * 0x8000 | uVar183 >> 0x11));
  uVar157 = uVar56 + uVar148 +
            (uVar116 >> 3 ^ (uVar116 << 0xe | uVar116 >> 0x12) ^ (uVar116 << 0x19 | uVar116 >> 7)) +
            (uVar184 >> 10 ^
            (uVar184 * 0x2000 | uVar184 >> 0x13) ^ (uVar184 * 0x8000 | uVar184 >> 0x11));
  uVar162 = uVar91 + uVar147 +
            (uVar119 >> 3 ^ (uVar119 << 0xe | uVar119 >> 0x12) ^ (uVar119 << 0x19 | uVar119 >> 7)) +
            (uVar185 >> 10 ^
            (uVar185 * 0x2000 | uVar185 >> 0x13) ^ (uVar185 * 0x8000 | uVar185 >> 0x11));
  uVar166 = uVar98 + uVar143 +
            (uVar137 >> 3 ^ (uVar137 << 0xe | uVar137 >> 0x12) ^ (uVar137 << 0x19 | uVar137 >> 7)) +
            (uVar186 >> 10 ^
            (uVar186 * 0x2000 | uVar186 >> 0x13) ^ (uVar186 * 0x8000 | uVar186 >> 0x11));
  iVar43 = uVar31 + uVar153 + (uVar87 & uVar61 | ~uVar61 & uVar144) + 0x5cb0a9dc +
           ((uVar61 * 0x80 | uVar61 >> 0x19) ^
           (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6));
  iVar49 = uVar34 + uVar157 + (uVar92 & uVar66 | ~uVar66 & uVar123) + 0x5cb0a9dc +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6));
  iVar52 = uVar57 + uVar162 + (uVar99 & uVar122 | ~uVar122 & uVar125) + 0x5cb0a9dc +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6));
  iVar55 = uVar120 + uVar166 + (uVar124 & uVar126 | ~uVar126 & uVar127) + 0x5cb0a9dc +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6));
  uVar64 = uVar64 + iVar43;
  uVar67 = uVar67 + iVar49;
  uVar70 = uVar70 + iVar52;
  uVar58 = uVar58 + iVar55;
  uVar53 = ((uVar74 | uVar60) & uVar104 | uVar74 & uVar60) +
           ((uVar74 * 0x400 | uVar74 >> 0x16) ^
           (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar43;
  uVar56 = ((uVar80 | uVar65) & uVar93 | uVar80 & uVar65) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar49;
  uVar59 = ((uVar82 | uVar68) & uVar105 | uVar82 & uVar68) +
           ((uVar82 * 0x400 | uVar82 >> 0x16) ^
           (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar52;
  uVar91 = ((uVar84 | uVar71) & uVar100 | uVar84 & uVar71) +
           ((uVar84 * 0x400 | uVar84 >> 0x16) ^
           (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar55;
  uVar120 = (uVar50 >> 3 ^ (uVar50 << 0xe | uVar50 >> 0x12) ^ (uVar50 << 0x19 | uVar50 >> 7)) +
            uVar112 + uVar152 +
            (uVar136 >> 10 ^
            (uVar136 * 0x2000 | uVar136 >> 0x13) ^ (uVar136 * 0x8000 | uVar136 >> 0x11));
  uVar112 = (uVar86 >> 3 ^ (uVar86 << 0xe | uVar86 >> 0x12) ^ (uVar86 << 0x19 | uVar86 >> 7)) +
            uVar116 + uVar156 +
            (uVar111 >> 10 ^
            (uVar111 * 0x2000 | uVar111 >> 0x13) ^ (uVar111 * 0x8000 | uVar111 >> 0x11));
  uVar116 = (uVar95 >> 3 ^ (uVar95 << 0xe | uVar95 >> 0x12) ^ (uVar95 << 0x19 | uVar95 >> 7)) +
            uVar119 + uVar161 +
            (uVar115 >> 10 ^
            (uVar115 * 0x2000 | uVar115 >> 0x13) ^ (uVar115 * 0x8000 | uVar115 >> 0x11));
  uVar119 = (uVar114 >> 3 ^ (uVar114 << 0xe | uVar114 >> 0x12) ^ (uVar114 << 0x19 | uVar114 >> 7)) +
            uVar137 + uVar165 +
            (uVar139 >> 10 ^
            (uVar139 * 0x2000 | uVar139 >> 0x13) ^ (uVar139 * 0x8000 | uVar139 >> 0x11));
  iVar43 = uVar144 + uVar120 + (uVar61 & uVar64 | ~uVar64 & uVar87) + 0x76f988da +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar49 = uVar123 + uVar112 + (uVar66 & uVar67 | ~uVar67 & uVar92) + 0x76f988da +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  iVar52 = uVar125 + uVar116 + (uVar122 & uVar70 | ~uVar70 & uVar99) + 0x76f988da +
           ((uVar70 * 0x80 | uVar70 >> 0x19) ^
           (uVar70 * 0x200000 | uVar70 >> 0xb) ^ (uVar70 * 0x4000000 | uVar70 >> 6));
  iVar55 = uVar127 + uVar119 + (uVar126 & uVar58 | ~uVar58 & uVar124) + 0x76f988da +
           ((uVar58 * 0x80 | uVar58 >> 0x19) ^
           (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6));
  uVar104 = uVar104 + iVar43;
  uVar93 = uVar93 + iVar49;
  uVar105 = uVar105 + iVar52;
  uVar100 = uVar100 + iVar55;
  uVar5 = ((uVar53 | uVar74) & uVar60 | uVar53 & uVar74) +
          ((uVar53 * 0x400 | uVar53 >> 0x16) ^
          (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar43;
  uVar18 = ((uVar56 | uVar80) & uVar65 | uVar56 & uVar80) +
           ((uVar56 * 0x400 | uVar56 >> 0x16) ^
           (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar49;
  uVar21 = ((uVar59 | uVar82) & uVar68 | uVar59 & uVar82) +
           ((uVar59 * 0x400 | uVar59 >> 0x16) ^
           (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar52;
  uVar8 = ((uVar91 | uVar84) & uVar71 | uVar91 & uVar84) +
          ((uVar91 * 0x400 | uVar91 >> 0x16) ^
          (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2)) + iVar55;
  uVar123 = (uVar128 >> 3 ^ (uVar128 << 0xe | uVar128 >> 0x12) ^ (uVar128 << 0x19 | uVar128 >> 7)) +
            uVar50 + uVar169 +
            (uVar153 >> 10 ^
            (uVar153 * 0x2000 | uVar153 >> 0x13) ^ (uVar153 * 0x8000 | uVar153 >> 0x11));
  uVar158 = (uVar132 >> 3 ^ (uVar132 << 0xe | uVar132 >> 0x12) ^ (uVar132 << 0x19 | uVar132 >> 7)) +
            uVar86 + uVar174 +
            (uVar157 >> 10 ^
            (uVar157 * 0x2000 | uVar157 >> 0x13) ^ (uVar157 * 0x8000 | uVar157 >> 0x11));
  uVar163 = (uVar135 >> 3 ^ (uVar135 << 0xe | uVar135 >> 0x12) ^ (uVar135 << 0x19 | uVar135 >> 7)) +
            uVar95 + uVar177 +
            (uVar162 >> 10 ^
            (uVar162 * 0x2000 | uVar162 >> 0x13) ^ (uVar162 * 0x8000 | uVar162 >> 0x11));
  uVar167 = (uVar138 >> 3 ^ (uVar138 << 0xe | uVar138 >> 0x12) ^ (uVar138 << 0x19 | uVar138 >> 7)) +
            uVar114 + uVar180 +
            (uVar166 >> 10 ^
            (uVar166 * 0x2000 | uVar166 >> 0x13) ^ (uVar166 * 0x8000 | uVar166 >> 0x11));
  iVar43 = uVar87 + uVar123 + (uVar64 & uVar104 | ~uVar104 & uVar61) + -0x67c1aeae +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6));
  iVar49 = uVar92 + uVar158 + (uVar67 & uVar93 | ~uVar93 & uVar66) + -0x67c1aeae +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6));
  iVar52 = uVar99 + uVar163 + (uVar70 & uVar105 | ~uVar105 & uVar122) + -0x67c1aeae +
           ((uVar105 * 0x80 | uVar105 >> 0x19) ^
           (uVar105 * 0x200000 | uVar105 >> 0xb) ^ (uVar105 * 0x4000000 | uVar105 >> 6));
  iVar55 = uVar124 + uVar167 + (uVar58 & uVar100 | ~uVar100 & uVar126) + -0x67c1aeae +
           ((uVar100 * 0x80 | uVar100 >> 0x19) ^
           (uVar100 * 0x200000 | uVar100 >> 0xb) ^ (uVar100 * 0x4000000 | uVar100 >> 6));
  uVar60 = uVar60 + iVar43;
  uVar65 = uVar65 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar71 = uVar71 + iVar55;
  uVar10 = ((uVar5 | uVar53) & uVar74 | uVar5 & uVar53) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar43;
  uVar33 = ((uVar18 | uVar56) & uVar80 | uVar18 & uVar56) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar49;
  uVar20 = ((uVar21 | uVar59) & uVar82 | uVar21 & uVar59) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar52;
  uVar31 = ((uVar8 | uVar91) & uVar84 | uVar8 & uVar91) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  uVar92 = (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7)) + uVar128 +
           uVar62 + (uVar120 >> 10 ^
                    (uVar120 * 0x2000 | uVar120 >> 0x13) ^ (uVar120 * 0x8000 | uVar120 >> 0x11));
  uVar99 = (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) + uVar132 +
           uVar96 + (uVar112 >> 10 ^
                    (uVar112 * 0x2000 | uVar112 >> 0x13) ^ (uVar112 * 0x8000 | uVar112 >> 0x11));
  uVar124 = (uVar22 >> 3 ^ (uVar22 << 0xe | uVar22 >> 0x12) ^ (uVar22 << 0x19 | uVar22 >> 7)) +
            uVar135 + uVar69 +
            (uVar116 >> 10 ^
            (uVar116 * 0x2000 | uVar116 >> 0x13) ^ (uVar116 * 0x8000 | uVar116 >> 0x11));
  uVar137 = (uVar29 >> 3 ^ (uVar29 << 0xe | uVar29 >> 0x12) ^ (uVar29 << 0x19 | uVar29 >> 7)) +
            uVar138 + uVar72 +
            (uVar119 >> 10 ^
            (uVar119 * 0x2000 | uVar119 >> 0x13) ^ (uVar119 * 0x8000 | uVar119 >> 0x11));
  iVar43 = uVar61 + uVar92 + (uVar104 & uVar60 | ~uVar60 & uVar64) + -0x57ce3993 +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar49 = uVar66 + uVar99 + (uVar93 & uVar65 | ~uVar65 & uVar67) + -0x57ce3993 +
           ((uVar65 * 0x80 | uVar65 >> 0x19) ^
           (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6));
  iVar52 = uVar122 + uVar124 + (uVar105 & uVar68 | ~uVar68 & uVar70) + -0x57ce3993 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6));
  iVar55 = uVar126 + uVar137 + (uVar100 & uVar71 | ~uVar71 & uVar58) + -0x57ce3993 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  uVar74 = uVar74 + iVar43;
  uVar80 = uVar80 + iVar49;
  uVar82 = uVar82 + iVar52;
  uVar84 = uVar84 + iVar55;
  uVar23 = ((uVar10 | uVar5) & uVar53 | uVar10 & uVar5) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar34 = ((uVar33 | uVar18) & uVar56 | uVar33 & uVar18) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar44 = ((uVar20 | uVar21) & uVar59 | uVar20 & uVar21) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar50 = ((uVar31 | uVar8) & uVar91 | uVar31 & uVar8) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  uVar154 = (uVar155 >> 3 ^ (uVar155 << 0xe | uVar155 >> 0x12) ^ (uVar155 << 0x19 | uVar155 >> 7)) +
            uVar2 + uVar106 +
            (uVar123 >> 10 ^
            (uVar123 * 0x2000 | uVar123 >> 0x13) ^ (uVar123 * 0x8000 | uVar123 >> 0x11));
  uVar159 = (uVar131 >> 3 ^ (uVar131 << 0xe | uVar131 >> 0x12) ^ (uVar131 << 0x19 | uVar131 >> 7)) +
            uVar7 + uVar129 +
            (uVar158 >> 10 ^
            (uVar158 * 0x2000 | uVar158 >> 0x13) ^ (uVar158 * 0x8000 | uVar158 >> 0x11));
  uVar164 = (uVar160 >> 3 ^ (uVar160 << 0xe | uVar160 >> 0x12) ^ (uVar160 << 0x19 | uVar160 >> 7)) +
            uVar22 + uVar130 +
            (uVar163 >> 10 ^
            (uVar163 * 0x2000 | uVar163 >> 0x13) ^ (uVar163 * 0x8000 | uVar163 >> 0x11));
  uVar168 = (uVar134 >> 3 ^ (uVar134 << 0xe | uVar134 >> 0x12) ^ (uVar134 << 0x19 | uVar134 >> 7)) +
            uVar29 + uVar133 +
            (uVar167 >> 10 ^
            (uVar167 * 0x2000 | uVar167 >> 0x13) ^ (uVar167 * 0x8000 | uVar167 >> 0x11));
  iVar43 = uVar64 + uVar154 + (uVar60 & uVar74 | ~uVar74 & uVar104) + -0x4ffcd838 +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6));
  iVar49 = uVar67 + uVar159 + (uVar65 & uVar80 | ~uVar80 & uVar93) + -0x4ffcd838 +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6));
  iVar52 = uVar70 + uVar164 + (uVar68 & uVar82 | ~uVar82 & uVar105) + -0x4ffcd838 +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6));
  iVar55 = uVar58 + uVar168 + (uVar71 & uVar84 | ~uVar84 & uVar100) + -0x4ffcd838 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6));
  uVar53 = uVar53 + iVar43;
  uVar56 = uVar56 + iVar49;
  uVar59 = uVar59 + iVar52;
  uVar91 = uVar91 + iVar55;
  uVar86 = ((uVar23 | uVar10) & uVar5 | uVar23 & uVar10) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar95 = ((uVar34 | uVar33) & uVar18 | uVar34 & uVar33) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar64 = ((uVar44 | uVar20) & uVar21 | uVar44 & uVar20) +
           ((uVar44 * 0x400 | uVar44 >> 0x16) ^
           (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar98 = ((uVar50 | uVar31) & uVar8 | uVar50 & uVar31) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  uVar126 = (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7)) + uVar155 +
            uVar183 + (uVar92 >> 10 ^
                      (uVar92 * 0x2000 | uVar92 >> 0x13) ^ (uVar92 * 0x8000 | uVar92 >> 0x11));
  uVar125 = (uVar9 >> 3 ^ (uVar9 << 0xe | uVar9 >> 0x12) ^ (uVar9 << 0x19 | uVar9 >> 7)) + uVar131 +
            uVar184 + (uVar99 >> 10 ^
                      (uVar99 * 0x2000 | uVar99 >> 0x13) ^ (uVar99 * 0x8000 | uVar99 >> 0x11));
  uVar145 = (uVar19 >> 3 ^ (uVar19 << 0xe | uVar19 >> 0x12) ^ (uVar19 << 0x19 | uVar19 >> 7)) +
            uVar160 + uVar185 +
            (uVar124 >> 10 ^
            (uVar124 * 0x2000 | uVar124 >> 0x13) ^ (uVar124 * 0x8000 | uVar124 >> 0x11));
  uVar149 = (uVar30 >> 3 ^ (uVar30 << 0xe | uVar30 >> 0x12) ^ (uVar30 << 0x19 | uVar30 >> 7)) +
            uVar134 + uVar186 +
            (uVar137 >> 10 ^
            (uVar137 * 0x2000 | uVar137 >> 0x13) ^ (uVar137 * 0x8000 | uVar137 >> 0x11));
  iVar43 = uVar104 + uVar126 + (uVar74 & uVar53 | ~uVar53 & uVar60) + -0x40a68039 +
           ((uVar53 * 0x80 | uVar53 >> 0x19) ^
           (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6));
  iVar49 = uVar93 + uVar125 + (uVar80 & uVar56 | ~uVar56 & uVar65) + -0x40a68039 +
           ((uVar56 * 0x80 | uVar56 >> 0x19) ^
           (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6));
  iVar52 = uVar105 + uVar145 + (uVar82 & uVar59 | ~uVar59 & uVar68) + -0x40a68039 +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6));
  iVar55 = uVar100 + uVar149 + (uVar84 & uVar91 | ~uVar91 & uVar71) + -0x40a68039 +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  uVar5 = uVar5 + iVar43;
  uVar18 = uVar18 + iVar49;
  uVar21 = uVar21 + iVar52;
  uVar8 = uVar8 + iVar55;
  uVar2 = ((uVar86 | uVar23) & uVar10 | uVar86 & uVar23) +
          ((uVar86 * 0x400 | uVar86 >> 0x16) ^
          (uVar86 * 0x80000 | uVar86 >> 0xd) ^ (uVar86 * 0x40000000 | uVar86 >> 2)) + iVar43;
  uVar7 = ((uVar95 | uVar34) & uVar33 | uVar95 & uVar34) +
          ((uVar95 * 0x400 | uVar95 >> 0x16) ^
          (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar49;
  uVar22 = ((uVar64 | uVar44) & uVar20 | uVar64 & uVar44) +
           ((uVar64 * 0x400 | uVar64 >> 0x16) ^
           (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar52;
  uVar29 = ((uVar98 | uVar50) & uVar31 | uVar98 & uVar50) +
           ((uVar98 * 0x400 | uVar98 >> 0x16) ^
           (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar55;
  uVar66 = (uVar45 >> 3 ^ (uVar45 << 0xe | uVar45 >> 0x12) ^ (uVar45 << 0x19 | uVar45 >> 7)) + uVar4
           + uVar136 +
           (uVar154 >> 10 ^
           (uVar154 * 0x2000 | uVar154 >> 0x13) ^ (uVar154 * 0x8000 | uVar154 >> 0x11));
  uVar131 = (uVar51 >> 3 ^ (uVar51 << 0xe | uVar51 >> 0x12) ^ (uVar51 << 0x19 | uVar51 >> 7)) +
            uVar9 + uVar111 +
            (uVar159 >> 10 ^
            (uVar159 * 0x2000 | uVar159 >> 0x13) ^ (uVar159 * 0x8000 | uVar159 >> 0x11));
  uVar134 = (uVar54 >> 3 ^ (uVar54 << 0xe | uVar54 >> 0x12) ^ (uVar54 << 0x19 | uVar54 >> 7)) +
            uVar19 + uVar115 +
            (uVar164 >> 10 ^
            (uVar164 * 0x2000 | uVar164 >> 0x13) ^ (uVar164 * 0x8000 | uVar164 >> 0x11));
  uVar105 = (uVar118 >> 3 ^ (uVar118 << 0xe | uVar118 >> 0x12) ^ (uVar118 << 0x19 | uVar118 >> 7)) +
            uVar30 + uVar139 +
            (uVar168 >> 10 ^
            (uVar168 * 0x2000 | uVar168 >> 0x13) ^ (uVar168 * 0x8000 | uVar168 >> 0x11));
  iVar43 = uVar60 + uVar66 + (uVar53 & uVar5 | ~uVar5 & uVar74) + -0x391ff40d +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
  iVar49 = uVar65 + uVar131 + (uVar56 & uVar18 | ~uVar18 & uVar80) + -0x391ff40d +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
  iVar52 = uVar68 + uVar134 + (uVar59 & uVar21 | ~uVar21 & uVar82) + -0x391ff40d +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6));
  iVar55 = uVar71 + uVar105 + (uVar91 & uVar8 | ~uVar8 & uVar84) + -0x391ff40d +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar155 = ((uVar2 | uVar86) & uVar23 | uVar2 & uVar86) +
            ((uVar2 * 0x400 | uVar2 >> 0x16) ^
            (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar43;
  uVar160 = ((uVar7 | uVar95) & uVar34 | uVar7 & uVar95) +
            ((uVar7 * 0x400 | uVar7 >> 0x16) ^
            (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar49;
  uVar104 = ((uVar22 | uVar64) & uVar44 | uVar22 & uVar64) +
            ((uVar22 * 0x400 | uVar22 >> 0x16) ^
            (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar52;
  uVar93 = ((uVar29 | uVar98) & uVar50 | uVar29 & uVar98) +
           ((uVar29 * 0x400 | uVar29 >> 0x16) ^
           (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar55;
  uVar144 = (uVar170 >> 3 ^ (uVar170 << 0xe | uVar170 >> 0x12) ^ (uVar170 << 0x19 | uVar170 >> 7)) +
            uVar45 + uVar153 +
            (uVar126 >> 10 ^
            (uVar126 * 0x2000 | uVar126 >> 0x13) ^ (uVar126 * 0x8000 | uVar126 >> 0x11));
  uVar127 = (uVar171 >> 3 ^ (uVar171 << 0xe | uVar171 >> 0x12) ^ (uVar171 << 0x19 | uVar171 >> 7)) +
            uVar51 + uVar157 +
            (uVar125 >> 10 ^
            (uVar125 * 0x2000 | uVar125 >> 0x13) ^ (uVar125 * 0x8000 | uVar125 >> 0x11));
  uVar146 = (uVar176 >> 3 ^ (uVar176 << 0xe | uVar176 >> 0x12) ^ (uVar176 << 0x19 | uVar176 >> 7)) +
            uVar54 + uVar162 +
            (uVar145 >> 10 ^
            (uVar145 * 0x2000 | uVar145 >> 0x13) ^ (uVar145 * 0x8000 | uVar145 >> 0x11));
  uVar150 = (uVar179 >> 3 ^ (uVar179 << 0xe | uVar179 >> 0x12) ^ (uVar179 << 0x19 | uVar179 >> 7)) +
            uVar118 + uVar166 +
            (uVar149 >> 10 ^
            (uVar149 * 0x2000 | uVar149 >> 0x13) ^ (uVar149 * 0x8000 | uVar149 >> 0x11));
  iVar43 = uVar74 + uVar144 + (uVar5 & uVar10 | ~uVar10 & uVar53) + -0x2a586eb9 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
  iVar49 = uVar80 + uVar127 + (uVar18 & uVar33 | ~uVar33 & uVar56) + -0x2a586eb9 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar52 = uVar82 + uVar146 + (uVar21 & uVar20 | ~uVar20 & uVar59) + -0x2a586eb9 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
  iVar55 = uVar84 + uVar150 + (uVar8 & uVar31 | ~uVar31 & uVar91) + -0x2a586eb9 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar9 = ((uVar155 | uVar2) & uVar86 | uVar155 & uVar2) +
          ((uVar155 * 0x400 | uVar155 >> 0x16) ^
          (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar43;
  uVar19 = ((uVar160 | uVar7) & uVar95 | uVar160 & uVar7) +
           ((uVar160 * 0x400 | uVar160 >> 0x16) ^
           (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar49;
  uVar67 = ((uVar104 | uVar22) & uVar64 | uVar104 & uVar22) +
           ((uVar104 * 0x400 | uVar104 >> 0x16) ^
           (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar52;
  uVar51 = ((uVar93 | uVar29) & uVar98 | uVar93 & uVar29) +
           ((uVar93 * 0x400 | uVar93 >> 0x16) ^
           (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar55;
  uVar170 = (uVar142 >> 3 ^ (uVar142 << 0xe | uVar142 >> 0x12) ^ (uVar142 << 0x19 | uVar142 >> 7)) +
            uVar170 + uVar120 +
            (uVar66 >> 10 ^ (uVar66 * 0x2000 | uVar66 >> 0x13) ^ (uVar66 * 0x8000 | uVar66 >> 0x11))
  ;
  uVar175 = (uVar148 >> 3 ^ (uVar148 << 0xe | uVar148 >> 0x12) ^ (uVar148 << 0x19 | uVar148 >> 7)) +
            uVar171 + uVar112 +
            (uVar131 >> 10 ^
            (uVar131 * 0x2000 | uVar131 >> 0x13) ^ (uVar131 * 0x8000 | uVar131 >> 0x11));
  uVar178 = (uVar147 >> 3 ^ (uVar147 << 0xe | uVar147 >> 0x12) ^ (uVar147 << 0x19 | uVar147 >> 7)) +
            uVar176 + uVar116 +
            (uVar134 >> 10 ^
            (uVar134 * 0x2000 | uVar134 >> 0x13) ^ (uVar134 * 0x8000 | uVar134 >> 0x11));
  uVar181 = (uVar143 >> 3 ^ (uVar143 << 0xe | uVar143 >> 0x12) ^ (uVar143 << 0x19 | uVar143 >> 7)) +
            uVar179 + uVar119 +
            (uVar105 >> 10 ^
            (uVar105 * 0x2000 | uVar105 >> 0x13) ^ (uVar105 * 0x8000 | uVar105 >> 0x11));
  iVar43 = uVar53 + uVar170 + (uVar10 & uVar23 | ~uVar23 & uVar5) +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) + 0x6ca6351;
  iVar49 = uVar56 + uVar175 + (uVar33 & uVar34 | ~uVar34 & uVar18) +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) + 0x6ca6351;
  iVar52 = uVar59 + uVar178 + (uVar20 & uVar44 | ~uVar44 & uVar21) +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) + 0x6ca6351;
  iVar55 = uVar91 + uVar181 + (uVar31 & uVar50 | ~uVar50 & uVar8) +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) + 0x6ca6351;
  uVar86 = uVar86 + iVar43;
  uVar95 = uVar95 + iVar49;
  uVar64 = uVar64 + iVar52;
  uVar98 = uVar98 + iVar55;
  uVar65 = ((uVar9 | uVar155) & uVar2 | uVar9 & uVar155) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar43;
  uVar68 = ((uVar19 | uVar160) & uVar7 | uVar19 & uVar160) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar49;
  uVar122 = ((uVar67 | uVar104) & uVar22 | uVar67 & uVar104) +
            ((uVar67 * 0x400 | uVar67 >> 0x16) ^
            (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar52;
  uVar71 = ((uVar51 | uVar93) & uVar29 | uVar51 & uVar93) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar55;
  uVar80 = (uVar152 >> 3 ^
           (uVar152 * 0x4000 | uVar152 >> 0x12) ^ (uVar152 * 0x2000000 | uVar152 >> 7)) + uVar142 +
           uVar123 + (uVar144 >> 10 ^
                     (uVar144 * 0x2000 | uVar144 >> 0x13) ^ (uVar144 * 0x8000 | uVar144 >> 0x11));
  uVar84 = (uVar156 >> 3 ^
           (uVar156 * 0x4000 | uVar156 >> 0x12) ^ (uVar156 * 0x2000000 | uVar156 >> 7)) + uVar148 +
           uVar158 + (uVar127 >> 10 ^
                     (uVar127 * 0x2000 | uVar127 >> 0x13) ^ (uVar127 * 0x8000 | uVar127 >> 0x11));
  uVar100 = (uVar161 >> 3 ^
            (uVar161 * 0x4000 | uVar161 >> 0x12) ^ (uVar161 * 0x2000000 | uVar161 >> 7)) + uVar147 +
            uVar163 + (uVar146 >> 10 ^
                      (uVar146 * 0x2000 | uVar146 >> 0x13) ^ (uVar146 * 0x8000 | uVar146 >> 0x11));
  uVar128 = (uVar165 >> 3 ^
            (uVar165 * 0x4000 | uVar165 >> 0x12) ^ (uVar165 * 0x2000000 | uVar165 >> 7)) + uVar143 +
            uVar167 + (uVar150 >> 10 ^
                      (uVar150 * 0x2000 | uVar150 >> 0x13) ^ (uVar150 * 0x8000 | uVar150 >> 0x11));
  iVar43 = uVar5 + uVar80 + (uVar23 & uVar86 | ~uVar86 & uVar10) + 0x14292967 +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  iVar49 = uVar18 + uVar84 + (uVar34 & uVar95 | ~uVar95 & uVar33) + 0x14292967 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar52 = uVar21 + uVar100 + (uVar44 & uVar64 | ~uVar64 & uVar20) + 0x14292967 +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar55 = uVar8 + uVar128 + (uVar50 & uVar98 | ~uVar98 & uVar31) + 0x14292967 +
           ((uVar98 * 0x80 | uVar98 >> 0x19) ^
           (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar7 = uVar7 + iVar49;
  uVar22 = uVar22 + iVar52;
  uVar29 = uVar29 + iVar55;
  uVar18 = ((uVar65 | uVar9) & uVar155 | uVar65 & uVar9) +
           ((uVar65 * 0x400 | uVar65 >> 0x16) ^
           (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar43;
  uVar57 = ((uVar68 | uVar19) & uVar160 | uVar68 & uVar19) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar49;
  uVar70 = ((uVar122 | uVar67) & uVar104 | uVar122 & uVar67) +
           ((uVar122 * 0x400 | uVar122 >> 0x16) ^
           (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar52;
  uVar118 = ((uVar71 | uVar51) & uVar93 | uVar71 & uVar51) +
            ((uVar71 * 0x400 | uVar71 >> 0x16) ^
            (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar55;
  uVar171 = (uVar169 >> 3 ^
            (uVar169 * 0x4000 | uVar169 >> 0x12) ^ (uVar169 * 0x2000000 | uVar169 >> 7)) + uVar152 +
            uVar92 + (uVar170 >> 10 ^
                     (uVar170 * 0x2000 | uVar170 >> 0x13) ^ (uVar170 * 0x8000 | uVar170 >> 0x11));
  uVar176 = (uVar174 >> 3 ^
            (uVar174 * 0x4000 | uVar174 >> 0x12) ^ (uVar174 * 0x2000000 | uVar174 >> 7)) + uVar156 +
            uVar99 + (uVar175 >> 10 ^
                     (uVar175 * 0x2000 | uVar175 >> 0x13) ^ (uVar175 * 0x8000 | uVar175 >> 0x11));
  uVar179 = (uVar177 >> 3 ^
            (uVar177 * 0x4000 | uVar177 >> 0x12) ^ (uVar177 * 0x2000000 | uVar177 >> 7)) + uVar161 +
            uVar124 + (uVar178 >> 10 ^
                      (uVar178 * 0x2000 | uVar178 >> 0x13) ^ (uVar178 * 0x8000 | uVar178 >> 0x11));
  uVar182 = (uVar180 >> 3 ^
            (uVar180 * 0x4000 | uVar180 >> 0x12) ^ (uVar180 * 0x2000000 | uVar180 >> 7)) + uVar165 +
            uVar137 + (uVar181 >> 10 ^
                      (uVar181 * 0x2000 | uVar181 >> 0x13) ^ (uVar181 * 0x8000 | uVar181 >> 0x11));
  iVar43 = uVar10 + uVar171 + (uVar86 & uVar2 | ~uVar2 & uVar23) + 0x27b70a85 +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = uVar33 + uVar176 + (uVar95 & uVar7 | ~uVar7 & uVar34) + 0x27b70a85 +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  iVar52 = uVar20 + uVar179 + (uVar64 & uVar22 | ~uVar22 & uVar44) + 0x27b70a85 +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
  iVar55 = uVar31 + uVar182 + (uVar98 & uVar29 | ~uVar29 & uVar50) + 0x27b70a85 +
           ((uVar29 * 0x80 | uVar29 >> 0x19) ^
           (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6));
  uVar155 = uVar155 + iVar43;
  uVar160 = uVar160 + iVar49;
  uVar104 = uVar104 + iVar52;
  uVar93 = uVar93 + iVar55;
  uVar58 = ((uVar18 | uVar65) & uVar9 | uVar18 & uVar65) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar43;
  uVar60 = ((uVar57 | uVar68) & uVar19 | uVar57 & uVar68) +
           ((uVar57 * 0x400 | uVar57 >> 0x16) ^
           (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar49;
  uVar87 = ((uVar70 | uVar122) & uVar67 | uVar70 & uVar122) +
           ((uVar70 * 0x400 | uVar70 >> 0x16) ^
           (uVar70 * 0x80000 | uVar70 >> 0xd) ^ (uVar70 * 0x40000000 | uVar70 >> 2)) + iVar52;
  uVar61 = ((uVar118 | uVar71) & uVar51 | uVar118 & uVar71) +
           ((uVar118 * 0x400 | uVar118 >> 0x16) ^
           (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar55;
  uVar142 = (uVar62 >> 3 ^ (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7))
            + uVar169 + uVar154 +
            (uVar80 >> 10 ^ (uVar80 * 0x2000 | uVar80 >> 0x13) ^ (uVar80 * 0x8000 | uVar80 >> 0x11))
  ;
  uVar148 = (uVar96 >> 3 ^ (uVar96 * 0x4000 | uVar96 >> 0x12) ^ (uVar96 * 0x2000000 | uVar96 >> 7))
            + uVar174 + uVar159 +
            (uVar84 >> 10 ^ (uVar84 * 0x2000 | uVar84 >> 0x13) ^ (uVar84 * 0x8000 | uVar84 >> 0x11))
  ;
  uVar147 = (uVar69 >> 3 ^ (uVar69 * 0x4000 | uVar69 >> 0x12) ^ (uVar69 * 0x2000000 | uVar69 >> 7))
            + uVar177 + uVar164 +
            (uVar100 >> 10 ^
            (uVar100 * 0x2000 | uVar100 >> 0x13) ^ (uVar100 * 0x8000 | uVar100 >> 0x11));
  uVar151 = (uVar72 >> 3 ^ (uVar72 * 0x4000 | uVar72 >> 0x12) ^ (uVar72 * 0x2000000 | uVar72 >> 7))
            + uVar180 + uVar168 +
            (uVar128 >> 10 ^
            (uVar128 * 0x2000 | uVar128 >> 0x13) ^ (uVar128 * 0x8000 | uVar128 >> 0x11));
  iVar43 = uVar23 + uVar142 + (uVar2 & uVar155 | ~uVar155 & uVar86) + 0x2e1b2138 +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6));
  iVar49 = uVar34 + uVar148 + (uVar7 & uVar160 | ~uVar160 & uVar95) + 0x2e1b2138 +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6));
  iVar52 = uVar44 + uVar147 + (uVar22 & uVar104 | ~uVar104 & uVar64) + 0x2e1b2138 +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6));
  iVar55 = uVar50 + uVar151 + (uVar29 & uVar93 | ~uVar93 & uVar98) + 0x2e1b2138 +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6));
  uVar9 = uVar9 + iVar43;
  uVar19 = uVar19 + iVar49;
  uVar67 = uVar67 + iVar52;
  uVar51 = uVar51 + iVar55;
  uVar53 = ((uVar58 | uVar18) & uVar65 | uVar58 & uVar18) +
           ((uVar58 * 0x400 | uVar58 >> 0x16) ^
           (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar43;
  uVar56 = ((uVar60 | uVar57) & uVar68 | uVar60 & uVar57) +
           ((uVar60 * 0x400 | uVar60 >> 0x16) ^
           (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar49;
  uVar59 = ((uVar87 | uVar70) & uVar122 | uVar87 & uVar70) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar52;
  uVar91 = ((uVar61 | uVar118) & uVar71 | uVar61 & uVar118) +
           ((uVar61 * 0x400 | uVar61 >> 0x16) ^
           (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar55;
  uVar21 = (uVar106 >> 3 ^
           (uVar106 * 0x4000 | uVar106 >> 0x12) ^ (uVar106 * 0x2000000 | uVar106 >> 7)) + uVar62 +
           uVar126 + (uVar171 >> 10 ^
                     (uVar171 * 0x2000 | uVar171 >> 0x13) ^ (uVar171 * 0x8000 | uVar171 >> 0x11));
  uVar30 = (uVar129 >> 3 ^
           (uVar129 * 0x4000 | uVar129 >> 0x12) ^ (uVar129 * 0x2000000 | uVar129 >> 7)) + uVar96 +
           uVar125 + (uVar176 >> 10 ^
                     (uVar176 * 0x2000 | uVar176 >> 0x13) ^ (uVar176 * 0x8000 | uVar176 >> 0x11));
  uVar10 = (uVar130 >> 3 ^
           (uVar130 * 0x4000 | uVar130 >> 0x12) ^ (uVar130 * 0x2000000 | uVar130 >> 7)) + uVar69 +
           uVar145 + (uVar179 >> 10 ^
                     (uVar179 * 0x2000 | uVar179 >> 0x13) ^ (uVar179 * 0x8000 | uVar179 >> 0x11));
  uVar20 = (uVar133 >> 3 ^
           (uVar133 * 0x4000 | uVar133 >> 0x12) ^ (uVar133 * 0x2000000 | uVar133 >> 7)) + uVar72 +
           uVar149 + (uVar182 >> 10 ^
                     (uVar182 * 0x2000 | uVar182 >> 0x13) ^ (uVar182 * 0x8000 | uVar182 >> 0x11));
  iVar43 = uVar86 + uVar21 + (uVar155 & uVar9 | ~uVar9 & uVar2) + 0x4d2c6dfc +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
  iVar49 = uVar95 + uVar30 + (uVar160 & uVar19 | ~uVar19 & uVar7) + 0x4d2c6dfc +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
  iVar52 = uVar64 + uVar10 + (uVar104 & uVar67 | ~uVar67 & uVar22) + 0x4d2c6dfc +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  iVar55 = uVar98 + uVar20 + (uVar93 & uVar51 | ~uVar51 & uVar29) + 0x4d2c6dfc +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  uVar65 = uVar65 + iVar43;
  uVar68 = uVar68 + iVar49;
  uVar122 = uVar122 + iVar52;
  uVar71 = uVar71 + iVar55;
  uVar86 = ((uVar53 | uVar58) & uVar18 | uVar53 & uVar58) +
           ((uVar53 * 0x400 | uVar53 >> 0x16) ^
           (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar43;
  uVar95 = ((uVar56 | uVar60) & uVar57 | uVar56 & uVar60) +
           ((uVar56 * 0x400 | uVar56 >> 0x16) ^
           (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar49;
  uVar98 = ((uVar59 | uVar87) & uVar70 | uVar59 & uVar87) +
           ((uVar59 * 0x400 | uVar59 >> 0x16) ^
           (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar52;
  uVar62 = ((uVar91 | uVar61) & uVar118 | uVar91 & uVar61) +
           ((uVar91 * 0x400 | uVar91 >> 0x16) ^
           (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2)) + iVar55;
  uVar156 = (uVar183 >> 3 ^
            (uVar183 * 0x4000 | uVar183 >> 0x12) ^ (uVar183 * 0x2000000 | uVar183 >> 7)) + uVar106 +
            uVar66 + (uVar142 >> 10 ^
                     (uVar142 * 0x2000 | uVar142 >> 0x13) ^ (uVar142 * 0x8000 | uVar142 >> 0x11));
  uVar165 = (uVar184 >> 3 ^
            (uVar184 * 0x4000 | uVar184 >> 0x12) ^ (uVar184 * 0x2000000 | uVar184 >> 7)) + uVar129 +
            uVar131 + (uVar148 >> 10 ^
                      (uVar148 * 0x2000 | uVar148 >> 0x13) ^ (uVar148 * 0x8000 | uVar148 >> 0x11));
  uVar174 = (uVar185 >> 3 ^
            (uVar185 * 0x4000 | uVar185 >> 0x12) ^ (uVar185 * 0x2000000 | uVar185 >> 7)) + uVar130 +
            uVar134 + (uVar147 >> 10 ^
                      (uVar147 * 0x2000 | uVar147 >> 0x13) ^ (uVar147 * 0x8000 | uVar147 >> 0x11));
  uVar180 = (uVar186 >> 3 ^
            (uVar186 * 0x4000 | uVar186 >> 0x12) ^ (uVar186 * 0x2000000 | uVar186 >> 7)) + uVar133 +
            uVar105 + (uVar151 >> 10 ^
                      (uVar151 * 0x2000 | uVar151 >> 0x13) ^ (uVar151 * 0x8000 | uVar151 >> 0x11));
  iVar43 = uVar2 + uVar156 + (uVar9 & uVar65 | ~uVar65 & uVar155) + 0x53380d13 +
           ((uVar65 * 0x80 | uVar65 >> 0x19) ^
           (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6));
  iVar49 = uVar7 + uVar165 + (uVar19 & uVar68 | ~uVar68 & uVar160) + 0x53380d13 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6));
  iVar52 = uVar22 + uVar174 + (uVar67 & uVar122 | ~uVar122 & uVar104) + 0x53380d13 +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6));
  iVar55 = uVar29 + uVar180 + (uVar51 & uVar71 | ~uVar71 & uVar93) + 0x53380d13 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  uVar18 = uVar18 + iVar43;
  uVar57 = uVar57 + iVar49;
  uVar70 = uVar70 + iVar52;
  uVar118 = uVar118 + iVar55;
  uVar2 = ((uVar86 | uVar53) & uVar58 | uVar86 & uVar53) +
          ((uVar86 * 0x400 | uVar86 >> 0x16) ^
          (uVar86 * 0x80000 | uVar86 >> 0xd) ^ (uVar86 * 0x40000000 | uVar86 >> 2)) + iVar43;
  uVar4 = ((uVar95 | uVar56) & uVar60 | uVar95 & uVar56) +
          ((uVar95 * 0x400 | uVar95 >> 0x16) ^
          (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar49;
  uVar5 = ((uVar98 | uVar59) & uVar87 | uVar98 & uVar59) +
          ((uVar98 * 0x400 | uVar98 >> 0x16) ^
          (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar52;
  uVar7 = ((uVar62 | uVar91) & uVar61 | uVar62 & uVar91) +
          ((uVar62 * 0x400 | uVar62 >> 0x16) ^
          (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar55;
  uVar64 = (uVar136 >> 3 ^
           (uVar136 * 0x4000 | uVar136 >> 0x12) ^ (uVar136 * 0x2000000 | uVar136 >> 7)) + uVar183 +
           uVar144 + (uVar21 >> 10 ^
                     (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11));
  uVar114 = (uVar111 >> 3 ^
            (uVar111 * 0x4000 | uVar111 >> 0x12) ^ (uVar111 * 0x2000000 | uVar111 >> 7)) + uVar184 +
            uVar127 + (uVar30 >> 10 ^
                      (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11));
  uVar45 = (uVar115 >> 3 ^
           (uVar115 * 0x4000 | uVar115 >> 0x12) ^ (uVar115 * 0x2000000 | uVar115 >> 7)) + uVar185 +
           uVar146 + (uVar10 >> 10 ^
                     (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
  uVar54 = (uVar139 >> 3 ^
           (uVar139 * 0x4000 | uVar139 >> 0x12) ^ (uVar139 * 0x2000000 | uVar139 >> 7)) + uVar186 +
           uVar150 + (uVar20 >> 10 ^
                     (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
  iVar43 = uVar155 + uVar64 + (uVar65 & uVar18 | ~uVar18 & uVar9) + 0x650a7354 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
  iVar49 = uVar160 + uVar114 + (uVar68 & uVar57 | ~uVar57 & uVar19) + 0x650a7354 +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  iVar52 = uVar104 + uVar45 + (uVar122 & uVar70 | ~uVar70 & uVar67) + 0x650a7354 +
           ((uVar70 * 0x80 | uVar70 >> 0x19) ^
           (uVar70 * 0x200000 | uVar70 >> 0xb) ^ (uVar70 * 0x4000000 | uVar70 >> 6));
  iVar55 = uVar93 + uVar54 + (uVar71 & uVar118 | ~uVar118 & uVar51) + 0x650a7354 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6));
  uVar58 = uVar58 + iVar43;
  uVar60 = uVar60 + iVar49;
  uVar87 = uVar87 + iVar52;
  uVar61 = uVar61 + iVar55;
  uVar23 = ((uVar2 | uVar86) & uVar53 | uVar2 & uVar86) +
           ((uVar2 * 0x400 | uVar2 >> 0x16) ^
           (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar43;
  uVar34 = ((uVar4 | uVar95) & uVar56 | uVar4 & uVar95) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar49;
  uVar44 = ((uVar5 | uVar98) & uVar59 | uVar5 & uVar98) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar52;
  uVar50 = ((uVar7 | uVar62) & uVar91 | uVar7 & uVar62) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar55;
  uVar161 = (uVar153 >> 3 ^
            (uVar153 * 0x4000 | uVar153 >> 0x12) ^ (uVar153 * 0x2000000 | uVar153 >> 7)) + uVar136 +
            uVar170 + (uVar156 >> 10 ^
                      (uVar156 * 0x2000 | uVar156 >> 0x13) ^ (uVar156 * 0x8000 | uVar156 >> 0x11));
  uVar169 = (uVar157 >> 3 ^
            (uVar157 * 0x4000 | uVar157 >> 0x12) ^ (uVar157 * 0x2000000 | uVar157 >> 7)) + uVar111 +
            uVar175 + (uVar165 >> 10 ^
                      (uVar165 * 0x2000 | uVar165 >> 0x13) ^ (uVar165 * 0x8000 | uVar165 >> 0x11));
  uVar177 = (uVar162 >> 3 ^
            (uVar162 * 0x4000 | uVar162 >> 0x12) ^ (uVar162 * 0x2000000 | uVar162 >> 7)) + uVar115 +
            uVar178 + (uVar174 >> 10 ^
                      (uVar174 * 0x2000 | uVar174 >> 0x13) ^ (uVar174 * 0x8000 | uVar174 >> 0x11));
  uVar183 = (uVar166 >> 3 ^
            (uVar166 * 0x4000 | uVar166 >> 0x12) ^ (uVar166 * 0x2000000 | uVar166 >> 7)) + uVar139 +
            uVar181 + (uVar180 >> 10 ^
                      (uVar180 * 0x2000 | uVar180 >> 0x13) ^ (uVar180 * 0x8000 | uVar180 >> 0x11));
  iVar43 = uVar9 + uVar161 + (uVar18 & uVar58 | ~uVar58 & uVar65) + 0x766a0abb +
           ((uVar58 * 0x80 | uVar58 >> 0x19) ^
           (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6));
  iVar49 = uVar19 + uVar169 + (uVar57 & uVar60 | ~uVar60 & uVar68) + 0x766a0abb +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar52 = uVar67 + uVar177 + (uVar70 & uVar87 | ~uVar87 & uVar122) + 0x766a0abb +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar55 = uVar51 + uVar183 + (uVar118 & uVar61 | ~uVar61 & uVar71) + 0x766a0abb +
           ((uVar61 * 0x80 | uVar61 >> 0x19) ^
           (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6));
  uVar53 = uVar53 + iVar43;
  uVar56 = uVar56 + iVar49;
  uVar59 = uVar59 + iVar52;
  uVar91 = uVar91 + iVar55;
  uVar29 = ((uVar23 | uVar2) & uVar86 | uVar23 & uVar2) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar8 = ((uVar34 | uVar4) & uVar95 | uVar34 & uVar4) +
          ((uVar34 * 0x400 | uVar34 >> 0x16) ^
          (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar33 = ((uVar44 | uVar5) & uVar98 | uVar44 & uVar5) +
           ((uVar44 * 0x400 | uVar44 >> 0x16) ^
           (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar31 = ((uVar50 | uVar7) & uVar62 | uVar50 & uVar7) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  uVar184 = (uVar120 >> 3 ^
            (uVar120 * 0x4000 | uVar120 >> 0x12) ^ (uVar120 * 0x2000000 | uVar120 >> 7)) + uVar153 +
            uVar80 + (uVar64 >> 10 ^
                     (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
  uVar185 = (uVar112 >> 3 ^
            (uVar112 * 0x4000 | uVar112 >> 0x12) ^ (uVar112 * 0x2000000 | uVar112 >> 7)) + uVar157 +
            uVar84 + (uVar114 >> 10 ^
                     (uVar114 * 0x2000 | uVar114 >> 0x13) ^ (uVar114 * 0x8000 | uVar114 >> 0x11));
  uVar186 = (uVar116 >> 3 ^
            (uVar116 * 0x4000 | uVar116 >> 0x12) ^ (uVar116 * 0x2000000 | uVar116 >> 7)) + uVar162 +
            uVar100 + (uVar45 >> 10 ^
                      (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  uVar187 = (uVar119 >> 3 ^
            (uVar119 * 0x4000 | uVar119 >> 0x12) ^ (uVar119 * 0x2000000 | uVar119 >> 7)) + uVar166 +
            uVar128 + (uVar54 >> 10 ^
                      (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11));
  iVar43 = uVar65 + uVar184 + (uVar58 & uVar53 | ~uVar53 & uVar18) + -0x7e3d36d2 +
           ((uVar53 * 0x80 | uVar53 >> 0x19) ^
           (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6));
  iVar49 = uVar68 + uVar185 + (uVar60 & uVar56 | ~uVar56 & uVar57) + -0x7e3d36d2 +
           ((uVar56 * 0x80 | uVar56 >> 0x19) ^
           (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6));
  iVar52 = uVar122 + uVar186 + (uVar87 & uVar59 | ~uVar59 & uVar70) + -0x7e3d36d2 +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6));
  iVar55 = uVar71 + uVar187 + (uVar61 & uVar91 | ~uVar91 & uVar118) + -0x7e3d36d2 +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  uVar86 = uVar86 + iVar43;
  uVar95 = uVar95 + iVar49;
  uVar98 = uVar98 + iVar52;
  uVar62 = uVar62 + iVar55;
  uVar67 = ((uVar29 | uVar23) & uVar2 | uVar29 & uVar23) +
           ((uVar29 * 0x400 | uVar29 >> 0x16) ^
           (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar43;
  uVar51 = ((uVar8 | uVar34) & uVar4 | uVar8 & uVar34) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar49;
  uVar71 = ((uVar33 | uVar44) & uVar5 | uVar33 & uVar44) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar52;
  uVar133 = ((uVar31 | uVar50) & uVar7 | uVar31 & uVar50) +
            ((uVar31 * 0x400 | uVar31 >> 0x16) ^
            (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  uVar72 = (uVar123 >> 3 ^
           (uVar123 * 0x4000 | uVar123 >> 0x12) ^ (uVar123 * 0x2000000 | uVar123 >> 7)) + uVar120 +
           uVar171 + (uVar161 >> 10 ^
                     (uVar161 * 0x2000 | uVar161 >> 0x13) ^ (uVar161 * 0x8000 | uVar161 >> 0x11));
  uVar132 = (uVar158 >> 3 ^
            (uVar158 * 0x4000 | uVar158 >> 0x12) ^ (uVar158 * 0x2000000 | uVar158 >> 7)) + uVar112 +
            uVar176 + (uVar169 >> 10 ^
                      (uVar169 * 0x2000 | uVar169 >> 0x13) ^ (uVar169 * 0x8000 | uVar169 >> 0x11));
  uVar135 = (uVar163 >> 3 ^
            (uVar163 * 0x4000 | uVar163 >> 0x12) ^ (uVar163 * 0x2000000 | uVar163 >> 7)) + uVar116 +
            uVar179 + (uVar177 >> 10 ^
                      (uVar177 * 0x2000 | uVar177 >> 0x13) ^ (uVar177 * 0x8000 | uVar177 >> 0x11));
  uVar138 = (uVar167 >> 3 ^
            (uVar167 * 0x4000 | uVar167 >> 0x12) ^ (uVar167 * 0x2000000 | uVar167 >> 7)) + uVar119 +
            uVar182 + (uVar183 >> 10 ^
                      (uVar183 * 0x2000 | uVar183 >> 0x13) ^ (uVar183 * 0x8000 | uVar183 >> 0x11));
  iVar43 = uVar18 + uVar72 + (uVar53 & uVar86 | ~uVar86 & uVar58) + -0x6d8dd37b +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  iVar49 = uVar57 + uVar132 + (uVar56 & uVar95 | ~uVar95 & uVar60) + -0x6d8dd37b +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar52 = uVar70 + uVar135 + (uVar59 & uVar98 | ~uVar98 & uVar87) + -0x6d8dd37b +
           ((uVar98 * 0x80 | uVar98 >> 0x19) ^
           (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6));
  iVar55 = uVar118 + uVar138 + (uVar91 & uVar62 | ~uVar62 & uVar61) + -0x6d8dd37b +
           ((uVar62 * 0x80 | uVar62 >> 0x19) ^
           (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar4 = uVar4 + iVar49;
  uVar5 = uVar5 + iVar52;
  uVar7 = uVar7 + iVar55;
  uVar57 = ((uVar67 | uVar29) & uVar23 | uVar67 & uVar29) +
           ((uVar67 * 0x400 | uVar67 >> 0x16) ^
           (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar43;
  uVar157 = ((uVar51 | uVar8) & uVar34 | uVar51 & uVar8) +
            ((uVar51 * 0x400 | uVar51 >> 0x16) ^
            (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar162 = ((uVar71 | uVar33) & uVar44 | uVar71 & uVar33) +
            ((uVar71 * 0x400 | uVar71 >> 0x16) ^
            (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar52;
  uVar166 = ((uVar133 | uVar31) & uVar50 | uVar133 & uVar31) +
            ((uVar133 * 0x400 | uVar133 >> 0x16) ^
            (uVar133 * 0x80000 | uVar133 >> 0xd) ^ (uVar133 * 0x40000000 | uVar133 >> 2)) + iVar55;
  uVar123 = (uVar92 >> 3 ^ (uVar92 * 0x4000 | uVar92 >> 0x12) ^ (uVar92 * 0x2000000 | uVar92 >> 7))
            + uVar123 + uVar142 +
            (uVar184 >> 10 ^
            (uVar184 * 0x2000 | uVar184 >> 0x13) ^ (uVar184 * 0x8000 | uVar184 >> 0x11));
  uVar143 = (uVar99 >> 3 ^ (uVar99 * 0x4000 | uVar99 >> 0x12) ^ (uVar99 * 0x2000000 | uVar99 >> 7))
            + uVar158 + uVar148 +
            (uVar185 >> 10 ^
            (uVar185 * 0x2000 | uVar185 >> 0x13) ^ (uVar185 * 0x8000 | uVar185 >> 0x11));
  uVar153 = (uVar124 >> 3 ^
            (uVar124 * 0x4000 | uVar124 >> 0x12) ^ (uVar124 * 0x2000000 | uVar124 >> 7)) + uVar163 +
            uVar147 + (uVar186 >> 10 ^
                      (uVar186 * 0x2000 | uVar186 >> 0x13) ^ (uVar186 * 0x8000 | uVar186 >> 0x11));
  uVar152 = (uVar137 >> 3 ^
            (uVar137 * 0x4000 | uVar137 >> 0x12) ^ (uVar137 * 0x2000000 | uVar137 >> 7)) + uVar167 +
            uVar151 + (uVar187 >> 10 ^
                      (uVar187 * 0x2000 | uVar187 >> 0x13) ^ (uVar187 * 0x8000 | uVar187 >> 0x11));
  iVar43 = uVar58 + uVar123 + (uVar86 & uVar2 | ~uVar2 & uVar53) + -0x5d40175f +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = uVar60 + uVar143 + (uVar95 & uVar4 | ~uVar4 & uVar56) + -0x5d40175f +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
  iVar52 = uVar87 + uVar153 + (uVar98 & uVar5 | ~uVar5 & uVar59) + -0x5d40175f +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
  iVar55 = uVar61 + uVar152 + (uVar62 & uVar7 | ~uVar7 & uVar91) + -0x5d40175f +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar9 = ((uVar57 | uVar67) & uVar29 | uVar57 & uVar67) +
          ((uVar57 * 0x400 | uVar57 >> 0x16) ^
          (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar43;
  uVar18 = ((uVar157 | uVar51) & uVar8 | uVar157 & uVar51) +
           ((uVar157 * 0x400 | uVar157 >> 0x16) ^
           (uVar157 * 0x80000 | uVar157 >> 0xd) ^ (uVar157 * 0x40000000 | uVar157 >> 2)) + iVar49;
  uVar22 = ((uVar162 | uVar71) & uVar33 | uVar162 & uVar71) +
           ((uVar162 * 0x400 | uVar162 >> 0x16) ^
           (uVar162 * 0x80000 | uVar162 >> 0xd) ^ (uVar162 * 0x40000000 | uVar162 >> 2)) + iVar52;
  uVar19 = ((uVar166 | uVar133) & uVar31 | uVar166 & uVar133) +
           ((uVar166 * 0x400 | uVar166 >> 0x16) ^
           (uVar166 * 0x80000 | uVar166 >> 0xd) ^ (uVar166 * 0x40000000 | uVar166 >> 2)) + iVar55;
  uVar65 = (uVar154 >> 3 ^
           (uVar154 * 0x4000 | uVar154 >> 0x12) ^ (uVar154 * 0x2000000 | uVar154 >> 7)) + uVar92 +
           uVar21 + (uVar72 >> 10 ^
                    (uVar72 * 0x2000 | uVar72 >> 0x13) ^ (uVar72 * 0x8000 | uVar72 >> 0x11));
  uVar96 = (uVar159 >> 3 ^
           (uVar159 * 0x4000 | uVar159 >> 0x12) ^ (uVar159 * 0x2000000 | uVar159 >> 7)) + uVar99 +
           uVar30 + (uVar132 >> 10 ^
                    (uVar132 * 0x2000 | uVar132 >> 0x13) ^ (uVar132 * 0x8000 | uVar132 >> 0x11));
  uVar122 = (uVar164 >> 3 ^
            (uVar164 * 0x4000 | uVar164 >> 0x12) ^ (uVar164 * 0x2000000 | uVar164 >> 7)) + uVar124 +
            uVar10 + (uVar135 >> 10 ^
                     (uVar135 * 0x2000 | uVar135 >> 0x13) ^ (uVar135 * 0x8000 | uVar135 >> 0x11));
  uVar124 = (uVar168 >> 3 ^
            (uVar168 * 0x4000 | uVar168 >> 0x12) ^ (uVar168 * 0x2000000 | uVar168 >> 7)) + uVar137 +
            uVar20 + (uVar138 >> 10 ^
                     (uVar138 * 0x2000 | uVar138 >> 0x13) ^ (uVar138 * 0x8000 | uVar138 >> 0x11));
  iVar43 = uVar53 + uVar65 + (uVar2 & uVar23 | ~uVar23 & uVar86) + -0x57e599b5 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar49 = uVar56 + uVar96 + (uVar4 & uVar34 | ~uVar34 & uVar95) + -0x57e599b5 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar52 = uVar59 + uVar122 + (uVar5 & uVar44 | ~uVar44 & uVar98) + -0x57e599b5 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar55 = uVar91 + uVar124 + (uVar7 & uVar50 | ~uVar50 & uVar62) + -0x57e599b5 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  uVar29 = uVar29 + iVar43;
  uVar8 = uVar8 + iVar49;
  uVar33 = uVar33 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar112 = ((uVar9 | uVar57) & uVar67 | uVar9 & uVar57) +
            ((uVar9 * 0x400 | uVar9 >> 0x16) ^
            (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar43;
  uVar116 = ((uVar18 | uVar157) & uVar51 | uVar18 & uVar157) +
            ((uVar18 * 0x400 | uVar18 >> 0x16) ^
            (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar49;
  uVar119 = ((uVar22 | uVar162) & uVar71 | uVar22 & uVar162) +
            ((uVar22 * 0x400 | uVar22 >> 0x16) ^
            (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar52;
  uVar137 = ((uVar19 | uVar166) & uVar133 | uVar19 & uVar166) +
            ((uVar19 * 0x400 | uVar19 >> 0x16) ^
            (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar55;
  uVar155 = (uVar126 >> 3 ^
            (uVar126 * 0x4000 | uVar126 >> 0x12) ^ (uVar126 * 0x2000000 | uVar126 >> 7)) + uVar154 +
            uVar156 + (uVar123 >> 10 ^
                      (uVar123 * 0x2000 | uVar123 >> 0x13) ^ (uVar123 * 0x8000 | uVar123 >> 0x11));
  uVar160 = (uVar125 >> 3 ^
            (uVar125 * 0x4000 | uVar125 >> 0x12) ^ (uVar125 * 0x2000000 | uVar125 >> 7)) + uVar159 +
            uVar165 + (uVar143 >> 10 ^
                      (uVar143 * 0x2000 | uVar143 >> 0x13) ^ (uVar143 * 0x8000 | uVar143 >> 0x11));
  uVar104 = (uVar145 >> 3 ^
            (uVar145 * 0x4000 | uVar145 >> 0x12) ^ (uVar145 * 0x2000000 | uVar145 >> 7)) + uVar164 +
            uVar174 + (uVar153 >> 10 ^
                      (uVar153 * 0x2000 | uVar153 >> 0x13) ^ (uVar153 * 0x8000 | uVar153 >> 0x11));
  uVar106 = (uVar149 >> 3 ^
            (uVar149 * 0x4000 | uVar149 >> 0x12) ^ (uVar149 * 0x2000000 | uVar149 >> 7)) + uVar168 +
            uVar180 + (uVar152 >> 10 ^
                      (uVar152 * 0x2000 | uVar152 >> 0x13) ^ (uVar152 * 0x8000 | uVar152 >> 0x11));
  iVar43 = uVar86 + uVar155 + (uVar23 & uVar29 | ~uVar29 & uVar2) + -0x3db47490 +
           ((uVar29 * 0x80 | uVar29 >> 0x19) ^
           (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6));
  iVar49 = uVar95 + uVar160 + (uVar34 & uVar8 | ~uVar8 & uVar4) + -0x3db47490 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
  iVar52 = uVar98 + uVar104 + (uVar44 & uVar33 | ~uVar33 & uVar5) + -0x3db47490 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar55 = uVar62 + uVar106 + (uVar50 & uVar31 | ~uVar31 & uVar7) + -0x3db47490 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  uVar67 = uVar67 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar71 = uVar71 + iVar52;
  uVar133 = uVar133 + iVar55;
  uVar70 = ((uVar112 | uVar9) & uVar57 | uVar112 & uVar9) +
           ((uVar112 * 0x400 | uVar112 >> 0x16) ^
           (uVar112 * 0x80000 | uVar112 >> 0xd) ^ (uVar112 * 0x40000000 | uVar112 >> 2)) + iVar43;
  uVar118 = ((uVar116 | uVar18) & uVar157 | uVar116 & uVar18) +
            ((uVar116 * 0x400 | uVar116 >> 0x16) ^
            (uVar116 * 0x80000 | uVar116 >> 0xd) ^ (uVar116 * 0x40000000 | uVar116 >> 2)) + iVar49;
  uVar120 = ((uVar119 | uVar22) & uVar162 | uVar119 & uVar22) +
            ((uVar119 * 0x400 | uVar119 >> 0x16) ^
            (uVar119 * 0x80000 | uVar119 >> 0xd) ^ (uVar119 * 0x40000000 | uVar119 >> 2)) + iVar52;
  uVar58 = ((uVar137 | uVar19) & uVar166 | uVar137 & uVar19) +
           ((uVar137 * 0x400 | uVar137 >> 0x16) ^
           (uVar137 * 0x80000 | uVar137 >> 0xd) ^ (uVar137 * 0x40000000 | uVar137 >> 2)) + iVar55;
  uVar92 = (uVar66 >> 3 ^ (uVar66 * 0x4000 | uVar66 >> 0x12) ^ (uVar66 * 0x2000000 | uVar66 >> 7)) +
           uVar126 + uVar64 +
           (uVar65 >> 10 ^ (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
  uVar68 = (uVar131 >> 3 ^
           (uVar131 * 0x4000 | uVar131 >> 0x12) ^ (uVar131 * 0x2000000 | uVar131 >> 7)) + uVar125 +
           uVar114 + (uVar96 >> 10 ^
                     (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11));
  uVar69 = (uVar134 >> 3 ^
           (uVar134 * 0x4000 | uVar134 >> 0x12) ^ (uVar134 * 0x2000000 | uVar134 >> 7)) + uVar145 +
           uVar45 + (uVar122 >> 10 ^
                    (uVar122 * 0x2000 | uVar122 >> 0x13) ^ (uVar122 * 0x8000 | uVar122 >> 0x11));
  uVar126 = (uVar105 >> 3 ^
            (uVar105 * 0x4000 | uVar105 >> 0x12) ^ (uVar105 * 0x2000000 | uVar105 >> 7)) + uVar149 +
            uVar54 + (uVar124 >> 10 ^
                     (uVar124 * 0x2000 | uVar124 >> 0x13) ^ (uVar124 * 0x8000 | uVar124 >> 0x11));
  iVar43 = uVar2 + uVar92 + (uVar29 & uVar67 | ~uVar67 & uVar23) + -0x3893ae5d +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  iVar49 = uVar4 + uVar68 + (uVar8 & uVar51 | ~uVar51 & uVar34) + -0x3893ae5d +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  iVar52 = uVar5 + uVar69 + (uVar33 & uVar71 | ~uVar71 & uVar44) + -0x3893ae5d +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  iVar55 = uVar7 + uVar126 + (uVar31 & uVar133 | ~uVar133 & uVar50) + -0x3893ae5d +
           ((uVar133 * 0x80 | uVar133 >> 0x19) ^
           (uVar133 * 0x200000 | uVar133 >> 0xb) ^ (uVar133 * 0x4000000 | uVar133 >> 6));
  uVar57 = uVar57 + iVar43;
  uVar157 = uVar157 + iVar49;
  uVar162 = uVar162 + iVar52;
  uVar166 = uVar166 + iVar55;
  uVar136 = ((uVar70 | uVar112) & uVar9 | uVar70 & uVar112) +
            ((uVar70 * 0x400 | uVar70 >> 0x16) ^
            (uVar70 * 0x80000 | uVar70 >> 0xd) ^ (uVar70 * 0x40000000 | uVar70 >> 2)) + iVar43;
  uVar111 = ((uVar118 | uVar116) & uVar18 | uVar118 & uVar116) +
            ((uVar118 * 0x400 | uVar118 >> 0x16) ^
            (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar49;
  uVar115 = ((uVar120 | uVar119) & uVar22 | uVar120 & uVar119) +
            ((uVar120 * 0x400 | uVar120 >> 0x16) ^
            (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar52;
  uVar139 = ((uVar58 | uVar137) & uVar19 | uVar58 & uVar137) +
            ((uVar58 * 0x400 | uVar58 >> 0x16) ^
            (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar55;
  uVar74 = (uVar144 >> 3 ^
           (uVar144 * 0x4000 | uVar144 >> 0x12) ^ (uVar144 * 0x2000000 | uVar144 >> 7)) + uVar66 +
           uVar161 + (uVar155 >> 10 ^
                     (uVar155 * 0x2000 | uVar155 >> 0x13) ^ (uVar155 * 0x8000 | uVar155 >> 0x11));
  uVar82 = (uVar127 >> 3 ^
           (uVar127 * 0x4000 | uVar127 >> 0x12) ^ (uVar127 * 0x2000000 | uVar127 >> 7)) + uVar131 +
           uVar169 + (uVar160 >> 10 ^
                     (uVar160 * 0x2000 | uVar160 >> 0x13) ^ (uVar160 * 0x8000 | uVar160 >> 0x11));
  uVar93 = (uVar146 >> 3 ^
           (uVar146 * 0x4000 | uVar146 >> 0x12) ^ (uVar146 * 0x2000000 | uVar146 >> 7)) + uVar134 +
           uVar177 + (uVar104 >> 10 ^
                     (uVar104 * 0x2000 | uVar104 >> 0x13) ^ (uVar104 * 0x8000 | uVar104 >> 0x11));
  uVar129 = (uVar150 >> 3 ^
            (uVar150 * 0x4000 | uVar150 >> 0x12) ^ (uVar150 * 0x2000000 | uVar150 >> 7)) + uVar105 +
            uVar183 + (uVar106 >> 10 ^
                      (uVar106 * 0x2000 | uVar106 >> 0x13) ^ (uVar106 * 0x8000 | uVar106 >> 0x11));
  iVar43 = uVar23 + uVar74 + (uVar67 & uVar57 | ~uVar57 & uVar29) + -0x2e6d17e7 +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  iVar49 = uVar34 + uVar82 + (uVar51 & uVar157 | ~uVar157 & uVar8) + -0x2e6d17e7 +
           ((uVar157 * 0x80 | uVar157 >> 0x19) ^
           (uVar157 * 0x200000 | uVar157 >> 0xb) ^ (uVar157 * 0x4000000 | uVar157 >> 6));
  iVar52 = uVar44 + uVar93 + (uVar71 & uVar162 | ~uVar162 & uVar33) + -0x2e6d17e7 +
           ((uVar162 * 0x80 | uVar162 >> 0x19) ^
           (uVar162 * 0x200000 | uVar162 >> 0xb) ^ (uVar162 * 0x4000000 | uVar162 >> 6));
  iVar55 = uVar50 + uVar129 + (uVar133 & uVar166 | ~uVar166 & uVar31) + -0x2e6d17e7 +
           ((uVar166 * 0x80 | uVar166 >> 0x19) ^
           (uVar166 * 0x200000 | uVar166 >> 0xb) ^ (uVar166 * 0x4000000 | uVar166 >> 6));
  uVar9 = uVar9 + iVar43;
  uVar18 = uVar18 + iVar49;
  uVar22 = uVar22 + iVar52;
  uVar19 = uVar19 + iVar55;
  uVar60 = ((uVar136 | uVar70) & uVar112 | uVar136 & uVar70) +
           ((uVar136 * 0x400 | uVar136 >> 0x16) ^
           (uVar136 * 0x80000 | uVar136 >> 0xd) ^ (uVar136 * 0x40000000 | uVar136 >> 2)) + iVar43;
  uVar87 = ((uVar111 | uVar118) & uVar116 | uVar111 & uVar118) +
           ((uVar111 * 0x400 | uVar111 >> 0x16) ^
           (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar49;
  uVar61 = ((uVar115 | uVar120) & uVar119 | uVar115 & uVar120) +
           ((uVar115 * 0x400 | uVar115 >> 0x16) ^
           (uVar115 * 0x80000 | uVar115 >> 0xd) ^ (uVar115 * 0x40000000 | uVar115 >> 2)) + iVar52;
  uVar62 = ((uVar139 | uVar58) & uVar137 | uVar139 & uVar58) +
           ((uVar139 * 0x400 | uVar139 >> 0x16) ^
           (uVar139 * 0x80000 | uVar139 >> 0xd) ^ (uVar139 * 0x40000000 | uVar139 >> 2)) + iVar55;
  uVar131 = (uVar170 >> 3 ^
            (uVar170 * 0x4000 | uVar170 >> 0x12) ^ (uVar170 * 0x2000000 | uVar170 >> 7)) + uVar144 +
            uVar184 + (uVar92 >> 10 ^
                      (uVar92 * 0x2000 | uVar92 >> 0x13) ^ (uVar92 * 0x8000 | uVar92 >> 0x11));
  uVar134 = (uVar175 >> 3 ^
            (uVar175 * 0x4000 | uVar175 >> 0x12) ^ (uVar175 * 0x2000000 | uVar175 >> 7)) + uVar127 +
            uVar185 + (uVar68 >> 10 ^
                      (uVar68 * 0x2000 | uVar68 >> 0x13) ^ (uVar68 * 0x8000 | uVar68 >> 0x11));
  uVar105 = (uVar178 >> 3 ^
            (uVar178 * 0x4000 | uVar178 >> 0x12) ^ (uVar178 * 0x2000000 | uVar178 >> 7)) + uVar146 +
            uVar186 + (uVar69 >> 10 ^
                      (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11));
  uVar130 = (uVar181 >> 3 ^
            (uVar181 * 0x4000 | uVar181 >> 0x12) ^ (uVar181 * 0x2000000 | uVar181 >> 7)) + uVar150 +
            uVar187 + (uVar126 >> 10 ^
                      (uVar126 * 0x2000 | uVar126 >> 0x13) ^ (uVar126 * 0x8000 | uVar126 >> 0x11));
  iVar43 = uVar29 + uVar131 + (uVar57 & uVar9 | ~uVar9 & uVar67) + -0x2966f9dc +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
  iVar49 = uVar8 + uVar134 + (uVar157 & uVar18 | ~uVar18 & uVar51) + -0x2966f9dc +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
  iVar52 = uVar33 + uVar105 + (uVar162 & uVar22 | ~uVar22 & uVar71) + -0x2966f9dc +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
  iVar55 = uVar31 + uVar130 + (uVar166 & uVar19 | ~uVar19 & uVar133) + -0x2966f9dc +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
  uVar112 = uVar112 + iVar43;
  uVar116 = uVar116 + iVar49;
  uVar119 = uVar119 + iVar52;
  uVar137 = uVar137 + iVar55;
  uVar149 = ((uVar60 | uVar136) & uVar70 | uVar60 & uVar136) +
            ((uVar60 * 0x400 | uVar60 >> 0x16) ^
            (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar43;
  uVar158 = ((uVar87 | uVar111) & uVar118 | uVar87 & uVar111) +
            ((uVar87 * 0x400 | uVar87 >> 0x16) ^
            (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar49;
  uVar168 = ((uVar61 | uVar115) & uVar120 | uVar61 & uVar115) +
            ((uVar61 * 0x400 | uVar61 >> 0x16) ^
            (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar52;
  uVar188 = ((uVar62 | uVar139) & uVar58 | uVar62 & uVar139) +
            ((uVar62 * 0x400 | uVar62 >> 0x16) ^
            (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar55;
  uVar33 = (uVar80 >> 3 ^ (uVar80 * 0x4000 | uVar80 >> 0x12) ^ (uVar80 * 0x2000000 | uVar80 >> 7)) +
           uVar170 + uVar72 +
           (uVar74 >> 10 ^ (uVar74 * 0x2000 | uVar74 >> 0x13) ^ (uVar74 * 0x8000 | uVar74 >> 0x11));
  uVar34 = (uVar84 >> 3 ^ (uVar84 * 0x4000 | uVar84 >> 0x12) ^ (uVar84 * 0x2000000 | uVar84 >> 7)) +
           uVar175 + uVar132 +
           (uVar82 >> 10 ^ (uVar82 * 0x2000 | uVar82 >> 0x13) ^ (uVar82 * 0x8000 | uVar82 >> 0x11));
  uVar53 = (uVar100 >> 3 ^
           (uVar100 * 0x4000 | uVar100 >> 0x12) ^ (uVar100 * 0x2000000 | uVar100 >> 7)) + uVar178 +
           uVar135 + (uVar93 >> 10 ^
                     (uVar93 * 0x2000 | uVar93 >> 0x13) ^ (uVar93 * 0x8000 | uVar93 >> 0x11));
  uVar59 = (uVar128 >> 3 ^
           (uVar128 * 0x4000 | uVar128 >> 0x12) ^ (uVar128 * 0x2000000 | uVar128 >> 7)) + uVar181 +
           uVar138 + (uVar129 >> 10 ^
                     (uVar129 * 0x2000 | uVar129 >> 0x13) ^ (uVar129 * 0x8000 | uVar129 >> 0x11));
  iVar43 = uVar67 + uVar33 + (uVar9 & uVar112 | ~uVar112 & uVar57) + -0xbf1ca7b +
           ((uVar112 * 0x80 | uVar112 >> 0x19) ^
           (uVar112 * 0x200000 | uVar112 >> 0xb) ^ (uVar112 * 0x4000000 | uVar112 >> 6));
  iVar49 = uVar51 + uVar34 + (uVar18 & uVar116 | ~uVar116 & uVar157) + -0xbf1ca7b +
           ((uVar116 * 0x80 | uVar116 >> 0x19) ^
           (uVar116 * 0x200000 | uVar116 >> 0xb) ^ (uVar116 * 0x4000000 | uVar116 >> 6));
  iVar52 = uVar71 + uVar53 + (uVar22 & uVar119 | ~uVar119 & uVar162) + -0xbf1ca7b +
           ((uVar119 * 0x80 | uVar119 >> 0x19) ^
           (uVar119 * 0x200000 | uVar119 >> 0xb) ^ (uVar119 * 0x4000000 | uVar119 >> 6));
  iVar55 = uVar133 + uVar59 + (uVar19 & uVar137 | ~uVar137 & uVar166) + -0xbf1ca7b +
           ((uVar137 * 0x80 | uVar137 >> 0x19) ^
           (uVar137 * 0x200000 | uVar137 >> 0xb) ^ (uVar137 * 0x4000000 | uVar137 >> 6));
  uVar70 = uVar70 + iVar43;
  uVar118 = uVar118 + iVar49;
  uVar120 = uVar120 + iVar52;
  uVar58 = uVar58 + iVar55;
  uVar8 = ((uVar149 | uVar60) & uVar136 | uVar149 & uVar60) +
          ((uVar149 * 0x400 | uVar149 >> 0x16) ^
          (uVar149 * 0x80000 | uVar149 >> 0xd) ^ (uVar149 * 0x40000000 | uVar149 >> 2)) + iVar43;
  uVar66 = ((uVar158 | uVar87) & uVar111 | uVar158 & uVar87) +
           ((uVar158 * 0x400 | uVar158 >> 0x16) ^
           (uVar158 * 0x80000 | uVar158 >> 0xd) ^ (uVar158 * 0x40000000 | uVar158 >> 2)) + iVar49;
  uVar99 = ((uVar168 | uVar61) & uVar115 | uVar168 & uVar61) +
           ((uVar168 * 0x400 | uVar168 >> 0x16) ^
           (uVar168 * 0x80000 | uVar168 >> 0xd) ^ (uVar168 * 0x40000000 | uVar168 >> 2)) + iVar52;
  uVar71 = ((uVar188 | uVar62) & uVar139 | uVar188 & uVar62) +
           ((uVar188 * 0x400 | uVar188 >> 0x16) ^
           (uVar188 * 0x80000 | uVar188 >> 0xd) ^ (uVar188 * 0x40000000 | uVar188 >> 2)) + iVar55;
  uVar31 = (uVar171 >> 3 ^
           (uVar171 * 0x4000 | uVar171 >> 0x12) ^ (uVar171 * 0x2000000 | uVar171 >> 7)) + uVar80 +
           uVar123 + (uVar131 >> 10 ^
                     (uVar131 * 0x2000 | uVar131 >> 0x13) ^ (uVar131 * 0x8000 | uVar131 >> 0x11));
  uVar44 = (uVar176 >> 3 ^
           (uVar176 * 0x4000 | uVar176 >> 0x12) ^ (uVar176 * 0x2000000 | uVar176 >> 7)) + uVar84 +
           uVar143 + (uVar134 >> 10 ^
                     (uVar134 * 0x2000 | uVar134 >> 0x13) ^ (uVar134 * 0x8000 | uVar134 >> 0x11));
  uVar56 = (uVar179 >> 3 ^
           (uVar179 * 0x4000 | uVar179 >> 0x12) ^ (uVar179 * 0x2000000 | uVar179 >> 7)) + uVar100 +
           uVar153 + (uVar105 >> 10 ^
                     (uVar105 * 0x2000 | uVar105 >> 0x13) ^ (uVar105 * 0x8000 | uVar105 >> 0x11));
  uVar91 = (uVar182 >> 3 ^
           (uVar182 * 0x4000 | uVar182 >> 0x12) ^ (uVar182 * 0x2000000 | uVar182 >> 7)) + uVar128 +
           uVar152 + (uVar130 >> 10 ^
                     (uVar130 * 0x2000 | uVar130 >> 0x13) ^ (uVar130 * 0x8000 | uVar130 >> 0x11));
  iVar43 = uVar57 + uVar31 + (uVar112 & uVar70 | ~uVar70 & uVar9) + 0x106aa070 +
           ((uVar70 * 0x80 | uVar70 >> 0x19) ^
           (uVar70 * 0x200000 | uVar70 >> 0xb) ^ (uVar70 * 0x4000000 | uVar70 >> 6));
  iVar49 = uVar157 + uVar44 + (uVar116 & uVar118 | ~uVar118 & uVar18) + 0x106aa070 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6));
  iVar52 = uVar162 + uVar56 + (uVar119 & uVar120 | ~uVar120 & uVar22) + 0x106aa070 +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  iVar55 = uVar166 + uVar91 + (uVar137 & uVar58 | ~uVar58 & uVar19) + 0x106aa070 +
           ((uVar58 * 0x80 | uVar58 >> 0x19) ^
           (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6));
  uVar136 = uVar136 + iVar43;
  uVar111 = uVar111 + iVar49;
  uVar115 = uVar115 + iVar52;
  uVar139 = uVar139 + iVar55;
  uVar98 = ((uVar8 | uVar149) & uVar60 | uVar8 & uVar149) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar43;
  uVar67 = ((uVar66 | uVar158) & uVar87 | uVar66 & uVar158) +
           ((uVar66 * 0x400 | uVar66 >> 0x16) ^
           (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar49;
  uVar51 = ((uVar99 | uVar168) & uVar61 | uVar99 & uVar168) +
           ((uVar99 * 0x400 | uVar99 >> 0x16) ^
           (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar52;
  uVar57 = ((uVar71 | uVar188) & uVar62 | uVar71 & uVar188) +
           ((uVar71 * 0x400 | uVar71 >> 0x16) ^
           (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar55;
  uVar23 = (uVar142 >> 3 ^
           (uVar142 * 0x4000 | uVar142 >> 0x12) ^ (uVar142 * 0x2000000 | uVar142 >> 7)) + uVar171 +
           uVar65 + (uVar33 >> 10 ^
                    (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11));
  uVar50 = (uVar148 >> 3 ^
           (uVar148 * 0x4000 | uVar148 >> 0x12) ^ (uVar148 * 0x2000000 | uVar148 >> 7)) + uVar176 +
           uVar96 + (uVar34 >> 10 ^
                    (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
  uVar86 = (uVar147 >> 3 ^
           (uVar147 * 0x4000 | uVar147 >> 0x12) ^ (uVar147 * 0x2000000 | uVar147 >> 7)) + uVar179 +
           uVar122 + (uVar53 >> 10 ^
                     (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11));
  uVar95 = (uVar151 >> 3 ^
           (uVar151 * 0x4000 | uVar151 >> 0x12) ^ (uVar151 * 0x2000000 | uVar151 >> 7)) + uVar182 +
           uVar124 + (uVar59 >> 10 ^
                     (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
  iVar43 = uVar9 + uVar23 + (uVar70 & uVar136 | ~uVar136 & uVar112) + 0x19a4c116 +
           ((uVar136 * 0x80 | uVar136 >> 0x19) ^
           (uVar136 * 0x200000 | uVar136 >> 0xb) ^ (uVar136 * 0x4000000 | uVar136 >> 6));
  iVar49 = uVar18 + uVar50 + (uVar118 & uVar111 | ~uVar111 & uVar116) + 0x19a4c116 +
           ((uVar111 * 0x80 | uVar111 >> 0x19) ^
           (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6));
  iVar52 = uVar22 + uVar86 + (uVar120 & uVar115 | ~uVar115 & uVar119) + 0x19a4c116 +
           ((uVar115 * 0x80 | uVar115 >> 0x19) ^
           (uVar115 * 0x200000 | uVar115 >> 0xb) ^ (uVar115 * 0x4000000 | uVar115 >> 6));
  iVar55 = uVar19 + uVar95 + (uVar58 & uVar139 | ~uVar139 & uVar137) + 0x19a4c116 +
           ((uVar139 * 0x80 | uVar139 >> 0x19) ^
           (uVar139 * 0x200000 | uVar139 >> 0xb) ^ (uVar139 * 0x4000000 | uVar139 >> 6));
  uVar60 = uVar60 + iVar43;
  uVar87 = uVar87 + iVar49;
  uVar61 = uVar61 + iVar52;
  uVar62 = uVar62 + iVar55;
  uVar80 = ((uVar98 | uVar8) & uVar149 | uVar98 & uVar8) +
           ((uVar98 * 0x400 | uVar98 >> 0x16) ^
           (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar43;
  uVar84 = ((uVar67 | uVar66) & uVar158 | uVar67 & uVar66) +
           ((uVar67 * 0x400 | uVar67 >> 0x16) ^
           (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar49;
  uVar100 = ((uVar51 | uVar99) & uVar168 | uVar51 & uVar99) +
            ((uVar51 * 0x400 | uVar51 >> 0x16) ^
            (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar52;
  uVar133 = ((uVar57 | uVar71) & uVar188 | uVar57 & uVar71) +
            ((uVar57 * 0x400 | uVar57 >> 0x16) ^
            (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar55;
  uVar128 = (uVar21 >> 3 ^ (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7))
            + uVar142 + uVar155 +
            (uVar31 >> 10 ^ (uVar31 * 0x2000 | uVar31 >> 0x13) ^ (uVar31 * 0x8000 | uVar31 >> 0x11))
  ;
  uVar162 = (uVar30 >> 3 ^ (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7))
            + uVar148 + uVar160 +
            (uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11))
  ;
  uVar164 = (uVar10 >> 3 ^ (uVar10 * 0x4000 | uVar10 >> 0x12) ^ (uVar10 * 0x2000000 | uVar10 >> 7))
            + uVar147 + uVar104 +
            (uVar56 >> 10 ^ (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11))
  ;
  uVar166 = (uVar20 >> 3 ^ (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7))
            + uVar151 + uVar106 +
            (uVar91 >> 10 ^ (uVar91 * 0x2000 | uVar91 >> 0x13) ^ (uVar91 * 0x8000 | uVar91 >> 0x11))
  ;
  iVar43 = uVar112 + uVar128 + (uVar136 & uVar60 | ~uVar60 & uVar70) + 0x1e376c08 +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar49 = uVar116 + uVar162 + (uVar111 & uVar87 | ~uVar87 & uVar118) + 0x1e376c08 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar52 = uVar119 + uVar164 + (uVar115 & uVar61 | ~uVar61 & uVar120) + 0x1e376c08 +
           ((uVar61 * 0x80 | uVar61 >> 0x19) ^
           (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6));
  iVar55 = uVar137 + uVar166 + (uVar139 & uVar62 | ~uVar62 & uVar58) + 0x1e376c08 +
           ((uVar62 * 0x80 | uVar62 >> 0x19) ^
           (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6));
  uVar149 = uVar149 + iVar43;
  uVar158 = uVar158 + iVar49;
  uVar168 = uVar168 + iVar52;
  uVar188 = uVar188 + iVar55;
  uVar2 = ((uVar80 | uVar98) & uVar8 | uVar80 & uVar98) +
          ((uVar80 * 0x400 | uVar80 >> 0x16) ^
          (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar43;
  uVar7 = ((uVar84 | uVar67) & uVar66 | uVar84 & uVar67) +
          ((uVar84 * 0x400 | uVar84 >> 0x16) ^
          (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar49;
  uVar22 = ((uVar100 | uVar51) & uVar99 | uVar100 & uVar51) +
           ((uVar100 * 0x400 | uVar100 >> 0x16) ^
           (uVar100 * 0x80000 | uVar100 >> 0xd) ^ (uVar100 * 0x40000000 | uVar100 >> 2)) + iVar52;
  uVar29 = ((uVar133 | uVar57) & uVar71 | uVar133 & uVar57) +
           ((uVar133 * 0x400 | uVar133 >> 0x16) ^
           (uVar133 * 0x80000 | uVar133 >> 0xd) ^ (uVar133 * 0x40000000 | uVar133 >> 2)) + iVar55;
  uVar146 = (uVar156 >> 3 ^
            (uVar156 * 0x4000 | uVar156 >> 0x12) ^ (uVar156 * 0x2000000 | uVar156 >> 7)) + uVar21 +
            uVar92 + (uVar23 >> 10 ^
                     (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
  uVar150 = (uVar165 >> 3 ^
            (uVar165 * 0x4000 | uVar165 >> 0x12) ^ (uVar165 * 0x2000000 | uVar165 >> 7)) + uVar30 +
            uVar68 + (uVar50 >> 10 ^
                     (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
  uVar154 = (uVar174 >> 3 ^
            (uVar174 * 0x4000 | uVar174 >> 0x12) ^ (uVar174 * 0x2000000 | uVar174 >> 7)) + uVar10 +
            uVar69 + (uVar86 >> 10 ^
                     (uVar86 * 0x2000 | uVar86 >> 0x13) ^ (uVar86 * 0x8000 | uVar86 >> 0x11));
  uVar157 = (uVar180 >> 3 ^
            (uVar180 * 0x4000 | uVar180 >> 0x12) ^ (uVar180 * 0x2000000 | uVar180 >> 7)) + uVar20 +
            uVar126 + (uVar95 >> 10 ^
                      (uVar95 * 0x2000 | uVar95 >> 0x13) ^ (uVar95 * 0x8000 | uVar95 >> 0x11));
  iVar43 = uVar70 + uVar146 + (uVar60 & uVar149 | ~uVar149 & uVar136) + 0x2748774c +
           ((uVar149 * 0x80 | uVar149 >> 0x19) ^
           (uVar149 * 0x200000 | uVar149 >> 0xb) ^ (uVar149 * 0x4000000 | uVar149 >> 6));
  iVar49 = uVar118 + uVar150 + (uVar87 & uVar158 | ~uVar158 & uVar111) + 0x2748774c +
           ((uVar158 * 0x80 | uVar158 >> 0x19) ^
           (uVar158 * 0x200000 | uVar158 >> 0xb) ^ (uVar158 * 0x4000000 | uVar158 >> 6));
  iVar52 = uVar120 + uVar154 + (uVar61 & uVar168 | ~uVar168 & uVar115) + 0x2748774c +
           ((uVar168 * 0x80 | uVar168 >> 0x19) ^
           (uVar168 * 0x200000 | uVar168 >> 0xb) ^ (uVar168 * 0x4000000 | uVar168 >> 6));
  iVar55 = uVar58 + uVar157 + (uVar62 & uVar188 | ~uVar188 & uVar139) + 0x2748774c +
           ((uVar188 * 0x80 | uVar188 >> 0x19) ^
           (uVar188 * 0x200000 | uVar188 >> 0xb) ^ (uVar188 * 0x4000000 | uVar188 >> 6));
  uVar8 = uVar8 + iVar43;
  uVar66 = uVar66 + iVar49;
  uVar99 = uVar99 + iVar52;
  uVar71 = uVar71 + iVar55;
  uVar4 = ((uVar2 | uVar80) & uVar98 | uVar2 & uVar80) +
          ((uVar2 * 0x400 | uVar2 >> 0x16) ^
          (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar43;
  uVar5 = ((uVar7 | uVar84) & uVar67 | uVar7 & uVar84) +
          ((uVar7 * 0x400 | uVar7 >> 0x16) ^
          (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar49;
  uVar9 = ((uVar22 | uVar100) & uVar51 | uVar22 & uVar100) +
          ((uVar22 * 0x400 | uVar22 >> 0x16) ^
          (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar52;
  uVar18 = ((uVar29 | uVar133) & uVar57 | uVar29 & uVar133) +
           ((uVar29 * 0x400 | uVar29 >> 0x16) ^
           (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar55;
  uVar159 = (uVar64 >> 3 ^ (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7))
            + uVar156 + uVar74 +
            (uVar128 >> 10 ^
            (uVar128 * 0x2000 | uVar128 >> 0x13) ^ (uVar128 * 0x8000 | uVar128 >> 0x11));
  uVar163 = (uVar114 >> 3 ^
            (uVar114 * 0x4000 | uVar114 >> 0x12) ^ (uVar114 * 0x2000000 | uVar114 >> 7)) + uVar165 +
            uVar82 + (uVar162 >> 10 ^
                     (uVar162 * 0x2000 | uVar162 >> 0x13) ^ (uVar162 * 0x8000 | uVar162 >> 0x11));
  uVar165 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7))
            + uVar174 + uVar93 +
            (uVar164 >> 10 ^
            (uVar164 * 0x2000 | uVar164 >> 0x13) ^ (uVar164 * 0x8000 | uVar164 >> 0x11));
  uVar167 = (uVar54 >> 3 ^ (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7))
            + uVar180 + uVar129 +
            (uVar166 >> 10 ^
            (uVar166 * 0x2000 | uVar166 >> 0x13) ^ (uVar166 * 0x8000 | uVar166 >> 0x11));
  iVar43 = uVar136 + uVar159 + (uVar149 & uVar8 | ~uVar8 & uVar60) + 0x34b0bcb5 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
  iVar49 = uVar111 + uVar163 + (uVar158 & uVar66 | ~uVar66 & uVar87) + 0x34b0bcb5 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6));
  iVar52 = uVar115 + uVar165 + (uVar168 & uVar99 | ~uVar99 & uVar61) + 0x34b0bcb5 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6));
  iVar55 = uVar139 + uVar167 + (uVar188 & uVar71 | ~uVar71 & uVar62) + 0x34b0bcb5 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  uVar98 = uVar98 + iVar43;
  uVar67 = uVar67 + iVar49;
  uVar51 = uVar51 + iVar52;
  uVar57 = uVar57 + iVar55;
  uVar147 = ((uVar4 | uVar2) & uVar80 | uVar4 & uVar2) +
            ((uVar4 * 0x400 | uVar4 >> 0x16) ^
            (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar125 = ((uVar5 | uVar7) & uVar84 | uVar5 & uVar7) +
            ((uVar5 * 0x400 | uVar5 >> 0x16) ^
            (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar49;
  uVar127 = ((uVar9 | uVar22) & uVar100 | uVar9 & uVar22) +
            ((uVar9 * 0x400 | uVar9 >> 0x16) ^
            (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar52;
  uVar145 = ((uVar18 | uVar29) & uVar133 | uVar18 & uVar29) +
            ((uVar18 * 0x400 | uVar18 >> 0x16) ^
            (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar55;
  uVar112 = (uVar161 >> 3 ^
            (uVar161 * 0x4000 | uVar161 >> 0x12) ^ (uVar161 * 0x2000000 | uVar161 >> 7)) + uVar64 +
            uVar131 + (uVar146 >> 10 ^
                      (uVar146 * 0x2000 | uVar146 >> 0x13) ^ (uVar146 * 0x8000 | uVar146 >> 0x11));
  uVar136 = (uVar169 >> 3 ^
            (uVar169 * 0x4000 | uVar169 >> 0x12) ^ (uVar169 * 0x2000000 | uVar169 >> 7)) + uVar114 +
            uVar134 + (uVar150 >> 10 ^
                      (uVar150 * 0x2000 | uVar150 >> 0x13) ^ (uVar150 * 0x8000 | uVar150 >> 0x11));
  uVar111 = (uVar177 >> 3 ^
            (uVar177 * 0x4000 | uVar177 >> 0x12) ^ (uVar177 * 0x2000000 | uVar177 >> 7)) + uVar45 +
            uVar105 + (uVar154 >> 10 ^
                      (uVar154 * 0x2000 | uVar154 >> 0x13) ^ (uVar154 * 0x8000 | uVar154 >> 0x11));
  uVar115 = (uVar183 >> 3 ^
            (uVar183 * 0x4000 | uVar183 >> 0x12) ^ (uVar183 * 0x2000000 | uVar183 >> 7)) + uVar54 +
            uVar130 + (uVar157 >> 10 ^
                      (uVar157 * 0x2000 | uVar157 >> 0x13) ^ (uVar157 * 0x8000 | uVar157 >> 0x11));
  iVar43 = uVar60 + uVar112 + (uVar8 & uVar98 | ~uVar98 & uVar149) + 0x391c0cb3 +
           ((uVar98 * 0x80 | uVar98 >> 0x19) ^
           (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6));
  iVar49 = uVar87 + uVar136 + (uVar66 & uVar67 | ~uVar67 & uVar158) + 0x391c0cb3 +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  iVar52 = uVar61 + uVar111 + (uVar99 & uVar51 | ~uVar51 & uVar168) + 0x391c0cb3 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  iVar55 = uVar62 + uVar115 + (uVar71 & uVar57 | ~uVar57 & uVar188) + 0x391c0cb3 +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  uVar80 = uVar80 + iVar43;
  uVar84 = uVar84 + iVar49;
  uVar100 = uVar100 + iVar52;
  uVar133 = uVar133 + iVar55;
  uVar139 = ((uVar147 | uVar4) & uVar2 | uVar147 & uVar4) +
            ((uVar147 * 0x400 | uVar147 >> 0x16) ^
            (uVar147 * 0x80000 | uVar147 >> 0xd) ^ (uVar147 * 0x40000000 | uVar147 >> 2)) + iVar43;
  uVar142 = ((uVar125 | uVar5) & uVar7 | uVar125 & uVar5) +
            ((uVar125 * 0x400 | uVar125 >> 0x16) ^
            (uVar125 * 0x80000 | uVar125 >> 0xd) ^ (uVar125 * 0x40000000 | uVar125 >> 2)) + iVar49;
  uVar144 = ((uVar127 | uVar9) & uVar22 | uVar127 & uVar9) +
            ((uVar127 * 0x400 | uVar127 >> 0x16) ^
            (uVar127 * 0x80000 | uVar127 >> 0xd) ^ (uVar127 * 0x40000000 | uVar127 >> 2)) + iVar52;
  uVar148 = ((uVar145 | uVar18) & uVar29 | uVar145 & uVar18) +
            ((uVar145 * 0x400 | uVar145 >> 0x16) ^
            (uVar145 * 0x80000 | uVar145 >> 0xd) ^ (uVar145 * 0x40000000 | uVar145 >> 2)) + iVar55;
  uVar10 = (uVar184 >> 3 ^
           (uVar184 * 0x4000 | uVar184 >> 0x12) ^ (uVar184 * 0x2000000 | uVar184 >> 7)) + uVar161 +
           uVar33 + (uVar159 >> 10 ^
                    (uVar159 * 0x2000 | uVar159 >> 0x13) ^ (uVar159 * 0x8000 | uVar159 >> 0x11));
  uVar45 = (uVar185 >> 3 ^
           (uVar185 * 0x4000 | uVar185 >> 0x12) ^ (uVar185 * 0x2000000 | uVar185 >> 7)) + uVar169 +
           uVar34 + (uVar163 >> 10 ^
                    (uVar163 * 0x2000 | uVar163 >> 0x13) ^ (uVar163 * 0x8000 | uVar163 >> 0x11));
  uVar118 = (uVar186 >> 3 ^
            (uVar186 * 0x4000 | uVar186 >> 0x12) ^ (uVar186 * 0x2000000 | uVar186 >> 7)) + uVar177 +
            uVar53 + (uVar165 >> 10 ^
                     (uVar165 * 0x2000 | uVar165 >> 0x13) ^ (uVar165 * 0x8000 | uVar165 >> 0x11));
  uVar58 = (uVar187 >> 3 ^
           (uVar187 * 0x4000 | uVar187 >> 0x12) ^ (uVar187 * 0x2000000 | uVar187 >> 7)) + uVar183 +
           uVar59 + (uVar167 >> 10 ^
                    (uVar167 * 0x2000 | uVar167 >> 0x13) ^ (uVar167 * 0x8000 | uVar167 >> 0x11));
  iVar43 = uVar149 + uVar10 + (uVar98 & uVar80 | ~uVar80 & uVar8) + 0x4ed8aa4a +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6));
  iVar49 = uVar158 + uVar45 + (uVar67 & uVar84 | ~uVar84 & uVar66) + 0x4ed8aa4a +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6));
  iVar52 = uVar168 + uVar118 + (uVar51 & uVar100 | ~uVar100 & uVar99) + 0x4ed8aa4a +
           ((uVar100 * 0x80 | uVar100 >> 0x19) ^
           (uVar100 * 0x200000 | uVar100 >> 0xb) ^ (uVar100 * 0x4000000 | uVar100 >> 6));
  iVar55 = uVar188 + uVar58 + (uVar57 & uVar133 | ~uVar133 & uVar71) + 0x4ed8aa4a +
           ((uVar133 * 0x80 | uVar133 >> 0x19) ^
           (uVar133 * 0x200000 | uVar133 >> 0xb) ^ (uVar133 * 0x4000000 | uVar133 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar7 = uVar7 + iVar49;
  uVar22 = uVar22 + iVar52;
  uVar29 = uVar29 + iVar55;
  uVar149 = ((uVar139 | uVar147) & uVar4 | uVar139 & uVar147) +
            ((uVar139 * 0x400 | uVar139 >> 0x16) ^
            (uVar139 * 0x80000 | uVar139 >> 0xd) ^ (uVar139 * 0x40000000 | uVar139 >> 2)) + iVar43;
  uVar151 = ((uVar142 | uVar125) & uVar5 | uVar142 & uVar125) +
            ((uVar142 * 0x400 | uVar142 >> 0x16) ^
            (uVar142 * 0x80000 | uVar142 >> 0xd) ^ (uVar142 * 0x40000000 | uVar142 >> 2)) + iVar49;
  uVar156 = ((uVar144 | uVar127) & uVar9 | uVar144 & uVar127) +
            ((uVar144 * 0x400 | uVar144 >> 0x16) ^
            (uVar144 * 0x80000 | uVar144 >> 0xd) ^ (uVar144 * 0x40000000 | uVar144 >> 2)) + iVar52;
  uVar158 = ((uVar148 | uVar145) & uVar18 | uVar148 & uVar145) +
            ((uVar148 * 0x400 | uVar148 >> 0x16) ^
            (uVar148 * 0x80000 | uVar148 >> 0xd) ^ (uVar148 * 0x40000000 | uVar148 >> 2)) + iVar55;
  uVar61 = (uVar72 >> 3 ^ (uVar72 * 0x4000 | uVar72 >> 0x12) ^ (uVar72 * 0x2000000 | uVar72 >> 7)) +
           uVar184 + uVar31 +
           (uVar112 >> 10 ^
           (uVar112 * 0x2000 | uVar112 >> 0x13) ^ (uVar112 * 0x8000 | uVar112 >> 0x11));
  uVar116 = (uVar132 >> 3 ^
            (uVar132 * 0x4000 | uVar132 >> 0x12) ^ (uVar132 * 0x2000000 | uVar132 >> 7)) + uVar185 +
            uVar44 + (uVar136 >> 10 ^
                     (uVar136 * 0x2000 | uVar136 >> 0x13) ^ (uVar136 * 0x8000 | uVar136 >> 0x11));
  uVar119 = (uVar135 >> 3 ^
            (uVar135 * 0x4000 | uVar135 >> 0x12) ^ (uVar135 * 0x2000000 | uVar135 >> 7)) + uVar186 +
            uVar56 + (uVar111 >> 10 ^
                     (uVar111 * 0x2000 | uVar111 >> 0x13) ^ (uVar111 * 0x8000 | uVar111 >> 0x11));
  uVar137 = (uVar138 >> 3 ^
            (uVar138 * 0x4000 | uVar138 >> 0x12) ^ (uVar138 * 0x2000000 | uVar138 >> 7)) + uVar187 +
            uVar91 + (uVar115 >> 10 ^
                     (uVar115 * 0x2000 | uVar115 >> 0x13) ^ (uVar115 * 0x8000 | uVar115 >> 0x11));
  iVar43 = uVar8 + uVar61 + (uVar80 & uVar2 | ~uVar2 & uVar98) + 0x5b9cca4f +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = uVar66 + uVar116 + (uVar84 & uVar7 | ~uVar7 & uVar67) + 0x5b9cca4f +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  iVar52 = uVar99 + uVar119 + (uVar100 & uVar22 | ~uVar22 & uVar51) + 0x5b9cca4f +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
  iVar55 = uVar71 + uVar137 + (uVar133 & uVar29 | ~uVar29 & uVar57) + 0x5b9cca4f +
           ((uVar29 * 0x80 | uVar29 >> 0x19) ^
           (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6));
  uVar4 = uVar4 + iVar43;
  uVar5 = uVar5 + iVar49;
  uVar9 = uVar9 + iVar52;
  uVar18 = uVar18 + iVar55;
  uVar19 = ((uVar149 | uVar139) & uVar147 | uVar149 & uVar139) +
           ((uVar149 * 0x400 | uVar149 >> 0x16) ^
           (uVar149 * 0x80000 | uVar149 >> 0xd) ^ (uVar149 * 0x40000000 | uVar149 >> 2)) + iVar43;
  uVar21 = ((uVar151 | uVar142) & uVar125 | uVar151 & uVar142) +
           ((uVar151 * 0x400 | uVar151 >> 0x16) ^
           (uVar151 * 0x80000 | uVar151 >> 0xd) ^ (uVar151 * 0x40000000 | uVar151 >> 2)) + iVar49;
  uVar30 = ((uVar156 | uVar144) & uVar127 | uVar156 & uVar144) +
           ((uVar156 * 0x400 | uVar156 >> 0x16) ^
           (uVar156 * 0x80000 | uVar156 >> 0xd) ^ (uVar156 * 0x40000000 | uVar156 >> 2)) + iVar52;
  uVar8 = ((uVar158 | uVar148) & uVar145 | uVar158 & uVar148) +
          ((uVar158 * 0x400 | uVar158 >> 0x16) ^
          (uVar158 * 0x80000 | uVar158 >> 0xd) ^ (uVar158 * 0x40000000 | uVar158 >> 2)) + iVar55;
  uVar20 = (uVar123 >> 3 ^
           (uVar123 * 0x4000 | uVar123 >> 0x12) ^ (uVar123 * 0x2000000 | uVar123 >> 7)) + uVar72 +
           uVar23 + (uVar10 >> 10 ^
                    (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
  uVar70 = (uVar143 >> 3 ^
           (uVar143 * 0x4000 | uVar143 >> 0x12) ^ (uVar143 * 0x2000000 | uVar143 >> 7)) + uVar132 +
           uVar50 + (uVar45 >> 10 ^
                    (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  uVar60 = (uVar153 >> 3 ^
           (uVar153 * 0x4000 | uVar153 >> 0x12) ^ (uVar153 * 0x2000000 | uVar153 >> 7)) + uVar135 +
           uVar86 + (uVar118 >> 10 ^
                    (uVar118 * 0x2000 | uVar118 >> 0x13) ^ (uVar118 * 0x8000 | uVar118 >> 0x11));
  uVar87 = (uVar152 >> 3 ^
           (uVar152 * 0x4000 | uVar152 >> 0x12) ^ (uVar152 * 0x2000000 | uVar152 >> 7)) + uVar138 +
           uVar95 + (uVar58 >> 10 ^
                    (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
  iVar43 = uVar98 + uVar20 + (uVar2 & uVar4 | ~uVar4 & uVar80) + 0x682e6ff3 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
  iVar49 = uVar67 + uVar70 + (uVar7 & uVar5 | ~uVar5 & uVar84) + 0x682e6ff3 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
  iVar52 = uVar51 + uVar60 + (uVar22 & uVar9 | ~uVar9 & uVar100) + 0x682e6ff3 +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
  iVar55 = uVar57 + uVar87 + (uVar29 & uVar18 | ~uVar18 & uVar133) + 0x682e6ff3 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
  uVar147 = uVar147 + iVar43;
  uVar125 = uVar125 + iVar49;
  uVar127 = uVar127 + iVar52;
  uVar145 = uVar145 + iVar55;
  uVar66 = ((uVar19 | uVar149) & uVar139 | uVar19 & uVar149) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar43;
  uVar99 = ((uVar21 | uVar151) & uVar142 | uVar21 & uVar151) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar49;
  uVar71 = ((uVar30 | uVar156) & uVar144 | uVar30 & uVar156) +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar52;
  uVar72 = ((uVar8 | uVar158) & uVar148 | uVar8 & uVar158) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  uVar128 = (uVar65 >> 3 ^ (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7))
            + uVar123 + uVar128 +
            (uVar61 >> 10 ^ (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11))
  ;
  uVar132 = (uVar96 >> 3 ^ (uVar96 * 0x4000 | uVar96 >> 0x12) ^ (uVar96 * 0x2000000 | uVar96 >> 7))
            + uVar143 + uVar162 +
            (uVar116 >> 10 ^
            (uVar116 * 0x2000 | uVar116 >> 0x13) ^ (uVar116 * 0x8000 | uVar116 >> 0x11));
  uVar135 = (uVar122 >> 3 ^
            (uVar122 * 0x4000 | uVar122 >> 0x12) ^ (uVar122 * 0x2000000 | uVar122 >> 7)) + uVar153 +
            uVar164 + (uVar119 >> 10 ^
                      (uVar119 * 0x2000 | uVar119 >> 0x13) ^ (uVar119 * 0x8000 | uVar119 >> 0x11));
  uVar138 = (uVar124 >> 3 ^
            (uVar124 * 0x4000 | uVar124 >> 0x12) ^ (uVar124 * 0x2000000 | uVar124 >> 7)) + uVar152 +
            uVar166 + (uVar137 >> 10 ^
                      (uVar137 * 0x2000 | uVar137 >> 0x13) ^ (uVar137 * 0x8000 | uVar137 >> 0x11));
  iVar43 = uVar80 + uVar128 + (uVar4 & uVar147 | ~uVar147 & uVar2) + 0x748f82ee +
           ((uVar147 * 0x80 | uVar147 >> 0x19) ^
           (uVar147 * 0x200000 | uVar147 >> 0xb) ^ (uVar147 * 0x4000000 | uVar147 >> 6));
  iVar49 = uVar84 + uVar132 + (uVar5 & uVar125 | ~uVar125 & uVar7) + 0x748f82ee +
           ((uVar125 * 0x80 | uVar125 >> 0x19) ^
           (uVar125 * 0x200000 | uVar125 >> 0xb) ^ (uVar125 * 0x4000000 | uVar125 >> 6));
  iVar52 = uVar100 + uVar135 + (uVar9 & uVar127 | ~uVar127 & uVar22) + 0x748f82ee +
           ((uVar127 * 0x80 | uVar127 >> 0x19) ^
           (uVar127 * 0x200000 | uVar127 >> 0xb) ^ (uVar127 * 0x4000000 | uVar127 >> 6));
  iVar55 = uVar133 + uVar138 + (uVar18 & uVar145 | ~uVar145 & uVar29) + 0x748f82ee +
           ((uVar145 * 0x80 | uVar145 >> 0x19) ^
           (uVar145 * 0x200000 | uVar145 >> 0xb) ^ (uVar145 * 0x4000000 | uVar145 >> 6));
  uVar139 = uVar139 + iVar43;
  uVar142 = uVar142 + iVar49;
  uVar144 = uVar144 + iVar52;
  uVar148 = uVar148 + iVar55;
  uVar64 = ((uVar66 | uVar19) & uVar149 | uVar66 & uVar19) +
           ((uVar66 * 0x400 | uVar66 >> 0x16) ^
           (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar43;
  uVar114 = ((uVar99 | uVar21) & uVar151 | uVar99 & uVar21) +
            ((uVar99 * 0x400 | uVar99 >> 0x16) ^
            (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar49;
  uVar54 = ((uVar71 | uVar30) & uVar156 | uVar71 & uVar30) +
           ((uVar71 * 0x400 | uVar71 >> 0x16) ^
           (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar52;
  uVar120 = ((uVar72 | uVar8) & uVar158 | uVar72 & uVar8) +
            ((uVar72 * 0x400 | uVar72 >> 0x16) ^
            (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar55;
  uVar62 = (uVar155 >> 3 ^
           (uVar155 * 0x4000 | uVar155 >> 0x12) ^ (uVar155 * 0x2000000 | uVar155 >> 7)) + uVar65 +
           uVar146 + (uVar20 >> 10 ^
                     (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
  uVar65 = (uVar160 >> 3 ^
           (uVar160 * 0x4000 | uVar160 >> 0x12) ^ (uVar160 * 0x2000000 | uVar160 >> 7)) + uVar96 +
           uVar150 + (uVar70 >> 10 ^
                     (uVar70 * 0x2000 | uVar70 >> 0x13) ^ (uVar70 * 0x8000 | uVar70 >> 0x11));
  uVar96 = (uVar104 >> 3 ^
           (uVar104 * 0x4000 | uVar104 >> 0x12) ^ (uVar104 * 0x2000000 | uVar104 >> 7)) + uVar122 +
           uVar154 + (uVar60 >> 10 ^
                     (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
  uVar84 = (uVar106 >> 3 ^
           (uVar106 * 0x4000 | uVar106 >> 0x12) ^ (uVar106 * 0x2000000 | uVar106 >> 7)) + uVar124 +
           uVar157 + (uVar87 >> 10 ^
                     (uVar87 * 0x2000 | uVar87 >> 0x13) ^ (uVar87 * 0x8000 | uVar87 >> 0x11));
  iVar43 = uVar2 + uVar62 + (uVar147 & uVar139 | ~uVar139 & uVar4) + 0x78a5636f +
           ((uVar139 * 0x80 | uVar139 >> 0x19) ^
           (uVar139 * 0x200000 | uVar139 >> 0xb) ^ (uVar139 * 0x4000000 | uVar139 >> 6));
  iVar49 = uVar7 + uVar65 + (uVar125 & uVar142 | ~uVar142 & uVar5) + 0x78a5636f +
           ((uVar142 * 0x80 | uVar142 >> 0x19) ^
           (uVar142 * 0x200000 | uVar142 >> 0xb) ^ (uVar142 * 0x4000000 | uVar142 >> 6));
  iVar52 = uVar22 + uVar96 + (uVar127 & uVar144 | ~uVar144 & uVar9) + 0x78a5636f +
           ((uVar144 * 0x80 | uVar144 >> 0x19) ^
           (uVar144 * 0x200000 | uVar144 >> 0xb) ^ (uVar144 * 0x4000000 | uVar144 >> 6));
  iVar55 = uVar29 + uVar84 + (uVar145 & uVar148 | ~uVar148 & uVar18) + 0x78a5636f +
           ((uVar148 * 0x80 | uVar148 >> 0x19) ^
           (uVar148 * 0x200000 | uVar148 >> 0xb) ^ (uVar148 * 0x4000000 | uVar148 >> 6));
  uVar149 = uVar149 + iVar43;
  uVar151 = uVar151 + iVar49;
  uVar156 = uVar156 + iVar52;
  uVar158 = uVar158 + iVar55;
  uVar2 = ((uVar64 | uVar66) & uVar19 | uVar64 & uVar66) +
          ((uVar64 * 0x400 | uVar64 >> 0x16) ^
          (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar43;
  uVar7 = ((uVar114 | uVar99) & uVar21 | uVar114 & uVar99) +
          ((uVar114 * 0x400 | uVar114 >> 0x16) ^
          (uVar114 * 0x80000 | uVar114 >> 0xd) ^ (uVar114 * 0x40000000 | uVar114 >> 2)) + iVar49;
  uVar22 = ((uVar54 | uVar71) & uVar30 | uVar54 & uVar71) +
           ((uVar54 * 0x400 | uVar54 >> 0x16) ^
           (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar52;
  uVar29 = ((uVar120 | uVar72) & uVar8 | uVar120 & uVar72) +
           ((uVar120 * 0x400 | uVar120 >> 0x16) ^
           (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar55;
  uVar98 = (uVar92 >> 3 ^ (uVar92 * 0x4000 | uVar92 >> 0x12) ^ (uVar92 * 0x2000000 | uVar92 >> 7)) +
           uVar155 + uVar159 +
           (uVar128 >> 10 ^
           (uVar128 * 0x2000 | uVar128 >> 0x13) ^ (uVar128 * 0x8000 | uVar128 >> 0x11));
  uVar67 = (uVar68 >> 3 ^ (uVar68 * 0x4000 | uVar68 >> 0x12) ^ (uVar68 * 0x2000000 | uVar68 >> 7)) +
           uVar160 + uVar163 +
           (uVar132 >> 10 ^
           (uVar132 * 0x2000 | uVar132 >> 0x13) ^ (uVar132 * 0x8000 | uVar132 >> 0x11));
  uVar51 = (uVar69 >> 3 ^ (uVar69 * 0x4000 | uVar69 >> 0x12) ^ (uVar69 * 0x2000000 | uVar69 >> 7)) +
           uVar104 + uVar165 +
           (uVar135 >> 10 ^
           (uVar135 * 0x2000 | uVar135 >> 0x13) ^ (uVar135 * 0x8000 | uVar135 >> 0x11));
  uVar57 = (uVar126 >> 3 ^
           (uVar126 * 0x4000 | uVar126 >> 0x12) ^ (uVar126 * 0x2000000 | uVar126 >> 7)) + uVar106 +
           uVar167 + (uVar138 >> 10 ^
                     (uVar138 * 0x2000 | uVar138 >> 0x13) ^ (uVar138 * 0x8000 | uVar138 >> 0x11));
  iVar43 = uVar4 + uVar98 + (uVar139 & uVar149 | ~uVar149 & uVar147) + -0x7b3787ec +
           ((uVar149 * 0x80 | uVar149 >> 0x19) ^
           (uVar149 * 0x200000 | uVar149 >> 0xb) ^ (uVar149 * 0x4000000 | uVar149 >> 6));
  iVar49 = uVar5 + uVar67 + (uVar142 & uVar151 | ~uVar151 & uVar125) + -0x7b3787ec +
           ((uVar151 * 0x80 | uVar151 >> 0x19) ^
           (uVar151 * 0x200000 | uVar151 >> 0xb) ^ (uVar151 * 0x4000000 | uVar151 >> 6));
  iVar52 = uVar9 + uVar51 + (uVar144 & uVar156 | ~uVar156 & uVar127) + -0x7b3787ec +
           ((uVar156 * 0x80 | uVar156 >> 0x19) ^
           (uVar156 * 0x200000 | uVar156 >> 0xb) ^ (uVar156 * 0x4000000 | uVar156 >> 6));
  iVar55 = uVar18 + uVar57 + (uVar148 & uVar158 | ~uVar158 & uVar145) + -0x7b3787ec +
           ((uVar158 * 0x80 | uVar158 >> 0x19) ^
           (uVar158 * 0x200000 | uVar158 >> 0xb) ^ (uVar158 * 0x4000000 | uVar158 >> 6));
  uVar19 = uVar19 + iVar43;
  uVar21 = uVar21 + iVar49;
  uVar30 = uVar30 + iVar52;
  uVar8 = uVar8 + iVar55;
  uVar122 = ((uVar2 | uVar64) & uVar66 | uVar2 & uVar64) +
            ((uVar2 * 0x400 | uVar2 >> 0x16) ^
            (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar43;
  uVar124 = ((uVar7 | uVar114) & uVar99 | uVar7 & uVar114) +
            ((uVar7 * 0x400 | uVar7 >> 0x16) ^
            (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar49;
  uVar155 = ((uVar22 | uVar54) & uVar71 | uVar22 & uVar54) +
            ((uVar22 * 0x400 | uVar22 >> 0x16) ^
            (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar52;
  uVar80 = ((uVar29 | uVar120) & uVar72 | uVar29 & uVar120) +
           ((uVar29 * 0x400 | uVar29 >> 0x16) ^
           (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar55;
  uVar62 = (uVar74 >> 3 ^ (uVar74 * 0x4000 | uVar74 >> 0x12) ^ (uVar74 * 0x2000000 | uVar74 >> 7)) +
           uVar92 + uVar112 +
           (uVar62 >> 10 ^ (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
  uVar65 = (uVar82 >> 3 ^ (uVar82 * 0x4000 | uVar82 >> 0x12) ^ (uVar82 * 0x2000000 | uVar82 >> 7)) +
           uVar68 + uVar136 +
           (uVar65 >> 10 ^ (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
  uVar92 = (uVar93 >> 3 ^ (uVar93 * 0x4000 | uVar93 >> 0x12) ^ (uVar93 * 0x2000000 | uVar93 >> 7)) +
           uVar69 + uVar111 +
           (uVar96 >> 10 ^ (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11));
  uVar96 = (uVar129 >> 3 ^
           (uVar129 * 0x4000 | uVar129 >> 0x12) ^ (uVar129 * 0x2000000 | uVar129 >> 7)) + uVar126 +
           uVar115 + (uVar84 >> 10 ^
                     (uVar84 * 0x2000 | uVar84 >> 0x13) ^ (uVar84 * 0x8000 | uVar84 >> 0x11));
  iVar43 = uVar147 + uVar62 + (uVar149 & uVar19 | ~uVar19 & uVar139) + -0x7338fdf8 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
  iVar49 = uVar125 + uVar65 + (uVar151 & uVar21 | ~uVar21 & uVar142) + -0x7338fdf8 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6));
  iVar52 = uVar127 + uVar92 + (uVar156 & uVar30 | ~uVar30 & uVar144) + -0x7338fdf8 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6));
  iVar55 = uVar145 + uVar96 + (uVar158 & uVar8 | ~uVar8 & uVar148) + -0x7338fdf8 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
  uVar66 = uVar66 + iVar43;
  uVar99 = uVar99 + iVar49;
  uVar71 = uVar71 + iVar52;
  uVar72 = uVar72 + iVar55;
  uVar4 = ((uVar122 | uVar2) & uVar64 | uVar122 & uVar2) +
          ((uVar122 * 0x400 | uVar122 >> 0x16) ^
          (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar43;
  uVar5 = ((uVar124 | uVar7) & uVar114 | uVar124 & uVar7) +
          ((uVar124 * 0x400 | uVar124 >> 0x16) ^
          (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar49;
  uVar9 = ((uVar155 | uVar22) & uVar54 | uVar155 & uVar22) +
          ((uVar155 * 0x400 | uVar155 >> 0x16) ^
          (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar52;
  uVar18 = ((uVar80 | uVar29) & uVar120 | uVar80 & uVar29) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar55;
  uVar10 = (uVar131 >> 3 ^
           (uVar131 * 0x4000 | uVar131 >> 0x12) ^ (uVar131 * 0x2000000 | uVar131 >> 7)) + uVar74 +
           uVar10 + (uVar98 >> 10 ^
                    (uVar98 * 0x2000 | uVar98 >> 0x13) ^ (uVar98 * 0x8000 | uVar98 >> 0x11));
  uVar45 = (uVar134 >> 3 ^
           (uVar134 * 0x4000 | uVar134 >> 0x12) ^ (uVar134 * 0x2000000 | uVar134 >> 7)) + uVar82 +
           uVar45 + (uVar67 >> 10 ^
                    (uVar67 * 0x2000 | uVar67 >> 0x13) ^ (uVar67 * 0x8000 | uVar67 >> 0x11));
  uVar51 = (uVar105 >> 3 ^
           (uVar105 * 0x4000 | uVar105 >> 0x12) ^ (uVar105 * 0x2000000 | uVar105 >> 7)) + uVar93 +
           uVar118 + (uVar51 >> 10 ^
                     (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
  uVar118 = (uVar130 >> 3 ^
            (uVar130 * 0x4000 | uVar130 >> 0x12) ^ (uVar130 * 0x2000000 | uVar130 >> 7)) + uVar129 +
            uVar58 + (uVar57 >> 10 ^
                     (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11));
  iVar43 = uVar139 + uVar10 + (uVar19 & uVar66 | ~uVar66 & uVar149) + -0x6f410006 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6));
  iVar49 = uVar142 + uVar45 + (uVar21 & uVar99 | ~uVar99 & uVar151) + -0x6f410006 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6));
  iVar52 = uVar144 + uVar51 + (uVar30 & uVar71 | ~uVar71 & uVar156) + -0x6f410006 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  iVar55 = uVar148 + uVar118 + (uVar8 & uVar72 | ~uVar72 & uVar158) + -0x6f410006 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6));
  uVar64 = uVar64 + iVar43;
  uVar114 = uVar114 + iVar49;
  uVar54 = uVar54 + iVar52;
  uVar120 = uVar120 + iVar55;
  uVar98 = ((uVar4 | uVar122) & uVar2 | uVar4 & uVar122) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar67 = ((uVar5 | uVar124) & uVar7 | uVar5 & uVar124) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar49;
  uVar57 = ((uVar9 | uVar155) & uVar22 | uVar9 & uVar155) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar52;
  uVar58 = ((uVar18 | uVar80) & uVar29 | uVar18 & uVar80) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar55;
  uVar68 = (uVar33 >> 3 ^ (uVar33 * 0x4000 | uVar33 >> 0x12) ^ (uVar33 * 0x2000000 | uVar33 >> 7)) +
           uVar131 + uVar61 +
           (uVar62 >> 10 ^ (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
  uVar69 = (uVar34 >> 3 ^ (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7)) +
           uVar134 + uVar116 +
           (uVar65 >> 10 ^ (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
  uVar126 = (uVar53 >> 3 ^ (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7))
            + uVar105 + uVar119 +
            (uVar92 >> 10 ^ (uVar92 * 0x2000 | uVar92 >> 0x13) ^ (uVar92 * 0x8000 | uVar92 >> 0x11))
  ;
  uVar96 = (uVar59 >> 3 ^ (uVar59 * 0x4000 | uVar59 >> 0x12) ^ (uVar59 * 0x2000000 | uVar59 >> 7)) +
           uVar130 + uVar137 +
           (uVar96 >> 10 ^ (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11));
  iVar43 = uVar149 + uVar68 + (uVar66 & uVar64 | ~uVar64 & uVar19) + -0x5baf9315 +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar49 = uVar151 + uVar69 + (uVar99 & uVar114 | ~uVar114 & uVar21) + -0x5baf9315 +
           ((uVar114 * 0x80 | uVar114 >> 0x19) ^
           (uVar114 * 0x200000 | uVar114 >> 0xb) ^ (uVar114 * 0x4000000 | uVar114 >> 6));
  iVar52 = uVar156 + uVar126 + (uVar71 & uVar54 | ~uVar54 & uVar30) + -0x5baf9315 +
           ((uVar54 * 0x80 | uVar54 >> 0x19) ^
           (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6));
  iVar55 = uVar158 + uVar96 + (uVar72 & uVar120 | ~uVar120 & uVar8) + -0x5baf9315 +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar7 = uVar7 + iVar49;
  uVar22 = uVar22 + iVar52;
  uVar29 = uVar29 + iVar55;
  uVar61 = ((uVar98 | uVar4) & uVar122 | uVar98 & uVar4) +
           ((uVar98 * 0x400 | uVar98 >> 0x16) ^
           (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar43;
  uVar62 = ((uVar67 | uVar5) & uVar124 | uVar67 & uVar5) +
           ((uVar67 * 0x400 | uVar67 >> 0x16) ^
           (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar49;
  uVar65 = ((uVar57 | uVar9) & uVar155 | uVar57 & uVar9) +
           ((uVar57 * 0x400 | uVar57 >> 0x16) ^
           (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar52;
  uVar92 = ((uVar58 | uVar18) & uVar80 | uVar58 & uVar18) +
           ((uVar58 * 0x400 | uVar58 >> 0x16) ^
           (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar55;
  iVar43 = (uVar31 >> 3 ^ (uVar31 * 0x4000 | uVar31 >> 0x12) ^ (uVar31 * 0x2000000 | uVar31 >> 7)) +
           uVar33 + uVar20 +
           (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11))
           + uVar19 + (uVar64 & uVar2 | ~uVar2 & uVar66) + -0x41065c09 +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) +
           uVar34 + uVar70 +
           (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11))
           + uVar21 + (uVar114 & uVar7 | ~uVar7 & uVar99) + -0x41065c09 +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  iVar52 = (uVar56 >> 3 ^ (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) +
           uVar53 + uVar60 +
           (uVar51 >> 10 ^ (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11))
           + uVar30 + (uVar54 & uVar22 | ~uVar22 & uVar71) + -0x41065c09 +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
  iVar55 = (uVar91 >> 3 ^ (uVar91 * 0x4000 | uVar91 >> 0x12) ^ (uVar91 * 0x2000000 | uVar91 >> 7)) +
           uVar59 + uVar87 +
           (uVar118 >> 10 ^
           (uVar118 * 0x2000 | uVar118 >> 0x13) ^ (uVar118 * 0x8000 | uVar118 >> 0x11)) + uVar8 +
           (uVar120 & uVar29 | ~uVar29 & uVar72) + -0x41065c09 +
           ((uVar29 * 0x80 | uVar29 >> 0x19) ^
           (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6));
  uVar122 = uVar122 + iVar43;
  uVar124 = uVar124 + iVar49;
  uVar155 = uVar155 + iVar52;
  uVar80 = uVar80 + iVar55;
  uVar106 = ((uVar61 | uVar98) & uVar4 | uVar61 & uVar98) +
            ((uVar61 * 0x400 | uVar61 >> 0x16) ^
            (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar43;
  uVar129 = ((uVar62 | uVar67) & uVar5 | uVar62 & uVar67) +
            ((uVar62 * 0x400 | uVar62 >> 0x16) ^
            (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar49;
  uVar133 = ((uVar65 | uVar57) & uVar9 | uVar65 & uVar57) +
            ((uVar65 * 0x400 | uVar65 >> 0x16) ^
            (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar52;
  uVar136 = ((uVar92 | uVar58) & uVar18 | uVar92 & uVar58) +
            ((uVar92 * 0x400 | uVar92 >> 0x16) ^
            (uVar92 * 0x80000 | uVar92 >> 0xd) ^ (uVar92 * 0x40000000 | uVar92 >> 2)) + iVar55;
  iVar43 = (uVar23 >> 3 ^ (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) +
           uVar31 + uVar128 +
           (uVar68 >> 10 ^ (uVar68 * 0x2000 | uVar68 >> 0x13) ^ (uVar68 * 0x8000 | uVar68 >> 0x11))
           + uVar66 + (uVar2 & uVar122 | ~uVar122 & uVar64) + -0x398e870e +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6));
  iVar49 = (uVar50 >> 3 ^ (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) +
           uVar44 + uVar132 +
           (uVar69 >> 10 ^ (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11))
           + uVar99 + (uVar7 & uVar124 | ~uVar124 & uVar114) + -0x398e870e +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6));
  iVar52 = (uVar86 >> 3 ^ (uVar86 * 0x4000 | uVar86 >> 0x12) ^ (uVar86 * 0x2000000 | uVar86 >> 7)) +
           uVar56 + uVar135 +
           (uVar126 >> 10 ^
           (uVar126 * 0x2000 | uVar126 >> 0x13) ^ (uVar126 * 0x8000 | uVar126 >> 0x11)) + uVar71 +
           (uVar22 & uVar155 | ~uVar155 & uVar54) + -0x398e870e +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6));
  iVar55 = (uVar95 >> 3 ^ (uVar95 * 0x4000 | uVar95 >> 0x12) ^ (uVar95 * 0x2000000 | uVar95 >> 7)) +
           uVar91 + uVar138 +
           (uVar96 >> 10 ^ (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11))
           + uVar72 + (uVar29 & uVar80 | ~uVar80 & uVar120) + -0x398e870e +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6));
  uVar53 = uVar4 + 0x510e527f + iVar43;
  uVar56 = uVar5 + 0x510e527f + iVar49;
  uVar86 = uVar9 + 0x510e527f + iVar52;
  uVar59 = uVar18 + 0x510e527f + iVar55;
  uVar91 = uVar122 + 0x9b05688c;
  uVar45 = uVar124 + 0x9b05688c;
  uVar70 = uVar155 + 0x9b05688c;
  uVar60 = uVar80 + 0x9b05688c;
  uVar119 = ((uVar106 | uVar61) & uVar98 | uVar106 & uVar61) +
            ((uVar106 * 0x400 | uVar106 >> 0x16) ^
            (uVar106 * 0x80000 | uVar106 >> 0xd) ^ (uVar106 * 0x40000000 | uVar106 >> 2)) + iVar43 +
            0x6a09e667;
  uVar135 = ((uVar129 | uVar62) & uVar67 | uVar129 & uVar62) +
            ((uVar129 * 0x400 | uVar129 >> 0x16) ^
            (uVar129 * 0x80000 | uVar129 >> 0xd) ^ (uVar129 * 0x40000000 | uVar129 >> 2)) + iVar49 +
            0x6a09e667;
  uVar115 = ((uVar133 | uVar65) & uVar57 | uVar133 & uVar65) +
            ((uVar133 * 0x400 | uVar133 >> 0x16) ^
            (uVar133 * 0x80000 | uVar133 >> 0xd) ^ (uVar133 * 0x40000000 | uVar133 >> 2)) + iVar52 +
            0x6a09e667;
  uVar137 = ((uVar136 | uVar92) & uVar58 | uVar136 & uVar92) +
            ((uVar136 * 0x400 | uVar136 >> 0x16) ^
            (uVar136 * 0x80000 | uVar136 >> 0xd) ^ (uVar136 * 0x40000000 | uVar136 >> 2)) + iVar55 +
            0x6a09e667;
  uVar106 = uVar106 + 0xbb67ae85;
  uVar129 = uVar129 + 0xbb67ae85;
  uVar133 = uVar133 + 0xbb67ae85;
  uVar136 = uVar136 + 0xbb67ae85;
  uVar61 = uVar61 + 0x3c6ef372;
  uVar62 = uVar62 + 0x3c6ef372;
  uVar65 = uVar65 + 0x3c6ef372;
  uVar92 = uVar92 + 0x3c6ef372;
  iVar43 = (uVar91 & uVar53 | ~uVar53 & uVar2 + 0x1f83d9ab) + uVar64 +
           ((uVar53 * 0x80 | uVar53 >> 0x19) ^
           (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) + 0x1e6afcb1;
  iVar49 = (uVar45 & uVar56 | ~uVar56 & uVar7 + 0x1f83d9ab) + uVar114 +
           ((uVar56 * 0x80 | uVar56 >> 0x19) ^
           (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) + 0x1e6afcb1;
  iVar52 = (uVar70 & uVar86 | ~uVar86 & uVar22 + 0x1f83d9ab) + uVar54 +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6)) + 0x1e6afcb1;
  iVar55 = (uVar60 & uVar59 | ~uVar59 & uVar29 + 0x1f83d9ab) + uVar120 +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) + 0x1e6afcb1;
  uVar10 = uVar98 + 0xa54ff53a + iVar43;
  uVar33 = uVar67 + 0xa54ff53a + iVar49;
  uVar20 = uVar57 + 0xa54ff53a + iVar52;
  uVar31 = uVar58 + 0xa54ff53a + iVar55;
  uVar95 = ((uVar119 | uVar106) & uVar61 | uVar119 & uVar106) +
           ((uVar119 * 0x400 | uVar119 >> 0x16) ^
           (uVar119 * 0x80000 | uVar119 >> 0xd) ^ (uVar119 * 0x40000000 | uVar119 >> 2)) + iVar43;
  uVar51 = ((uVar135 | uVar129) & uVar62 | uVar135 & uVar129) +
           ((uVar135 * 0x400 | uVar135 >> 0x16) ^
           (uVar135 * 0x80000 | uVar135 >> 0xd) ^ (uVar135 * 0x40000000 | uVar135 >> 2)) + iVar49;
  uVar118 = ((uVar115 | uVar133) & uVar65 | uVar115 & uVar133) +
            ((uVar115 * 0x400 | uVar115 >> 0x16) ^
            (uVar115 * 0x80000 | uVar115 >> 0xd) ^ (uVar115 * 0x40000000 | uVar115 >> 2)) + iVar52;
  uVar87 = ((uVar137 | uVar136) & uVar92 | uVar137 & uVar136) +
           ((uVar137 * 0x400 | uVar137 >> 0x16) ^
           (uVar137 * 0x80000 | uVar137 >> 0xd) ^ (uVar137 * 0x40000000 | uVar137 >> 2)) + iVar55;
  iVar43 = (uVar53 & uVar10 | ~uVar10 & uVar91) + uVar2 + -0x6f44e1c4 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
  iVar49 = (uVar56 & uVar33 | ~uVar33 & uVar45) + uVar7 + -0x6f44e1c4 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar52 = (uVar86 & uVar20 | ~uVar20 & uVar70) + uVar22 + -0x6f44e1c4 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
  iVar55 = (uVar59 & uVar31 | ~uVar31 & uVar60) + uVar29 + -0x6f44e1c4 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  uVar66 = ((uVar95 | uVar119) & uVar106 | uVar95 & uVar119) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar96 = ((uVar51 | uVar135) & uVar129 | uVar51 & uVar135) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar68 = ((uVar118 | uVar115) & uVar133 | uVar118 & uVar115) +
           ((uVar118 * 0x400 | uVar118 >> 0x16) ^
           (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar52;
  uVar99 = ((uVar87 | uVar137) & uVar136 | uVar87 & uVar137) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar55;
  uVar23 = iVar43 + uVar61;
  uVar34 = iVar49 + uVar62;
  uVar44 = iVar52 + uVar65;
  uVar50 = iVar55 + uVar92;
  iVar43 = (uVar10 & uVar23 | ~uVar23 & uVar53) + uVar122 + 0x50c6645b +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar49 = (uVar33 & uVar34 | ~uVar34 & uVar56) + uVar124 + 0x50c6645b +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar52 = (uVar20 & uVar44 | ~uVar44 & uVar86) + uVar155 + 0x50c6645b +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar55 = (uVar31 & uVar50 | ~uVar50 & uVar59) + uVar80 + 0x50c6645b +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  uVar122 = ((uVar66 | uVar95) & uVar119 | uVar66 & uVar95) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar43;
  uVar69 = ((uVar96 | uVar51) & uVar135 | uVar96 & uVar51) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar49;
  uVar71 = ((uVar68 | uVar118) & uVar115 | uVar68 & uVar118) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar124 = ((uVar99 | uVar87) & uVar137 | uVar99 & uVar87) +
            ((uVar99 * 0x400 | uVar99 >> 0x16) ^
            (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar55;
  uVar19 = iVar43 + uVar106;
  uVar21 = iVar49 + uVar129;
  uVar30 = iVar52 + uVar133;
  uVar8 = iVar55 + uVar136;
  iVar43 = (uVar23 & uVar19 | ~uVar19 & uVar10) + uVar53 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + -0x164a245b;
  iVar49 = (uVar34 & uVar21 | ~uVar21 & uVar33) + uVar56 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + -0x164a245b;
  iVar52 = (uVar44 & uVar30 | ~uVar30 & uVar20) + uVar86 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) + -0x164a245b;
  iVar55 = (uVar50 & uVar8 | ~uVar8 & uVar31) + uVar59 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + -0x164a245b;
  uVar126 = ((uVar122 | uVar66) & uVar95 | uVar122 & uVar66) +
            ((uVar122 * 0x400 | uVar122 >> 0x16) ^
            (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar43;
  uVar72 = ((uVar69 | uVar96) & uVar51 | uVar69 & uVar96) +
           ((uVar69 * 0x400 | uVar69 >> 0x16) ^
           (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar49;
  uVar155 = ((uVar71 | uVar68) & uVar118 | uVar71 & uVar68) +
            ((uVar71 * 0x400 | uVar71 >> 0x16) ^
            (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar52;
  uVar74 = ((uVar124 | uVar99) & uVar87 | uVar124 & uVar99) +
           ((uVar124 * 0x400 | uVar124 >> 0x16) ^
           (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar55;
  uVar4 = iVar43 + uVar119;
  uVar5 = iVar49 + uVar135;
  uVar9 = iVar52 + uVar115;
  uVar18 = iVar55 + uVar137;
  iVar43 = (uVar19 & uVar4 | ~uVar4 & uVar23) + uVar10 + 0x3956c25b +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
  iVar49 = (uVar21 & uVar5 | ~uVar5 & uVar34) + uVar33 + 0x3956c25b +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
  iVar52 = (uVar30 & uVar9 | ~uVar9 & uVar44) + uVar20 + 0x3956c25b +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
  iVar55 = (uVar8 & uVar18 | ~uVar18 & uVar50) + uVar31 + 0x3956c25b +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
  uVar95 = uVar95 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar118 = uVar118 + iVar52;
  uVar87 = uVar87 + iVar55;
  uVar10 = ((uVar126 | uVar122) & uVar66 | uVar126 & uVar122) +
           ((uVar126 * 0x400 | uVar126 >> 0x16) ^
           (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar43;
  uVar33 = ((uVar72 | uVar69) & uVar96 | uVar72 & uVar69) +
           ((uVar72 * 0x400 | uVar72 >> 0x16) ^
           (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar49;
  uVar20 = ((uVar155 | uVar71) & uVar68 | uVar155 & uVar71) +
           ((uVar155 * 0x400 | uVar155 >> 0x16) ^
           (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar52;
  uVar31 = ((uVar74 | uVar124) & uVar99 | uVar74 & uVar124) +
           ((uVar74 * 0x400 | uVar74 >> 0x16) ^
           (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar55;
  iVar43 = (uVar4 & uVar95 | ~uVar95 & uVar19) + uVar23 + 0x59f111f1 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar49 = (uVar5 & uVar51 | ~uVar51 & uVar21) + uVar34 + 0x59f111f1 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  iVar52 = (uVar9 & uVar118 | ~uVar118 & uVar30) + uVar44 + 0x59f111f1 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6));
  iVar55 = (uVar18 & uVar87 | ~uVar87 & uVar8) + uVar50 + 0x59f111f1 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  uVar66 = uVar66 + iVar43;
  uVar96 = uVar96 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar99 = uVar99 + iVar55;
  uVar131 = ((uVar10 | uVar126) & uVar122 | uVar10 & uVar126) +
            ((uVar10 * 0x400 | uVar10 >> 0x16) ^
            (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar80 = ((uVar33 | uVar72) & uVar69 | uVar33 & uVar72) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar160 = ((uVar20 | uVar155) & uVar71 | uVar20 & uVar155) +
            ((uVar20 * 0x400 | uVar20 >> 0x16) ^
            (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar82 = ((uVar31 | uVar74) & uVar124 | uVar31 & uVar74) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  iVar43 = (uVar95 & uVar66 | ~uVar66 & uVar4) + uVar19 + -0x6dc07d5c +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6));
  iVar49 = (uVar51 & uVar96 | ~uVar96 & uVar5) + uVar21 + -0x6dc07d5c +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6));
  iVar52 = (uVar118 & uVar68 | ~uVar68 & uVar9) + uVar30 + -0x6dc07d5c +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6));
  iVar55 = (uVar87 & uVar99 | ~uVar99 & uVar18) + uVar8 + -0x6dc07d5c +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6));
  uVar122 = uVar122 + iVar43;
  uVar69 = uVar69 + iVar49;
  uVar71 = uVar71 + iVar52;
  uVar124 = uVar124 + iVar55;
  uVar19 = ((uVar131 | uVar10) & uVar126 | uVar131 & uVar10) +
           ((uVar131 * 0x400 | uVar131 >> 0x16) ^
           (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar43;
  uVar21 = ((uVar80 | uVar33) & uVar72 | uVar80 & uVar33) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar49;
  uVar30 = ((uVar160 | uVar20) & uVar155 | uVar160 & uVar20) +
           ((uVar160 * 0x400 | uVar160 >> 0x16) ^
           (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar52;
  uVar8 = ((uVar82 | uVar31) & uVar74 | uVar82 & uVar31) +
          ((uVar82 * 0x400 | uVar82 >> 0x16) ^
          (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar55;
  iVar43 = (uVar66 & uVar122 | ~uVar122 & uVar95) + uVar4 + -0x54e3a12b +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6));
  iVar49 = (uVar96 & uVar69 | ~uVar69 & uVar51) + uVar5 + -0x54e3a12b +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6));
  iVar52 = (uVar68 & uVar71 | ~uVar71 & uVar118) + uVar9 + -0x54e3a12b +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  iVar55 = (uVar99 & uVar124 | ~uVar124 & uVar87) + uVar18 + -0x54e3a12b +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6));
  uVar126 = uVar126 + iVar43;
  uVar72 = uVar72 + iVar49;
  uVar155 = uVar155 + iVar52;
  uVar74 = uVar74 + iVar55;
  uVar23 = ((uVar19 | uVar131) & uVar10 | uVar19 & uVar131) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar43;
  uVar34 = ((uVar21 | uVar80) & uVar33 | uVar21 & uVar80) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar49;
  uVar44 = ((uVar30 | uVar160) & uVar20 | uVar30 & uVar160) +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar52;
  uVar50 = ((uVar8 | uVar82) & uVar31 | uVar8 & uVar82) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  iVar43 = (uVar122 & uVar126 | ~uVar126 & uVar66) + uVar95 + -0x27f85568 +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6));
  iVar49 = (uVar69 & uVar72 | ~uVar72 & uVar96) + uVar51 + -0x27f85568 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6));
  iVar52 = (uVar71 & uVar155 | ~uVar155 & uVar68) + uVar118 + -0x27f85568 +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6));
  iVar55 = (uVar124 & uVar74 | ~uVar74 & uVar99) + uVar87 + -0x27f85568 +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6));
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar128 = ((uVar23 | uVar19) & uVar131 | uVar23 & uVar19) +
            ((uVar23 * 0x400 | uVar23 >> 0x16) ^
            (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar116 = ((uVar34 | uVar21) & uVar80 | uVar34 & uVar21) +
            ((uVar34 * 0x400 | uVar34 >> 0x16) ^
            (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar132 = ((uVar44 | uVar30) & uVar160 | uVar44 & uVar30) +
            ((uVar44 * 0x400 | uVar44 >> 0x16) ^
            (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar111 = ((uVar50 | uVar8) & uVar82 | uVar50 & uVar8) +
            ((uVar50 * 0x400 | uVar50 >> 0x16) ^
            (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  iVar43 = (uVar126 & uVar10 | ~uVar10 & uVar122) + uVar66 + 0x12835b01 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
  iVar49 = (uVar72 & uVar33 | ~uVar33 & uVar69) + uVar96 + 0x12835b01 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar52 = (uVar155 & uVar20 | ~uVar20 & uVar71) + uVar68 + 0x12835b01 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
  iVar55 = (uVar74 & uVar31 | ~uVar31 & uVar124) + uVar99 + 0x12835b01 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  uVar131 = uVar131 + iVar43;
  uVar80 = uVar80 + iVar49;
  uVar160 = uVar160 + iVar52;
  uVar82 = uVar82 + iVar55;
  uVar134 = ((uVar128 | uVar23) & uVar19 | uVar128 & uVar23) +
            ((uVar128 * 0x400 | uVar128 >> 0x16) ^
            (uVar128 * 0x80000 | uVar128 >> 0xd) ^ (uVar128 * 0x40000000 | uVar128 >> 2)) + iVar43;
  uVar84 = ((uVar116 | uVar34) & uVar21 | uVar116 & uVar34) +
           ((uVar116 * 0x400 | uVar116 >> 0x16) ^
           (uVar116 * 0x80000 | uVar116 >> 0xd) ^ (uVar116 * 0x40000000 | uVar116 >> 2)) + iVar49;
  uVar104 = ((uVar132 | uVar44) & uVar30 | uVar132 & uVar44) +
            ((uVar132 * 0x400 | uVar132 >> 0x16) ^
            (uVar132 * 0x80000 | uVar132 >> 0xd) ^ (uVar132 * 0x40000000 | uVar132 >> 2)) + iVar52;
  uVar93 = ((uVar111 | uVar50) & uVar8 | uVar111 & uVar50) +
           ((uVar111 * 0x400 | uVar111 >> 0x16) ^
           (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar55;
  iVar43 = (uVar10 & uVar131 | ~uVar131 & uVar126) + uVar122 + 0x243185be +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6));
  iVar49 = (uVar33 & uVar80 | ~uVar80 & uVar72) + uVar69 + 0x243185be +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6));
  iVar52 = (uVar20 & uVar160 | ~uVar160 & uVar155) + uVar71 + 0x243185be +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6));
  iVar55 = (uVar31 & uVar82 | ~uVar82 & uVar74) + uVar124 + 0x243185be +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6));
  uVar19 = uVar19 + iVar43;
  uVar21 = uVar21 + iVar49;
  uVar30 = uVar30 + iVar52;
  uVar8 = uVar8 + iVar55;
  uVar105 = ((uVar134 | uVar128) & uVar23 | uVar134 & uVar128) +
            ((uVar134 * 0x400 | uVar134 >> 0x16) ^
            (uVar134 * 0x80000 | uVar134 >> 0xd) ^ (uVar134 * 0x40000000 | uVar134 >> 2)) + iVar43;
  uVar100 = ((uVar84 | uVar116) & uVar34 | uVar84 & uVar116) +
            ((uVar84 * 0x400 | uVar84 >> 0x16) ^
            (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar49;
  uVar130 = ((uVar104 | uVar132) & uVar44 | uVar104 & uVar132) +
            ((uVar104 * 0x400 | uVar104 >> 0x16) ^
            (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar52;
  uVar112 = ((uVar93 | uVar111) & uVar50 | uVar93 & uVar111) +
            ((uVar93 * 0x400 | uVar93 >> 0x16) ^
            (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar55;
  iVar43 = (uVar131 & uVar19 | ~uVar19 & uVar10) + uVar126 + 0x550c7dc3 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
  iVar49 = (uVar80 & uVar21 | ~uVar21 & uVar33) + uVar72 + 0x550c7dc3 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6));
  iVar52 = (uVar160 & uVar30 | ~uVar30 & uVar20) + uVar155 + 0x550c7dc3 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6));
  iVar55 = (uVar82 & uVar8 | ~uVar8 & uVar31) + uVar74 + 0x550c7dc3 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar4 = ((uVar105 | uVar134) & uVar128 | uVar105 & uVar134) +
          ((uVar105 * 0x400 | uVar105 >> 0x16) ^
          (uVar105 * 0x80000 | uVar105 >> 0xd) ^ (uVar105 * 0x40000000 | uVar105 >> 2)) + iVar43;
  uVar5 = ((uVar100 | uVar84) & uVar116 | uVar100 & uVar84) +
          ((uVar100 * 0x400 | uVar100 >> 0x16) ^
          (uVar100 * 0x80000 | uVar100 >> 0xd) ^ (uVar100 * 0x40000000 | uVar100 >> 2)) + iVar49;
  uVar9 = ((uVar130 | uVar104) & uVar132 | uVar130 & uVar104) +
          ((uVar130 * 0x400 | uVar130 >> 0x16) ^
          (uVar130 * 0x80000 | uVar130 >> 0xd) ^ (uVar130 * 0x40000000 | uVar130 >> 2)) + iVar52;
  uVar18 = ((uVar112 | uVar93) & uVar111 | uVar112 & uVar93) +
           ((uVar112 * 0x400 | uVar112 >> 0x16) ^
           (uVar112 * 0x80000 | uVar112 >> 0xd) ^ (uVar112 * 0x40000000 | uVar112 >> 2)) + iVar55;
  iVar43 = (uVar19 & uVar23 | ~uVar23 & uVar131) + uVar10 + 0x72be5d74 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar49 = (uVar21 & uVar34 | ~uVar34 & uVar80) + uVar33 + 0x72be5d74 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar52 = (uVar30 & uVar44 | ~uVar44 & uVar160) + uVar20 + 0x72be5d74 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar55 = (uVar8 & uVar50 | ~uVar50 & uVar82) + uVar31 + 0x72be5d74 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  uVar128 = uVar128 + iVar43;
  uVar116 = uVar116 + iVar49;
  uVar132 = uVar132 + iVar52;
  uVar111 = uVar111 + iVar55;
  uVar95 = ((uVar4 | uVar105) & uVar134 | uVar4 & uVar105) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar51 = ((uVar5 | uVar100) & uVar84 | uVar5 & uVar100) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar49;
  uVar118 = ((uVar9 | uVar130) & uVar104 | uVar9 & uVar130) +
            ((uVar9 * 0x400 | uVar9 >> 0x16) ^
            (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar52;
  uVar87 = ((uVar18 | uVar112) & uVar93 | uVar18 & uVar112) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar55;
  iVar43 = (uVar23 & uVar128 | ~uVar128 & uVar19) + uVar131 + -0x7f214e02 +
           ((uVar128 * 0x80 | uVar128 >> 0x19) ^
           (uVar128 * 0x200000 | uVar128 >> 0xb) ^ (uVar128 * 0x4000000 | uVar128 >> 6));
  iVar49 = (uVar34 & uVar116 | ~uVar116 & uVar21) + uVar80 + -0x7f214e02 +
           ((uVar116 * 0x80 | uVar116 >> 0x19) ^
           (uVar116 * 0x200000 | uVar116 >> 0xb) ^ (uVar116 * 0x4000000 | uVar116 >> 6));
  iVar52 = (uVar44 & uVar132 | ~uVar132 & uVar30) + uVar160 + -0x7f214e02 +
           ((uVar132 * 0x80 | uVar132 >> 0x19) ^
           (uVar132 * 0x200000 | uVar132 >> 0xb) ^ (uVar132 * 0x4000000 | uVar132 >> 6));
  iVar55 = (uVar50 & uVar111 | ~uVar111 & uVar8) + uVar82 + -0x7f214e02 +
           ((uVar111 * 0x80 | uVar111 >> 0x19) ^
           (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6));
  uVar134 = uVar134 + iVar43;
  uVar84 = uVar84 + iVar49;
  uVar104 = uVar104 + iVar52;
  uVar93 = uVar93 + iVar55;
  uVar10 = ((uVar95 | uVar4) & uVar105 | uVar95 & uVar4) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar33 = ((uVar51 | uVar5) & uVar100 | uVar51 & uVar5) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar20 = ((uVar118 | uVar9) & uVar130 | uVar118 & uVar9) +
           ((uVar118 * 0x400 | uVar118 >> 0x16) ^
           (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar52;
  uVar31 = ((uVar87 | uVar18) & uVar112 | uVar87 & uVar18) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar55;
  iVar43 = (uVar128 & uVar134 | ~uVar134 & uVar23) + uVar19 + -0x6423f959 +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6));
  iVar49 = (uVar116 & uVar84 | ~uVar84 & uVar34) + uVar21 + -0x6423f959 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6));
  iVar52 = (uVar132 & uVar104 | ~uVar104 & uVar44) + uVar30 + -0x6423f959 +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6));
  iVar55 = (uVar111 & uVar93 | ~uVar93 & uVar50) + uVar8 + -0x6423f959 +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6));
  uVar105 = uVar105 + iVar43;
  uVar100 = uVar100 + iVar49;
  uVar130 = uVar130 + iVar52;
  uVar112 = uVar112 + iVar55;
  uVar19 = ((uVar10 | uVar95) & uVar4 | uVar10 & uVar95) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar21 = ((uVar33 | uVar51) & uVar5 | uVar33 & uVar51) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar30 = ((uVar20 | uVar118) & uVar9 | uVar20 & uVar118) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar8 = ((uVar31 | uVar87) & uVar18 | uVar31 & uVar87) +
          ((uVar31 * 0x400 | uVar31 >> 0x16) ^
          (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  iVar43 = (uVar134 & uVar105 | ~uVar105 & uVar128) + uVar23 +
           ((uVar105 * 0x80 | uVar105 >> 0x19) ^
           (uVar105 * 0x200000 | uVar105 >> 0xb) ^ (uVar105 * 0x4000000 | uVar105 >> 6)) +
           -0x3e640c8c;
  iVar49 = (uVar84 & uVar100 | ~uVar100 & uVar116) + uVar34 +
           ((uVar100 * 0x80 | uVar100 >> 0x19) ^
           (uVar100 * 0x200000 | uVar100 >> 0xb) ^ (uVar100 * 0x4000000 | uVar100 >> 6)) +
           -0x3e640c8c;
  iVar52 = (uVar104 & uVar130 | ~uVar130 & uVar132) + uVar44 +
           ((uVar130 * 0x80 | uVar130 >> 0x19) ^
           (uVar130 * 0x200000 | uVar130 >> 0xb) ^ (uVar130 * 0x4000000 | uVar130 >> 6)) +
           -0x3e640c8c;
  iVar55 = (uVar93 & uVar112 | ~uVar112 & uVar111) + uVar50 +
           ((uVar112 * 0x80 | uVar112 >> 0x19) ^
           (uVar112 * 0x200000 | uVar112 >> 0xb) ^ (uVar112 * 0x4000000 | uVar112 >> 6)) +
           -0x3e640c8c;
  uVar4 = uVar4 + iVar43;
  uVar5 = uVar5 + iVar49;
  uVar9 = uVar9 + iVar52;
  uVar18 = uVar18 + iVar55;
  uVar23 = ((uVar19 | uVar10) & uVar95 | uVar19 & uVar10) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar43;
  uVar34 = ((uVar21 | uVar33) & uVar51 | uVar21 & uVar33) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar49;
  uVar44 = ((uVar30 | uVar20) & uVar118 | uVar30 & uVar20) +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar52;
  uVar50 = ((uVar8 | uVar31) & uVar87 | uVar8 & uVar31) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  iVar43 = (uVar105 & uVar4 | ~uVar4 & uVar134) + uVar128 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + 0x649b69c1;
  iVar49 = (uVar100 & uVar5 | ~uVar5 & uVar84) + uVar116 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + 0x649b69c1;
  iVar52 = (uVar130 & uVar9 | ~uVar9 & uVar104) + uVar132 +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x649b69c1;
  iVar55 = (uVar112 & uVar18 | ~uVar18 & uVar93) + uVar111 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) + 0x649b69c1;
  uVar95 = uVar95 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar118 = uVar118 + iVar52;
  uVar87 = uVar87 + iVar55;
  uVar66 = ((uVar23 | uVar19) & uVar10 | uVar23 & uVar19) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar96 = ((uVar34 | uVar21) & uVar33 | uVar34 & uVar21) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar68 = ((uVar44 | uVar30) & uVar20 | uVar44 & uVar30) +
           ((uVar44 * 0x400 | uVar44 >> 0x16) ^
           (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar99 = ((uVar50 | uVar8) & uVar31 | uVar50 & uVar8) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  iVar43 = (uVar4 & uVar95 | ~uVar95 & uVar105) + uVar134 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6)) + -0xf01b87a;
  iVar49 = (uVar5 & uVar51 | ~uVar51 & uVar100) + uVar84 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) + -0xf01b87a;
  iVar52 = (uVar9 & uVar118 | ~uVar118 & uVar130) + uVar104 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6)) +
           -0xf01b87a;
  iVar55 = (uVar18 & uVar87 | ~uVar87 & uVar112) + uVar93 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6)) + -0xf01b87a;
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar122 = ((uVar66 | uVar23) & uVar19 | uVar66 & uVar23) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar43;
  uVar69 = ((uVar96 | uVar34) & uVar21 | uVar96 & uVar34) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar49;
  uVar71 = ((uVar68 | uVar44) & uVar30 | uVar68 & uVar44) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar124 = ((uVar99 | uVar50) & uVar8 | uVar99 & uVar50) +
            ((uVar99 * 0x400 | uVar99 >> 0x16) ^
            (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar55;
  iVar43 = (uVar95 & uVar10 | ~uVar10 & uVar4) + uVar105 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + 0xfe1edc6;
  iVar49 = (uVar51 & uVar33 | ~uVar33 & uVar5) + uVar100 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) + 0xfe1edc6;
  iVar52 = (uVar118 & uVar20 | ~uVar20 & uVar9) + uVar130 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) + 0xfe1edc6;
  iVar55 = (uVar87 & uVar31 | ~uVar31 & uVar18) + uVar112 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) + 0xfe1edc6;
  uVar19 = uVar19 + iVar43;
  uVar21 = uVar21 + iVar49;
  uVar30 = uVar30 + iVar52;
  uVar8 = uVar8 + iVar55;
  uVar126 = ((uVar122 | uVar66) & uVar23 | uVar122 & uVar66) +
            ((uVar122 * 0x400 | uVar122 >> 0x16) ^
            (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar43;
  uVar72 = ((uVar69 | uVar96) & uVar34 | uVar69 & uVar96) +
           ((uVar69 * 0x400 | uVar69 >> 0x16) ^
           (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar49;
  uVar155 = ((uVar71 | uVar68) & uVar44 | uVar71 & uVar68) +
            ((uVar71 * 0x400 | uVar71 >> 0x16) ^
            (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar52;
  uVar74 = ((uVar124 | uVar99) & uVar50 | uVar124 & uVar99) +
           ((uVar124 * 0x400 | uVar124 >> 0x16) ^
           (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar55;
  iVar43 = (uVar10 & uVar19 | ~uVar19 & uVar95) + uVar4 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + 0x240cf254;
  iVar49 = (uVar33 & uVar21 | ~uVar21 & uVar51) + uVar5 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + 0x240cf254;
  iVar52 = (uVar20 & uVar30 | ~uVar30 & uVar118) + uVar9 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) + 0x240cf254;
  iVar55 = (uVar31 & uVar8 | ~uVar8 & uVar87) + uVar18 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + 0x240cf254;
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar131 = ((uVar126 | uVar122) & uVar66 | uVar126 & uVar122) +
            ((uVar126 * 0x400 | uVar126 >> 0x16) ^
            (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar43;
  uVar80 = ((uVar72 | uVar69) & uVar96 | uVar72 & uVar69) +
           ((uVar72 * 0x400 | uVar72 >> 0x16) ^
           (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar49;
  uVar160 = ((uVar155 | uVar71) & uVar68 | uVar155 & uVar71) +
            ((uVar155 * 0x400 | uVar155 >> 0x16) ^
            (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar52;
  uVar82 = ((uVar74 | uVar124) & uVar99 | uVar74 & uVar124) +
           ((uVar74 * 0x400 | uVar74 >> 0x16) ^
           (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar55;
  iVar43 = (uVar19 & uVar23 | ~uVar23 & uVar10) + uVar95 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) + 0x4fe9346f;
  iVar49 = (uVar21 & uVar34 | ~uVar34 & uVar33) + uVar51 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) + 0x4fe9346f;
  iVar52 = (uVar30 & uVar44 | ~uVar44 & uVar20) + uVar118 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) + 0x4fe9346f;
  iVar55 = (uVar8 & uVar50 | ~uVar50 & uVar31) + uVar87 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) + 0x4fe9346f;
  uVar66 = uVar66 + iVar43;
  uVar96 = uVar96 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar99 = uVar99 + iVar55;
  uVar134 = ((uVar131 | uVar126) & uVar122 | uVar131 & uVar126) +
            ((uVar131 * 0x400 | uVar131 >> 0x16) ^
            (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar43;
  uVar84 = ((uVar80 | uVar72) & uVar69 | uVar80 & uVar72) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar49;
  uVar104 = ((uVar160 | uVar155) & uVar71 | uVar160 & uVar155) +
            ((uVar160 * 0x400 | uVar160 >> 0x16) ^
            (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar52;
  uVar93 = ((uVar82 | uVar74) & uVar124 | uVar82 & uVar74) +
           ((uVar82 * 0x400 | uVar82 >> 0x16) ^
           (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar55;
  iVar43 = (uVar23 & uVar66 | ~uVar66 & uVar19) + uVar10 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6)) + 0x6cc984be;
  iVar49 = (uVar34 & uVar96 | ~uVar96 & uVar21) + uVar33 +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6)) + 0x6cc984be;
  iVar52 = (uVar44 & uVar68 | ~uVar68 & uVar30) + uVar20 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6)) + 0x6cc984be;
  iVar55 = (uVar50 & uVar99 | ~uVar99 & uVar8) + uVar31 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6)) + 0x6cc984be;
  uVar122 = uVar122 + iVar43;
  uVar69 = uVar69 + iVar49;
  uVar71 = uVar71 + iVar52;
  uVar124 = uVar124 + iVar55;
  uVar105 = ((uVar134 | uVar131) & uVar126 | uVar134 & uVar131) +
            ((uVar134 * 0x400 | uVar134 >> 0x16) ^
            (uVar134 * 0x80000 | uVar134 >> 0xd) ^ (uVar134 * 0x40000000 | uVar134 >> 2)) + iVar43;
  uVar100 = ((uVar84 | uVar80) & uVar72 | uVar84 & uVar80) +
            ((uVar84 * 0x400 | uVar84 >> 0x16) ^
            (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar49;
  uVar130 = ((uVar104 | uVar160) & uVar155 | uVar104 & uVar160) +
            ((uVar104 * 0x400 | uVar104 >> 0x16) ^
            (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar52;
  uVar112 = ((uVar93 | uVar82) & uVar74 | uVar93 & uVar82) +
            ((uVar93 * 0x400 | uVar93 >> 0x16) ^
            (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar55;
  iVar43 = (uVar66 & uVar122 | ~uVar122 & uVar23) + uVar19 +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6)) +
           0x61b9411e;
  iVar49 = (uVar96 & uVar69 | ~uVar69 & uVar34) + uVar21 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6)) + 0x61b9411e;
  iVar52 = (uVar68 & uVar71 | ~uVar71 & uVar44) + uVar30 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6)) + 0x61b9411e;
  iVar55 = (uVar99 & uVar124 | ~uVar124 & uVar50) + uVar8 +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6)) +
           0x61b9411e;
  uVar126 = uVar126 + iVar43;
  uVar72 = uVar72 + iVar49;
  uVar155 = uVar155 + iVar52;
  uVar74 = uVar74 + iVar55;
  uVar128 = ((uVar105 | uVar134) & uVar131 | uVar105 & uVar134) +
            ((uVar105 * 0x400 | uVar105 >> 0x16) ^
            (uVar105 * 0x80000 | uVar105 >> 0xd) ^ (uVar105 * 0x40000000 | uVar105 >> 2)) + iVar43;
  uVar116 = ((uVar100 | uVar84) & uVar80 | uVar100 & uVar84) +
            ((uVar100 * 0x400 | uVar100 >> 0x16) ^
            (uVar100 * 0x80000 | uVar100 >> 0xd) ^ (uVar100 * 0x40000000 | uVar100 >> 2)) + iVar49;
  uVar132 = ((uVar130 | uVar104) & uVar160 | uVar130 & uVar104) +
            ((uVar130 * 0x400 | uVar130 >> 0x16) ^
            (uVar130 * 0x80000 | uVar130 >> 0xd) ^ (uVar130 * 0x40000000 | uVar130 >> 2)) + iVar52;
  uVar111 = ((uVar112 | uVar93) & uVar82 | uVar112 & uVar93) +
            ((uVar112 * 0x400 | uVar112 >> 0x16) ^
            (uVar112 * 0x80000 | uVar112 >> 0xd) ^ (uVar112 * 0x40000000 | uVar112 >> 2)) + iVar55;
  iVar43 = (uVar122 & uVar126 | ~uVar126 & uVar66) + uVar23 +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6)) +
           0x16f988fa;
  iVar49 = (uVar69 & uVar72 | ~uVar72 & uVar96) + uVar34 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6)) + 0x16f988fa;
  iVar52 = (uVar71 & uVar155 | ~uVar155 & uVar68) + uVar44 +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6)) +
           0x16f988fa;
  iVar55 = (uVar124 & uVar74 | ~uVar74 & uVar99) + uVar50 +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) + 0x16f988fa;
  uVar131 = uVar131 + iVar43;
  uVar80 = uVar80 + iVar49;
  uVar160 = uVar160 + iVar52;
  uVar82 = uVar82 + iVar55;
  uVar4 = ((uVar128 | uVar105) & uVar134 | uVar128 & uVar105) +
          ((uVar128 * 0x400 | uVar128 >> 0x16) ^
          (uVar128 * 0x80000 | uVar128 >> 0xd) ^ (uVar128 * 0x40000000 | uVar128 >> 2)) + iVar43;
  uVar5 = ((uVar116 | uVar100) & uVar84 | uVar116 & uVar100) +
          ((uVar116 * 0x400 | uVar116 >> 0x16) ^
          (uVar116 * 0x80000 | uVar116 >> 0xd) ^ (uVar116 * 0x40000000 | uVar116 >> 2)) + iVar49;
  uVar9 = ((uVar132 | uVar130) & uVar104 | uVar132 & uVar130) +
          ((uVar132 * 0x400 | uVar132 >> 0x16) ^
          (uVar132 * 0x80000 | uVar132 >> 0xd) ^ (uVar132 * 0x40000000 | uVar132 >> 2)) + iVar52;
  uVar18 = ((uVar111 | uVar112) & uVar93 | uVar111 & uVar112) +
           ((uVar111 * 0x400 | uVar111 >> 0x16) ^
           (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar55;
  iVar43 = (uVar126 & uVar131 | ~uVar131 & uVar122) + uVar66 +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6)) +
           -0xd39aeae;
  iVar49 = (uVar72 & uVar80 | ~uVar80 & uVar69) + uVar96 +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6)) + -0xd39aeae;
  iVar52 = (uVar155 & uVar160 | ~uVar160 & uVar71) + uVar68 +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6)) +
           -0xd39aeae;
  iVar55 = (uVar74 & uVar82 | ~uVar82 & uVar124) + uVar99 +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6)) + -0xd39aeae;
  uVar134 = uVar134 + iVar43;
  uVar84 = uVar84 + iVar49;
  uVar104 = uVar104 + iVar52;
  uVar93 = uVar93 + iVar55;
  uVar19 = ((uVar4 | uVar128) & uVar105 | uVar4 & uVar128) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar21 = ((uVar5 | uVar116) & uVar100 | uVar5 & uVar116) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar49;
  uVar30 = ((uVar9 | uVar132) & uVar130 | uVar9 & uVar132) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar52;
  uVar8 = ((uVar18 | uVar111) & uVar112 | uVar18 & uVar111) +
          ((uVar18 * 0x400 | uVar18 >> 0x16) ^
          (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar55;
  iVar43 = (uVar131 & uVar134 | ~uVar134 & uVar126) + uVar122 +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6)) +
           -0x5771a593;
  iVar49 = (uVar80 & uVar84 | ~uVar84 & uVar72) + uVar69 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6)) + -0x5771a593;
  iVar52 = (uVar160 & uVar104 | ~uVar104 & uVar155) + uVar71 +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6)) +
           -0x5771a593;
  iVar55 = (uVar82 & uVar93 | ~uVar93 & uVar74) + uVar124 +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6)) + -0x5771a593;
  uVar105 = uVar105 + iVar43;
  uVar100 = uVar100 + iVar49;
  uVar130 = uVar130 + iVar52;
  uVar112 = uVar112 + iVar55;
  uVar10 = ((uVar19 | uVar4) & uVar128 | uVar19 & uVar4) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar43;
  uVar33 = ((uVar21 | uVar5) & uVar116 | uVar21 & uVar5) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar49;
  uVar20 = ((uVar30 | uVar9) & uVar132 | uVar30 & uVar9) +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar52;
  uVar31 = ((uVar8 | uVar18) & uVar111 | uVar8 & uVar18) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  iVar43 = (uVar134 & uVar105 | ~uVar105 & uVar131) + uVar126 +
           ((uVar105 * 0x80 | uVar105 >> 0x19) ^
           (uVar105 * 0x200000 | uVar105 >> 0xb) ^ (uVar105 * 0x4000000 | uVar105 >> 6)) +
           -0x4fe6039b;
  iVar49 = (uVar84 & uVar100 | ~uVar100 & uVar80) + uVar72 +
           ((uVar100 * 0x80 | uVar100 >> 0x19) ^
           (uVar100 * 0x200000 | uVar100 >> 0xb) ^ (uVar100 * 0x4000000 | uVar100 >> 6)) +
           -0x4fe6039b;
  iVar52 = (uVar104 & uVar130 | ~uVar130 & uVar160) + uVar155 +
           ((uVar130 * 0x80 | uVar130 >> 0x19) ^
           (uVar130 * 0x200000 | uVar130 >> 0xb) ^ (uVar130 * 0x4000000 | uVar130 >> 6)) +
           -0x4fe6039b;
  iVar55 = (uVar93 & uVar112 | ~uVar112 & uVar82) + uVar74 +
           ((uVar112 * 0x80 | uVar112 >> 0x19) ^
           (uVar112 * 0x200000 | uVar112 >> 0xb) ^ (uVar112 * 0x4000000 | uVar112 >> 6)) +
           -0x4fe6039b;
  uVar128 = uVar128 + iVar43;
  uVar116 = uVar116 + iVar49;
  uVar132 = uVar132 + iVar52;
  uVar111 = uVar111 + iVar55;
  uVar23 = ((uVar10 | uVar19) & uVar4 | uVar10 & uVar19) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar34 = ((uVar33 | uVar21) & uVar5 | uVar33 & uVar21) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar44 = ((uVar20 | uVar30) & uVar9 | uVar20 & uVar30) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar50 = ((uVar31 | uVar8) & uVar18 | uVar31 & uVar8) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  iVar43 = (uVar105 & uVar128 | ~uVar128 & uVar134) + uVar131 +
           ((uVar128 * 0x80 | uVar128 >> 0x19) ^
           (uVar128 * 0x200000 | uVar128 >> 0xb) ^ (uVar128 * 0x4000000 | uVar128 >> 6)) +
           -0x46266139;
  iVar49 = (uVar100 & uVar116 | ~uVar116 & uVar84) + uVar80 +
           ((uVar116 * 0x80 | uVar116 >> 0x19) ^
           (uVar116 * 0x200000 | uVar116 >> 0xb) ^ (uVar116 * 0x4000000 | uVar116 >> 6)) +
           -0x46266139;
  iVar52 = (uVar130 & uVar132 | ~uVar132 & uVar104) + uVar160 +
           ((uVar132 * 0x80 | uVar132 >> 0x19) ^
           (uVar132 * 0x200000 | uVar132 >> 0xb) ^ (uVar132 * 0x4000000 | uVar132 >> 6)) +
           -0x46266139;
  iVar55 = (uVar112 & uVar111 | ~uVar111 & uVar93) + uVar82 +
           ((uVar111 * 0x80 | uVar111 >> 0x19) ^
           (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6)) +
           -0x46266139;
  uVar4 = uVar4 + iVar43;
  uVar5 = uVar5 + iVar49;
  uVar9 = uVar9 + iVar52;
  uVar18 = uVar18 + iVar55;
  uVar95 = ((uVar23 | uVar10) & uVar19 | uVar23 & uVar10) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar51 = ((uVar34 | uVar33) & uVar21 | uVar34 & uVar33) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar118 = ((uVar44 | uVar20) & uVar30 | uVar44 & uVar20) +
            ((uVar44 * 0x400 | uVar44 >> 0x16) ^
            (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar87 = ((uVar50 | uVar31) & uVar8 | uVar50 & uVar31) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  iVar43 = (uVar128 & uVar4 | ~uVar4 & uVar105) + uVar134 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + -0x65edce3d;
  iVar49 = (uVar116 & uVar5 | ~uVar5 & uVar100) + uVar84 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + -0x65edce3d;
  iVar52 = (uVar132 & uVar9 | ~uVar9 & uVar130) + uVar104 +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + -0x65edce3d;
  iVar55 = (uVar111 & uVar18 | ~uVar18 & uVar112) + uVar93 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) + -0x65edce3d;
  uVar19 = uVar19 + iVar43;
  uVar21 = uVar21 + iVar49;
  uVar30 = uVar30 + iVar52;
  uVar8 = uVar8 + iVar55;
  uVar66 = ((uVar95 | uVar23) & uVar10 | uVar95 & uVar23) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar96 = ((uVar51 | uVar34) & uVar33 | uVar51 & uVar34) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar68 = ((uVar118 | uVar44) & uVar20 | uVar118 & uVar44) +
           ((uVar118 * 0x400 | uVar118 >> 0x16) ^
           (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar52;
  uVar99 = ((uVar87 | uVar50) & uVar31 | uVar87 & uVar50) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar55;
  iVar43 = (uVar4 & uVar19 | ~uVar19 & uVar128) + uVar105 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + -0x18f11560;
  iVar49 = (uVar5 & uVar21 | ~uVar21 & uVar116) + uVar100 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + -0x18f11560;
  iVar52 = (uVar9 & uVar30 | ~uVar30 & uVar132) + uVar130 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) + -0x18f11560;
  iVar55 = (uVar18 & uVar8 | ~uVar8 & uVar111) + uVar112 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + -0x18f11560;
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar122 = ((uVar66 | uVar95) & uVar23 | uVar66 & uVar95) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar43;
  uVar69 = ((uVar96 | uVar51) & uVar34 | uVar96 & uVar51) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar49;
  uVar71 = ((uVar68 | uVar118) & uVar44 | uVar68 & uVar118) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar124 = ((uVar99 | uVar87) & uVar50 | uVar99 & uVar87) +
            ((uVar99 * 0x400 | uVar99 >> 0x16) ^
            (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar55;
  iVar43 = (uVar19 & uVar10 | ~uVar10 & uVar4) + uVar128 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + -0x24edcd5;
  iVar49 = (uVar21 & uVar33 | ~uVar33 & uVar5) + uVar116 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) + -0x24edcd5;
  iVar52 = (uVar30 & uVar20 | ~uVar20 & uVar9) + uVar132 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) + -0x24edcd5;
  iVar55 = (uVar8 & uVar31 | ~uVar31 & uVar18) + uVar111 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) + -0x24edcd5;
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar126 = ((uVar122 | uVar66) & uVar95 | uVar122 & uVar66) +
            ((uVar122 * 0x400 | uVar122 >> 0x16) ^
            (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar43;
  uVar72 = ((uVar69 | uVar96) & uVar51 | uVar69 & uVar96) +
           ((uVar69 * 0x400 | uVar69 >> 0x16) ^
           (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar49;
  uVar131 = ((uVar71 | uVar68) & uVar118 | uVar71 & uVar68) +
            ((uVar71 * 0x400 | uVar71 >> 0x16) ^
            (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar52;
  uVar80 = ((uVar124 | uVar99) & uVar87 | uVar124 & uVar99) +
           ((uVar124 * 0x400 | uVar124 >> 0x16) ^
           (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar55;
  iVar43 = (uVar10 & uVar23 | ~uVar23 & uVar19) + uVar4 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) + -0x38cac150;
  iVar49 = (uVar33 & uVar34 | ~uVar34 & uVar21) + uVar5 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) + -0x38cac150;
  iVar52 = (uVar20 & uVar44 | ~uVar44 & uVar30) + uVar9 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) + -0x38cac150;
  iVar55 = (uVar31 & uVar50 | ~uVar50 & uVar8) + uVar18 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) + -0x38cac150;
  uVar95 = uVar95 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar118 = uVar118 + iVar52;
  uVar87 = uVar87 + iVar55;
  uVar4 = ((uVar126 | uVar122) & uVar66 | uVar126 & uVar122) +
          ((uVar126 * 0x400 | uVar126 >> 0x16) ^
          (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar43;
  uVar5 = ((uVar72 | uVar69) & uVar96 | uVar72 & uVar69) +
          ((uVar72 * 0x400 | uVar72 >> 0x16) ^
          (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar49;
  uVar9 = ((uVar131 | uVar71) & uVar68 | uVar131 & uVar71) +
          ((uVar131 * 0x400 | uVar131 >> 0x16) ^
          (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar52;
  uVar18 = ((uVar80 | uVar124) & uVar99 | uVar80 & uVar124) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar55;
  iVar43 = (uVar23 & uVar95 | ~uVar95 & uVar10) + uVar19 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6)) + 0x3069bad5;
  iVar49 = (uVar34 & uVar51 | ~uVar51 & uVar33) + uVar21 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) + 0x3069bad5;
  iVar52 = (uVar44 & uVar118 | ~uVar118 & uVar20) + uVar30 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6)) +
           0x3069bad5;
  iVar55 = (uVar50 & uVar87 | ~uVar87 & uVar31) + uVar8 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6)) + 0x3069bad5;
  uVar66 = uVar66 + iVar43;
  uVar96 = uVar96 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar99 = uVar99 + iVar55;
  uVar19 = ((uVar4 | uVar126) & uVar122 | uVar4 & uVar126) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar21 = ((uVar5 | uVar72) & uVar69 | uVar5 & uVar72) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar49;
  uVar30 = ((uVar9 | uVar131) & uVar71 | uVar9 & uVar131) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar52;
  uVar8 = ((uVar18 | uVar80) & uVar124 | uVar18 & uVar80) +
          ((uVar18 * 0x400 | uVar18 >> 0x16) ^
          (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar55;
  iVar43 = (uVar95 & uVar66 | ~uVar66 & uVar23) + uVar10 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6)) + -0x346892a1;
  iVar49 = (uVar51 & uVar96 | ~uVar96 & uVar34) + uVar33 +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6)) + -0x346892a1;
  iVar52 = (uVar118 & uVar68 | ~uVar68 & uVar44) + uVar20 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6)) + -0x346892a1;
  iVar55 = (uVar87 & uVar99 | ~uVar99 & uVar50) + uVar31 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6)) + -0x346892a1;
  uVar122 = uVar122 + iVar43;
  uVar69 = uVar69 + iVar49;
  uVar71 = uVar71 + iVar52;
  uVar124 = uVar124 + iVar55;
  uVar10 = ((uVar19 | uVar4) & uVar126 | uVar19 & uVar4) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar43;
  uVar33 = ((uVar21 | uVar5) & uVar72 | uVar21 & uVar5) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar49;
  uVar20 = ((uVar30 | uVar9) & uVar131 | uVar30 & uVar9) +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar52;
  uVar31 = ((uVar8 | uVar18) & uVar80 | uVar8 & uVar18) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  iVar43 = (uVar66 & uVar122 | ~uVar122 & uVar95) + uVar23 +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6)) +
           0x5a0f118f;
  iVar49 = (uVar96 & uVar69 | ~uVar69 & uVar51) + uVar34 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6)) + 0x5a0f118f;
  iVar52 = (uVar68 & uVar71 | ~uVar71 & uVar118) + uVar44 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6)) + 0x5a0f118f;
  iVar55 = (uVar99 & uVar124 | ~uVar124 & uVar87) + uVar50 +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6)) +
           0x5a0f118f;
  uVar126 = uVar126 + iVar43;
  uVar72 = uVar72 + iVar49;
  uVar131 = uVar131 + iVar52;
  uVar80 = uVar80 + iVar55;
  uVar23 = ((uVar10 | uVar19) & uVar4 | uVar10 & uVar19) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar34 = ((uVar33 | uVar21) & uVar5 | uVar33 & uVar21) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar44 = ((uVar20 | uVar30) & uVar9 | uVar20 & uVar30) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar50 = ((uVar31 | uVar8) & uVar18 | uVar31 & uVar8) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  iVar43 = (uVar122 & uVar126 | ~uVar126 & uVar66) + uVar95 +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6)) +
           -0x23e11103;
  iVar49 = (uVar69 & uVar72 | ~uVar72 & uVar96) + uVar51 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6)) + -0x23e11103;
  iVar52 = (uVar71 & uVar131 | ~uVar131 & uVar68) + uVar118 +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6)) +
           -0x23e11103;
  iVar55 = (uVar124 & uVar80 | ~uVar80 & uVar99) + uVar87 +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6)) + -0x23e11103;
  uVar4 = uVar4 + iVar43;
  uVar5 = uVar5 + iVar49;
  uVar9 = uVar9 + iVar52;
  uVar18 = uVar18 + iVar55;
  uVar95 = ((uVar23 | uVar10) & uVar19 | uVar23 & uVar10) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar51 = ((uVar34 | uVar33) & uVar21 | uVar34 & uVar33) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar118 = ((uVar44 | uVar20) & uVar30 | uVar44 & uVar20) +
            ((uVar44 * 0x400 | uVar44 >> 0x16) ^
            (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar87 = ((uVar50 | uVar31) & uVar8 | uVar50 & uVar31) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  iVar43 = (uVar126 & uVar4 | ~uVar4 & uVar122) + uVar66 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + 0xa35b689;
  iVar49 = (uVar72 & uVar5 | ~uVar5 & uVar69) + uVar96 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + 0xa35b689;
  iVar52 = (uVar131 & uVar9 | ~uVar9 & uVar71) + uVar68 +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0xa35b689;
  iVar55 = (uVar80 & uVar18 | ~uVar18 & uVar124) + uVar99 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) + 0xa35b689;
  uVar19 = uVar19 + iVar43;
  uVar21 = uVar21 + iVar49;
  uVar30 = uVar30 + iVar52;
  uVar8 = uVar8 + iVar55;
  uVar66 = ((uVar95 | uVar23) & uVar10 | uVar95 & uVar23) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar96 = ((uVar51 | uVar34) & uVar33 | uVar51 & uVar34) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar68 = ((uVar118 | uVar44) & uVar20 | uVar118 & uVar44) +
           ((uVar118 * 0x400 | uVar118 >> 0x16) ^
           (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar52;
  uVar99 = ((uVar87 | uVar50) & uVar31 | uVar87 & uVar50) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar55;
  iVar43 = (uVar4 & uVar19 | ~uVar19 & uVar126) + uVar122 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + -0x21f485fc;
  iVar49 = (uVar5 & uVar21 | ~uVar21 & uVar72) + uVar69 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + -0x21f485fc;
  iVar52 = (uVar9 & uVar30 | ~uVar30 & uVar131) + uVar71 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) + -0x21f485fc;
  iVar55 = (uVar18 & uVar8 | ~uVar8 & uVar80) + uVar124 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + -0x21f485fc;
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar122 = ((uVar66 | uVar95) & uVar23 | uVar66 & uVar95) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar43;
  uVar69 = ((uVar96 | uVar51) & uVar34 | uVar96 & uVar51) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar49;
  uVar155 = ((uVar68 | uVar118) & uVar44 | uVar68 & uVar118) +
            ((uVar68 * 0x400 | uVar68 >> 0x16) ^
            (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar74 = ((uVar99 | uVar87) & uVar50 | uVar99 & uVar87) +
           ((uVar99 * 0x400 | uVar99 >> 0x16) ^
           (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar55;
  iVar43 = (uVar19 & uVar10 | ~uVar10 & uVar4) + uVar126 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + 0x58f4ca9d;
  iVar49 = (uVar21 & uVar33 | ~uVar33 & uVar5) + uVar72 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) + 0x58f4ca9d;
  iVar52 = (uVar30 & uVar20 | ~uVar20 & uVar9) + uVar131 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) + 0x58f4ca9d;
  iVar55 = (uVar8 & uVar31 | ~uVar31 & uVar18) + uVar80 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) + 0x58f4ca9d;
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar160 = ((uVar122 | uVar66) & uVar95 | uVar122 & uVar66) +
            ((uVar122 * 0x400 | uVar122 >> 0x16) ^
            (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar43;
  uVar82 = ((uVar69 | uVar96) & uVar51 | uVar69 & uVar96) +
           ((uVar69 * 0x400 | uVar69 >> 0x16) ^
           (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar49;
  uVar134 = ((uVar155 | uVar68) & uVar118 | uVar155 & uVar68) +
            ((uVar155 * 0x400 | uVar155 >> 0x16) ^
            (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar52;
  uVar84 = ((uVar74 | uVar99) & uVar87 | uVar74 & uVar99) +
           ((uVar74 * 0x400 | uVar74 >> 0x16) ^
           (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar55;
  iVar43 = (uVar10 & uVar23 | ~uVar23 & uVar19) + uVar4 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) + -0x1ea2a4ea;
  iVar49 = (uVar33 & uVar34 | ~uVar34 & uVar21) + uVar5 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) + -0x1ea2a4ea;
  iVar52 = (uVar20 & uVar44 | ~uVar44 & uVar30) + uVar9 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) + -0x1ea2a4ea;
  iVar55 = (uVar31 & uVar50 | ~uVar50 & uVar8) + uVar18 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) + -0x1ea2a4ea;
  uVar95 = uVar95 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar118 = uVar118 + iVar52;
  uVar87 = uVar87 + iVar55;
  uVar4 = ((uVar160 | uVar122) & uVar66 | uVar160 & uVar122) +
          ((uVar160 * 0x400 | uVar160 >> 0x16) ^
          (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar43;
  uVar5 = ((uVar82 | uVar69) & uVar96 | uVar82 & uVar69) +
          ((uVar82 * 0x400 | uVar82 >> 0x16) ^
          (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar49;
  uVar9 = ((uVar134 | uVar155) & uVar68 | uVar134 & uVar155) +
          ((uVar134 * 0x400 | uVar134 >> 0x16) ^
          (uVar134 * 0x80000 | uVar134 >> 0xd) ^ (uVar134 * 0x40000000 | uVar134 >> 2)) + iVar52;
  uVar18 = ((uVar84 | uVar74) & uVar99 | uVar84 & uVar74) +
           ((uVar84 * 0x400 | uVar84 >> 0x16) ^
           (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar55;
  iVar43 = (uVar23 & uVar95 | ~uVar95 & uVar10) + uVar19 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6)) + 0x7f3e86;
  iVar49 = (uVar34 & uVar51 | ~uVar51 & uVar33) + uVar21 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) + 0x7f3e86;
  iVar52 = (uVar44 & uVar118 | ~uVar118 & uVar20) + uVar30 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6)) + 0x7f3e86;
  iVar55 = (uVar50 & uVar87 | ~uVar87 & uVar31) + uVar8 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6)) + 0x7f3e86;
  uVar66 = uVar66 + iVar43;
  uVar96 = uVar96 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar99 = uVar99 + iVar55;
  uVar19 = ((uVar4 | uVar160) & uVar122 | uVar4 & uVar160) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar21 = ((uVar5 | uVar82) & uVar69 | uVar5 & uVar82) +
           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar49;
  uVar30 = ((uVar9 | uVar134) & uVar155 | uVar9 & uVar134) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar52;
  uVar8 = ((uVar18 | uVar84) & uVar74 | uVar18 & uVar84) +
          ((uVar18 * 0x400 | uVar18 >> 0x16) ^
          (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar55;
  iVar43 = (uVar95 & uVar66 | ~uVar66 & uVar23) + uVar10 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6)) + 0x37088980;
  iVar49 = (uVar51 & uVar96 | ~uVar96 & uVar34) + uVar33 +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6)) + 0x37088980;
  iVar52 = (uVar118 & uVar68 | ~uVar68 & uVar44) + uVar20 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6)) + 0x37088980;
  iVar55 = (uVar87 & uVar99 | ~uVar99 & uVar50) + uVar31 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6)) + 0x37088980;
  uVar122 = uVar122 + iVar43;
  uVar69 = uVar69 + iVar49;
  uVar155 = uVar155 + iVar52;
  uVar74 = uVar74 + iVar55;
  uVar10 = ((uVar19 | uVar4) & uVar160 | uVar19 & uVar4) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar43;
  uVar33 = ((uVar21 | uVar5) & uVar82 | uVar21 & uVar5) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar49;
  uVar20 = ((uVar30 | uVar9) & uVar134 | uVar30 & uVar9) +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar52;
  uVar31 = ((uVar8 | uVar18) & uVar84 | uVar8 & uVar18) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  iVar43 = (uVar66 & uVar122 | ~uVar122 & uVar95) + uVar23 +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6)) +
           -0x5af815ce;
  iVar49 = (uVar96 & uVar69 | ~uVar69 & uVar51) + uVar34 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6)) + -0x5af815ce;
  iVar52 = (uVar68 & uVar155 | ~uVar155 & uVar118) + uVar44 +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6)) +
           -0x5af815ce;
  iVar55 = (uVar99 & uVar74 | ~uVar74 & uVar87) + uVar50 +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) + -0x5af815ce;
  uVar160 = uVar160 + iVar43;
  uVar82 = uVar82 + iVar49;
  uVar134 = uVar134 + iVar52;
  uVar84 = uVar84 + iVar55;
  uVar23 = ((uVar10 | uVar19) & uVar4 | uVar10 & uVar19) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar34 = ((uVar33 | uVar21) & uVar5 | uVar33 & uVar21) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar44 = ((uVar20 | uVar30) & uVar9 | uVar20 & uVar30) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar50 = ((uVar31 | uVar8) & uVar18 | uVar31 & uVar8) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  iVar43 = (uVar122 & uVar160 | ~uVar160 & uVar66) + uVar95 +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6)) +
           0x6fab9537;
  iVar49 = (uVar69 & uVar82 | ~uVar82 & uVar96) + uVar51 +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6)) + 0x6fab9537;
  iVar52 = (uVar155 & uVar134 | ~uVar134 & uVar68) + uVar118 +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6)) +
           0x6fab9537;
  iVar55 = (uVar74 & uVar84 | ~uVar84 & uVar99) + uVar87 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6)) + 0x6fab9537;
  uVar4 = uVar4 + iVar43;
  uVar5 = uVar5 + iVar49;
  uVar9 = uVar9 + iVar52;
  uVar18 = uVar18 + iVar55;
  uVar95 = ((uVar23 | uVar10) & uVar19 | uVar23 & uVar10) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar51 = ((uVar34 | uVar33) & uVar21 | uVar34 & uVar33) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar118 = ((uVar44 | uVar20) & uVar30 | uVar44 & uVar20) +
            ((uVar44 * 0x400 | uVar44 >> 0x16) ^
            (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar87 = ((uVar50 | uVar31) & uVar8 | uVar50 & uVar31) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  iVar43 = (uVar160 & uVar4 | ~uVar4 & uVar122) + uVar66 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + 0x17406110;
  iVar49 = (uVar82 & uVar5 | ~uVar5 & uVar69) + uVar96 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + 0x17406110;
  iVar52 = (uVar134 & uVar9 | ~uVar9 & uVar155) + uVar68 +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x17406110;
  iVar55 = (uVar84 & uVar18 | ~uVar18 & uVar74) + uVar99 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) + 0x17406110;
  uVar19 = uVar19 + iVar43;
  uVar21 = uVar21 + iVar49;
  uVar30 = uVar30 + iVar52;
  uVar8 = uVar8 + iVar55;
  uVar71 = ((uVar95 | uVar23) & uVar10 | uVar95 & uVar23) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar124 = ((uVar51 | uVar34) & uVar33 | uVar51 & uVar34) +
            ((uVar51 * 0x400 | uVar51 >> 0x16) ^
            (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar126 = ((uVar118 | uVar44) & uVar20 | uVar118 & uVar44) +
            ((uVar118 * 0x400 | uVar118 >> 0x16) ^
            (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar52;
  uVar72 = ((uVar87 | uVar50) & uVar31 | uVar87 & uVar50) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar55;
  iVar43 = (uVar4 & uVar19 | ~uVar19 & uVar160) + uVar122 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + 0xd8cd6f1;
  iVar49 = (uVar5 & uVar21 | ~uVar21 & uVar82) + uVar69 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + 0xd8cd6f1;
  iVar52 = (uVar9 & uVar30 | ~uVar30 & uVar134) + uVar155 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) + 0xd8cd6f1;
  iVar55 = (uVar18 & uVar8 | ~uVar8 & uVar84) + uVar74 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + 0xd8cd6f1;
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar155 = ((uVar71 | uVar95) & uVar23 | uVar71 & uVar95) +
            ((uVar71 * 0x400 | uVar71 >> 0x16) ^
            (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar43;
  uVar74 = ((uVar124 | uVar51) & uVar34 | uVar124 & uVar51) +
           ((uVar124 * 0x400 | uVar124 >> 0x16) ^
           (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar49;
  uVar131 = ((uVar126 | uVar118) & uVar44 | uVar126 & uVar118) +
            ((uVar126 * 0x400 | uVar126 >> 0x16) ^
            (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar52;
  uVar80 = ((uVar72 | uVar87) & uVar50 | uVar72 & uVar87) +
           ((uVar72 * 0x400 | uVar72 >> 0x16) ^
           (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar55;
  iVar43 = (uVar19 & uVar10 | ~uVar10 & uVar4) + uVar160 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + -0x3255c493;
  iVar49 = (uVar21 & uVar33 | ~uVar33 & uVar5) + uVar82 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) + -0x3255c493;
  iVar52 = (uVar30 & uVar20 | ~uVar20 & uVar9) + uVar134 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) + -0x3255c493;
  iVar55 = (uVar8 & uVar31 | ~uVar31 & uVar18) + uVar84 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) + -0x3255c493;
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar160 = ((uVar155 | uVar71) & uVar95 | uVar155 & uVar71) +
            ((uVar155 * 0x400 | uVar155 >> 0x16) ^
            (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar43;
  uVar84 = ((uVar74 | uVar124) & uVar51 | uVar74 & uVar124) +
           ((uVar74 * 0x400 | uVar74 >> 0x16) ^
           (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar49;
  uVar104 = ((uVar131 | uVar126) & uVar118 | uVar131 & uVar126) +
            ((uVar131 * 0x400 | uVar131 >> 0x16) ^
            (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar52;
  uVar93 = ((uVar80 | uVar72) & uVar87 | uVar80 & uVar72) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar55;
  iVar43 = (uVar10 & uVar23 | ~uVar23 & uVar19) + uVar4 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) + -0x3f4441c9;
  iVar49 = (uVar33 & uVar34 | ~uVar34 & uVar21) + uVar5 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) + -0x3f4441c9;
  iVar52 = (uVar20 & uVar44 | ~uVar44 & uVar30) + uVar9 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) + -0x3f4441c9;
  iVar55 = (uVar31 & uVar50 | ~uVar50 & uVar8) + uVar18 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) + -0x3f4441c9;
  uVar95 = uVar95 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar118 = uVar118 + iVar52;
  uVar87 = uVar87 + iVar55;
  uVar4 = ((uVar160 | uVar155) & uVar71 | uVar160 & uVar155) +
          ((uVar160 * 0x400 | uVar160 >> 0x16) ^
          (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar43;
  uVar5 = ((uVar84 | uVar74) & uVar124 | uVar84 & uVar74) +
          ((uVar84 * 0x400 | uVar84 >> 0x16) ^
          (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar49;
  uVar9 = ((uVar104 | uVar131) & uVar126 | uVar104 & uVar131) +
          ((uVar104 * 0x400 | uVar104 >> 0x16) ^
          (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar52;
  uVar18 = ((uVar93 | uVar80) & uVar72 | uVar93 & uVar80) +
           ((uVar93 * 0x400 | uVar93 >> 0x16) ^
           (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar55;
  iVar43 = (uVar23 & uVar95 | ~uVar95 & uVar10) + uVar19 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6)) + -0x7c9ec426;
  iVar49 = (uVar34 & uVar51 | ~uVar51 & uVar33) + uVar21 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) + -0x7c9ec426;
  iVar52 = (uVar44 & uVar118 | ~uVar118 & uVar20) + uVar30 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6)) +
           -0x7c9ec426;
  iVar55 = (uVar50 & uVar87 | ~uVar87 & uVar31) + uVar8 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6)) + -0x7c9ec426;
  uVar71 = uVar71 + iVar43;
  uVar124 = uVar124 + iVar49;
  uVar126 = uVar126 + iVar52;
  uVar72 = uVar72 + iVar55;
  uVar21 = ((uVar4 | uVar160) & uVar155 | uVar4 & uVar160) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar8 = ((uVar5 | uVar84) & uVar74 | uVar5 & uVar84) +
          ((uVar5 * 0x400 | uVar5 >> 0x16) ^
          (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar49;
  uVar66 = ((uVar9 | uVar104) & uVar131 | uVar9 & uVar104) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar52;
  uVar96 = ((uVar18 | uVar93) & uVar80 | uVar18 & uVar93) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar55;
  iVar43 = (uVar95 & uVar71 | ~uVar71 & uVar23) + uVar10 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6)) + -0x24b75c9d;
  iVar49 = (uVar51 & uVar124 | ~uVar124 & uVar34) + uVar33 +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6)) +
           -0x24b75c9d;
  iVar52 = (uVar118 & uVar126 | ~uVar126 & uVar44) + uVar20 +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6)) +
           -0x24b75c9d;
  iVar55 = (uVar87 & uVar72 | ~uVar72 & uVar50) + uVar31 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6)) + -0x24b75c9d;
  uVar155 = uVar155 + iVar43;
  uVar74 = uVar74 + iVar49;
  uVar131 = uVar131 + iVar52;
  uVar80 = uVar80 + iVar55;
  uVar68 = ((uVar21 | uVar4) & uVar160 | uVar21 & uVar4) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar43;
  uVar99 = ((uVar8 | uVar5) & uVar84 | uVar8 & uVar5) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar49;
  uVar122 = ((uVar66 | uVar9) & uVar104 | uVar66 & uVar9) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar52;
  uVar69 = ((uVar96 | uVar18) & uVar93 | uVar96 & uVar18) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar55;
  iVar43 = (uVar71 & uVar155 | ~uVar155 & uVar95) + uVar23 +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6)) + 0xb02e931
  ;
  iVar49 = (uVar124 & uVar74 | ~uVar74 & uVar51) + uVar34 +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) + 0xb02e931;
  iVar52 = (uVar126 & uVar131 | ~uVar131 & uVar118) + uVar44 +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6)) + 0xb02e931
  ;
  iVar55 = (uVar72 & uVar80 | ~uVar80 & uVar87) + uVar50 +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6)) + 0xb02e931;
  uVar160 = uVar160 + iVar43;
  uVar84 = uVar84 + iVar49;
  uVar104 = uVar104 + iVar52;
  uVar93 = uVar93 + iVar55;
  uVar10 = ((uVar68 | uVar21) & uVar4 | uVar68 & uVar21) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar43;
  uVar33 = ((uVar99 | uVar8) & uVar5 | uVar99 & uVar8) +
           ((uVar99 * 0x400 | uVar99 >> 0x16) ^
           (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar49;
  uVar20 = ((uVar122 | uVar66) & uVar9 | uVar122 & uVar66) +
           ((uVar122 * 0x400 | uVar122 >> 0x16) ^
           (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar52;
  uVar31 = ((uVar69 | uVar96) & uVar18 | uVar69 & uVar96) +
           ((uVar69 * 0x400 | uVar69 >> 0x16) ^
           (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar55;
  iVar43 = (uVar155 & uVar160 | ~uVar160 & uVar71) + uVar95 +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6)) +
           0x6fd15ca7;
  iVar49 = (uVar74 & uVar84 | ~uVar84 & uVar124) + uVar51 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6)) + 0x6fd15ca7;
  iVar52 = (uVar131 & uVar104 | ~uVar104 & uVar126) + uVar118 +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6)) +
           0x6fd15ca7;
  iVar55 = (uVar80 & uVar93 | ~uVar93 & uVar72) + uVar87 +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6)) + 0x6fd15ca7;
  uVar4 = uVar4 + iVar43;
  uVar5 = uVar5 + iVar49;
  uVar9 = uVar9 + iVar52;
  uVar18 = uVar18 + iVar55;
  uVar95 = ((uVar10 | uVar68) & uVar21 | uVar10 & uVar68) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar51 = ((uVar33 | uVar99) & uVar8 | uVar33 & uVar99) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar118 = ((uVar20 | uVar122) & uVar66 | uVar20 & uVar122) +
            ((uVar20 * 0x400 | uVar20 >> 0x16) ^
            (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar87 = ((uVar31 | uVar69) & uVar96 | uVar31 & uVar69) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  iVar43 = (uVar160 & uVar4 | ~uVar4 & uVar155) + uVar71 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + 0x521afaca;
  iVar49 = (uVar84 & uVar5 | ~uVar5 & uVar74) + uVar124 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + 0x521afaca;
  iVar52 = (uVar104 & uVar9 | ~uVar9 & uVar131) + uVar126 +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x521afaca;
  iVar55 = (uVar93 & uVar18 | ~uVar18 & uVar80) + uVar72 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) + 0x521afaca;
  uVar21 = uVar21 + iVar43;
  uVar8 = uVar8 + iVar49;
  uVar66 = uVar66 + iVar52;
  uVar96 = uVar96 + iVar55;
  uVar71 = ((uVar95 | uVar10) & uVar68 | uVar95 & uVar10) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar124 = ((uVar51 | uVar33) & uVar99 | uVar51 & uVar33) +
            ((uVar51 * 0x400 | uVar51 >> 0x16) ^
            (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar126 = ((uVar118 | uVar20) & uVar122 | uVar118 & uVar20) +
            ((uVar118 * 0x400 | uVar118 >> 0x16) ^
            (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar52;
  uVar72 = ((uVar87 | uVar31) & uVar69 | uVar87 & uVar31) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar55;
  iVar43 = (uVar4 & uVar21 | ~uVar21 & uVar160) + uVar155 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + 0x31338431;
  iVar49 = (uVar5 & uVar8 | ~uVar8 & uVar84) + uVar74 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + 0x31338431;
  iVar52 = (uVar9 & uVar66 | ~uVar66 & uVar104) + uVar131 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6)) + 0x31338431;
  iVar55 = (uVar18 & uVar96 | ~uVar96 & uVar93) + uVar80 +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6)) + 0x31338431;
  uVar68 = uVar68 + iVar43;
  uVar99 = uVar99 + iVar49;
  uVar122 = uVar122 + iVar52;
  uVar69 = uVar69 + iVar55;
  uVar74 = ((uVar71 | uVar95) & uVar10 | uVar71 & uVar95) +
           ((uVar71 * 0x400 | uVar71 >> 0x16) ^
           (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar43;
  uVar80 = ((uVar124 | uVar51) & uVar33 | uVar124 & uVar51) +
           ((uVar124 * 0x400 | uVar124 >> 0x16) ^
           (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar49;
  uVar82 = ((uVar126 | uVar118) & uVar20 | uVar126 & uVar118) +
           ((uVar126 * 0x400 | uVar126 >> 0x16) ^
           (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar52;
  uVar134 = ((uVar72 | uVar87) & uVar31 | uVar72 & uVar87) +
            ((uVar72 * 0x400 | uVar72 >> 0x16) ^
            (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar55;
  iVar43 = (uVar21 & uVar68 | ~uVar68 & uVar4) + uVar160 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6)) + 0x6ed41a95;
  iVar49 = (uVar8 & uVar99 | ~uVar99 & uVar5) + uVar84 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6)) + 0x6ed41a95;
  iVar52 = (uVar66 & uVar122 | ~uVar122 & uVar9) + uVar104 +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6)) +
           0x6ed41a95;
  iVar55 = (uVar96 & uVar69 | ~uVar69 & uVar18) + uVar93 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6)) + 0x6ed41a95;
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar23 = ((uVar74 | uVar71) & uVar95 | uVar74 & uVar71) +
           ((uVar74 * 0x400 | uVar74 >> 0x16) ^
           (uVar74 * 0x80000 | uVar74 >> 0xd) ^ (uVar74 * 0x40000000 | uVar74 >> 2)) + iVar43;
  uVar34 = ((uVar80 | uVar124) & uVar51 | uVar80 & uVar124) +
           ((uVar80 * 0x400 | uVar80 >> 0x16) ^
           (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar49;
  uVar44 = ((uVar82 | uVar126) & uVar118 | uVar82 & uVar126) +
           ((uVar82 * 0x400 | uVar82 >> 0x16) ^
           (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar52;
  uVar50 = ((uVar134 | uVar72) & uVar87 | uVar134 & uVar72) +
           ((uVar134 * 0x400 | uVar134 >> 0x16) ^
           (uVar134 * 0x80000 | uVar134 >> 0xd) ^ (uVar134 * 0x40000000 | uVar134 >> 2)) + iVar55;
  iVar43 = (uVar68 & uVar10 | ~uVar10 & uVar21) + uVar4 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + 0x6d437890;
  iVar49 = (uVar99 & uVar33 | ~uVar33 & uVar8) + uVar5 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) + 0x6d437890;
  iVar52 = (uVar122 & uVar20 | ~uVar20 & uVar66) + uVar9 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) + 0x6d437890;
  iVar55 = (uVar69 & uVar31 | ~uVar31 & uVar96) + uVar18 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) + 0x6d437890;
  uVar95 = uVar95 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar118 = uVar118 + iVar52;
  uVar87 = uVar87 + iVar55;
  uVar4 = ((uVar23 | uVar74) & uVar71 | uVar23 & uVar74) +
          ((uVar23 * 0x400 | uVar23 >> 0x16) ^
          (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar9 = ((uVar34 | uVar80) & uVar124 | uVar34 & uVar80) +
          ((uVar34 * 0x400 | uVar34 >> 0x16) ^
          (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar19 = ((uVar44 | uVar82) & uVar126 | uVar44 & uVar82) +
           ((uVar44 * 0x400 | uVar44 >> 0x16) ^
           (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar30 = ((uVar50 | uVar134) & uVar72 | uVar50 & uVar134) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  iVar43 = (uVar10 & uVar95 | ~uVar95 & uVar68) + uVar21 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6)) + -0x3c636e0e;
  iVar49 = (uVar33 & uVar51 | ~uVar51 & uVar99) + uVar8 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) + -0x3c636e0e;
  iVar52 = (uVar20 & uVar118 | ~uVar118 & uVar122) + uVar66 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6)) +
           -0x3c636e0e;
  iVar55 = (uVar31 & uVar87 | ~uVar87 & uVar69) + uVar96 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6)) + -0x3c636e0e;
  uVar71 = uVar71 + iVar43;
  uVar124 = uVar124 + iVar49;
  uVar126 = uVar126 + iVar52;
  uVar72 = uVar72 + iVar55;
  uVar5 = ((uVar4 | uVar23) & uVar74 | uVar4 & uVar23) +
          ((uVar4 * 0x400 | uVar4 >> 0x16) ^
          (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar43;
  uVar18 = ((uVar9 | uVar34) & uVar80 | uVar9 & uVar34) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar49;
  uVar21 = ((uVar19 | uVar44) & uVar82 | uVar19 & uVar44) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar52;
  uVar8 = ((uVar30 | uVar50) & uVar134 | uVar30 & uVar50) +
          ((uVar30 * 0x400 | uVar30 >> 0x16) ^
          (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar55;
  iVar43 = (uVar95 & uVar71 | ~uVar71 & uVar10) + uVar68 +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6)) + -0x61335443;
  iVar49 = (uVar51 & uVar124 | ~uVar124 & uVar33) + uVar99 +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6)) +
           -0x61335443;
  iVar52 = (uVar118 & uVar126 | ~uVar126 & uVar20) + uVar122 +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6)) +
           -0x61335443;
  iVar55 = (uVar87 & uVar72 | ~uVar72 & uVar31) + uVar69 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6)) + -0x61335443;
  uVar74 = uVar74 + iVar43;
  uVar80 = uVar80 + iVar49;
  uVar82 = uVar82 + iVar52;
  uVar134 = uVar134 + iVar55;
  uVar160 = ((uVar5 | uVar4) & uVar23 | uVar5 & uVar4) +
            ((uVar5 * 0x400 | uVar5 >> 0x16) ^
            (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar43;
  uVar84 = ((uVar18 | uVar9) & uVar34 | uVar18 & uVar9) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar49;
  uVar104 = ((uVar21 | uVar19) & uVar44 | uVar21 & uVar19) +
            ((uVar21 * 0x400 | uVar21 >> 0x16) ^
            (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar52;
  uVar100 = ((uVar8 | uVar30) & uVar50 | uVar8 & uVar30) +
            ((uVar8 * 0x400 | uVar8 >> 0x16) ^
            (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar55;
  iVar43 = (uVar71 & uVar74 | ~uVar74 & uVar95) + uVar10 +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6)) + -0x4a365f1a;
  iVar49 = (uVar124 & uVar80 | ~uVar80 & uVar51) + uVar33 +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6)) + -0x4a365f1a;
  iVar52 = (uVar126 & uVar82 | ~uVar82 & uVar118) + uVar20 +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6)) + -0x4a365f1a;
  iVar55 = (uVar72 & uVar134 | ~uVar134 & uVar87) + uVar31 +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6)) +
           -0x4a365f1a;
  uVar68 = ((uVar160 | uVar5) & uVar4 | uVar160 & uVar5) +
           ((uVar160 * 0x400 | uVar160 >> 0x16) ^
           (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar43;
  uVar99 = ((uVar84 | uVar18) & uVar9 | uVar84 & uVar18) +
           ((uVar84 * 0x400 | uVar84 >> 0x16) ^
           (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar49;
  uVar155 = ((uVar104 | uVar21) & uVar19 | uVar104 & uVar21) +
            ((uVar104 * 0x400 | uVar104 >> 0x16) ^
            (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar52;
  uVar131 = ((uVar100 | uVar8) & uVar30 | uVar100 & uVar8) +
            ((uVar100 * 0x400 | uVar100 >> 0x16) ^
            (uVar100 * 0x80000 | uVar100 >> 0xd) ^ (uVar100 * 0x40000000 | uVar100 >> 2)) + iVar55;
  uVar23 = iVar43 + uVar23;
  uVar34 = iVar49 + uVar34;
  uVar44 = iVar52 + uVar44;
  uVar50 = iVar55 + uVar50;
  iVar43 = (uVar74 & uVar23 | ~uVar23 & uVar71) + uVar95 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) + 0x532fb63c;
  iVar49 = (uVar80 & uVar34 | ~uVar34 & uVar124) + uVar51 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) + 0x532fb63c;
  iVar52 = (uVar82 & uVar44 | ~uVar44 & uVar126) + uVar118 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) + 0x532fb63c;
  iVar55 = (uVar134 & uVar50 | ~uVar50 & uVar72) + uVar87 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) + 0x532fb63c;
  uVar10 = ((uVar68 | uVar160) & uVar5 | uVar68 & uVar160) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar43;
  uVar20 = ((uVar99 | uVar84) & uVar18 | uVar99 & uVar84) +
           ((uVar99 * 0x400 | uVar99 >> 0x16) ^
           (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar49;
  uVar51 = ((uVar155 | uVar104) & uVar21 | uVar155 & uVar104) +
           ((uVar155 * 0x400 | uVar155 >> 0x16) ^
           (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar52;
  uVar118 = ((uVar131 | uVar100) & uVar8 | uVar131 & uVar100) +
            ((uVar131 * 0x400 | uVar131 >> 0x16) ^
            (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar55;
  uVar4 = iVar43 + uVar4;
  uVar9 = iVar49 + uVar9;
  uVar19 = iVar52 + uVar19;
  uVar30 = iVar55 + uVar30;
  iVar43 = (uVar23 & uVar4 | ~uVar4 & uVar74) + uVar71 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + -0x2d38be3a;
  iVar49 = (uVar34 & uVar9 | ~uVar9 & uVar80) + uVar124 +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + -0x2d38be3a;
  iVar52 = (uVar44 & uVar19 | ~uVar19 & uVar82) + uVar126 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + -0x2d38be3a;
  iVar55 = (uVar50 & uVar30 | ~uVar30 & uVar134) + uVar72 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) + -0x2d38be3a;
  uVar33 = ((uVar10 | uVar68) & uVar160 | uVar10 & uVar68) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar31 = ((uVar20 | uVar99) & uVar84 | uVar20 & uVar99) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar49;
  uVar95 = ((uVar51 | uVar155) & uVar104 | uVar51 & uVar155) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar52;
  uVar87 = ((uVar118 | uVar131) & uVar100 | uVar118 & uVar131) +
           ((uVar118 * 0x400 | uVar118 >> 0x16) ^
           (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar55;
  uVar5 = iVar43 + uVar5;
  uVar18 = iVar49 + uVar18;
  uVar21 = iVar52 + uVar21;
  uVar8 = iVar55 + uVar8;
  iVar43 = (uVar4 & uVar5 | ~uVar5 & uVar23) + uVar74 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + 0x7237ea3;
  iVar49 = (uVar9 & uVar18 | ~uVar18 & uVar34) + uVar80 +
           ((uVar18 * 0x80 | uVar18 >> 0x19) ^
           (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) + 0x7237ea3;
  iVar52 = (uVar19 & uVar21 | ~uVar21 & uVar44) + uVar82 +
           ((uVar21 * 0x80 | uVar21 >> 0x19) ^
           (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) + 0x7237ea3;
  iVar55 = (uVar30 & uVar8 | ~uVar8 & uVar50) + uVar134 +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + 0x7237ea3;
  uVar160 = uVar160 + iVar43;
  uVar84 = uVar84 + iVar49;
  uVar104 = uVar104 + iVar52;
  uVar100 = uVar100 + iVar55;
  uVar122 = ((uVar33 | uVar10) & uVar68 | uVar33 & uVar10) +
            ((uVar33 * 0x400 | uVar33 >> 0x16) ^
            (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar43;
  uVar69 = ((uVar31 | uVar20) & uVar99 | uVar31 & uVar20) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar49;
  uVar71 = ((uVar95 | uVar51) & uVar155 | uVar95 & uVar51) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar52;
  uVar124 = ((uVar87 | uVar118) & uVar131 | uVar87 & uVar118) +
            ((uVar87 * 0x400 | uVar87 >> 0x16) ^
            (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar55;
  iVar43 = (uVar5 & uVar160 | ~uVar160 & uVar4) + uVar23 +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6)) +
           -0x5b6ab498;
  iVar49 = (uVar18 & uVar84 | ~uVar84 & uVar9) + uVar34 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6)) + -0x5b6ab498;
  iVar52 = (uVar21 & uVar104 | ~uVar104 & uVar19) + uVar44 +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6)) +
           -0x5b6ab498;
  iVar55 = (uVar8 & uVar100 | ~uVar100 & uVar30) + uVar50 +
           ((uVar100 * 0x80 | uVar100 >> 0x19) ^
           (uVar100 * 0x200000 | uVar100 >> 0xb) ^ (uVar100 * 0x4000000 | uVar100 >> 6)) +
           -0x5b6ab498;
  uVar68 = uVar68 + iVar43;
  uVar99 = uVar99 + iVar49;
  uVar155 = uVar155 + iVar52;
  uVar131 = uVar131 + iVar55;
  uVar23 = ((uVar122 | uVar33) & uVar10 | uVar122 & uVar33) +
           ((uVar122 * 0x400 | uVar122 >> 0x16) ^
           (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar43;
  uVar34 = ((uVar69 | uVar31) & uVar20 | uVar69 & uVar31) +
           ((uVar69 * 0x400 | uVar69 >> 0x16) ^
           (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar49;
  uVar44 = ((uVar71 | uVar95) & uVar51 | uVar71 & uVar95) +
           ((uVar71 * 0x400 | uVar71 >> 0x16) ^
           (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2)) + iVar52;
  uVar50 = ((uVar124 | uVar87) & uVar118 | uVar124 & uVar87) +
           ((uVar124 * 0x400 | uVar124 >> 0x16) ^
           (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar55;
  uVar106 = uVar23 + uVar106;
  uVar129 = uVar34 + uVar129;
  uVar133 = uVar44 + uVar133;
  uVar136 = uVar50 + uVar136;
  uVar61 = uVar122 + uVar61;
  uVar62 = uVar69 + uVar62;
  uVar65 = uVar71 + uVar65;
  uVar92 = uVar124 + uVar92;
  uVar66 = uVar33 + uVar98 + 0xa54ff53a;
  uVar96 = uVar31 + uVar67 + 0xa54ff53a;
  uVar57 = uVar95 + uVar57 + 0xa54ff53a;
  uVar58 = uVar87 + uVar58 + 0xa54ff53a;
  iVar43 = (uVar160 & uVar68 | ~uVar68 & uVar5) + uVar4 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6)) + 0x4c191d76;
  iVar49 = (uVar84 & uVar99 | ~uVar99 & uVar18) + uVar9 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6)) + 0x4c191d76;
  iVar52 = (uVar104 & uVar155 | ~uVar155 & uVar21) + uVar19 +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6)) +
           0x4c191d76;
  iVar55 = (uVar100 & uVar131 | ~uVar131 & uVar8) + uVar30 +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6)) +
           0x4c191d76;
  iVar35 = ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + uVar119 +
           ((uVar23 | uVar122) & uVar33 | uVar23 & uVar122) + iVar43;
  iVar40 = ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + uVar135 +
           ((uVar34 | uVar69) & uVar31 | uVar34 & uVar69) + iVar49;
  iVar41 = ((uVar44 * 0x400 | uVar44 >> 0x16) ^
           (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + uVar115 +
           ((uVar44 | uVar71) & uVar95 | uVar44 & uVar71) + iVar52;
  iVar42 = ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + uVar137 +
           ((uVar50 | uVar124) & uVar87 | uVar50 & uVar124) + iVar55;
  uVar53 = uVar10 + uVar53 + iVar43;
  uVar95 = uVar20 + uVar56 + iVar49;
  uVar98 = uVar51 + uVar86 + iVar52;
  uVar67 = uVar118 + uVar59 + iVar55;
  uVar68 = uVar68 + uVar91;
  uVar99 = uVar99 + uVar45;
  uVar155 = uVar155 + uVar70;
  uVar131 = uVar131 + uVar60;
  uVar160 = uVar160 + uVar2 + 0x1f83d9ab;
  uVar84 = uVar84 + uVar7 + 0x1f83d9ab;
  uVar104 = uVar104 + uVar22 + 0x1f83d9ab;
  uVar100 = uVar100 + uVar29 + 0x1f83d9ab;
  uVar5 = uVar64 + 0x5be0cd19 + uVar5;
  uVar18 = uVar114 + 0x5be0cd19 + uVar18;
  uVar21 = uVar54 + 0x5be0cd19 + uVar21;
  uVar8 = uVar120 + 0x5be0cd19 + uVar8;
  uVar23 = iVar35 + 0x98c7e2a2;
  uVar34 = iVar40 + 0x98c7e2a2;
  uVar44 = iVar41 + 0x98c7e2a2;
  uVar50 = iVar42 + 0x98c7e2a2;
  iVar73 = (uVar23 & 0xca0b3af3 ^ 0x9b05688c) + uVar106 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar79 = (uVar34 & 0xca0b3af3 ^ 0x9b05688c) + uVar129 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar81 = (uVar44 & 0xca0b3af3 ^ 0x9b05688c) + uVar133 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar83 = (uVar50 & 0xca0b3af3 ^ 0x9b05688c) + uVar136 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  uVar70 = iVar35 + 0xfc08884d;
  uVar120 = iVar40 + 0xfc08884d;
  uVar87 = iVar41 + 0xfc08884d;
  uVar69 = iVar42 + 0xfc08884d;
  uVar10 = iVar73 + 0xcd2a11ae;
  uVar33 = iVar79 + 0xcd2a11ae;
  uVar20 = iVar81 + 0xcd2a11ae;
  uVar31 = iVar83 + 0xcd2a11ae;
  iVar43 = ((uVar23 ^ 0x510e527f) & uVar10 ^ 0x510e527f) + uVar61 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
  iVar49 = ((uVar34 ^ 0x510e527f) & uVar33 ^ 0x510e527f) + uVar62 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar52 = ((uVar44 ^ 0x510e527f) & uVar20 ^ 0x510e527f) + uVar65 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
  iVar55 = ((uVar50 ^ 0x510e527f) & uVar31 ^ 0x510e527f) + uVar92 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  uVar54 = (uVar70 & 0xd16e48e2) +
           ((uVar70 * 0x400 | uVar70 >> 0x16) ^
           (uVar70 * 0x80000 | uVar70 >> 0xd) ^ (uVar70 * 0x40000000 | uVar70 >> 2)) + iVar73 +
           0xbabcc441;
  uVar118 = (uVar120 & 0xd16e48e2) +
            ((uVar120 * 0x400 | uVar120 >> 0x16) ^
            (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar79 +
            0xbabcc441;
  uVar60 = (uVar87 & 0xd16e48e2) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar81 +
           0xbabcc441;
  uVar122 = (uVar69 & 0xd16e48e2) +
            ((uVar69 * 0x400 | uVar69 >> 0x16) ^
            (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar83 +
            0xbabcc441;
  uVar64 = iVar43 + 0xc2e12e0;
  uVar114 = iVar49 + 0xc2e12e0;
  uVar45 = iVar52 + 0xc2e12e0;
  uVar51 = iVar55 + 0xc2e12e0;
  uVar2 = iVar43 + 0x50c6645b +
          ((uVar54 | uVar70) & 0x6a09e667 | uVar54 & uVar70) +
          ((uVar54 * 0x400 | uVar54 >> 0x16) ^
          (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2));
  uVar4 = iVar49 + 0x50c6645b +
          ((uVar118 | uVar120) & 0x6a09e667 | uVar118 & uVar120) +
          ((uVar118 * 0x400 | uVar118 >> 0x16) ^
          (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2));
  uVar7 = iVar52 + 0x50c6645b +
          ((uVar60 | uVar87) & 0x6a09e667 | uVar60 & uVar87) +
          ((uVar60 * 0x400 | uVar60 >> 0x16) ^
          (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2));
  uVar9 = iVar55 + 0x50c6645b +
          ((uVar122 | uVar69) & 0x6a09e667 | uVar122 & uVar69) +
          ((uVar122 * 0x400 | uVar122 >> 0x16) ^
          (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2));
  iVar43 = (uVar10 & uVar64 | ~uVar64 & uVar23) + uVar66 +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar49 = (uVar33 & uVar114 | ~uVar114 & uVar34) + uVar96 +
           ((uVar114 * 0x80 | uVar114 >> 0x19) ^
           (uVar114 * 0x200000 | uVar114 >> 0xb) ^ (uVar114 * 0x4000000 | uVar114 >> 6));
  iVar52 = (uVar20 & uVar45 | ~uVar45 & uVar44) + uVar57 +
           ((uVar45 * 0x80 | uVar45 >> 0x19) ^
           (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6));
  iVar55 = (uVar31 & uVar51 | ~uVar51 & uVar50) + uVar58 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  uVar74 = iVar43 + 0xa4ce148b;
  uVar80 = iVar49 + 0xa4ce148b;
  uVar82 = iVar52 + 0xa4ce148b;
  uVar134 = iVar55 + 0xa4ce148b;
  iVar43 = ((uVar2 | uVar54) & uVar70 | uVar2 & uVar54) + iVar43 +
           ((uVar2 * 0x400 | uVar2 >> 0x16) ^
           (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2));
  iVar49 = ((uVar4 | uVar118) & uVar120 | uVar4 & uVar118) + iVar49 +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2));
  iVar52 = ((uVar7 | uVar60) & uVar87 | uVar7 & uVar60) + iVar52 +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2));
  iVar55 = ((uVar9 | uVar122) & uVar69 | uVar9 & uVar122) + iVar55 +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2));
  uVar22 = iVar43 + 0x3ac42e24;
  uVar19 = iVar49 + 0x3ac42e24;
  uVar29 = iVar52 + 0x3ac42e24;
  uVar30 = iVar55 + 0x3ac42e24;
  iVar73 = uVar23 + uVar53 + (uVar64 & uVar74 | ~uVar74 & uVar10) + 0x3956c25b +
           ((uVar74 * 0x80 | uVar74 >> 0x19) ^
           (uVar74 * 0x200000 | uVar74 >> 0xb) ^ (uVar74 * 0x4000000 | uVar74 >> 6));
  iVar79 = uVar34 + uVar95 + (uVar114 & uVar80 | ~uVar80 & uVar33) + 0x3956c25b +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6));
  iVar81 = uVar44 + uVar98 + (uVar45 & uVar82 | ~uVar82 & uVar20) + 0x3956c25b +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6));
  iVar83 = uVar50 + uVar67 + (uVar51 & uVar134 | ~uVar134 & uVar31) + 0x3956c25b +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6));
  uVar70 = uVar70 + iVar73;
  uVar120 = uVar120 + iVar79;
  uVar87 = uVar87 + iVar81;
  uVar69 = uVar69 + iVar83;
  uVar56 = ((uVar22 | uVar2) & uVar54 | uVar22 & uVar2) + iVar73 +
           ((uVar22 * 0x400 | uVar22 >> 0x16) ^
           (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (iVar43 * 0x40000000 | uVar22 >> 2));
  uVar86 = ((uVar19 | uVar4) & uVar118 | uVar19 & uVar4) + iVar79 +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (iVar49 * 0x40000000 | uVar19 >> 2));
  uVar59 = ((uVar29 | uVar7) & uVar60 | uVar29 & uVar7) + iVar81 +
           ((uVar29 * 0x400 | uVar29 >> 0x16) ^
           (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (iVar52 * 0x40000000 | uVar29 >> 2));
  uVar91 = ((uVar30 | uVar9) & uVar122 | uVar30 & uVar9) + iVar83 +
           ((uVar30 * 0x400 | uVar30 >> 0x16) ^
           (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (iVar55 * 0x40000000 | uVar30 >> 2));
  iVar43 = uVar10 + uVar68 + (uVar74 & uVar70 | ~uVar70 & uVar64) + 0x59f111f1 +
           ((uVar70 * 0x80 | uVar70 >> 0x19) ^
           (uVar70 * 0x200000 | uVar70 >> 0xb) ^ (uVar70 * 0x4000000 | uVar70 >> 6));
  iVar49 = uVar33 + uVar99 + (uVar80 & uVar120 | ~uVar120 & uVar114) + 0x59f111f1 +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  iVar52 = uVar20 + uVar155 + (uVar82 & uVar87 | ~uVar87 & uVar45) + 0x59f111f1 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar55 = uVar31 + uVar131 + (uVar134 & uVar69 | ~uVar69 & uVar51) + 0x59f111f1 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6));
  uVar54 = uVar54 + iVar43;
  uVar118 = uVar118 + iVar49;
  uVar60 = uVar60 + iVar52;
  uVar122 = uVar122 + iVar55;
  uVar71 = ((uVar56 | uVar22) & uVar2 | uVar56 & uVar22) + iVar43 +
           ((uVar56 * 0x400 | uVar56 >> 0x16) ^
           (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2));
  uVar124 = ((uVar86 | uVar19) & uVar4 | uVar86 & uVar19) + iVar49 +
            ((uVar86 * 0x400 | uVar86 >> 0x16) ^
            (uVar86 * 0x80000 | uVar86 >> 0xd) ^ (uVar86 * 0x40000000 | uVar86 >> 2));
  uVar126 = ((uVar59 | uVar29) & uVar7 | uVar59 & uVar29) + iVar52 +
            ((uVar59 * 0x400 | uVar59 >> 0x16) ^
            (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2));
  uVar72 = ((uVar91 | uVar30) & uVar9 | uVar91 & uVar30) + iVar55 +
           ((uVar91 * 0x400 | uVar91 >> 0x16) ^
           (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2));
  iVar43 = uVar64 + uVar160 + (uVar70 & uVar54 | ~uVar54 & uVar74) + -0x6dc07d5c +
           ((uVar54 * 0x80 | uVar54 >> 0x19) ^
           (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6));
  iVar49 = uVar114 + uVar84 + (uVar120 & uVar118 | ~uVar118 & uVar80) + -0x6dc07d5c +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6));
  iVar52 = uVar45 + uVar104 + (uVar87 & uVar60 | ~uVar60 & uVar82) + -0x6dc07d5c +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar55 = uVar51 + uVar100 + (uVar69 & uVar122 | ~uVar122 & uVar134) + -0x6dc07d5c +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar4 = uVar4 + iVar49;
  uVar7 = uVar7 + iVar52;
  uVar9 = uVar9 + iVar55;
  uVar23 = ((uVar71 | uVar56) & uVar22 | uVar71 & uVar56) + iVar43 +
           ((uVar71 * 0x400 | uVar71 >> 0x16) ^
           (uVar71 * 0x80000 | uVar71 >> 0xd) ^ (uVar71 * 0x40000000 | uVar71 >> 2));
  uVar34 = ((uVar124 | uVar86) & uVar19 | uVar124 & uVar86) + iVar49 +
           ((uVar124 * 0x400 | uVar124 >> 0x16) ^
           (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2));
  uVar44 = ((uVar126 | uVar59) & uVar29 | uVar126 & uVar59) + iVar52 +
           ((uVar126 * 0x400 | uVar126 >> 0x16) ^
           (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2));
  uVar50 = ((uVar72 | uVar91) & uVar30 | uVar72 & uVar91) + iVar55 +
           ((uVar72 * 0x400 | uVar72 >> 0x16) ^
           (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2));
  iVar43 = uVar74 + uVar5 + (uVar54 & uVar2 | ~uVar2 & uVar70) + -0x54e3a12b +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = uVar80 + uVar18 + (uVar118 & uVar4 | ~uVar4 & uVar120) + -0x54e3a12b +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
  iVar52 = uVar82 + uVar21 + (uVar60 & uVar7 | ~uVar7 & uVar87) + -0x54e3a12b +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  iVar55 = uVar134 + uVar8 + (uVar122 & uVar9 | ~uVar9 & uVar69) + -0x54e3a12b +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
  uVar22 = uVar22 + iVar43;
  uVar19 = uVar19 + iVar49;
  uVar29 = uVar29 + iVar52;
  uVar30 = uVar30 + iVar55;
  uVar64 = ((uVar23 | uVar71) & uVar56 | uVar23 & uVar71) + iVar43 +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2));
  uVar114 = ((uVar34 | uVar124) & uVar86 | uVar34 & uVar124) + iVar49 +
            ((uVar34 * 0x400 | uVar34 >> 0x16) ^
            (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2));
  uVar45 = ((uVar44 | uVar126) & uVar59 | uVar44 & uVar126) + iVar52 +
           ((uVar44 * 0x400 | uVar44 >> 0x16) ^
           (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2));
  uVar51 = ((uVar50 | uVar72) & uVar91 | uVar50 & uVar72) + iVar55 +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2));
  iVar43 = (uVar2 & uVar22 | ~uVar22 & uVar54) + uVar70 +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) + 0x5807aa98;
  iVar49 = (uVar4 & uVar19 | ~uVar19 & uVar118) + uVar120 +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6)) + 0x5807aa98;
  iVar52 = (uVar7 & uVar29 | ~uVar29 & uVar60) + uVar87 +
           ((uVar29 * 0x80 | uVar29 >> 0x19) ^
           (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6)) + 0x5807aa98;
  iVar55 = (uVar9 & uVar30 | ~uVar30 & uVar122) + uVar69 +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6)) + 0x5807aa98;
  uVar56 = uVar56 + iVar43;
  uVar86 = uVar86 + iVar49;
  uVar59 = uVar59 + iVar52;
  uVar91 = uVar91 + iVar55;
  uVar70 = ((uVar64 | uVar23) & uVar71 | uVar64 & uVar23) +
           ((uVar64 * 0x400 | uVar64 >> 0x16) ^
           (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar43;
  uVar120 = ((uVar114 | uVar34) & uVar124 | uVar114 & uVar34) +
            ((uVar114 * 0x400 | uVar114 >> 0x16) ^
            (uVar114 * 0x80000 | uVar114 >> 0xd) ^ (uVar114 * 0x40000000 | uVar114 >> 2)) + iVar49;
  uVar87 = ((uVar45 | uVar44) & uVar126 | uVar45 & uVar44) +
           ((uVar45 * 0x400 | uVar45 >> 0x16) ^
           (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar52;
  uVar69 = ((uVar51 | uVar50) & uVar72 | uVar51 & uVar50) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar55;
  iVar43 = (uVar22 & uVar56 | ~uVar56 & uVar2) + uVar54 + 0x12835b01 +
           ((uVar56 * 0x80 | uVar56 >> 0x19) ^
           (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6));
  iVar49 = (uVar19 & uVar86 | ~uVar86 & uVar4) + uVar118 + 0x12835b01 +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  iVar52 = (uVar29 & uVar59 | ~uVar59 & uVar7) + uVar60 + 0x12835b01 +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6));
  iVar55 = (uVar30 & uVar91 | ~uVar91 & uVar9) + uVar122 + 0x12835b01 +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  uVar71 = uVar71 + iVar43;
  uVar124 = uVar124 + iVar49;
  uVar126 = uVar126 + iVar52;
  uVar72 = uVar72 + iVar55;
  uVar10 = ((uVar70 | uVar64) & uVar23 | uVar70 & uVar64) +
           ((uVar70 * 0x400 | uVar70 >> 0x16) ^
           (uVar70 * 0x80000 | uVar70 >> 0xd) ^ (uVar70 * 0x40000000 | uVar70 >> 2)) + iVar43;
  uVar33 = ((uVar120 | uVar114) & uVar34 | uVar120 & uVar114) +
           ((uVar120 * 0x400 | uVar120 >> 0x16) ^
           (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar49;
  uVar20 = ((uVar87 | uVar45) & uVar44 | uVar87 & uVar45) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar52;
  uVar31 = ((uVar69 | uVar51) & uVar50 | uVar69 & uVar51) +
           ((uVar69 * 0x400 | uVar69 >> 0x16) ^
           (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar55;
  iVar43 = (uVar56 & uVar71 | ~uVar71 & uVar22) + uVar2 + 0x243185be +
           ((uVar71 * 0x80 | uVar71 >> 0x19) ^
           (uVar71 * 0x200000 | uVar71 >> 0xb) ^ (uVar71 * 0x4000000 | uVar71 >> 6));
  iVar49 = (uVar86 & uVar124 | ~uVar124 & uVar19) + uVar4 + 0x243185be +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6));
  iVar52 = (uVar59 & uVar126 | ~uVar126 & uVar29) + uVar7 + 0x243185be +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6));
  iVar55 = (uVar91 & uVar72 | ~uVar72 & uVar30) + uVar9 + 0x243185be +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6));
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar82 = ((uVar10 | uVar70) & uVar64 | uVar10 & uVar70) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar43;
  uVar134 = ((uVar33 | uVar120) & uVar114 | uVar33 & uVar120) +
            ((uVar33 * 0x400 | uVar33 >> 0x16) ^
            (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar49;
  uVar93 = ((uVar20 | uVar87) & uVar45 | uVar20 & uVar87) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar52;
  uVar115 = ((uVar31 | uVar69) & uVar51 | uVar31 & uVar69) +
            ((uVar31 * 0x400 | uVar31 >> 0x16) ^
            (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  iVar43 = (uVar71 & uVar23 | ~uVar23 & uVar56) + uVar22 + 0x550c7dc3 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar49 = (uVar124 & uVar34 | ~uVar34 & uVar86) + uVar19 + 0x550c7dc3 +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar52 = (uVar126 & uVar44 | ~uVar44 & uVar59) + uVar29 + 0x550c7dc3 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar55 = (uVar72 & uVar50 | ~uVar50 & uVar91) + uVar30 + 0x550c7dc3 +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  uVar64 = uVar64 + iVar43;
  uVar114 = uVar114 + iVar49;
  uVar45 = uVar45 + iVar52;
  uVar51 = uVar51 + iVar55;
  uVar54 = ((uVar82 | uVar10) & uVar70 | uVar82 & uVar10) +
           ((uVar82 * 0x400 | uVar82 >> 0x16) ^
           (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar43;
  uVar118 = ((uVar134 | uVar33) & uVar120 | uVar134 & uVar33) +
            ((uVar134 * 0x400 | uVar134 >> 0x16) ^
            (uVar134 * 0x80000 | uVar134 >> 0xd) ^ (uVar134 * 0x40000000 | uVar134 >> 2)) + iVar49;
  uVar60 = ((uVar93 | uVar20) & uVar87 | uVar93 & uVar20) +
           ((uVar93 * 0x400 | uVar93 >> 0x16) ^
           (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar52;
  uVar122 = ((uVar115 | uVar31) & uVar69 | uVar115 & uVar31) +
            ((uVar115 * 0x400 | uVar115 >> 0x16) ^
            (uVar115 * 0x80000 | uVar115 >> 0xd) ^ (uVar115 * 0x40000000 | uVar115 >> 2)) + iVar55;
  iVar43 = (uVar23 & uVar64 | ~uVar64 & uVar71) + uVar56 + 0x72be5d74 +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar49 = (uVar34 & uVar114 | ~uVar114 & uVar124) + uVar86 + 0x72be5d74 +
           ((uVar114 * 0x80 | uVar114 >> 0x19) ^
           (uVar114 * 0x200000 | uVar114 >> 0xb) ^ (uVar114 * 0x4000000 | uVar114 >> 6));
  iVar52 = (uVar44 & uVar45 | ~uVar45 & uVar126) + uVar59 + 0x72be5d74 +
           ((uVar45 * 0x80 | uVar45 >> 0x19) ^
           (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6));
  iVar55 = (uVar50 & uVar51 | ~uVar51 & uVar72) + uVar91 + 0x72be5d74 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  uVar70 = uVar70 + iVar43;
  uVar120 = uVar120 + iVar49;
  uVar87 = uVar87 + iVar52;
  uVar69 = uVar69 + iVar55;
  uVar2 = ((uVar54 | uVar82) & uVar10 | uVar54 & uVar82) +
          ((uVar54 * 0x400 | uVar54 >> 0x16) ^
          (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar43;
  uVar4 = ((uVar118 | uVar134) & uVar33 | uVar118 & uVar134) +
          ((uVar118 * 0x400 | uVar118 >> 0x16) ^
          (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar49;
  uVar7 = ((uVar60 | uVar93) & uVar20 | uVar60 & uVar93) +
          ((uVar60 * 0x400 | uVar60 >> 0x16) ^
          (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar52;
  uVar9 = ((uVar122 | uVar115) & uVar31 | uVar122 & uVar115) +
          ((uVar122 * 0x400 | uVar122 >> 0x16) ^
          (uVar122 * 0x80000 | uVar122 >> 0xd) ^ (uVar122 * 0x40000000 | uVar122 >> 2)) + iVar55;
  iVar43 = (uVar64 & uVar70 | ~uVar70 & uVar23) + uVar71 + -0x7f214e02 +
           ((uVar70 * 0x80 | uVar70 >> 0x19) ^
           (uVar70 * 0x200000 | uVar70 >> 0xb) ^ (uVar70 * 0x4000000 | uVar70 >> 6));
  iVar49 = (uVar114 & uVar120 | ~uVar120 & uVar34) + uVar124 + -0x7f214e02 +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  iVar52 = (uVar45 & uVar87 | ~uVar87 & uVar44) + uVar126 + -0x7f214e02 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar55 = (uVar51 & uVar69 | ~uVar69 & uVar50) + uVar72 + -0x7f214e02 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6));
  uVar10 = uVar10 + iVar43;
  uVar33 = uVar33 + iVar49;
  uVar20 = uVar20 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar130 = ((uVar2 | uVar54) & uVar82 | uVar2 & uVar54) +
            ((uVar2 * 0x400 | uVar2 >> 0x16) ^
            (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar43;
  uVar111 = ((uVar4 | uVar118) & uVar134 | uVar4 & uVar118) +
            ((uVar4 * 0x400 | uVar4 >> 0x16) ^
            (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar49;
  uVar135 = ((uVar7 | uVar60) & uVar93 | uVar7 & uVar60) +
            ((uVar7 * 0x400 | uVar7 >> 0x16) ^
            (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar52;
  uVar137 = ((uVar9 | uVar122) & uVar115 | uVar9 & uVar122) +
            ((uVar9 * 0x400 | uVar9 >> 0x16) ^
            (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar55;
  iVar43 = (uVar70 & uVar10 | ~uVar10 & uVar64) + uVar23 + -0x6423f959 +
           ((uVar10 * 0x80 | uVar10 >> 0x19) ^
           (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
  iVar49 = (uVar120 & uVar33 | ~uVar33 & uVar114) + uVar34 + -0x6423f959 +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar52 = (uVar87 & uVar20 | ~uVar20 & uVar45) + uVar44 + -0x6423f959 +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
  iVar55 = (uVar69 & uVar31 | ~uVar31 & uVar51) + uVar50 + -0x6423f959 +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  uVar82 = uVar82 + iVar43;
  uVar134 = uVar134 + iVar49;
  uVar93 = uVar93 + iVar52;
  uVar115 = uVar115 + iVar55;
  uVar23 = ((uVar130 | uVar2) & uVar54 | uVar130 & uVar2) +
           ((uVar130 * 0x400 | uVar130 >> 0x16) ^
           (uVar130 * 0x80000 | uVar130 >> 0xd) ^ (uVar130 * 0x40000000 | uVar130 >> 2)) + iVar43;
  uVar34 = ((uVar111 | uVar4) & uVar118 | uVar111 & uVar4) +
           ((uVar111 * 0x400 | uVar111 >> 0x16) ^
           (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar49;
  uVar44 = ((uVar135 | uVar7) & uVar60 | uVar135 & uVar7) +
           ((uVar135 * 0x400 | uVar135 >> 0x16) ^
           (uVar135 * 0x80000 | uVar135 >> 0xd) ^ (uVar135 * 0x40000000 | uVar135 >> 2)) + iVar52;
  uVar50 = ((uVar137 | uVar9) & uVar122 | uVar137 & uVar9) +
           ((uVar137 * 0x400 | uVar137 >> 0x16) ^
           (uVar137 * 0x80000 | uVar137 >> 0xd) ^ (uVar137 * 0x40000000 | uVar137 >> 2)) + iVar55;
  iVar43 = (uVar10 & uVar82 | ~uVar82 & uVar70) + uVar64 +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6)) + -0x3e640d8c;
  iVar49 = (uVar33 & uVar134 | ~uVar134 & uVar120) + uVar114 +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6)) +
           -0x3e640d8c;
  iVar52 = (uVar20 & uVar93 | ~uVar93 & uVar87) + uVar45 +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6)) + -0x3e640d8c;
  iVar55 = (uVar31 & uVar115 | ~uVar115 & uVar69) + uVar51 +
           ((uVar115 * 0x80 | uVar115 >> 0x19) ^
           (uVar115 * 0x200000 | uVar115 >> 0xb) ^ (uVar115 * 0x4000000 | uVar115 >> 6)) +
           -0x3e640d8c;
  uVar54 = uVar54 + iVar43;
  uVar118 = uVar118 + iVar49;
  uVar60 = uVar60 + iVar52;
  uVar122 = uVar122 + iVar55;
  uVar86 = ((uVar23 | uVar130) & uVar2 | uVar23 & uVar130) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar59 = ((uVar34 | uVar111) & uVar4 | uVar34 & uVar111) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar91 = ((uVar44 | uVar135) & uVar7 | uVar44 & uVar135) +
           ((uVar44 * 0x400 | uVar44 >> 0x16) ^
           (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar64 = ((uVar50 | uVar137) & uVar9 | uVar50 & uVar137) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  iVar73 = (uVar61 >> 3 ^ (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7)) +
           uVar106;
  iVar79 = (uVar62 >> 3 ^ (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7)) +
           uVar129;
  iVar81 = (uVar65 >> 3 ^ (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7)) +
           uVar133;
  iVar83 = (uVar92 >> 3 ^ (uVar92 * 0x4000 | uVar92 >> 0x12) ^ (uVar92 * 0x2000000 | uVar92 >> 7)) +
           uVar136;
  uVar126 = (uVar106 >> 3 ^
            (uVar106 * 0x4000 | uVar106 >> 0x12) ^ (uVar106 * 0x2000000 | uVar106 >> 7)) + iVar35;
  uVar72 = (uVar129 >> 3 ^
           (uVar129 * 0x4000 | uVar129 >> 0x12) ^ (uVar129 * 0x2000000 | uVar129 >> 7)) + iVar40;
  uVar74 = (uVar133 >> 3 ^
           (uVar133 * 0x4000 | uVar133 >> 0x12) ^ (uVar133 * 0x2000000 | uVar133 >> 7)) + iVar41;
  uVar80 = (uVar136 >> 3 ^
           (uVar136 * 0x4000 | uVar136 >> 0x12) ^ (uVar136 * 0x2000000 | uVar136 >> 7)) + iVar42;
  iVar43 = uVar70 + uVar126 + (uVar82 & uVar54 | ~uVar54 & uVar10) + -0x1b64963f +
           ((uVar54 * 0x80 | uVar54 >> 0x19) ^
           (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6));
  iVar49 = uVar120 + uVar72 + (uVar134 & uVar118 | ~uVar118 & uVar33) + -0x1b64963f +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6));
  iVar52 = uVar87 + uVar74 + (uVar93 & uVar60 | ~uVar60 & uVar20) + -0x1b64963f +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar55 = uVar69 + uVar80 + (uVar115 & uVar122 | ~uVar122 & uVar31) + -0x1b64963f +
           ((uVar122 * 0x80 | uVar122 >> 0x19) ^
           (uVar122 * 0x200000 | uVar122 >> 0xb) ^ (uVar122 * 0x4000000 | uVar122 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar4 = uVar4 + iVar49;
  uVar7 = uVar7 + iVar52;
  uVar9 = uVar9 + iVar55;
  uVar51 = ((uVar86 | uVar23) & uVar130 | uVar86 & uVar23) +
           ((uVar86 * 0x400 | uVar86 >> 0x16) ^
           (uVar86 * 0x80000 | uVar86 >> 0xd) ^ (uVar86 * 0x40000000 | uVar86 >> 2)) + iVar43;
  uVar120 = ((uVar59 | uVar34) & uVar111 | uVar59 & uVar34) +
            ((uVar59 * 0x400 | uVar59 >> 0x16) ^
            (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar49;
  uVar116 = ((uVar91 | uVar44) & uVar135 | uVar91 & uVar44) +
            ((uVar91 * 0x400 | uVar91 >> 0x16) ^
            (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2)) + iVar52;
  uVar132 = ((uVar64 | uVar50) & uVar137 | uVar64 & uVar50) +
            ((uVar64 * 0x400 | uVar64 >> 0x16) ^
            (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar55;
  uVar105 = iVar73 + 0xa00000;
  uVar133 = iVar79 + 0xa00000;
  uVar112 = iVar81 + 0xa00000;
  uVar128 = iVar83 + 0xa00000;
  iVar43 = uVar10 + uVar105 + (uVar54 & uVar2 | ~uVar2 & uVar82) + -0x1041b87a +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = uVar33 + uVar133 + (uVar118 & uVar4 | ~uVar4 & uVar134) + -0x1041b87a +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
  iVar52 = uVar20 + uVar112 + (uVar60 & uVar7 | ~uVar7 & uVar93) + -0x1041b87a +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  iVar55 = uVar31 + uVar128 + (uVar122 & uVar9 | ~uVar9 & uVar115) + -0x1041b87a +
           ((uVar9 * 0x80 | uVar9 >> 0x19) ^
           (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
  uVar130 = uVar130 + iVar43;
  uVar111 = uVar111 + iVar49;
  uVar135 = uVar135 + iVar52;
  uVar137 = uVar137 + iVar55;
  uVar33 = ((uVar51 | uVar86) & uVar23 | uVar51 & uVar86) +
           ((uVar51 * 0x400 | uVar51 >> 0x16) ^
           (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar43;
  uVar20 = ((uVar120 | uVar59) & uVar34 | uVar120 & uVar59) +
           ((uVar120 * 0x400 | uVar120 >> 0x16) ^
           (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar49;
  uVar31 = ((uVar116 | uVar91) & uVar44 | uVar116 & uVar91) +
           ((uVar116 * 0x400 | uVar116 >> 0x16) ^
           (uVar116 * 0x80000 | uVar116 >> 0xd) ^ (uVar116 * 0x40000000 | uVar116 >> 2)) + iVar52;
  uVar56 = ((uVar132 | uVar64) & uVar50 | uVar132 & uVar64) +
           ((uVar132 * 0x400 | uVar132 >> 0x16) ^
           (uVar132 * 0x80000 | uVar132 >> 0xd) ^ (uVar132 * 0x40000000 | uVar132 >> 2)) + iVar55;
  uVar119 = (uVar66 >> 3 ^ (uVar66 * 0x4000 | uVar66 >> 0x12) ^ (uVar66 * 0x2000000 | uVar66 >> 7))
            + uVar61 +
            (uVar126 >> 10 ^
            (uVar126 * 0x2000 | uVar126 >> 0x13) ^ (uVar126 * 0x8000 | uVar126 >> 0x11));
  uVar138 = (uVar96 >> 3 ^ (uVar96 * 0x4000 | uVar96 >> 0x12) ^ (uVar96 * 0x2000000 | uVar96 >> 7))
            + uVar62 +
            (uVar72 >> 10 ^ (uVar72 * 0x2000 | uVar72 >> 0x13) ^ (uVar72 * 0x8000 | uVar72 >> 0x11))
  ;
  uVar144 = (uVar57 >> 3 ^ (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7))
            + uVar65 +
            (uVar74 >> 10 ^ (uVar74 * 0x2000 | uVar74 >> 0x13) ^ (uVar74 * 0x8000 | uVar74 >> 0x11))
  ;
  uVar148 = (uVar58 >> 3 ^ (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7))
            + uVar92 +
            (uVar80 >> 10 ^ (uVar80 * 0x2000 | uVar80 >> 0x13) ^ (uVar80 * 0x8000 | uVar80 >> 0x11))
  ;
  iVar43 = uVar82 + uVar119 + (uVar2 & uVar130 | ~uVar130 & uVar54) + 0xfc19dc6 +
           ((uVar130 * 0x80 | uVar130 >> 0x19) ^
           (uVar130 * 0x200000 | uVar130 >> 0xb) ^ (uVar130 * 0x4000000 | uVar130 >> 6));
  iVar49 = uVar134 + uVar138 + (uVar4 & uVar111 | ~uVar111 & uVar118) + 0xfc19dc6 +
           ((uVar111 * 0x80 | uVar111 >> 0x19) ^
           (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6));
  iVar52 = uVar93 + uVar144 + (uVar7 & uVar135 | ~uVar135 & uVar60) + 0xfc19dc6 +
           ((uVar135 * 0x80 | uVar135 >> 0x19) ^
           (uVar135 * 0x200000 | uVar135 >> 0xb) ^ (uVar135 * 0x4000000 | uVar135 >> 6));
  iVar55 = uVar115 + uVar148 + (uVar9 & uVar137 | ~uVar137 & uVar122) + 0xfc19dc6 +
           ((uVar137 * 0x80 | uVar137 >> 0x19) ^
           (uVar137 * 0x200000 | uVar137 >> 0xb) ^ (uVar137 * 0x4000000 | uVar137 >> 6));
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar22 = ((uVar33 | uVar51) & uVar86 | uVar33 & uVar51) +
           ((uVar33 * 0x400 | uVar33 >> 0x16) ^
           (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar43;
  uVar19 = ((uVar20 | uVar120) & uVar59 | uVar20 & uVar120) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar49;
  uVar29 = ((uVar31 | uVar116) & uVar91 | uVar31 & uVar116) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar52;
  uVar30 = ((uVar56 | uVar132) & uVar64 | uVar56 & uVar132) +
           ((uVar56 * 0x400 | uVar56 >> 0x16) ^
           (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar55;
  uVar115 = (uVar105 >> 10 ^
            (iVar73 * 0x2000 | uVar105 >> 0x13) ^ (iVar73 * 0x8000 | uVar105 >> 0x11)) + uVar66 +
            (uVar53 >> 3 ^ (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7));
  uVar139 = (uVar133 >> 10 ^
            (iVar79 * 0x2000 | uVar133 >> 0x13) ^ (iVar79 * 0x8000 | uVar133 >> 0x11)) + uVar96 +
            (uVar95 >> 3 ^ (uVar95 * 0x4000 | uVar95 >> 0x12) ^ (uVar95 * 0x2000000 | uVar95 >> 7));
  uVar147 = (uVar112 >> 10 ^
            (iVar81 * 0x2000 | uVar112 >> 0x13) ^ (iVar81 * 0x8000 | uVar112 >> 0x11)) + uVar57 +
            (uVar98 >> 3 ^ (uVar98 * 0x4000 | uVar98 >> 0x12) ^ (uVar98 * 0x2000000 | uVar98 >> 7));
  uVar127 = (uVar128 >> 10 ^
            (iVar83 * 0x2000 | uVar128 >> 0x13) ^ (iVar83 * 0x8000 | uVar128 >> 0x11)) + uVar58 +
            (uVar67 >> 3 ^ (uVar67 * 0x4000 | uVar67 >> 0x12) ^ (uVar67 * 0x2000000 | uVar67 >> 7));
  iVar43 = uVar54 + uVar115 + (uVar130 & uVar23 | ~uVar23 & uVar2) + 0x240ca1cc +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar49 = uVar118 + uVar139 + (uVar111 & uVar34 | ~uVar34 & uVar4) + 0x240ca1cc +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar52 = uVar60 + uVar147 + (uVar135 & uVar44 | ~uVar44 & uVar7) + 0x240ca1cc +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar55 = uVar122 + uVar127 + (uVar137 & uVar50 | ~uVar50 & uVar9) + 0x240ca1cc +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  uVar86 = uVar86 + iVar43;
  uVar59 = uVar59 + iVar49;
  uVar91 = uVar91 + iVar52;
  uVar64 = uVar64 + iVar55;
  uVar92 = ((uVar22 | uVar33) & uVar51 | uVar22 & uVar33) +
           ((uVar22 * 0x400 | uVar22 >> 0x16) ^
           (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar43;
  uVar96 = ((uVar19 | uVar20) & uVar120 | uVar19 & uVar20) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar49;
  uVar93 = ((uVar29 | uVar31) & uVar116 | uVar29 & uVar31) +
           ((uVar29 * 0x400 | uVar29 >> 0x16) ^
           (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar52;
  uVar136 = ((uVar30 | uVar56) & uVar132 | uVar30 & uVar56) +
            ((uVar30 * 0x400 | uVar30 >> 0x16) ^
            (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar55;
  uVar122 = (uVar68 >> 3 ^ (uVar68 * 0x4000 | uVar68 >> 0x12) ^ (uVar68 * 0x2000000 | uVar68 >> 7))
            + uVar53 +
            (uVar119 >> 10 ^
            (uVar119 * 0x2000 | uVar119 >> 0x13) ^ (uVar119 * 0x8000 | uVar119 >> 0x11));
  uVar69 = (uVar99 >> 3 ^ (uVar99 * 0x4000 | uVar99 >> 0x12) ^ (uVar99 * 0x2000000 | uVar99 >> 7)) +
           uVar95 + (uVar138 >> 10 ^
                    (uVar138 * 0x2000 | uVar138 >> 0x13) ^ (uVar138 * 0x8000 | uVar138 >> 0x11));
  uVar71 = (uVar155 >> 3 ^
           (uVar155 * 0x4000 | uVar155 >> 0x12) ^ (uVar155 * 0x2000000 | uVar155 >> 7)) + uVar98 +
           (uVar144 >> 10 ^
           (uVar144 * 0x2000 | uVar144 >> 0x13) ^ (uVar144 * 0x8000 | uVar144 >> 0x11));
  uVar124 = (uVar131 >> 3 ^
            (uVar131 * 0x4000 | uVar131 >> 0x12) ^ (uVar131 * 0x2000000 | uVar131 >> 7)) + uVar67 +
            (uVar148 >> 10 ^
            (uVar148 * 0x2000 | uVar148 >> 0x13) ^ (uVar148 * 0x8000 | uVar148 >> 0x11));
  iVar43 = uVar2 + uVar122 + (uVar23 & uVar86 | ~uVar86 & uVar130) + 0x2de92c6f +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  iVar49 = uVar4 + uVar69 + (uVar34 & uVar59 | ~uVar59 & uVar111) + 0x2de92c6f +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6));
  iVar52 = uVar7 + uVar71 + (uVar44 & uVar91 | ~uVar91 & uVar135) + 0x2de92c6f +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  iVar55 = uVar9 + uVar124 + (uVar50 & uVar64 | ~uVar64 & uVar137) + 0x2de92c6f +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  uVar51 = uVar51 + iVar43;
  uVar120 = uVar120 + iVar49;
  uVar116 = uVar116 + iVar52;
  uVar132 = uVar132 + iVar55;
  uVar95 = ((uVar92 | uVar22) & uVar33 | uVar92 & uVar22) +
           ((uVar92 * 0x400 | uVar92 >> 0x16) ^
           (uVar92 * 0x80000 | uVar92 >> 0xd) ^ (uVar92 * 0x40000000 | uVar92 >> 2)) + iVar43;
  uVar98 = ((uVar96 | uVar19) & uVar20 | uVar96 & uVar19) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar49;
  uVar82 = ((uVar93 | uVar29) & uVar31 | uVar93 & uVar29) +
           ((uVar93 * 0x400 | uVar93 >> 0x16) ^
           (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar52;
  uVar134 = ((uVar136 | uVar30) & uVar56 | uVar136 & uVar30) +
            ((uVar136 * 0x400 | uVar136 >> 0x16) ^
            (uVar136 * 0x80000 | uVar136 >> 0xd) ^ (uVar136 * 0x40000000 | uVar136 >> 2)) + iVar55;
  uVar150 = (uVar160 >> 3 ^
            (uVar160 * 0x4000 | uVar160 >> 0x12) ^ (uVar160 * 0x2000000 | uVar160 >> 7)) + uVar68 +
            (uVar115 >> 10 ^
            (uVar115 * 0x2000 | uVar115 >> 0x13) ^ (uVar115 * 0x8000 | uVar115 >> 0x11));
  uVar151 = (uVar84 >> 3 ^ (uVar84 * 0x4000 | uVar84 >> 0x12) ^ (uVar84 * 0x2000000 | uVar84 >> 7))
            + uVar99 +
            (uVar139 >> 10 ^
            (uVar139 * 0x2000 | uVar139 >> 0x13) ^ (uVar139 * 0x8000 | uVar139 >> 0x11));
  uVar152 = (uVar104 >> 3 ^
            (uVar104 * 0x4000 | uVar104 >> 0x12) ^ (uVar104 * 0x2000000 | uVar104 >> 7)) + uVar155 +
            (uVar147 >> 10 ^
            (uVar147 * 0x2000 | uVar147 >> 0x13) ^ (uVar147 * 0x8000 | uVar147 >> 0x11));
  uVar170 = (uVar100 >> 3 ^
            (uVar100 * 0x4000 | uVar100 >> 0x12) ^ (uVar100 * 0x2000000 | uVar100 >> 7)) + uVar131 +
            (uVar127 >> 10 ^
            (uVar127 * 0x2000 | uVar127 >> 0x13) ^ (uVar127 * 0x8000 | uVar127 >> 0x11));
  iVar43 = uVar130 + uVar150 + (uVar86 & uVar51 | ~uVar51 & uVar23) + 0x4a7484aa +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  iVar49 = uVar111 + uVar151 + (uVar59 & uVar120 | ~uVar120 & uVar34) + 0x4a7484aa +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  iVar52 = uVar135 + uVar152 + (uVar91 & uVar116 | ~uVar116 & uVar44) + 0x4a7484aa +
           ((uVar116 * 0x80 | uVar116 >> 0x19) ^
           (uVar116 * 0x200000 | uVar116 >> 0xb) ^ (uVar116 * 0x4000000 | uVar116 >> 6));
  iVar55 = uVar137 + uVar170 + (uVar64 & uVar132 | ~uVar132 & uVar50) + 0x4a7484aa +
           ((uVar132 * 0x80 | uVar132 >> 0x19) ^
           (uVar132 * 0x200000 | uVar132 >> 0xb) ^ (uVar132 * 0x4000000 | uVar132 >> 6));
  uVar33 = uVar33 + iVar43;
  uVar20 = uVar20 + iVar49;
  uVar31 = uVar31 + iVar52;
  uVar56 = uVar56 + iVar55;
  uVar111 = ((uVar95 | uVar92) & uVar22 | uVar95 & uVar92) +
            ((uVar95 * 0x400 | uVar95 >> 0x16) ^
            (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar135 = ((uVar98 | uVar96) & uVar19 | uVar98 & uVar96) +
            ((uVar98 * 0x400 | uVar98 >> 0x16) ^
            (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar49;
  uVar137 = ((uVar82 | uVar93) & uVar29 | uVar82 & uVar93) +
            ((uVar82 * 0x400 | uVar82 >> 0x16) ^
            (uVar82 * 0x80000 | uVar82 >> 0xd) ^ (uVar82 * 0x40000000 | uVar82 >> 2)) + iVar52;
  uVar142 = ((uVar134 | uVar136) & uVar30 | uVar134 & uVar136) +
            ((uVar134 * 0x400 | uVar134 >> 0x16) ^
            (uVar134 * 0x80000 | uVar134 >> 0xd) ^ (uVar134 * 0x40000000 | uVar134 >> 2)) + iVar55;
  uVar114 = (uVar5 >> 3 ^ (uVar5 * 0x4000 | uVar5 >> 0x12) ^ (uVar5 * 0x2000000 | uVar5 >> 7)) +
            uVar160 + 0x100 +
            (uVar122 >> 10 ^
            (uVar122 * 0x2000 | uVar122 >> 0x13) ^ (uVar122 * 0x8000 | uVar122 >> 0x11));
  uVar45 = (uVar18 >> 3 ^ (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)) +
           uVar84 + 0x100 +
           (uVar69 >> 10 ^ (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11));
  uVar54 = (uVar21 >> 3 ^ (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7)) +
           uVar104 + 0x100 +
           (uVar71 >> 10 ^ (uVar71 * 0x2000 | uVar71 >> 0x13) ^ (uVar71 * 0x8000 | uVar71 >> 0x11));
  uVar70 = (uVar8 >> 3 ^ (uVar8 * 0x4000 | uVar8 >> 0x12) ^ (uVar8 * 0x2000000 | uVar8 >> 7)) +
           uVar100 + 0x100 +
           (uVar124 >> 10 ^
           (uVar124 * 0x2000 | uVar124 >> 0x13) ^ (uVar124 * 0x8000 | uVar124 >> 0x11));
  iVar43 = uVar23 + uVar114 + (uVar51 & uVar33 | ~uVar33 & uVar86) + 0x5cb0a9dc +
           ((uVar33 * 0x80 | uVar33 >> 0x19) ^
           (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6));
  iVar49 = uVar34 + uVar45 + (uVar120 & uVar20 | ~uVar20 & uVar59) + 0x5cb0a9dc +
           ((uVar20 * 0x80 | uVar20 >> 0x19) ^
           (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
  iVar52 = uVar44 + uVar54 + (uVar116 & uVar31 | ~uVar31 & uVar91) + 0x5cb0a9dc +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  iVar55 = uVar50 + uVar70 + (uVar132 & uVar56 | ~uVar56 & uVar64) + 0x5cb0a9dc +
           ((uVar56 * 0x80 | uVar56 >> 0x19) ^
           (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6));
  uVar22 = uVar22 + iVar43;
  uVar19 = uVar19 + iVar49;
  uVar29 = uVar29 + iVar52;
  uVar30 = uVar30 + iVar55;
  uVar7 = ((uVar111 | uVar95) & uVar92 | uVar111 & uVar95) +
          ((uVar111 * 0x400 | uVar111 >> 0x16) ^
          (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar43;
  uVar155 = ((uVar135 | uVar98) & uVar96 | uVar135 & uVar98) +
            ((uVar135 * 0x400 | uVar135 >> 0x16) ^
            (uVar135 * 0x80000 | uVar135 >> 0xd) ^ (uVar135 * 0x40000000 | uVar135 >> 2)) + iVar49;
  uVar131 = ((uVar137 | uVar82) & uVar93 | uVar137 & uVar82) +
            ((uVar137 * 0x400 | uVar137 >> 0x16) ^
            (uVar137 * 0x80000 | uVar137 >> 0xd) ^ (uVar137 * 0x40000000 | uVar137 >> 2)) + iVar52;
  uVar160 = ((uVar142 | uVar134) & uVar136 | uVar142 & uVar134) +
            ((uVar142 * 0x400 | uVar142 >> 0x16) ^
            (uVar142 * 0x80000 | uVar142 >> 0xd) ^ (uVar142 * 0x40000000 | uVar142 >> 2)) + iVar55;
  iVar35 = uVar5 + uVar126 +
           (uVar150 >> 10 ^
           (uVar150 * 0x2000 | uVar150 >> 0x13) ^ (uVar150 * 0x8000 | uVar150 >> 0x11));
  iVar40 = uVar18 + uVar72 +
           (uVar151 >> 10 ^
           (uVar151 * 0x2000 | uVar151 >> 0x13) ^ (uVar151 * 0x8000 | uVar151 >> 0x11));
  iVar41 = uVar21 + uVar74 +
           (uVar152 >> 10 ^
           (uVar152 * 0x2000 | uVar152 >> 0x13) ^ (uVar152 * 0x8000 | uVar152 >> 0x11));
  iVar42 = uVar8 + uVar80 +
           (uVar170 >> 10 ^
           (uVar170 * 0x2000 | uVar170 >> 0x13) ^ (uVar170 * 0x8000 | uVar170 >> 0x11));
  uVar100 = iVar35 + 0x11002000;
  uVar106 = iVar40 + 0x11002000;
  uVar129 = iVar41 + 0x11002000;
  uVar130 = iVar42 + 0x11002000;
  iVar43 = uVar86 + uVar100 + (uVar33 & uVar22 | ~uVar22 & uVar51) + 0x76f988da +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
  iVar49 = uVar59 + uVar106 + (uVar20 & uVar19 | ~uVar19 & uVar120) + 0x76f988da +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
  iVar52 = uVar91 + uVar129 + (uVar31 & uVar29 | ~uVar29 & uVar116) + 0x76f988da +
           ((uVar29 * 0x80 | uVar29 >> 0x19) ^
           (uVar29 * 0x200000 | uVar29 >> 0xb) ^ (uVar29 * 0x4000000 | uVar29 >> 6));
  iVar55 = uVar64 + uVar130 + (uVar56 & uVar30 | ~uVar30 & uVar132) + 0x76f988da +
           ((uVar30 * 0x80 | uVar30 >> 0x19) ^
           (uVar30 * 0x200000 | uVar30 >> 0xb) ^ (uVar30 * 0x4000000 | uVar30 >> 6));
  uVar92 = uVar92 + iVar43;
  uVar96 = uVar96 + iVar49;
  uVar93 = uVar93 + iVar52;
  uVar136 = uVar136 + iVar55;
  uVar60 = ((uVar7 | uVar111) & uVar95 | uVar7 & uVar111) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar43;
  uVar87 = ((uVar155 | uVar135) & uVar98 | uVar155 & uVar135) +
           ((uVar155 * 0x400 | uVar155 >> 0x16) ^
           (uVar155 * 0x80000 | uVar155 >> 0xd) ^ (uVar155 * 0x40000000 | uVar155 >> 2)) + iVar49;
  uVar65 = ((uVar131 | uVar137) & uVar82 | uVar131 & uVar137) +
           ((uVar131 * 0x400 | uVar131 >> 0x16) ^
           (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar52;
  uVar66 = ((uVar160 | uVar142) & uVar134 | uVar160 & uVar142) +
           ((uVar160 * 0x400 | uVar160 >> 0x16) ^
           (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar55;
  uVar2 = (uVar114 >> 10 ^
           (uVar114 * 0x2000 | uVar114 >> 0x13) ^ (uVar114 * 0x8000 | uVar114 >> 0x11) ^ 0x80000000)
          + uVar105;
  uVar9 = (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11) ^
          0x80000000) + uVar133;
  uVar21 = (uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11) ^
           0x80000000) + uVar112;
  uVar10 = (uVar70 >> 10 ^ (uVar70 * 0x2000 | uVar70 >> 0x13) ^ (uVar70 * 0x8000 | uVar70 >> 0x11) ^
           0x80000000) + uVar128;
  iVar43 = uVar51 + uVar2 + (uVar22 & uVar92 | ~uVar92 & uVar33) + -0x67c1aeae +
           ((uVar92 * 0x80 | uVar92 >> 0x19) ^
           (uVar92 * 0x200000 | uVar92 >> 0xb) ^ (uVar92 * 0x4000000 | uVar92 >> 6));
  iVar49 = uVar120 + uVar9 + (uVar19 & uVar96 | ~uVar96 & uVar20) + -0x67c1aeae +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6));
  iVar52 = uVar116 + uVar21 + (uVar29 & uVar93 | ~uVar93 & uVar31) + -0x67c1aeae +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6));
  iVar55 = uVar132 + uVar10 + (uVar30 & uVar136 | ~uVar136 & uVar56) + -0x67c1aeae +
           ((uVar136 * 0x80 | uVar136 >> 0x19) ^
           (uVar136 * 0x200000 | uVar136 >> 0xb) ^ (uVar136 * 0x4000000 | uVar136 >> 6));
  uVar95 = uVar95 + iVar43;
  uVar98 = uVar98 + iVar49;
  uVar82 = uVar82 + iVar52;
  uVar134 = uVar134 + iVar55;
  uVar67 = ((uVar60 | uVar7) & uVar111 | uVar60 & uVar7) +
           ((uVar60 * 0x400 | uVar60 >> 0x16) ^
           (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar43;
  uVar51 = ((uVar87 | uVar155) & uVar135 | uVar87 & uVar155) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar49;
  uVar57 = ((uVar65 | uVar131) & uVar137 | uVar65 & uVar131) +
           ((uVar65 * 0x400 | uVar65 >> 0x16) ^
           (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar52;
  uVar118 = ((uVar66 | uVar160) & uVar142 | uVar66 & uVar160) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar55;
  uVar163 = (uVar100 >> 10 ^
            (uVar100 * 0x2000 | uVar100 >> 0x13) ^ (uVar100 * 0x8000 | uVar100 >> 0x11)) + uVar119;
  uVar165 = (uVar106 >> 10 ^
            (uVar106 * 0x2000 | uVar106 >> 0x13) ^ (uVar106 * 0x8000 | uVar106 >> 0x11)) + uVar138;
  uVar167 = (uVar129 >> 10 ^
            (uVar129 * 0x2000 | uVar129 >> 0x13) ^ (uVar129 * 0x8000 | uVar129 >> 0x11)) + uVar144;
  uVar171 = (uVar130 >> 10 ^
            (uVar130 * 0x2000 | uVar130 >> 0x13) ^ (uVar130 * 0x8000 | uVar130 >> 0x11)) + uVar148;
  iVar43 = uVar33 + uVar163 + (uVar92 & uVar95 | ~uVar95 & uVar22) + -0x57ce3993 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar49 = uVar20 + uVar165 + (uVar96 & uVar98 | ~uVar98 & uVar19) + -0x57ce3993 +
           ((uVar98 * 0x80 | uVar98 >> 0x19) ^
           (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6));
  iVar52 = uVar31 + uVar167 + (uVar93 & uVar82 | ~uVar82 & uVar29) + -0x57ce3993 +
           ((uVar82 * 0x80 | uVar82 >> 0x19) ^
           (uVar82 * 0x200000 | uVar82 >> 0xb) ^ (uVar82 * 0x4000000 | uVar82 >> 6));
  iVar55 = uVar56 + uVar171 + (uVar136 & uVar134 | ~uVar134 & uVar30) + -0x57ce3993 +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6));
  uVar111 = uVar111 + iVar43;
  uVar135 = uVar135 + iVar49;
  uVar137 = uVar137 + iVar52;
  uVar142 = uVar142 + iVar55;
  uVar132 = ((uVar67 | uVar60) & uVar7 | uVar67 & uVar60) +
            ((uVar67 * 0x400 | uVar67 >> 0x16) ^
            (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar43;
  uVar125 = ((uVar51 | uVar87) & uVar155 | uVar51 & uVar87) +
            ((uVar51 * 0x400 | uVar51 >> 0x16) ^
            (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar49;
  uVar145 = ((uVar57 | uVar65) & uVar131 | uVar57 & uVar65) +
            ((uVar57 * 0x400 | uVar57 >> 0x16) ^
            (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar52;
  uVar153 = ((uVar118 | uVar66) & uVar160 | uVar118 & uVar66) +
            ((uVar118 * 0x400 | uVar118 >> 0x16) ^
            (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar55;
  uVar23 = (uVar2 >> 10 ^ (uVar2 * 0x2000 | uVar2 >> 0x13) ^ (uVar2 * 0x8000 | uVar2 >> 0x11)) +
           uVar115;
  uVar44 = (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11)) +
           uVar139;
  uVar53 = (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11))
           + uVar147;
  uVar86 = (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11))
           + uVar127;
  iVar43 = uVar22 + uVar23 + (uVar95 & uVar111 | ~uVar111 & uVar92) + -0x4ffcd838 +
           ((uVar111 * 0x80 | uVar111 >> 0x19) ^
           (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6));
  iVar49 = uVar19 + uVar44 + (uVar98 & uVar135 | ~uVar135 & uVar96) + -0x4ffcd838 +
           ((uVar135 * 0x80 | uVar135 >> 0x19) ^
           (uVar135 * 0x200000 | uVar135 >> 0xb) ^ (uVar135 * 0x4000000 | uVar135 >> 6));
  iVar52 = uVar29 + uVar53 + (uVar82 & uVar137 | ~uVar137 & uVar93) + -0x4ffcd838 +
           ((uVar137 * 0x80 | uVar137 >> 0x19) ^
           (uVar137 * 0x200000 | uVar137 >> 0xb) ^ (uVar137 * 0x4000000 | uVar137 >> 6));
  iVar55 = uVar30 + uVar86 + (uVar134 & uVar142 | ~uVar142 & uVar136) + -0x4ffcd838 +
           ((uVar142 * 0x80 | uVar142 >> 0x19) ^
           (uVar142 * 0x200000 | uVar142 >> 0xb) ^ (uVar142 * 0x4000000 | uVar142 >> 6));
  uVar7 = uVar7 + iVar43;
  uVar155 = uVar155 + iVar49;
  uVar131 = uVar131 + iVar52;
  uVar160 = uVar160 + iVar55;
  uVar120 = ((uVar132 | uVar67) & uVar60 | uVar132 & uVar67) +
            ((uVar132 * 0x400 | uVar132 >> 0x16) ^
            (uVar132 * 0x80000 | uVar132 >> 0xd) ^ (uVar132 * 0x40000000 | uVar132 >> 2)) + iVar43;
  uVar58 = ((uVar125 | uVar51) & uVar87 | uVar125 & uVar51) +
           ((uVar125 * 0x400 | uVar125 >> 0x16) ^
           (uVar125 * 0x80000 | uVar125 >> 0xd) ^ (uVar125 * 0x40000000 | uVar125 >> 2)) + iVar49;
  uVar61 = ((uVar145 | uVar57) & uVar65 | uVar145 & uVar57) +
           ((uVar145 * 0x400 | uVar145 >> 0x16) ^
           (uVar145 * 0x80000 | uVar145 >> 0xd) ^ (uVar145 * 0x40000000 | uVar145 >> 2)) + iVar52;
  uVar62 = ((uVar153 | uVar118) & uVar66 | uVar153 & uVar118) +
           ((uVar153 * 0x400 | uVar153 >> 0x16) ^
           (uVar153 * 0x80000 | uVar153 >> 0xd) ^ (uVar153 * 0x40000000 | uVar153 >> 2)) + iVar55;
  uVar4 = (uVar163 >> 10 ^
          (uVar163 * 0x2000 | uVar163 >> 0x13) ^ (uVar163 * 0x8000 | uVar163 >> 0x11)) + uVar122;
  uVar18 = (uVar165 >> 10 ^
           (uVar165 * 0x2000 | uVar165 >> 0x13) ^ (uVar165 * 0x8000 | uVar165 >> 0x11)) + uVar69;
  uVar29 = (uVar167 >> 10 ^
           (uVar167 * 0x2000 | uVar167 >> 0x13) ^ (uVar167 * 0x8000 | uVar167 >> 0x11)) + uVar71;
  uVar33 = (uVar171 >> 10 ^
           (uVar171 * 0x2000 | uVar171 >> 0x13) ^ (uVar171 * 0x8000 | uVar171 >> 0x11)) + uVar124;
  iVar43 = uVar92 + uVar4 + (uVar111 & uVar7 | ~uVar7 & uVar95) + -0x40a68039 +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  iVar49 = uVar96 + uVar18 + (uVar135 & uVar155 | ~uVar155 & uVar98) + -0x40a68039 +
           ((uVar155 * 0x80 | uVar155 >> 0x19) ^
           (uVar155 * 0x200000 | uVar155 >> 0xb) ^ (uVar155 * 0x4000000 | uVar155 >> 6));
  iVar52 = uVar93 + uVar29 + (uVar137 & uVar131 | ~uVar131 & uVar82) + -0x40a68039 +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6));
  iVar55 = uVar136 + uVar33 + (uVar142 & uVar160 | ~uVar160 & uVar134) + -0x40a68039 +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6));
  uVar60 = uVar60 + iVar43;
  uVar87 = uVar87 + iVar49;
  uVar65 = uVar65 + iVar52;
  uVar66 = uVar66 + iVar55;
  uVar92 = ((uVar120 | uVar132) & uVar67 | uVar120 & uVar132) +
           ((uVar120 * 0x400 | uVar120 >> 0x16) ^
           (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar43;
  uVar96 = ((uVar58 | uVar125) & uVar51 | uVar58 & uVar125) +
           ((uVar58 * 0x400 | uVar58 >> 0x16) ^
           (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar49;
  uVar68 = ((uVar61 | uVar145) & uVar57 | uVar61 & uVar145) +
           ((uVar61 * 0x400 | uVar61 >> 0x16) ^
           (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar52;
  uVar99 = ((uVar62 | uVar153) & uVar118 | uVar62 & uVar153) +
           ((uVar62 * 0x400 | uVar62 >> 0x16) ^
           (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar55;
  auVar13._0_4_ =
       (uVar23 >> 10 ^ (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11)) +
       uVar150;
  auVar13._4_4_ =
       (uVar44 >> 10 ^ (uVar44 * 0x2000 | uVar44 >> 0x13) ^ (uVar44 * 0x8000 | uVar44 >> 0x11)) +
       uVar151;
  auVar13._8_4_ =
       (uVar53 >> 10 ^ (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11)) +
       uVar152;
  auVar13._12_4_ =
       (uVar86 >> 10 ^ (uVar86 * 0x2000 | uVar86 >> 0x13) ^ (uVar86 * 0x8000 | uVar86 >> 0x11)) +
       uVar170;
  iVar43 = uVar95 + auVar13._0_4_ + (uVar7 & uVar60 | ~uVar60 & uVar111) + -0x391ff40d +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar49 = uVar98 + auVar13._4_4_ + (uVar155 & uVar87 | ~uVar87 & uVar135) + -0x391ff40d +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar52 = uVar82 + auVar13._8_4_ + (uVar131 & uVar65 | ~uVar65 & uVar137) + -0x391ff40d +
           ((uVar65 * 0x80 | uVar65 >> 0x19) ^
           (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6));
  iVar55 = uVar134 + auVar13._12_4_ + (uVar160 & uVar66 | ~uVar66 & uVar142) + -0x391ff40d +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6));
  uVar67 = uVar67 + iVar43;
  uVar51 = uVar51 + iVar49;
  uVar57 = uVar57 + iVar52;
  uVar118 = uVar118 + iVar55;
  uVar91 = ((uVar92 | uVar120) & uVar132 | uVar92 & uVar120) +
           ((uVar92 * 0x400 | uVar92 >> 0x16) ^
           (uVar92 * 0x80000 | uVar92 >> 0xd) ^ (uVar92 * 0x40000000 | uVar92 >> 2)) + iVar43;
  uVar95 = ((uVar96 | uVar58) & uVar125 | uVar96 & uVar58) +
           ((uVar96 * 0x400 | uVar96 >> 0x16) ^
           (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar49;
  uVar64 = ((uVar68 | uVar61) & uVar145 | uVar68 & uVar61) +
           ((uVar68 * 0x400 | uVar68 >> 0x16) ^
           (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar98 = ((uVar99 | uVar62) & uVar153 | uVar99 & uVar62) +
           ((uVar99 * 0x400 | uVar99 >> 0x16) ^
           (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar55;
  uVar5 = (uVar4 >> 10 ^ (uVar4 * 0x2000 | uVar4 >> 0x13) ^ (uVar4 * 0x8000 | uVar4 >> 0x11)) +
          uVar114;
  uVar22 = (uVar18 >> 10 ^ (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11))
           + uVar45;
  uVar30 = (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11))
           + uVar54;
  uVar20 = (uVar33 >> 10 ^ (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11))
           + uVar70;
  iVar43 = uVar111 + uVar5 + (uVar60 & uVar67 | ~uVar67 & uVar7) + -0x2a586eb9 +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  iVar49 = uVar135 + uVar22 + (uVar87 & uVar51 | ~uVar51 & uVar155) + -0x2a586eb9 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  iVar52 = uVar137 + uVar30 + (uVar65 & uVar57 | ~uVar57 & uVar131) + -0x2a586eb9 +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  iVar55 = uVar142 + uVar20 + (uVar66 & uVar118 | ~uVar118 & uVar160) + -0x2a586eb9 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6));
  uVar132 = uVar132 + iVar43;
  uVar125 = uVar125 + iVar49;
  uVar145 = uVar145 + iVar52;
  uVar153 = uVar153 + iVar55;
  uVar134 = ((uVar91 | uVar92) & uVar120 | uVar91 & uVar92) +
            ((uVar91 * 0x400 | uVar91 >> 0x16) ^
            (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2)) + iVar43;
  uVar84 = ((uVar95 | uVar96) & uVar58 | uVar95 & uVar96) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar49;
  uVar104 = ((uVar64 | uVar68) & uVar61 | uVar64 & uVar68) +
            ((uVar64 * 0x400 | uVar64 >> 0x16) ^
            (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar52;
  uVar93 = ((uVar98 | uVar99) & uVar62 | uVar98 & uVar99) +
           ((uVar98 * 0x400 | uVar98 >> 0x16) ^
           (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar55;
  iVar43 = (auVar13._0_4_ >> 10 ^
           (auVar13._0_4_ * 0x2000 | auVar13._0_4_ >> 0x13) ^
           (auVar13._0_4_ * 0x8000 | auVar13._0_4_ >> 0x11)) + uVar100;
  iVar49 = (auVar13._4_4_ >> 10 ^
           (auVar13._4_4_ * 0x2000 | auVar13._4_4_ >> 0x13) ^
           (auVar13._4_4_ * 0x8000 | auVar13._4_4_ >> 0x11)) + uVar106;
  iVar52 = (auVar13._8_4_ >> 10 ^
           (auVar13._8_4_ * 0x2000 | auVar13._8_4_ >> 0x13) ^
           (auVar13._8_4_ * 0x8000 | auVar13._8_4_ >> 0x11)) + uVar129;
  iVar55 = (auVar13._12_4_ >> 10 ^
           (auVar13._12_4_ * 0x2000 | auVar13._12_4_ >> 0x13) ^
           (auVar13._12_4_ * 0x8000 | auVar13._12_4_ >> 0x11)) + uVar130;
  auVar11 = pmovsxbw(auVar13,0x4022402240224022);
  uVar34 = auVar11._0_4_ + iVar43;
  uVar50 = auVar11._4_4_ + iVar49;
  uVar56 = auVar11._8_4_ + iVar52;
  uVar59 = auVar11._12_4_ + iVar55;
  iVar43 = iVar43 + uVar7 + (uVar67 & uVar132 | ~uVar132 & uVar60) +
           ((uVar132 * 0x80 | uVar132 >> 0x19) ^
           (uVar132 * 0x200000 | uVar132 >> 0xb) ^ (uVar132 * 0x4000000 | uVar132 >> 6)) + 0x70a6373
  ;
  iVar49 = iVar49 + uVar155 + (uVar51 & uVar125 | ~uVar125 & uVar87) +
           ((uVar125 * 0x80 | uVar125 >> 0x19) ^
           (uVar125 * 0x200000 | uVar125 >> 0xb) ^ (uVar125 * 0x4000000 | uVar125 >> 6)) + 0x70a6373
  ;
  iVar52 = iVar52 + uVar131 + (uVar57 & uVar145 | ~uVar145 & uVar65) +
           ((uVar145 * 0x80 | uVar145 >> 0x19) ^
           (uVar145 * 0x200000 | uVar145 >> 0xb) ^ (uVar145 * 0x4000000 | uVar145 >> 6)) + 0x70a6373
  ;
  iVar55 = iVar55 + uVar160 + (uVar118 & uVar153 | ~uVar153 & uVar66) +
           ((uVar153 * 0x80 | uVar153 >> 0x19) ^
           (uVar153 * 0x200000 | uVar153 >> 0xb) ^ (uVar153 * 0x4000000 | uVar153 >> 6)) + 0x70a6373
  ;
  uVar120 = uVar120 + iVar43;
  uVar58 = uVar58 + iVar49;
  uVar61 = uVar61 + iVar52;
  uVar62 = uVar62 + iVar55;
  uVar116 = ((uVar134 | uVar91) & uVar92 | uVar134 & uVar91) +
            ((uVar134 * 0x400 | uVar134 >> 0x16) ^
            (uVar134 * 0x80000 | uVar134 >> 0xd) ^ (uVar134 * 0x40000000 | uVar134 >> 2)) + iVar43;
  uVar111 = ((uVar84 | uVar95) & uVar96 | uVar84 & uVar95) +
            ((uVar84 * 0x400 | uVar84 >> 0x16) ^
            (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar49;
  uVar135 = ((uVar104 | uVar64) & uVar68 | uVar104 & uVar64) +
            ((uVar104 * 0x400 | uVar104 >> 0x16) ^
            (uVar104 * 0x80000 | uVar104 >> 0xd) ^ (uVar104 * 0x40000000 | uVar104 >> 2)) + iVar52;
  uVar137 = ((uVar93 | uVar98) & uVar99 | uVar93 & uVar98) +
            ((uVar93 * 0x400 | uVar93 >> 0x16) ^
            (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar55;
  uVar7 = (uVar126 >> 3 ^
          (uVar126 * 0x4000 | uVar126 >> 0x12) ^ (uVar126 * 0x2000000 | uVar126 >> 7)) + uVar2 +
          0x100 + (uVar5 >> 10 ^ (uVar5 * 0x2000 | uVar5 >> 0x13) ^ (uVar5 * 0x8000 | uVar5 >> 0x11)
                  );
  uVar19 = (uVar72 >> 3 ^ (uVar72 * 0x4000 | uVar72 >> 0x12) ^ (uVar72 * 0x2000000 | uVar72 >> 7)) +
           uVar9 + 0x100 +
           (uVar22 >> 10 ^ (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
  uVar8 = (uVar74 >> 3 ^ (uVar74 * 0x4000 | uVar74 >> 0x12) ^ (uVar74 * 0x2000000 | uVar74 >> 7)) +
          uVar21 + 0x100 +
          (uVar30 >> 10 ^ (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11));
  uVar31 = (uVar80 >> 3 ^ (uVar80 * 0x4000 | uVar80 >> 0x12) ^ (uVar80 * 0x2000000 | uVar80 >> 7)) +
           uVar10 + 0x100 +
           (uVar20 >> 10 ^ (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
  iVar43 = uVar60 + uVar7 + (uVar132 & uVar120 | ~uVar120 & uVar67) + 0x14292967 +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  iVar49 = uVar87 + uVar19 + (uVar125 & uVar58 | ~uVar58 & uVar51) + 0x14292967 +
           ((uVar58 * 0x80 | uVar58 >> 0x19) ^
           (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6));
  iVar52 = uVar65 + uVar8 + (uVar145 & uVar61 | ~uVar61 & uVar57) + 0x14292967 +
           ((uVar61 * 0x80 | uVar61 >> 0x19) ^
           (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6));
  iVar55 = uVar66 + uVar31 + (uVar153 & uVar62 | ~uVar62 & uVar118) + 0x14292967 +
           ((uVar62 * 0x80 | uVar62 >> 0x19) ^
           (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6));
  uVar92 = uVar92 + iVar43;
  uVar96 = uVar96 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar99 = uVar99 + iVar55;
  uVar60 = ((uVar116 | uVar134) & uVar91 | uVar116 & uVar134) +
           ((uVar116 * 0x400 | uVar116 >> 0x16) ^
           (uVar116 * 0x80000 | uVar116 >> 0xd) ^ (uVar116 * 0x40000000 | uVar116 >> 2)) + iVar43;
  uVar87 = ((uVar111 | uVar84) & uVar95 | uVar111 & uVar84) +
           ((uVar111 * 0x400 | uVar111 >> 0x16) ^
           (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar49;
  uVar65 = ((uVar135 | uVar104) & uVar64 | uVar135 & uVar104) +
           ((uVar135 * 0x400 | uVar135 >> 0x16) ^
           (uVar135 * 0x80000 | uVar135 >> 0xd) ^ (uVar135 * 0x40000000 | uVar135 >> 2)) + iVar52;
  uVar66 = ((uVar137 | uVar93) & uVar98 | uVar137 & uVar93) +
           ((uVar137 * 0x400 | uVar137 >> 0x16) ^
           (uVar137 * 0x80000 | uVar137 >> 0xd) ^ (uVar137 * 0x40000000 | uVar137 >> 2)) + iVar55;
  uVar142 = (uVar105 >> 3 ^
            (iVar73 * 0x4000 | uVar105 >> 0x12) ^ (iVar73 * 0x2000000 | uVar105 >> 7)) + uVar126 +
            uVar163 + (uVar34 >> 10 ^
                      (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
  uVar123 = (uVar133 >> 3 ^
            (iVar79 * 0x4000 | uVar133 >> 0x12) ^ (iVar79 * 0x2000000 | uVar133 >> 7)) + uVar72 +
            uVar165 + (uVar50 >> 10 ^
                      (uVar50 * 0x2000 | uVar50 >> 0x13) ^ (uVar50 * 0x8000 | uVar50 >> 0x11));
  uVar143 = (uVar112 >> 3 ^
            (iVar81 * 0x4000 | uVar112 >> 0x12) ^ (iVar81 * 0x2000000 | uVar112 >> 7)) + uVar74 +
            uVar167 + (uVar56 >> 10 ^
                      (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
  uVar146 = (uVar128 >> 3 ^
            (iVar83 * 0x4000 | uVar128 >> 0x12) ^ (iVar83 * 0x2000000 | uVar128 >> 7)) + uVar80 +
            uVar171 + (uVar59 >> 10 ^
                      (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
  iVar43 = uVar67 + uVar142 + (uVar120 & uVar92 | ~uVar92 & uVar132) + 0x27b70a85 +
           ((uVar92 * 0x80 | uVar92 >> 0x19) ^
           (uVar92 * 0x200000 | uVar92 >> 0xb) ^ (uVar92 * 0x4000000 | uVar92 >> 6));
  iVar49 = uVar51 + uVar123 + (uVar58 & uVar96 | ~uVar96 & uVar125) + 0x27b70a85 +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6));
  iVar52 = uVar57 + uVar143 + (uVar61 & uVar68 | ~uVar68 & uVar145) + 0x27b70a85 +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6));
  iVar55 = uVar118 + uVar146 + (uVar62 & uVar99 | ~uVar99 & uVar153) + 0x27b70a85 +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6));
  uVar91 = uVar91 + iVar43;
  uVar95 = uVar95 + iVar49;
  uVar64 = uVar64 + iVar52;
  uVar98 = uVar98 + iVar55;
  uVar131 = ((uVar60 | uVar116) & uVar134 | uVar60 & uVar116) +
            ((uVar60 * 0x400 | uVar60 >> 0x16) ^
            (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar43;
  uVar80 = ((uVar87 | uVar111) & uVar84 | uVar87 & uVar111) +
           ((uVar87 * 0x400 | uVar87 >> 0x16) ^
           (uVar87 * 0x80000 | uVar87 >> 0xd) ^ (uVar87 * 0x40000000 | uVar87 >> 2)) + iVar49;
  uVar160 = ((uVar65 | uVar135) & uVar104 | uVar65 & uVar135) +
            ((uVar65 * 0x400 | uVar65 >> 0x16) ^
            (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar52;
  uVar136 = ((uVar66 | uVar137) & uVar93 | uVar66 & uVar137) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar55;
  uVar166 = (uVar119 >> 3 ^
            (uVar119 * 0x4000 | uVar119 >> 0x12) ^ (uVar119 * 0x2000000 | uVar119 >> 7)) + uVar105 +
            uVar23 + (uVar7 >> 10 ^
                     (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
  uVar168 = (uVar138 >> 3 ^
            (uVar138 * 0x4000 | uVar138 >> 0x12) ^ (uVar138 * 0x2000000 | uVar138 >> 7)) + uVar133 +
            uVar44 + (uVar19 >> 10 ^
                     (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
  uVar169 = (uVar144 >> 3 ^
            (uVar144 * 0x4000 | uVar144 >> 0x12) ^ (uVar144 * 0x2000000 | uVar144 >> 7)) + uVar112 +
            uVar53 + (uVar8 >> 10 ^
                     (uVar8 * 0x2000 | uVar8 >> 0x13) ^ (uVar8 * 0x8000 | uVar8 >> 0x11));
  uVar174 = (uVar148 >> 3 ^
            (uVar148 * 0x4000 | uVar148 >> 0x12) ^ (uVar148 * 0x2000000 | uVar148 >> 7)) + uVar128 +
            uVar86 + (uVar31 >> 10 ^
                     (uVar31 * 0x2000 | uVar31 >> 0x13) ^ (uVar31 * 0x8000 | uVar31 >> 0x11));
  iVar43 = uVar132 + uVar166 + (uVar92 & uVar91 | ~uVar91 & uVar120) + 0x2e1b2138 +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  iVar49 = uVar125 + uVar168 + (uVar96 & uVar95 | ~uVar95 & uVar58) + 0x2e1b2138 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar52 = uVar145 + uVar169 + (uVar68 & uVar64 | ~uVar64 & uVar61) + 0x2e1b2138 +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar55 = uVar153 + uVar174 + (uVar99 & uVar98 | ~uVar98 & uVar62) + 0x2e1b2138 +
           ((uVar98 * 0x80 | uVar98 >> 0x19) ^
           (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6));
  uVar134 = uVar134 + iVar43;
  uVar84 = uVar84 + iVar49;
  uVar104 = uVar104 + iVar52;
  uVar93 = uVar93 + iVar55;
  uVar51 = ((uVar131 | uVar60) & uVar116 | uVar131 & uVar60) +
           ((uVar131 * 0x400 | uVar131 >> 0x16) ^
           (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar43;
  uVar118 = ((uVar80 | uVar87) & uVar111 | uVar80 & uVar87) +
            ((uVar80 * 0x400 | uVar80 >> 0x16) ^
            (uVar80 * 0x80000 | uVar80 >> 0xd) ^ (uVar80 * 0x40000000 | uVar80 >> 2)) + iVar49;
  uVar126 = ((uVar160 | uVar65) & uVar135 | uVar160 & uVar65) +
            ((uVar160 * 0x400 | uVar160 >> 0x16) ^
            (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar52;
  uVar72 = ((uVar136 | uVar66) & uVar137 | uVar136 & uVar66) +
           ((uVar136 * 0x400 | uVar136 >> 0x16) ^
           (uVar136 * 0x80000 | uVar136 >> 0xd) ^ (uVar136 * 0x40000000 | uVar136 >> 2)) + iVar55;
  uVar157 = (uVar115 >> 3 ^
            (uVar115 * 0x4000 | uVar115 >> 0x12) ^ (uVar115 * 0x2000000 | uVar115 >> 7)) + uVar119 +
            uVar4 + (uVar142 >> 10 ^
                    (uVar142 * 0x2000 | uVar142 >> 0x13) ^ (uVar142 * 0x8000 | uVar142 >> 0x11));
  uVar159 = (uVar139 >> 3 ^
            (uVar139 * 0x4000 | uVar139 >> 0x12) ^ (uVar139 * 0x2000000 | uVar139 >> 7)) + uVar138 +
            uVar18 + (uVar123 >> 10 ^
                     (uVar123 * 0x2000 | uVar123 >> 0x13) ^ (uVar123 * 0x8000 | uVar123 >> 0x11));
  uVar162 = (uVar147 >> 3 ^
            (uVar147 * 0x4000 | uVar147 >> 0x12) ^ (uVar147 * 0x2000000 | uVar147 >> 7)) + uVar144 +
            uVar29 + (uVar143 >> 10 ^
                     (uVar143 * 0x2000 | uVar143 >> 0x13) ^ (uVar143 * 0x8000 | uVar143 >> 0x11));
  uVar164 = (uVar127 >> 3 ^
            (uVar127 * 0x4000 | uVar127 >> 0x12) ^ (uVar127 * 0x2000000 | uVar127 >> 7)) + uVar148 +
            uVar33 + (uVar146 >> 10 ^
                     (uVar146 * 0x2000 | uVar146 >> 0x13) ^ (uVar146 * 0x8000 | uVar146 >> 0x11));
  iVar43 = uVar120 + uVar157 + (uVar91 & uVar134 | ~uVar134 & uVar92) + 0x4d2c6dfc +
           ((uVar134 * 0x80 | uVar134 >> 0x19) ^
           (uVar134 * 0x200000 | uVar134 >> 0xb) ^ (uVar134 * 0x4000000 | uVar134 >> 6));
  iVar49 = uVar58 + uVar159 + (uVar95 & uVar84 | ~uVar84 & uVar96) + 0x4d2c6dfc +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6));
  iVar52 = uVar61 + uVar162 + (uVar64 & uVar104 | ~uVar104 & uVar68) + 0x4d2c6dfc +
           ((uVar104 * 0x80 | uVar104 >> 0x19) ^
           (uVar104 * 0x200000 | uVar104 >> 0xb) ^ (uVar104 * 0x4000000 | uVar104 >> 6));
  iVar55 = uVar62 + uVar164 + (uVar98 & uVar93 | ~uVar93 & uVar99) + 0x4d2c6dfc +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6));
  uVar116 = uVar116 + iVar43;
  uVar111 = uVar111 + iVar49;
  uVar135 = uVar135 + iVar52;
  uVar137 = uVar137 + iVar55;
  uVar148 = ((uVar51 | uVar131) & uVar60 | uVar51 & uVar131) +
            ((uVar51 * 0x400 | uVar51 >> 0x16) ^
            (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar43;
  uVar125 = ((uVar118 | uVar80) & uVar87 | uVar118 & uVar80) +
            ((uVar118 * 0x400 | uVar118 >> 0x16) ^
            (uVar118 * 0x80000 | uVar118 >> 0xd) ^ (uVar118 * 0x40000000 | uVar118 >> 2)) + iVar49;
  uVar145 = ((uVar126 | uVar160) & uVar65 | uVar126 & uVar160) +
            ((uVar126 * 0x400 | uVar126 >> 0x16) ^
            (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar52;
  uVar149 = ((uVar72 | uVar136) & uVar66 | uVar72 & uVar136) +
            ((uVar72 * 0x400 | uVar72 >> 0x16) ^
            (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar55;
  uVar155 = (uVar122 >> 3 ^
            (uVar122 * 0x4000 | uVar122 >> 0x12) ^ (uVar122 * 0x2000000 | uVar122 >> 7)) + uVar115 +
            auVar13._0_4_ +
            (uVar166 >> 10 ^
            (uVar166 * 0x2000 | uVar166 >> 0x13) ^ (uVar166 * 0x8000 | uVar166 >> 0x11));
  uVar82 = (uVar69 >> 3 ^ (uVar69 * 0x4000 | uVar69 >> 0x12) ^ (uVar69 * 0x2000000 | uVar69 >> 7)) +
           uVar139 + auVar13._4_4_ +
           (uVar168 >> 10 ^
           (uVar168 * 0x2000 | uVar168 >> 0x13) ^ (uVar168 * 0x8000 | uVar168 >> 0x11));
  uVar105 = (uVar71 >> 3 ^ (uVar71 * 0x4000 | uVar71 >> 0x12) ^ (uVar71 * 0x2000000 | uVar71 >> 7))
            + uVar147 + auVar13._8_4_ +
            (uVar169 >> 10 ^
            (uVar169 * 0x2000 | uVar169 >> 0x13) ^ (uVar169 * 0x8000 | uVar169 >> 0x11));
  uVar133 = (uVar124 >> 3 ^
            (uVar124 * 0x4000 | uVar124 >> 0x12) ^ (uVar124 * 0x2000000 | uVar124 >> 7)) + uVar127 +
            auVar13._12_4_ +
            (uVar174 >> 10 ^
            (uVar174 * 0x2000 | uVar174 >> 0x13) ^ (uVar174 * 0x8000 | uVar174 >> 0x11));
  iVar43 = uVar92 + uVar155 + (uVar134 & uVar116 | ~uVar116 & uVar91) + 0x53380d13 +
           ((uVar116 * 0x80 | uVar116 >> 0x19) ^
           (uVar116 * 0x200000 | uVar116 >> 0xb) ^ (uVar116 * 0x4000000 | uVar116 >> 6));
  iVar49 = uVar96 + uVar82 + (uVar84 & uVar111 | ~uVar111 & uVar95) + 0x53380d13 +
           ((uVar111 * 0x80 | uVar111 >> 0x19) ^
           (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6));
  iVar52 = uVar68 + uVar105 + (uVar104 & uVar135 | ~uVar135 & uVar64) + 0x53380d13 +
           ((uVar135 * 0x80 | uVar135 >> 0x19) ^
           (uVar135 * 0x200000 | uVar135 >> 0xb) ^ (uVar135 * 0x4000000 | uVar135 >> 6));
  iVar55 = uVar99 + uVar133 + (uVar93 & uVar137 | ~uVar137 & uVar98) + 0x53380d13 +
           ((uVar137 * 0x80 | uVar137 >> 0x19) ^
           (uVar137 * 0x200000 | uVar137 >> 0xb) ^ (uVar137 * 0x4000000 | uVar137 >> 6));
  uVar60 = uVar60 + iVar43;
  uVar87 = uVar87 + iVar49;
  uVar65 = uVar65 + iVar52;
  uVar66 = uVar66 + iVar55;
  uVar61 = ((uVar148 | uVar51) & uVar131 | uVar148 & uVar51) +
           ((uVar148 * 0x400 | uVar148 >> 0x16) ^
           (uVar148 * 0x80000 | uVar148 >> 0xd) ^ (uVar148 * 0x40000000 | uVar148 >> 2)) + iVar43;
  uVar62 = ((uVar125 | uVar118) & uVar80 | uVar125 & uVar118) +
           ((uVar125 * 0x400 | uVar125 >> 0x16) ^
           (uVar125 * 0x80000 | uVar125 >> 0xd) ^ (uVar125 * 0x40000000 | uVar125 >> 2)) + iVar49;
  uVar92 = ((uVar145 | uVar126) & uVar160 | uVar145 & uVar126) +
           ((uVar145 * 0x400 | uVar145 >> 0x16) ^
           (uVar145 * 0x80000 | uVar145 >> 0xd) ^ (uVar145 * 0x40000000 | uVar145 >> 2)) + iVar52;
  uVar96 = ((uVar149 | uVar72) & uVar136 | uVar149 & uVar72) +
           ((uVar149 * 0x400 | uVar149 >> 0x16) ^
           (uVar149 * 0x80000 | uVar149 >> 0xd) ^ (uVar149 * 0x40000000 | uVar149 >> 2)) + iVar55;
  uVar144 = (uVar150 >> 3 ^
            (uVar150 * 0x4000 | uVar150 >> 0x12) ^ (uVar150 * 0x2000000 | uVar150 >> 7)) + uVar122 +
            uVar5 + (uVar157 >> 10 ^
                    (uVar157 * 0x2000 | uVar157 >> 0x13) ^ (uVar157 * 0x8000 | uVar157 >> 0x11));
  uVar147 = (uVar151 >> 3 ^
            (uVar151 * 0x4000 | uVar151 >> 0x12) ^ (uVar151 * 0x2000000 | uVar151 >> 7)) + uVar69 +
            uVar22 + (uVar159 >> 10 ^
                     (uVar159 * 0x2000 | uVar159 >> 0x13) ^ (uVar159 * 0x8000 | uVar159 >> 0x11));
  uVar127 = (uVar152 >> 3 ^
            (uVar152 * 0x4000 | uVar152 >> 0x12) ^ (uVar152 * 0x2000000 | uVar152 >> 7)) + uVar71 +
            uVar30 + (uVar162 >> 10 ^
                     (uVar162 * 0x2000 | uVar162 >> 0x13) ^ (uVar162 * 0x8000 | uVar162 >> 0x11));
  uVar153 = (uVar170 >> 3 ^
            (uVar170 * 0x4000 | uVar170 >> 0x12) ^ (uVar170 * 0x2000000 | uVar170 >> 7)) + uVar124 +
            uVar20 + (uVar164 >> 10 ^
                     (uVar164 * 0x2000 | uVar164 >> 0x13) ^ (uVar164 * 0x8000 | uVar164 >> 0x11));
  iVar43 = uVar91 + uVar144 + (uVar116 & uVar60 | ~uVar60 & uVar134) + 0x650a7354 +
           ((uVar60 * 0x80 | uVar60 >> 0x19) ^
           (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6));
  iVar49 = uVar95 + uVar147 + (uVar111 & uVar87 | ~uVar87 & uVar84) + 0x650a7354 +
           ((uVar87 * 0x80 | uVar87 >> 0x19) ^
           (uVar87 * 0x200000 | uVar87 >> 0xb) ^ (uVar87 * 0x4000000 | uVar87 >> 6));
  iVar52 = uVar64 + uVar127 + (uVar135 & uVar65 | ~uVar65 & uVar104) + 0x650a7354 +
           ((uVar65 * 0x80 | uVar65 >> 0x19) ^
           (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6));
  iVar55 = uVar98 + uVar153 + (uVar137 & uVar66 | ~uVar66 & uVar93) + 0x650a7354 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6));
  uVar131 = uVar131 + iVar43;
  uVar80 = uVar80 + iVar49;
  uVar160 = uVar160 + iVar52;
  uVar136 = uVar136 + iVar55;
  uVar154 = ((uVar61 | uVar148) & uVar51 | uVar61 & uVar148) +
            ((uVar61 * 0x400 | uVar61 >> 0x16) ^
            (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar43;
  uVar156 = ((uVar62 | uVar125) & uVar118 | uVar62 & uVar125) +
            ((uVar62 * 0x400 | uVar62 >> 0x16) ^
            (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar49;
  uVar158 = ((uVar92 | uVar145) & uVar126 | uVar92 & uVar145) +
            ((uVar92 * 0x400 | uVar92 >> 0x16) ^
            (uVar92 * 0x80000 | uVar92 >> 0xd) ^ (uVar92 * 0x40000000 | uVar92 >> 2)) + iVar52;
  uVar161 = ((uVar96 | uVar149) & uVar72 | uVar96 & uVar149) +
            ((uVar96 * 0x400 | uVar96 >> 0x16) ^
            (uVar96 * 0x80000 | uVar96 >> 0xd) ^ (uVar96 * 0x40000000 | uVar96 >> 2)) + iVar55;
  uVar68 = (uVar114 >> 3 ^
           (uVar114 * 0x4000 | uVar114 >> 0x12) ^ (uVar114 * 0x2000000 | uVar114 >> 7)) + uVar150 +
           uVar34 + (uVar155 >> 10 ^
                    (uVar155 * 0x2000 | uVar155 >> 0x13) ^ (uVar155 * 0x8000 | uVar155 >> 0x11));
  uVar99 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) +
           uVar151 + uVar50 +
           (uVar82 >> 10 ^ (uVar82 * 0x2000 | uVar82 >> 0x13) ^ (uVar82 * 0x8000 | uVar82 >> 0x11));
  uVar122 = (uVar54 >> 3 ^ (uVar54 * 0x4000 | uVar54 >> 0x12) ^ (uVar54 * 0x2000000 | uVar54 >> 7))
            + uVar152 + uVar56 +
            (uVar105 >> 10 ^
            (uVar105 * 0x2000 | uVar105 >> 0x13) ^ (uVar105 * 0x8000 | uVar105 >> 0x11));
  uVar71 = (uVar70 >> 3 ^ (uVar70 * 0x4000 | uVar70 >> 0x12) ^ (uVar70 * 0x2000000 | uVar70 >> 7)) +
           uVar170 + uVar59 +
           (uVar133 >> 10 ^
           (uVar133 * 0x2000 | uVar133 >> 0x13) ^ (uVar133 * 0x8000 | uVar133 >> 0x11));
  iVar43 = uVar134 + uVar68 + (uVar60 & uVar131 | ~uVar131 & uVar116) + 0x766a0abb +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6));
  iVar49 = uVar84 + uVar99 + (uVar87 & uVar80 | ~uVar80 & uVar111) + 0x766a0abb +
           ((uVar80 * 0x80 | uVar80 >> 0x19) ^
           (uVar80 * 0x200000 | uVar80 >> 0xb) ^ (uVar80 * 0x4000000 | uVar80 >> 6));
  iVar52 = uVar104 + uVar122 + (uVar65 & uVar160 | ~uVar160 & uVar135) + 0x766a0abb +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6));
  iVar55 = uVar93 + uVar71 + (uVar66 & uVar136 | ~uVar136 & uVar137) + 0x766a0abb +
           ((uVar136 * 0x80 | uVar136 >> 0x19) ^
           (uVar136 * 0x200000 | uVar136 >> 0xb) ^ (uVar136 * 0x4000000 | uVar136 >> 6));
  uVar51 = uVar51 + iVar43;
  uVar118 = uVar118 + iVar49;
  uVar126 = uVar126 + iVar52;
  uVar72 = uVar72 + iVar55;
  uVar91 = ((uVar154 | uVar61) & uVar148 | uVar154 & uVar61) +
           ((uVar154 * 0x400 | uVar154 >> 0x16) ^
           (uVar154 * 0x80000 | uVar154 >> 0xd) ^ (uVar154 * 0x40000000 | uVar154 >> 2)) + iVar43;
  uVar67 = ((uVar156 | uVar62) & uVar125 | uVar156 & uVar62) +
           ((uVar156 * 0x400 | uVar156 >> 0x16) ^
           (uVar156 * 0x80000 | uVar156 >> 0xd) ^ (uVar156 * 0x40000000 | uVar156 >> 2)) + iVar49;
  uVar57 = ((uVar158 | uVar92) & uVar145 | uVar158 & uVar92) +
           ((uVar158 * 0x400 | uVar158 >> 0x16) ^
           (uVar158 * 0x80000 | uVar158 >> 0xd) ^ (uVar158 * 0x40000000 | uVar158 >> 2)) + iVar52;
  uVar120 = ((uVar161 | uVar96) & uVar149 | uVar161 & uVar96) +
            ((uVar161 * 0x400 | uVar161 >> 0x16) ^
            (uVar161 * 0x80000 | uVar161 >> 0xd) ^ (uVar161 * 0x40000000 | uVar161 >> 2)) + iVar55;
  uVar132 = (uVar100 >> 3 ^
            (uVar100 * 0x4000 | uVar100 >> 0x12) ^ (iVar35 * 0x2000000 | uVar100 >> 7)) + uVar114 +
            uVar7 + (uVar144 >> 10 ^
                    (uVar144 * 0x2000 | uVar144 >> 0x13) ^ (uVar144 * 0x8000 | uVar144 >> 0x11));
  uVar119 = (uVar106 >> 3 ^
            (uVar106 * 0x4000 | uVar106 >> 0x12) ^ (iVar40 * 0x2000000 | uVar106 >> 7)) + uVar45 +
            uVar19 + (uVar147 >> 10 ^
                     (uVar147 * 0x2000 | uVar147 >> 0x13) ^ (uVar147 * 0x8000 | uVar147 >> 0x11));
  uVar115 = (uVar129 >> 3 ^
            (uVar129 * 0x4000 | uVar129 >> 0x12) ^ (iVar41 * 0x2000000 | uVar129 >> 7)) + uVar54 +
            uVar8 + (uVar127 >> 10 ^
                    (uVar127 * 0x2000 | uVar127 >> 0x13) ^ (uVar127 * 0x8000 | uVar127 >> 0x11));
  uVar138 = (uVar130 >> 3 ^
            (uVar130 * 0x4000 | uVar130 >> 0x12) ^ (iVar42 * 0x2000000 | uVar130 >> 7)) + uVar70 +
            uVar31 + (uVar153 >> 10 ^
                     (uVar153 * 0x2000 | uVar153 >> 0x13) ^ (uVar153 * 0x8000 | uVar153 >> 0x11));
  iVar43 = uVar116 + uVar132 + (uVar131 & uVar51 | ~uVar51 & uVar60) + -0x7e3d36d2 +
           ((uVar51 * 0x80 | uVar51 >> 0x19) ^
           (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6));
  iVar49 = uVar111 + uVar119 + (uVar80 & uVar118 | ~uVar118 & uVar87) + -0x7e3d36d2 +
           ((uVar118 * 0x80 | uVar118 >> 0x19) ^
           (uVar118 * 0x200000 | uVar118 >> 0xb) ^ (uVar118 * 0x4000000 | uVar118 >> 6));
  iVar52 = uVar135 + uVar115 + (uVar160 & uVar126 | ~uVar126 & uVar65) + -0x7e3d36d2 +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6));
  iVar55 = uVar137 + uVar138 + (uVar136 & uVar72 | ~uVar72 & uVar66) + -0x7e3d36d2 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6));
  uVar148 = uVar148 + iVar43;
  uVar125 = uVar125 + iVar49;
  uVar145 = uVar145 + iVar52;
  uVar149 = uVar149 + iVar55;
  uVar95 = ((uVar91 | uVar154) & uVar61 | uVar91 & uVar154) +
           ((uVar91 * 0x400 | uVar91 >> 0x16) ^
           (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2)) + iVar43;
  uVar114 = ((uVar67 | uVar156) & uVar62 | uVar67 & uVar156) +
            ((uVar67 * 0x400 | uVar67 >> 0x16) ^
            (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar49;
  uVar54 = ((uVar57 | uVar158) & uVar92 | uVar57 & uVar158) +
           ((uVar57 * 0x400 | uVar57 >> 0x16) ^
           (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar52;
  uVar58 = ((uVar120 | uVar161) & uVar96 | uVar120 & uVar161) +
           ((uVar120 * 0x400 | uVar120 >> 0x16) ^
           (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar55;
  uVar74 = (uVar2 >> 3 ^ (uVar2 * 0x4000 | uVar2 >> 0x12) ^ (uVar2 * 0x2000000 | uVar2 >> 7)) +
           uVar100 + uVar142 +
           (uVar68 >> 10 ^ (uVar68 * 0x2000 | uVar68 >> 0x13) ^ (uVar68 * 0x8000 | uVar68 >> 0x11));
  uVar134 = (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
            uVar106 + uVar123 +
            (uVar99 >> 10 ^ (uVar99 * 0x2000 | uVar99 >> 0x13) ^ (uVar99 * 0x8000 | uVar99 >> 0x11))
  ;
  uVar100 = (uVar21 >> 3 ^ (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7))
            + uVar129 + uVar143 +
            (uVar122 >> 10 ^
            (uVar122 * 0x2000 | uVar122 >> 0x13) ^ (uVar122 * 0x8000 | uVar122 >> 0x11));
  uVar112 = (uVar10 >> 3 ^ (uVar10 * 0x4000 | uVar10 >> 0x12) ^ (uVar10 * 0x2000000 | uVar10 >> 7))
            + uVar130 + uVar146 +
            (uVar71 >> 10 ^ (uVar71 * 0x2000 | uVar71 >> 0x13) ^ (uVar71 * 0x8000 | uVar71 >> 0x11))
  ;
  iVar43 = uVar60 + uVar74 + (uVar51 & uVar148 | ~uVar148 & uVar131) + -0x6d8dd37b +
           ((uVar148 * 0x80 | uVar148 >> 0x19) ^
           (uVar148 * 0x200000 | uVar148 >> 0xb) ^ (uVar148 * 0x4000000 | uVar148 >> 6));
  iVar49 = uVar87 + uVar134 + (uVar118 & uVar125 | ~uVar125 & uVar80) + -0x6d8dd37b +
           ((uVar125 * 0x80 | uVar125 >> 0x19) ^
           (uVar125 * 0x200000 | uVar125 >> 0xb) ^ (uVar125 * 0x4000000 | uVar125 >> 6));
  iVar52 = uVar65 + uVar100 + (uVar126 & uVar145 | ~uVar145 & uVar160) + -0x6d8dd37b +
           ((uVar145 * 0x80 | uVar145 >> 0x19) ^
           (uVar145 * 0x200000 | uVar145 >> 0xb) ^ (uVar145 * 0x4000000 | uVar145 >> 6));
  iVar55 = uVar66 + uVar112 + (uVar72 & uVar149 | ~uVar149 & uVar136) + -0x6d8dd37b +
           ((uVar149 * 0x80 | uVar149 >> 0x19) ^
           (uVar149 * 0x200000 | uVar149 >> 0xb) ^ (uVar149 * 0x4000000 | uVar149 >> 6));
  uVar61 = uVar61 + iVar43;
  uVar62 = uVar62 + iVar49;
  uVar92 = uVar92 + iVar52;
  uVar96 = uVar96 + iVar55;
  uVar65 = ((uVar95 | uVar91) & uVar154 | uVar95 & uVar91) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar66 = ((uVar114 | uVar67) & uVar156 | uVar114 & uVar67) +
           ((uVar114 * 0x400 | uVar114 >> 0x16) ^
           (uVar114 * 0x80000 | uVar114 >> 0xd) ^ (uVar114 * 0x40000000 | uVar114 >> 2)) + iVar49;
  uVar69 = ((uVar54 | uVar57) & uVar158 | uVar54 & uVar57) +
           ((uVar54 * 0x400 | uVar54 >> 0x16) ^
           (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar52;
  uVar124 = ((uVar58 | uVar120) & uVar161 | uVar58 & uVar120) +
            ((uVar58 * 0x400 | uVar58 >> 0x16) ^
            (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar55;
  uVar64 = (uVar163 >> 3 ^
           (uVar163 * 0x4000 | uVar163 >> 0x12) ^ (uVar163 * 0x2000000 | uVar163 >> 7)) + uVar2 +
           uVar166 + (uVar132 >> 10 ^
                     (uVar132 * 0x2000 | uVar132 >> 0x13) ^ (uVar132 * 0x8000 | uVar132 >> 0x11));
  uVar45 = (uVar165 >> 3 ^
           (uVar165 * 0x4000 | uVar165 >> 0x12) ^ (uVar165 * 0x2000000 | uVar165 >> 7)) + uVar9 +
           uVar168 + (uVar119 >> 10 ^
                     (uVar119 * 0x2000 | uVar119 >> 0x13) ^ (uVar119 * 0x8000 | uVar119 >> 0x11));
  uVar70 = (uVar167 >> 3 ^
           (uVar167 * 0x4000 | uVar167 >> 0x12) ^ (uVar167 * 0x2000000 | uVar167 >> 7)) + uVar21 +
           uVar169 + (uVar115 >> 10 ^
                     (uVar115 * 0x2000 | uVar115 >> 0x13) ^ (uVar115 * 0x8000 | uVar115 >> 0x11));
  uVar60 = (uVar171 >> 3 ^
           (uVar171 * 0x4000 | uVar171 >> 0x12) ^ (uVar171 * 0x2000000 | uVar171 >> 7)) + uVar10 +
           uVar174 + (uVar138 >> 10 ^
                     (uVar138 * 0x2000 | uVar138 >> 0x13) ^ (uVar138 * 0x8000 | uVar138 >> 0x11));
  iVar43 = uVar131 + uVar64 + (uVar148 & uVar61 | ~uVar61 & uVar51) + -0x5d40175f +
           ((uVar61 * 0x80 | uVar61 >> 0x19) ^
           (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6));
  iVar49 = uVar80 + uVar45 + (uVar125 & uVar62 | ~uVar62 & uVar118) + -0x5d40175f +
           ((uVar62 * 0x80 | uVar62 >> 0x19) ^
           (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6));
  iVar52 = uVar160 + uVar70 + (uVar145 & uVar92 | ~uVar92 & uVar126) + -0x5d40175f +
           ((uVar92 * 0x80 | uVar92 >> 0x19) ^
           (uVar92 * 0x200000 | uVar92 >> 0xb) ^ (uVar92 * 0x4000000 | uVar92 >> 6));
  iVar55 = uVar136 + uVar60 + (uVar149 & uVar96 | ~uVar96 & uVar72) + -0x5d40175f +
           ((uVar96 * 0x80 | uVar96 >> 0x19) ^
           (uVar96 * 0x200000 | uVar96 >> 0xb) ^ (uVar96 * 0x4000000 | uVar96 >> 6));
  uVar154 = uVar154 + iVar43;
  uVar156 = uVar156 + iVar49;
  uVar158 = uVar158 + iVar52;
  uVar161 = uVar161 + iVar55;
  uVar2 = ((uVar65 | uVar95) & uVar91 | uVar65 & uVar95) +
          ((uVar65 * 0x400 | uVar65 >> 0x16) ^
          (uVar65 * 0x80000 | uVar65 >> 0xd) ^ (uVar65 * 0x40000000 | uVar65 >> 2)) + iVar43;
  uVar150 = ((uVar66 | uVar114) & uVar67 | uVar66 & uVar114) +
            ((uVar66 * 0x400 | uVar66 >> 0x16) ^
            (uVar66 * 0x80000 | uVar66 >> 0xd) ^ (uVar66 * 0x40000000 | uVar66 >> 2)) + iVar49;
  uVar151 = ((uVar69 | uVar54) & uVar57 | uVar69 & uVar54) +
            ((uVar69 * 0x400 | uVar69 >> 0x16) ^
            (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar52;
  uVar152 = ((uVar124 | uVar58) & uVar120 | uVar124 & uVar58) +
            ((uVar124 * 0x400 | uVar124 >> 0x16) ^
            (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar55;
  uVar131 = (uVar23 >> 3 ^ (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7))
            + uVar163 + uVar157 +
            (uVar74 >> 10 ^ (uVar74 * 0x2000 | uVar74 >> 0x13) ^ (uVar74 * 0x8000 | uVar74 >> 0x11))
  ;
  uVar84 = (uVar44 >> 3 ^ (uVar44 * 0x4000 | uVar44 >> 0x12) ^ (uVar44 * 0x2000000 | uVar44 >> 7)) +
           uVar165 + uVar159 +
           (uVar134 >> 10 ^
           (uVar134 * 0x2000 | uVar134 >> 0x13) ^ (uVar134 * 0x8000 | uVar134 >> 0x11));
  uVar106 = (uVar53 >> 3 ^ (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7))
            + uVar167 + uVar162 +
            (uVar100 >> 10 ^
            (uVar100 * 0x2000 | uVar100 >> 0x13) ^ (uVar100 * 0x8000 | uVar100 >> 0x11));
  uVar128 = (uVar86 >> 3 ^ (uVar86 * 0x4000 | uVar86 >> 0x12) ^ (uVar86 * 0x2000000 | uVar86 >> 7))
            + uVar171 + uVar164 +
            (uVar112 >> 10 ^
            (uVar112 * 0x2000 | uVar112 >> 0x13) ^ (uVar112 * 0x8000 | uVar112 >> 0x11));
  iVar43 = uVar51 + uVar131 + (uVar61 & uVar154 | ~uVar154 & uVar148) + -0x57e599b5 +
           ((uVar154 * 0x80 | uVar154 >> 0x19) ^
           (uVar154 * 0x200000 | uVar154 >> 0xb) ^ (uVar154 * 0x4000000 | uVar154 >> 6));
  iVar49 = uVar118 + uVar84 + (uVar62 & uVar156 | ~uVar156 & uVar125) + -0x57e599b5 +
           ((uVar156 * 0x80 | uVar156 >> 0x19) ^
           (uVar156 * 0x200000 | uVar156 >> 0xb) ^ (uVar156 * 0x4000000 | uVar156 >> 6));
  iVar52 = uVar126 + uVar106 + (uVar92 & uVar158 | ~uVar158 & uVar145) + -0x57e599b5 +
           ((uVar158 * 0x80 | uVar158 >> 0x19) ^
           (uVar158 * 0x200000 | uVar158 >> 0xb) ^ (uVar158 * 0x4000000 | uVar158 >> 6));
  iVar55 = uVar72 + uVar128 + (uVar96 & uVar161 | ~uVar161 & uVar149) + -0x57e599b5 +
           ((uVar161 * 0x80 | uVar161 >> 0x19) ^
           (uVar161 * 0x200000 | uVar161 >> 0xb) ^ (uVar161 * 0x4000000 | uVar161 >> 6));
  uVar91 = uVar91 + iVar43;
  uVar67 = uVar67 + iVar49;
  uVar57 = uVar57 + iVar52;
  uVar120 = uVar120 + iVar55;
  uVar111 = ((uVar2 | uVar65) & uVar95 | uVar2 & uVar65) +
            ((uVar2 * 0x400 | uVar2 >> 0x16) ^
            (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar43;
  uVar135 = ((uVar150 | uVar66) & uVar114 | uVar150 & uVar66) +
            ((uVar150 * 0x400 | uVar150 >> 0x16) ^
            (uVar150 * 0x80000 | uVar150 >> 0xd) ^ (uVar150 * 0x40000000 | uVar150 >> 2)) + iVar49;
  uVar137 = ((uVar151 | uVar69) & uVar54 | uVar151 & uVar69) +
            ((uVar151 * 0x400 | uVar151 >> 0x16) ^
            (uVar151 * 0x80000 | uVar151 >> 0xd) ^ (uVar151 * 0x40000000 | uVar151 >> 2)) + iVar52;
  uVar139 = ((uVar152 | uVar124) & uVar58 | uVar152 & uVar124) +
            ((uVar152 * 0x400 | uVar152 >> 0x16) ^
            (uVar152 * 0x80000 | uVar152 >> 0xd) ^ (uVar152 * 0x40000000 | uVar152 >> 2)) + iVar55;
  uVar98 = (uVar4 >> 3 ^ (uVar4 * 0x4000 | uVar4 >> 0x12) ^ (uVar4 * 0x2000000 | uVar4 >> 7)) +
           uVar23 + uVar155 +
           (uVar64 >> 10 ^ (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
  uVar51 = (uVar18 >> 3 ^ (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)) +
           uVar44 + uVar82 +
           (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  uVar118 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7))
            + uVar53 + uVar105 +
            (uVar70 >> 10 ^ (uVar70 * 0x2000 | uVar70 >> 0x13) ^ (uVar70 * 0x8000 | uVar70 >> 0x11))
  ;
  uVar87 = (uVar33 >> 3 ^ (uVar33 * 0x4000 | uVar33 >> 0x12) ^ (uVar33 * 0x2000000 | uVar33 >> 7)) +
           uVar86 + uVar133 +
           (uVar60 >> 10 ^ (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
  iVar43 = uVar148 + uVar98 + (uVar154 & uVar91 | ~uVar91 & uVar61) + -0x3db47490 +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  iVar49 = uVar125 + uVar51 + (uVar156 & uVar67 | ~uVar67 & uVar62) + -0x3db47490 +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  iVar52 = uVar145 + uVar118 + (uVar158 & uVar57 | ~uVar57 & uVar92) + -0x3db47490 +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  iVar55 = uVar149 + uVar87 + (uVar161 & uVar120 | ~uVar120 & uVar96) + -0x3db47490 +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  uVar95 = uVar95 + iVar43;
  uVar114 = uVar114 + iVar49;
  uVar54 = uVar54 + iVar52;
  uVar58 = uVar58 + iVar55;
  uVar23 = ((uVar111 | uVar2) & uVar65 | uVar111 & uVar2) +
           ((uVar111 * 0x400 | uVar111 >> 0x16) ^
           (uVar111 * 0x80000 | uVar111 >> 0xd) ^ (uVar111 * 0x40000000 | uVar111 >> 2)) + iVar43;
  uVar44 = ((uVar135 | uVar150) & uVar66 | uVar135 & uVar150) +
           ((uVar135 * 0x400 | uVar135 >> 0x16) ^
           (uVar135 * 0x80000 | uVar135 >> 0xd) ^ (uVar135 * 0x40000000 | uVar135 >> 2)) + iVar49;
  uVar53 = ((uVar137 | uVar151) & uVar69 | uVar137 & uVar151) +
           ((uVar137 * 0x400 | uVar137 >> 0x16) ^
           (uVar137 * 0x80000 | uVar137 >> 0xd) ^ (uVar137 * 0x40000000 | uVar137 >> 2)) + iVar52;
  uVar86 = ((uVar139 | uVar152) & uVar124 | uVar139 & uVar152) +
           ((uVar139 * 0x400 | uVar139 >> 0x16) ^
           (uVar139 * 0x80000 | uVar139 >> 0xd) ^ (uVar139 * 0x40000000 | uVar139 >> 2)) + iVar55;
  uVar80 = (auVar13._0_4_ >> 3 ^
           (auVar13._0_4_ * 0x4000 | auVar13._0_4_ >> 0x12) ^
           (auVar13._0_4_ * 0x2000000 | auVar13._0_4_ >> 7)) + uVar4 + uVar144 +
           (uVar131 >> 10 ^
           (uVar131 * 0x2000 | uVar131 >> 0x13) ^ (uVar131 * 0x8000 | uVar131 >> 0x11));
  uVar104 = (auVar13._4_4_ >> 3 ^
            (auVar13._4_4_ * 0x4000 | auVar13._4_4_ >> 0x12) ^
            (auVar13._4_4_ * 0x2000000 | auVar13._4_4_ >> 7)) + uVar18 + uVar147 +
            (uVar84 >> 10 ^ (uVar84 * 0x2000 | uVar84 >> 0x13) ^ (uVar84 * 0x8000 | uVar84 >> 0x11))
  ;
  uVar129 = (auVar13._8_4_ >> 3 ^
            (auVar13._8_4_ * 0x4000 | auVar13._8_4_ >> 0x12) ^
            (auVar13._8_4_ * 0x2000000 | auVar13._8_4_ >> 7)) + uVar29 + uVar127 +
            (uVar106 >> 10 ^
            (uVar106 * 0x2000 | uVar106 >> 0x13) ^ (uVar106 * 0x8000 | uVar106 >> 0x11));
  uVar136 = (auVar13._12_4_ >> 3 ^
            (auVar13._12_4_ * 0x4000 | auVar13._12_4_ >> 0x12) ^
            (auVar13._12_4_ * 0x2000000 | auVar13._12_4_ >> 7)) + uVar33 + uVar153 +
            (uVar128 >> 10 ^
            (uVar128 * 0x2000 | uVar128 >> 0x13) ^ (uVar128 * 0x8000 | uVar128 >> 0x11));
  iVar43 = uVar61 + uVar80 + (uVar91 & uVar95 | ~uVar95 & uVar154) + -0x3893ae5d +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar49 = uVar62 + uVar104 + (uVar67 & uVar114 | ~uVar114 & uVar156) + -0x3893ae5d +
           ((uVar114 * 0x80 | uVar114 >> 0x19) ^
           (uVar114 * 0x200000 | uVar114 >> 0xb) ^ (uVar114 * 0x4000000 | uVar114 >> 6));
  iVar52 = uVar92 + uVar129 + (uVar57 & uVar54 | ~uVar54 & uVar158) + -0x3893ae5d +
           ((uVar54 * 0x80 | uVar54 >> 0x19) ^
           (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6));
  iVar55 = uVar96 + uVar136 + (uVar120 & uVar58 | ~uVar58 & uVar161) + -0x3893ae5d +
           ((uVar58 * 0x80 | uVar58 >> 0x19) ^
           (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6));
  uVar65 = uVar65 + iVar43;
  uVar66 = uVar66 + iVar49;
  uVar69 = uVar69 + iVar52;
  uVar124 = uVar124 + iVar55;
  uVar148 = ((uVar23 | uVar111) & uVar2 | uVar23 & uVar111) +
            ((uVar23 * 0x400 | uVar23 >> 0x16) ^
            (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar125 = ((uVar44 | uVar135) & uVar150 | uVar44 & uVar135) +
            ((uVar44 * 0x400 | uVar44 >> 0x16) ^
            (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar49;
  uVar145 = ((uVar53 | uVar137) & uVar151 | uVar53 & uVar137) +
            ((uVar53 * 0x400 | uVar53 >> 0x16) ^
            (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar52;
  uVar149 = ((uVar86 | uVar139) & uVar152 | uVar86 & uVar139) +
            ((uVar86 * 0x400 | uVar86 >> 0x16) ^
            (uVar86 * 0x80000 | uVar86 >> 0xd) ^ (uVar86 * 0x40000000 | uVar86 >> 2)) + iVar55;
  uVar167 = (uVar5 >> 3 ^ (uVar5 * 0x4000 | uVar5 >> 0x12) ^ (uVar5 * 0x2000000 | uVar5 >> 7)) +
            auVar13._0_4_ + uVar68 +
            (uVar98 >> 10 ^ (uVar98 * 0x2000 | uVar98 >> 0x13) ^ (uVar98 * 0x8000 | uVar98 >> 0x11))
  ;
  uVar170 = (uVar22 >> 3 ^ (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7))
            + auVar13._4_4_ + uVar99 +
            (uVar51 >> 10 ^ (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11))
  ;
  uVar171 = (uVar30 >> 3 ^ (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7))
            + auVar13._8_4_ + uVar122 +
            (uVar118 >> 10 ^
            (uVar118 * 0x2000 | uVar118 >> 0x13) ^ (uVar118 * 0x8000 | uVar118 >> 0x11));
  uVar175 = (uVar20 >> 3 ^ (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7))
            + auVar13._12_4_ + uVar71 +
            (uVar87 >> 10 ^ (uVar87 * 0x2000 | uVar87 >> 0x13) ^ (uVar87 * 0x8000 | uVar87 >> 0x11))
  ;
  iVar43 = uVar154 + uVar167 + (uVar95 & uVar65 | ~uVar65 & uVar91) + -0x2e6d17e7 +
           ((uVar65 * 0x80 | uVar65 >> 0x19) ^
           (uVar65 * 0x200000 | uVar65 >> 0xb) ^ (uVar65 * 0x4000000 | uVar65 >> 6));
  iVar49 = uVar156 + uVar170 + (uVar114 & uVar66 | ~uVar66 & uVar67) + -0x2e6d17e7 +
           ((uVar66 * 0x80 | uVar66 >> 0x19) ^
           (uVar66 * 0x200000 | uVar66 >> 0xb) ^ (uVar66 * 0x4000000 | uVar66 >> 6));
  iVar52 = uVar158 + uVar171 + (uVar54 & uVar69 | ~uVar69 & uVar57) + -0x2e6d17e7 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6));
  iVar55 = uVar161 + uVar175 + (uVar58 & uVar124 | ~uVar124 & uVar120) + -0x2e6d17e7 +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar150 = uVar150 + iVar49;
  uVar151 = uVar151 + iVar52;
  uVar152 = uVar152 + iVar55;
  uVar160 = ((uVar148 | uVar23) & uVar111 | uVar148 & uVar23) +
            ((uVar148 * 0x400 | uVar148 >> 0x16) ^
            (uVar148 * 0x80000 | uVar148 >> 0xd) ^ (uVar148 * 0x40000000 | uVar148 >> 2)) + iVar43;
  uVar93 = ((uVar125 | uVar44) & uVar135 | uVar125 & uVar44) +
           ((uVar125 * 0x400 | uVar125 >> 0x16) ^
           (uVar125 * 0x80000 | uVar125 >> 0xd) ^ (uVar125 * 0x40000000 | uVar125 >> 2)) + iVar49;
  uVar130 = ((uVar145 | uVar53) & uVar137 | uVar145 & uVar53) +
            ((uVar145 * 0x400 | uVar145 >> 0x16) ^
            (uVar145 * 0x80000 | uVar145 >> 0xd) ^ (uVar145 * 0x40000000 | uVar145 >> 2)) + iVar52;
  uVar116 = ((uVar149 | uVar86) & uVar139 | uVar149 & uVar86) +
            ((uVar149 * 0x400 | uVar149 >> 0x16) ^
            (uVar149 * 0x80000 | uVar149 >> 0xd) ^ (uVar149 * 0x40000000 | uVar149 >> 2)) + iVar55;
  uVar9 = (uVar34 >> 3 ^ (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7)) +
          uVar5 + uVar132 +
          (uVar80 >> 10 ^ (uVar80 * 0x2000 | uVar80 >> 0x13) ^ (uVar80 * 0x8000 | uVar80 >> 0x11));
  uVar21 = (uVar50 >> 3 ^ (uVar50 * 0x4000 | uVar50 >> 0x12) ^ (uVar50 * 0x2000000 | uVar50 >> 7)) +
           uVar22 + uVar119 +
           (uVar104 >> 10 ^
           (uVar104 * 0x2000 | uVar104 >> 0x13) ^ (uVar104 * 0x8000 | uVar104 >> 0x11));
  uVar30 = (uVar56 >> 3 ^ (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) +
           uVar30 + uVar115 +
           (uVar129 >> 10 ^
           (uVar129 * 0x2000 | uVar129 >> 0x13) ^ (uVar129 * 0x8000 | uVar129 >> 0x11));
  uVar33 = (uVar59 >> 3 ^ (uVar59 * 0x4000 | uVar59 >> 0x12) ^ (uVar59 * 0x2000000 | uVar59 >> 7)) +
           uVar20 + uVar138 +
           (uVar136 >> 10 ^
           (uVar136 * 0x2000 | uVar136 >> 0x13) ^ (uVar136 * 0x8000 | uVar136 >> 0x11));
  iVar43 = uVar91 + uVar9 + (uVar65 & uVar2 | ~uVar2 & uVar95) + -0x2966f9dc +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = uVar67 + uVar21 + (uVar66 & uVar150 | ~uVar150 & uVar114) + -0x2966f9dc +
           ((uVar150 * 0x80 | uVar150 >> 0x19) ^
           (uVar150 * 0x200000 | uVar150 >> 0xb) ^ (uVar150 * 0x4000000 | uVar150 >> 6));
  iVar52 = uVar57 + uVar30 + (uVar69 & uVar151 | ~uVar151 & uVar54) + -0x2966f9dc +
           ((uVar151 * 0x80 | uVar151 >> 0x19) ^
           (uVar151 * 0x200000 | uVar151 >> 0xb) ^ (uVar151 * 0x4000000 | uVar151 >> 6));
  iVar55 = uVar120 + uVar33 + (uVar124 & uVar152 | ~uVar152 & uVar58) + -0x2966f9dc +
           ((uVar152 * 0x80 | uVar152 >> 0x19) ^
           (uVar152 * 0x200000 | uVar152 >> 0xb) ^ (uVar152 * 0x4000000 | uVar152 >> 6));
  uVar111 = uVar111 + iVar43;
  uVar135 = uVar135 + iVar49;
  uVar137 = uVar137 + iVar52;
  uVar139 = uVar139 + iVar55;
  uVar91 = ((uVar160 | uVar148) & uVar23 | uVar160 & uVar148) +
           ((uVar160 * 0x400 | uVar160 >> 0x16) ^
           (uVar160 * 0x80000 | uVar160 >> 0xd) ^ (uVar160 * 0x40000000 | uVar160 >> 2)) + iVar43;
  uVar67 = ((uVar93 | uVar125) & uVar44 | uVar93 & uVar125) +
           ((uVar93 * 0x400 | uVar93 >> 0x16) ^
           (uVar93 * 0x80000 | uVar93 >> 0xd) ^ (uVar93 * 0x40000000 | uVar93 >> 2)) + iVar49;
  uVar57 = ((uVar130 | uVar145) & uVar53 | uVar130 & uVar145) +
           ((uVar130 * 0x400 | uVar130 >> 0x16) ^
           (uVar130 * 0x80000 | uVar130 >> 0xd) ^ (uVar130 * 0x40000000 | uVar130 >> 2)) + iVar52;
  uVar120 = ((uVar116 | uVar149) & uVar86 | uVar116 & uVar149) +
            ((uVar116 * 0x400 | uVar116 >> 0x16) ^
            (uVar116 * 0x80000 | uVar116 >> 0xd) ^ (uVar116 * 0x40000000 | uVar116 >> 2)) + iVar55;
  uVar18 = (uVar7 >> 3 ^ (uVar7 * 0x4000 | uVar7 >> 0x12) ^ (uVar7 * 0x2000000 | uVar7 >> 7)) +
           uVar34 + uVar74 +
           (uVar167 >> 10 ^
           (uVar167 * 0x2000 | uVar167 >> 0x13) ^ (uVar167 * 0x8000 | uVar167 >> 0x11));
  uVar29 = (uVar19 >> 3 ^ (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) +
           uVar50 + uVar134 +
           (uVar170 >> 10 ^
           (uVar170 * 0x2000 | uVar170 >> 0x13) ^ (uVar170 * 0x8000 | uVar170 >> 0x11));
  uVar10 = (uVar8 >> 3 ^ (uVar8 * 0x4000 | uVar8 >> 0x12) ^ (uVar8 * 0x2000000 | uVar8 >> 7)) +
           uVar56 + uVar100 +
           (uVar171 >> 10 ^
           (uVar171 * 0x2000 | uVar171 >> 0x13) ^ (uVar171 * 0x8000 | uVar171 >> 0x11));
  uVar20 = (uVar31 >> 3 ^ (uVar31 * 0x4000 | uVar31 >> 0x12) ^ (uVar31 * 0x2000000 | uVar31 >> 7)) +
           uVar59 + uVar112 +
           (uVar175 >> 10 ^
           (uVar175 * 0x2000 | uVar175 >> 0x13) ^ (uVar175 * 0x8000 | uVar175 >> 0x11));
  iVar43 = uVar95 + uVar18 + (uVar2 & uVar111 | ~uVar111 & uVar65) + -0xbf1ca7b +
           ((uVar111 * 0x80 | uVar111 >> 0x19) ^
           (uVar111 * 0x200000 | uVar111 >> 0xb) ^ (uVar111 * 0x4000000 | uVar111 >> 6));
  iVar49 = uVar114 + uVar29 + (uVar150 & uVar135 | ~uVar135 & uVar66) + -0xbf1ca7b +
           ((uVar135 * 0x80 | uVar135 >> 0x19) ^
           (uVar135 * 0x200000 | uVar135 >> 0xb) ^ (uVar135 * 0x4000000 | uVar135 >> 6));
  iVar52 = uVar54 + uVar10 + (uVar151 & uVar137 | ~uVar137 & uVar69) + -0xbf1ca7b +
           ((uVar137 * 0x80 | uVar137 >> 0x19) ^
           (uVar137 * 0x200000 | uVar137 >> 0xb) ^ (uVar137 * 0x4000000 | uVar137 >> 6));
  iVar55 = uVar58 + uVar20 + (uVar152 & uVar139 | ~uVar139 & uVar124) + -0xbf1ca7b +
           ((uVar139 * 0x80 | uVar139 >> 0x19) ^
           (uVar139 * 0x200000 | uVar139 >> 0xb) ^ (uVar139 * 0x4000000 | uVar139 >> 6));
  uVar23 = uVar23 + iVar43;
  uVar44 = uVar44 + iVar49;
  uVar53 = uVar53 + iVar52;
  uVar86 = uVar86 + iVar55;
  uVar95 = ((uVar91 | uVar160) & uVar148 | uVar91 & uVar160) +
           ((uVar91 * 0x400 | uVar91 >> 0x16) ^
           (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2)) + iVar43;
  uVar114 = ((uVar67 | uVar93) & uVar125 | uVar67 & uVar93) +
            ((uVar67 * 0x400 | uVar67 >> 0x16) ^
            (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar49;
  uVar154 = ((uVar57 | uVar130) & uVar145 | uVar57 & uVar130) +
            ((uVar57 * 0x400 | uVar57 >> 0x16) ^
            (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar52;
  uVar156 = ((uVar120 | uVar116) & uVar149 | uVar120 & uVar116) +
            ((uVar120 * 0x400 | uVar120 >> 0x16) ^
            (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar55;
  uVar158 = (uVar142 >> 3 ^
            (uVar142 * 0x4000 | uVar142 >> 0x12) ^ (uVar142 * 0x2000000 | uVar142 >> 7)) + uVar7 +
            uVar64 + (uVar9 >> 10 ^
                     (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
  uVar161 = (uVar123 >> 3 ^
            (uVar123 * 0x4000 | uVar123 >> 0x12) ^ (uVar123 * 0x2000000 | uVar123 >> 7)) + uVar19 +
            uVar45 + (uVar21 >> 10 ^
                     (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11));
  uVar163 = (uVar143 >> 3 ^
            (uVar143 * 0x4000 | uVar143 >> 0x12) ^ (uVar143 * 0x2000000 | uVar143 >> 7)) + uVar8 +
            uVar70 + (uVar30 >> 10 ^
                     (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11));
  uVar165 = (uVar146 >> 3 ^
            (uVar146 * 0x4000 | uVar146 >> 0x12) ^ (uVar146 * 0x2000000 | uVar146 >> 7)) + uVar31 +
            uVar60 + (uVar33 >> 10 ^
                     (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11));
  iVar43 = uVar65 + uVar158 + (uVar111 & uVar23 | ~uVar23 & uVar2) + 0x106aa070 +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar49 = uVar66 + uVar161 + (uVar135 & uVar44 | ~uVar44 & uVar150) + 0x106aa070 +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar52 = uVar69 + uVar163 + (uVar137 & uVar53 | ~uVar53 & uVar151) + 0x106aa070 +
           ((uVar53 * 0x80 | uVar53 >> 0x19) ^
           (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6));
  iVar55 = uVar124 + uVar165 + (uVar139 & uVar86 | ~uVar86 & uVar152) + 0x106aa070 +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  uVar148 = uVar148 + iVar43;
  uVar125 = uVar125 + iVar49;
  uVar145 = uVar145 + iVar52;
  uVar149 = uVar149 + iVar55;
  uVar69 = ((uVar95 | uVar91) & uVar160 | uVar95 & uVar91) +
           ((uVar95 * 0x400 | uVar95 >> 0x16) ^
           (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar43;
  uVar124 = ((uVar114 | uVar67) & uVar93 | uVar114 & uVar67) +
            ((uVar114 * 0x400 | uVar114 >> 0x16) ^
            (uVar114 * 0x80000 | uVar114 >> 0xd) ^ (uVar114 * 0x40000000 | uVar114 >> 2)) + iVar49;
  uVar126 = ((uVar154 | uVar57) & uVar130 | uVar154 & uVar57) +
            ((uVar154 * 0x400 | uVar154 >> 0x16) ^
            (uVar154 * 0x80000 | uVar154 >> 0xd) ^ (uVar154 * 0x40000000 | uVar154 >> 2)) + iVar52;
  uVar72 = ((uVar156 | uVar120) & uVar116 | uVar156 & uVar120) +
           ((uVar156 * 0x400 | uVar156 >> 0x16) ^
           (uVar156 * 0x80000 | uVar156 >> 0xd) ^ (uVar156 * 0x40000000 | uVar156 >> 2)) + iVar55;
  uVar65 = (uVar166 >> 3 ^
           (uVar166 * 0x4000 | uVar166 >> 0x12) ^ (uVar166 * 0x2000000 | uVar166 >> 7)) + uVar142 +
           uVar131 + (uVar18 >> 10 ^
                     (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
  uVar92 = (uVar168 >> 3 ^
           (uVar168 * 0x4000 | uVar168 >> 0x12) ^ (uVar168 * 0x2000000 | uVar168 >> 7)) + uVar123 +
           uVar84 + (uVar29 >> 10 ^
                    (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11));
  uVar66 = (uVar169 >> 3 ^
           (uVar169 * 0x4000 | uVar169 >> 0x12) ^ (uVar169 * 0x2000000 | uVar169 >> 7)) + uVar143 +
           uVar106 + (uVar10 >> 10 ^
                     (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
  uVar96 = (uVar174 >> 3 ^
           (uVar174 * 0x4000 | uVar174 >> 0x12) ^ (uVar174 * 0x2000000 | uVar174 >> 7)) + uVar146 +
           uVar128 + (uVar20 >> 10 ^
                     (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
  iVar43 = uVar2 + uVar65 + (uVar23 & uVar148 | ~uVar148 & uVar111) + 0x19a4c116 +
           ((uVar148 * 0x80 | uVar148 >> 0x19) ^
           (uVar148 * 0x200000 | uVar148 >> 0xb) ^ (uVar148 * 0x4000000 | uVar148 >> 6));
  iVar49 = uVar150 + uVar92 + (uVar44 & uVar125 | ~uVar125 & uVar135) + 0x19a4c116 +
           ((uVar125 * 0x80 | uVar125 >> 0x19) ^
           (uVar125 * 0x200000 | uVar125 >> 0xb) ^ (uVar125 * 0x4000000 | uVar125 >> 6));
  iVar52 = uVar151 + uVar66 + (uVar53 & uVar145 | ~uVar145 & uVar137) + 0x19a4c116 +
           ((uVar145 * 0x80 | uVar145 >> 0x19) ^
           (uVar145 * 0x200000 | uVar145 >> 0xb) ^ (uVar145 * 0x4000000 | uVar145 >> 6));
  iVar55 = uVar152 + uVar96 + (uVar86 & uVar149 | ~uVar149 & uVar139) + 0x19a4c116 +
           ((uVar149 * 0x80 | uVar149 >> 0x19) ^
           (uVar149 * 0x200000 | uVar149 >> 0xb) ^ (uVar149 * 0x4000000 | uVar149 >> 6));
  uVar160 = uVar160 + iVar43;
  uVar93 = uVar93 + iVar49;
  uVar130 = uVar130 + iVar52;
  uVar116 = uVar116 + iVar55;
  uVar150 = ((uVar69 | uVar95) & uVar91 | uVar69 & uVar95) +
            ((uVar69 * 0x400 | uVar69 >> 0x16) ^
            (uVar69 * 0x80000 | uVar69 >> 0xd) ^ (uVar69 * 0x40000000 | uVar69 >> 2)) + iVar43;
  uVar151 = ((uVar124 | uVar114) & uVar67 | uVar124 & uVar114) +
            ((uVar124 * 0x400 | uVar124 >> 0x16) ^
            (uVar124 * 0x80000 | uVar124 >> 0xd) ^ (uVar124 * 0x40000000 | uVar124 >> 2)) + iVar49;
  uVar152 = ((uVar126 | uVar154) & uVar57 | uVar126 & uVar154) +
            ((uVar126 * 0x400 | uVar126 >> 0x16) ^
            (uVar126 * 0x80000 | uVar126 >> 0xd) ^ (uVar126 * 0x40000000 | uVar126 >> 2)) + iVar52;
  uVar176 = ((uVar72 | uVar156) & uVar120 | uVar72 & uVar156) +
            ((uVar72 * 0x400 | uVar72 >> 0x16) ^
            (uVar72 * 0x80000 | uVar72 >> 0xd) ^ (uVar72 * 0x40000000 | uVar72 >> 2)) + iVar55;
  uVar2 = (uVar157 >> 3 ^
          (uVar157 * 0x4000 | uVar157 >> 0x12) ^ (uVar157 * 0x2000000 | uVar157 >> 7)) + uVar166 +
          uVar98 + (uVar158 >> 10 ^
                   (uVar158 * 0x2000 | uVar158 >> 0x13) ^ (uVar158 * 0x8000 | uVar158 >> 0x11));
  uVar4 = (uVar159 >> 3 ^
          (uVar159 * 0x4000 | uVar159 >> 0x12) ^ (uVar159 * 0x2000000 | uVar159 >> 7)) + uVar168 +
          uVar51 + (uVar161 >> 10 ^
                   (uVar161 * 0x2000 | uVar161 >> 0x13) ^ (uVar161 * 0x8000 | uVar161 >> 0x11));
  uVar5 = (uVar162 >> 3 ^
          (uVar162 * 0x4000 | uVar162 >> 0x12) ^ (uVar162 * 0x2000000 | uVar162 >> 7)) + uVar169 +
          uVar118 + (uVar163 >> 10 ^
                    (uVar163 * 0x2000 | uVar163 >> 0x13) ^ (uVar163 * 0x8000 | uVar163 >> 0x11));
  uVar7 = (uVar164 >> 3 ^
          (uVar164 * 0x4000 | uVar164 >> 0x12) ^ (uVar164 * 0x2000000 | uVar164 >> 7)) + uVar174 +
          uVar87 + (uVar165 >> 10 ^
                   (uVar165 * 0x2000 | uVar165 >> 0x13) ^ (uVar165 * 0x8000 | uVar165 >> 0x11));
  iVar43 = uVar111 + uVar2 + (uVar148 & uVar160 | ~uVar160 & uVar23) + 0x1e376c08 +
           ((uVar160 * 0x80 | uVar160 >> 0x19) ^
           (uVar160 * 0x200000 | uVar160 >> 0xb) ^ (uVar160 * 0x4000000 | uVar160 >> 6));
  iVar49 = uVar135 + uVar4 + (uVar125 & uVar93 | ~uVar93 & uVar44) + 0x1e376c08 +
           ((uVar93 * 0x80 | uVar93 >> 0x19) ^
           (uVar93 * 0x200000 | uVar93 >> 0xb) ^ (uVar93 * 0x4000000 | uVar93 >> 6));
  iVar52 = uVar137 + uVar5 + (uVar145 & uVar130 | ~uVar130 & uVar53) + 0x1e376c08 +
           ((uVar130 * 0x80 | uVar130 >> 0x19) ^
           (uVar130 * 0x200000 | uVar130 >> 0xb) ^ (uVar130 * 0x4000000 | uVar130 >> 6));
  iVar55 = uVar139 + uVar7 + (uVar149 & uVar116 | ~uVar116 & uVar86) + 0x1e376c08 +
           ((uVar116 * 0x80 | uVar116 >> 0x19) ^
           (uVar116 * 0x200000 | uVar116 >> 0xb) ^ (uVar116 * 0x4000000 | uVar116 >> 6));
  uVar91 = uVar91 + iVar43;
  uVar67 = uVar67 + iVar49;
  uVar57 = uVar57 + iVar52;
  uVar120 = uVar120 + iVar55;
  uVar54 = ((uVar150 | uVar69) & uVar95 | uVar150 & uVar69) +
           ((uVar150 * 0x400 | uVar150 >> 0x16) ^
           (uVar150 * 0x80000 | uVar150 >> 0xd) ^ (uVar150 * 0x40000000 | uVar150 >> 2)) + iVar43;
  uVar58 = ((uVar151 | uVar124) & uVar114 | uVar151 & uVar124) +
           ((uVar151 * 0x400 | uVar151 >> 0x16) ^
           (uVar151 * 0x80000 | uVar151 >> 0xd) ^ (uVar151 * 0x40000000 | uVar151 >> 2)) + iVar49;
  uVar61 = ((uVar152 | uVar126) & uVar154 | uVar152 & uVar126) +
           ((uVar152 * 0x400 | uVar152 >> 0x16) ^
           (uVar152 * 0x80000 | uVar152 >> 0xd) ^ (uVar152 * 0x40000000 | uVar152 >> 2)) + iVar52;
  uVar62 = ((uVar176 | uVar72) & uVar156 | uVar176 & uVar72) +
           ((uVar176 * 0x400 | uVar176 >> 0x16) ^
           (uVar176 * 0x80000 | uVar176 >> 0xd) ^ (uVar176 * 0x40000000 | uVar176 >> 2)) + iVar55;
  uVar111 = (uVar155 >> 3 ^
            (uVar155 * 0x4000 | uVar155 >> 0x12) ^ (uVar155 * 0x2000000 | uVar155 >> 7)) + uVar157 +
            uVar80 + (uVar65 >> 10 ^
                     (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11));
  uVar135 = (uVar82 >> 3 ^ (uVar82 * 0x4000 | uVar82 >> 0x12) ^ (uVar82 * 0x2000000 | uVar82 >> 7))
            + uVar159 + uVar104 +
            (uVar92 >> 10 ^ (uVar92 * 0x2000 | uVar92 >> 0x13) ^ (uVar92 * 0x8000 | uVar92 >> 0x11))
  ;
  uVar137 = (uVar105 >> 3 ^
            (uVar105 * 0x4000 | uVar105 >> 0x12) ^ (uVar105 * 0x2000000 | uVar105 >> 7)) + uVar162 +
            uVar129 + (uVar66 >> 10 ^
                      (uVar66 * 0x2000 | uVar66 >> 0x13) ^ (uVar66 * 0x8000 | uVar66 >> 0x11));
  uVar139 = (uVar133 >> 3 ^
            (uVar133 * 0x4000 | uVar133 >> 0x12) ^ (uVar133 * 0x2000000 | uVar133 >> 7)) + uVar164 +
            uVar136 + (uVar96 >> 10 ^
                      (uVar96 * 0x2000 | uVar96 >> 0x13) ^ (uVar96 * 0x8000 | uVar96 >> 0x11));
  iVar43 = uVar23 + uVar111 + (uVar160 & uVar91 | ~uVar91 & uVar148) + 0x2748774c +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  iVar49 = uVar44 + uVar135 + (uVar93 & uVar67 | ~uVar67 & uVar125) + 0x2748774c +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  iVar52 = uVar53 + uVar137 + (uVar130 & uVar57 | ~uVar57 & uVar145) + 0x2748774c +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  iVar55 = uVar86 + uVar139 + (uVar116 & uVar120 | ~uVar120 & uVar149) + 0x2748774c +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  uVar95 = uVar95 + iVar43;
  uVar114 = uVar114 + iVar49;
  uVar154 = uVar154 + iVar52;
  uVar156 = uVar156 + iVar55;
  uVar53 = ((uVar54 | uVar150) & uVar69 | uVar54 & uVar150) +
           ((uVar54 * 0x400 | uVar54 >> 0x16) ^
           (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar43;
  uVar56 = ((uVar58 | uVar151) & uVar124 | uVar58 & uVar151) +
           ((uVar58 * 0x400 | uVar58 >> 0x16) ^
           (uVar58 * 0x80000 | uVar58 >> 0xd) ^ (uVar58 * 0x40000000 | uVar58 >> 2)) + iVar49;
  uVar86 = ((uVar61 | uVar152) & uVar126 | uVar61 & uVar152) +
           ((uVar61 * 0x400 | uVar61 >> 0x16) ^
           (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar52;
  uVar59 = ((uVar62 | uVar176) & uVar72 | uVar62 & uVar176) +
           ((uVar62 * 0x400 | uVar62 >> 0x16) ^
           (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar55;
  uVar142 = (uVar144 >> 3 ^
            (uVar144 * 0x4000 | uVar144 >> 0x12) ^ (uVar144 * 0x2000000 | uVar144 >> 7)) + uVar155 +
            uVar167 + (uVar2 >> 10 ^
                      (uVar2 * 0x2000 | uVar2 >> 0x13) ^ (uVar2 * 0x8000 | uVar2 >> 0x11));
  uVar123 = (uVar147 >> 3 ^
            (uVar147 * 0x4000 | uVar147 >> 0x12) ^ (uVar147 * 0x2000000 | uVar147 >> 7)) + uVar82 +
            uVar170 + (uVar4 >> 10 ^
                      (uVar4 * 0x2000 | uVar4 >> 0x13) ^ (uVar4 * 0x8000 | uVar4 >> 0x11));
  uVar143 = (uVar127 >> 3 ^
            (uVar127 * 0x4000 | uVar127 >> 0x12) ^ (uVar127 * 0x2000000 | uVar127 >> 7)) + uVar105 +
            uVar171 + (uVar5 >> 10 ^
                      (uVar5 * 0x2000 | uVar5 >> 0x13) ^ (uVar5 * 0x8000 | uVar5 >> 0x11));
  uVar146 = (uVar153 >> 3 ^
            (uVar153 * 0x4000 | uVar153 >> 0x12) ^ (uVar153 * 0x2000000 | uVar153 >> 7)) + uVar133 +
            uVar175 + (uVar7 >> 10 ^
                      (uVar7 * 0x2000 | uVar7 >> 0x13) ^ (uVar7 * 0x8000 | uVar7 >> 0x11));
  iVar43 = uVar148 + uVar142 + (uVar91 & uVar95 | ~uVar95 & uVar160) + 0x34b0bcb5 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar49 = uVar125 + uVar123 + (uVar67 & uVar114 | ~uVar114 & uVar93) + 0x34b0bcb5 +
           ((uVar114 * 0x80 | uVar114 >> 0x19) ^
           (uVar114 * 0x200000 | uVar114 >> 0xb) ^ (uVar114 * 0x4000000 | uVar114 >> 6));
  iVar52 = uVar145 + uVar143 + (uVar57 & uVar154 | ~uVar154 & uVar130) + 0x34b0bcb5 +
           ((uVar154 * 0x80 | uVar154 >> 0x19) ^
           (uVar154 * 0x200000 | uVar154 >> 0xb) ^ (uVar154 * 0x4000000 | uVar154 >> 6));
  iVar55 = uVar149 + uVar146 + (uVar120 & uVar156 | ~uVar156 & uVar116) + 0x34b0bcb5 +
           ((uVar156 * 0x80 | uVar156 >> 0x19) ^
           (uVar156 * 0x200000 | uVar156 >> 0xb) ^ (uVar156 * 0x4000000 | uVar156 >> 6));
  uVar69 = uVar69 + iVar43;
  uVar124 = uVar124 + iVar49;
  uVar126 = uVar126 + iVar52;
  uVar72 = uVar72 + iVar55;
  uVar23 = ((uVar53 | uVar54) & uVar150 | uVar53 & uVar54) +
           ((uVar53 * 0x400 | uVar53 >> 0x16) ^
           (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar43;
  uVar34 = ((uVar56 | uVar58) & uVar151 | uVar56 & uVar58) +
           ((uVar56 * 0x400 | uVar56 >> 0x16) ^
           (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar49;
  uVar44 = ((uVar86 | uVar61) & uVar152 | uVar86 & uVar61) +
           ((uVar86 * 0x400 | uVar86 >> 0x16) ^
           (uVar86 * 0x80000 | uVar86 >> 0xd) ^ (uVar86 * 0x40000000 | uVar86 >> 2)) + iVar52;
  uVar50 = ((uVar59 | uVar62) & uVar176 | uVar59 & uVar62) +
           ((uVar59 * 0x400 | uVar59 >> 0x16) ^
           (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar55;
  uVar155 = (uVar68 >> 3 ^ (uVar68 * 0x4000 | uVar68 >> 0x12) ^ (uVar68 * 0x2000000 | uVar68 >> 7))
            + uVar144 + uVar9 +
            (uVar111 >> 10 ^
            (uVar111 * 0x2000 | uVar111 >> 0x13) ^ (uVar111 * 0x8000 | uVar111 >> 0x11));
  uVar82 = (uVar99 >> 3 ^ (uVar99 * 0x4000 | uVar99 >> 0x12) ^ (uVar99 * 0x2000000 | uVar99 >> 7)) +
           uVar147 + uVar21 +
           (uVar135 >> 10 ^
           (uVar135 * 0x2000 | uVar135 >> 0x13) ^ (uVar135 * 0x8000 | uVar135 >> 0x11));
  uVar105 = (uVar122 >> 3 ^
            (uVar122 * 0x4000 | uVar122 >> 0x12) ^ (uVar122 * 0x2000000 | uVar122 >> 7)) + uVar127 +
            uVar30 + (uVar137 >> 10 ^
                     (uVar137 * 0x2000 | uVar137 >> 0x13) ^ (uVar137 * 0x8000 | uVar137 >> 0x11));
  uVar133 = (uVar71 >> 3 ^ (uVar71 * 0x4000 | uVar71 >> 0x12) ^ (uVar71 * 0x2000000 | uVar71 >> 7))
            + uVar153 + uVar33 +
            (uVar139 >> 10 ^
            (uVar139 * 0x2000 | uVar139 >> 0x13) ^ (uVar139 * 0x8000 | uVar139 >> 0x11));
  iVar43 = uVar160 + uVar155 + (uVar95 & uVar69 | ~uVar69 & uVar91) + 0x391c0cb3 +
           ((uVar69 * 0x80 | uVar69 >> 0x19) ^
           (uVar69 * 0x200000 | uVar69 >> 0xb) ^ (uVar69 * 0x4000000 | uVar69 >> 6));
  iVar49 = uVar93 + uVar82 + (uVar114 & uVar124 | ~uVar124 & uVar67) + 0x391c0cb3 +
           ((uVar124 * 0x80 | uVar124 >> 0x19) ^
           (uVar124 * 0x200000 | uVar124 >> 0xb) ^ (uVar124 * 0x4000000 | uVar124 >> 6));
  iVar52 = uVar130 + uVar105 + (uVar154 & uVar126 | ~uVar126 & uVar57) + 0x391c0cb3 +
           ((uVar126 * 0x80 | uVar126 >> 0x19) ^
           (uVar126 * 0x200000 | uVar126 >> 0xb) ^ (uVar126 * 0x4000000 | uVar126 >> 6));
  iVar55 = uVar116 + uVar133 + (uVar156 & uVar72 | ~uVar72 & uVar120) + 0x391c0cb3 +
           ((uVar72 * 0x80 | uVar72 >> 0x19) ^
           (uVar72 * 0x200000 | uVar72 >> 0xb) ^ (uVar72 * 0x4000000 | uVar72 >> 6));
  uVar150 = uVar150 + iVar43;
  uVar151 = uVar151 + iVar49;
  uVar152 = uVar152 + iVar52;
  uVar176 = uVar176 + iVar55;
  uVar22 = ((uVar23 | uVar53) & uVar54 | uVar23 & uVar53) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar43;
  uVar19 = ((uVar34 | uVar56) & uVar58 | uVar34 & uVar56) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar49;
  uVar8 = ((uVar44 | uVar86) & uVar61 | uVar44 & uVar86) +
          ((uVar44 * 0x400 | uVar44 >> 0x16) ^
          (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar52;
  uVar31 = ((uVar50 | uVar59) & uVar62 | uVar50 & uVar59) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar55;
  uVar93 = (uVar132 >> 3 ^
           (uVar132 * 0x4000 | uVar132 >> 0x12) ^ (uVar132 * 0x2000000 | uVar132 >> 7)) + uVar68 +
           uVar18 + (uVar142 >> 10 ^
                    (uVar142 * 0x2000 | uVar142 >> 0x13) ^ (uVar142 * 0x8000 | uVar142 >> 0x11));
  uVar130 = (uVar119 >> 3 ^
            (uVar119 * 0x4000 | uVar119 >> 0x12) ^ (uVar119 * 0x2000000 | uVar119 >> 7)) + uVar99 +
            uVar29 + (uVar123 >> 10 ^
                     (uVar123 * 0x2000 | uVar123 >> 0x13) ^ (uVar123 * 0x8000 | uVar123 >> 0x11));
  uVar116 = (uVar115 >> 3 ^
            (uVar115 * 0x4000 | uVar115 >> 0x12) ^ (uVar115 * 0x2000000 | uVar115 >> 7)) + uVar122 +
            uVar10 + (uVar143 >> 10 ^
                     (uVar143 * 0x2000 | uVar143 >> 0x13) ^ (uVar143 * 0x8000 | uVar143 >> 0x11));
  uVar144 = (uVar138 >> 3 ^
            (uVar138 * 0x4000 | uVar138 >> 0x12) ^ (uVar138 * 0x2000000 | uVar138 >> 7)) + uVar71 +
            uVar20 + (uVar146 >> 10 ^
                     (uVar146 * 0x2000 | uVar146 >> 0x13) ^ (uVar146 * 0x8000 | uVar146 >> 0x11));
  iVar43 = uVar91 + uVar93 + (uVar69 & uVar150 | ~uVar150 & uVar95) + 0x4ed8aa4a +
           ((uVar150 * 0x80 | uVar150 >> 0x19) ^
           (uVar150 * 0x200000 | uVar150 >> 0xb) ^ (uVar150 * 0x4000000 | uVar150 >> 6));
  iVar49 = uVar67 + uVar130 + (uVar124 & uVar151 | ~uVar151 & uVar114) + 0x4ed8aa4a +
           ((uVar151 * 0x80 | uVar151 >> 0x19) ^
           (uVar151 * 0x200000 | uVar151 >> 0xb) ^ (uVar151 * 0x4000000 | uVar151 >> 6));
  iVar52 = uVar57 + uVar116 + (uVar126 & uVar152 | ~uVar152 & uVar154) + 0x4ed8aa4a +
           ((uVar152 * 0x80 | uVar152 >> 0x19) ^
           (uVar152 * 0x200000 | uVar152 >> 0xb) ^ (uVar152 * 0x4000000 | uVar152 >> 6));
  iVar55 = uVar120 + uVar144 + (uVar72 & uVar176 | ~uVar176 & uVar156) + 0x4ed8aa4a +
           ((uVar176 * 0x80 | uVar176 >> 0x19) ^
           (uVar176 * 0x200000 | uVar176 >> 0xb) ^ (uVar176 * 0x4000000 | uVar176 >> 6));
  uVar54 = uVar54 + iVar43;
  uVar58 = uVar58 + iVar49;
  uVar61 = uVar61 + iVar52;
  uVar62 = uVar62 + iVar55;
  uVar57 = ((uVar22 | uVar23) & uVar53 | uVar22 & uVar23) +
           ((uVar22 * 0x400 | uVar22 >> 0x16) ^
           (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar43;
  uVar120 = ((uVar19 | uVar34) & uVar56 | uVar19 & uVar34) +
            ((uVar19 * 0x400 | uVar19 >> 0x16) ^
            (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar49;
  uVar68 = ((uVar8 | uVar44) & uVar86 | uVar8 & uVar44) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar52;
  uVar99 = ((uVar31 | uVar50) & uVar59 | uVar31 & uVar50) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar55;
  uVar132 = (uVar74 >> 3 ^ (uVar74 * 0x4000 | uVar74 >> 0x12) ^ (uVar74 * 0x2000000 | uVar74 >> 7))
            + uVar132 + uVar158 +
            (uVar155 >> 10 ^
            (uVar155 * 0x2000 | uVar155 >> 0x13) ^ (uVar155 * 0x8000 | uVar155 >> 0x11));
  uVar119 = (uVar134 >> 3 ^
            (uVar134 * 0x4000 | uVar134 >> 0x12) ^ (uVar134 * 0x2000000 | uVar134 >> 7)) + uVar119 +
            uVar161 + (uVar82 >> 10 ^
                      (uVar82 * 0x2000 | uVar82 >> 0x13) ^ (uVar82 * 0x8000 | uVar82 >> 0x11));
  uVar115 = (uVar100 >> 3 ^
            (uVar100 * 0x4000 | uVar100 >> 0x12) ^ (uVar100 * 0x2000000 | uVar100 >> 7)) + uVar115 +
            uVar163 + (uVar105 >> 10 ^
                      (uVar105 * 0x2000 | uVar105 >> 0x13) ^ (uVar105 * 0x8000 | uVar105 >> 0x11));
  uVar138 = (uVar112 >> 3 ^
            (uVar112 * 0x4000 | uVar112 >> 0x12) ^ (uVar112 * 0x2000000 | uVar112 >> 7)) + uVar138 +
            uVar165 + (uVar133 >> 10 ^
                      (uVar133 * 0x2000 | uVar133 >> 0x13) ^ (uVar133 * 0x8000 | uVar133 >> 0x11));
  iVar43 = uVar95 + uVar132 + (uVar150 & uVar54 | ~uVar54 & uVar69) + 0x5b9cca4f +
           ((uVar54 * 0x80 | uVar54 >> 0x19) ^
           (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6));
  iVar49 = uVar114 + uVar119 + (uVar151 & uVar58 | ~uVar58 & uVar124) + 0x5b9cca4f +
           ((uVar58 * 0x80 | uVar58 >> 0x19) ^
           (uVar58 * 0x200000 | uVar58 >> 0xb) ^ (uVar58 * 0x4000000 | uVar58 >> 6));
  iVar52 = uVar154 + uVar115 + (uVar152 & uVar61 | ~uVar61 & uVar126) + 0x5b9cca4f +
           ((uVar61 * 0x80 | uVar61 >> 0x19) ^
           (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6));
  iVar55 = uVar156 + uVar138 + (uVar176 & uVar62 | ~uVar62 & uVar72) + 0x5b9cca4f +
           ((uVar62 * 0x80 | uVar62 >> 0x19) ^
           (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6));
  uVar53 = uVar53 + iVar43;
  uVar56 = uVar56 + iVar49;
  uVar86 = uVar86 + iVar52;
  uVar59 = uVar59 + iVar55;
  uVar91 = ((uVar57 | uVar22) & uVar23 | uVar57 & uVar22) +
           ((uVar57 * 0x400 | uVar57 >> 0x16) ^
           (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar43;
  uVar95 = ((uVar120 | uVar19) & uVar34 | uVar120 & uVar19) +
           ((uVar120 * 0x400 | uVar120 >> 0x16) ^
           (uVar120 * 0x80000 | uVar120 >> 0xd) ^ (uVar120 * 0x40000000 | uVar120 >> 2)) + iVar49;
  uVar114 = ((uVar68 | uVar8) & uVar44 | uVar68 & uVar8) +
            ((uVar68 * 0x400 | uVar68 >> 0x16) ^
            (uVar68 * 0x80000 | uVar68 >> 0xd) ^ (uVar68 * 0x40000000 | uVar68 >> 2)) + iVar52;
  uVar67 = ((uVar99 | uVar31) & uVar50 | uVar99 & uVar31) +
           ((uVar99 * 0x400 | uVar99 >> 0x16) ^
           (uVar99 * 0x80000 | uVar99 >> 0xd) ^ (uVar99 * 0x40000000 | uVar99 >> 2)) + iVar55;
  uVar122 = (uVar64 >> 3 ^ (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7))
            + uVar74 + uVar65 +
            (uVar93 >> 10 ^ (uVar93 * 0x2000 | uVar93 >> 0x13) ^ (uVar93 * 0x8000 | uVar93 >> 0x11))
  ;
  uVar71 = (uVar45 >> 3 ^ (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) +
           uVar134 + uVar92 +
           (uVar130 >> 10 ^
           (uVar130 * 0x2000 | uVar130 >> 0x13) ^ (uVar130 * 0x8000 | uVar130 >> 0x11));
  uVar74 = (uVar70 >> 3 ^ (uVar70 * 0x4000 | uVar70 >> 0x12) ^ (uVar70 * 0x2000000 | uVar70 >> 7)) +
           uVar100 + uVar66 +
           (uVar116 >> 10 ^
           (uVar116 * 0x2000 | uVar116 >> 0x13) ^ (uVar116 * 0x8000 | uVar116 >> 0x11));
  uVar160 = (uVar60 >> 3 ^ (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7))
            + uVar112 + uVar96 +
            (uVar144 >> 10 ^
            (uVar144 * 0x2000 | uVar144 >> 0x13) ^ (uVar144 * 0x8000 | uVar144 >> 0x11));
  iVar43 = uVar69 + uVar122 + (uVar54 & uVar53 | ~uVar53 & uVar150) + 0x682e6ff3 +
           ((uVar53 * 0x80 | uVar53 >> 0x19) ^
           (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6));
  iVar49 = uVar124 + uVar71 + (uVar58 & uVar56 | ~uVar56 & uVar151) + 0x682e6ff3 +
           ((uVar56 * 0x80 | uVar56 >> 0x19) ^
           (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6));
  iVar52 = uVar126 + uVar74 + (uVar61 & uVar86 | ~uVar86 & uVar152) + 0x682e6ff3 +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  iVar55 = uVar72 + uVar160 + (uVar62 & uVar59 | ~uVar59 & uVar176) + 0x682e6ff3 +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6));
  uVar23 = uVar23 + iVar43;
  uVar34 = uVar34 + iVar49;
  uVar44 = uVar44 + iVar52;
  uVar50 = uVar50 + iVar55;
  uVar100 = ((uVar91 | uVar57) & uVar22 | uVar91 & uVar57) +
            ((uVar91 * 0x400 | uVar91 >> 0x16) ^
            (uVar91 * 0x80000 | uVar91 >> 0xd) ^ (uVar91 * 0x40000000 | uVar91 >> 2)) + iVar43;
  uVar112 = ((uVar95 | uVar120) & uVar19 | uVar95 & uVar120) +
            ((uVar95 * 0x400 | uVar95 >> 0x16) ^
            (uVar95 * 0x80000 | uVar95 >> 0xd) ^ (uVar95 * 0x40000000 | uVar95 >> 2)) + iVar49;
  uVar148 = ((uVar114 | uVar68) & uVar8 | uVar114 & uVar68) +
            ((uVar114 * 0x400 | uVar114 >> 0x16) ^
            (uVar114 * 0x80000 | uVar114 >> 0xd) ^ (uVar114 * 0x40000000 | uVar114 >> 2)) + iVar52;
  uVar147 = ((uVar67 | uVar99) & uVar31 | uVar67 & uVar99) +
            ((uVar67 * 0x400 | uVar67 >> 0x16) ^
            (uVar67 * 0x80000 | uVar67 >> 0xd) ^ (uVar67 * 0x40000000 | uVar67 >> 2)) + iVar55;
  uVar124 = (uVar131 >> 3 ^
            (uVar131 * 0x4000 | uVar131 >> 0x12) ^ (uVar131 * 0x2000000 | uVar131 >> 7)) + uVar64 +
            uVar2 + (uVar132 >> 10 ^
                    (uVar132 * 0x2000 | uVar132 >> 0x13) ^ (uVar132 * 0x8000 | uVar132 >> 0x11));
  uVar126 = (uVar84 >> 3 ^ (uVar84 * 0x4000 | uVar84 >> 0x12) ^ (uVar84 * 0x2000000 | uVar84 >> 7))
            + uVar45 + uVar4 +
            (uVar119 >> 10 ^
            (uVar119 * 0x2000 | uVar119 >> 0x13) ^ (uVar119 * 0x8000 | uVar119 >> 0x11));
  uVar72 = (uVar106 >> 3 ^
           (uVar106 * 0x4000 | uVar106 >> 0x12) ^ (uVar106 * 0x2000000 | uVar106 >> 7)) + uVar70 +
           uVar5 + (uVar115 >> 10 ^
                   (uVar115 * 0x2000 | uVar115 >> 0x13) ^ (uVar115 * 0x8000 | uVar115 >> 0x11));
  uVar134 = (uVar128 >> 3 ^
            (uVar128 * 0x4000 | uVar128 >> 0x12) ^ (uVar128 * 0x2000000 | uVar128 >> 7)) + uVar60 +
            uVar7 + (uVar138 >> 10 ^
                    (uVar138 * 0x2000 | uVar138 >> 0x13) ^ (uVar138 * 0x8000 | uVar138 >> 0x11));
  iVar43 = uVar150 + uVar124 + (uVar53 & uVar23 | ~uVar23 & uVar54) + 0x748f82ee +
           ((uVar23 * 0x80 | uVar23 >> 0x19) ^
           (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
  iVar49 = uVar151 + uVar126 + (uVar56 & uVar34 | ~uVar34 & uVar58) + 0x748f82ee +
           ((uVar34 * 0x80 | uVar34 >> 0x19) ^
           (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6));
  iVar52 = uVar152 + uVar72 + (uVar86 & uVar44 | ~uVar44 & uVar61) + 0x748f82ee +
           ((uVar44 * 0x80 | uVar44 >> 0x19) ^
           (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
  iVar55 = uVar176 + uVar134 + (uVar59 & uVar50 | ~uVar50 & uVar62) + 0x748f82ee +
           ((uVar50 * 0x80 | uVar50 >> 0x19) ^
           (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
  uVar22 = uVar22 + iVar43;
  uVar19 = uVar19 + iVar49;
  uVar8 = uVar8 + iVar52;
  uVar31 = uVar31 + iVar55;
  uVar2 = ((uVar100 | uVar91) & uVar57 | uVar100 & uVar91) +
          ((uVar100 * 0x400 | uVar100 >> 0x16) ^
          (uVar100 * 0x80000 | uVar100 >> 0xd) ^ (uVar100 * 0x40000000 | uVar100 >> 2)) + iVar43;
  uVar4 = ((uVar112 | uVar95) & uVar120 | uVar112 & uVar95) +
          ((uVar112 * 0x400 | uVar112 >> 0x16) ^
          (uVar112 * 0x80000 | uVar112 >> 0xd) ^ (uVar112 * 0x40000000 | uVar112 >> 2)) + iVar49;
  uVar5 = ((uVar148 | uVar114) & uVar68 | uVar148 & uVar114) +
          ((uVar148 * 0x400 | uVar148 >> 0x16) ^
          (uVar148 * 0x80000 | uVar148 >> 0xd) ^ (uVar148 * 0x40000000 | uVar148 >> 2)) + iVar52;
  uVar7 = ((uVar147 | uVar67) & uVar99 | uVar147 & uVar67) +
          ((uVar147 * 0x400 | uVar147 >> 0x16) ^
          (uVar147 * 0x80000 | uVar147 >> 0xd) ^ (uVar147 * 0x40000000 | uVar147 >> 2)) + iVar55;
  uVar45 = (uVar98 >> 3 ^ (uVar98 * 0x4000 | uVar98 >> 0x12) ^ (uVar98 * 0x2000000 | uVar98 >> 7)) +
           uVar131 + uVar111 +
           (uVar122 >> 10 ^
           (uVar122 * 0x2000 | uVar122 >> 0x13) ^ (uVar122 * 0x8000 | uVar122 >> 0x11));
  uVar70 = (uVar51 >> 3 ^ (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7)) +
           uVar84 + uVar135 +
           (uVar71 >> 10 ^ (uVar71 * 0x2000 | uVar71 >> 0x13) ^ (uVar71 * 0x8000 | uVar71 >> 0x11));
  uVar60 = (uVar118 >> 3 ^
           (uVar118 * 0x4000 | uVar118 >> 0x12) ^ (uVar118 * 0x2000000 | uVar118 >> 7)) + uVar106 +
           uVar137 + (uVar74 >> 10 ^
                     (uVar74 * 0x2000 | uVar74 >> 0x13) ^ (uVar74 * 0x8000 | uVar74 >> 0x11));
  uVar69 = (uVar87 >> 3 ^ (uVar87 * 0x4000 | uVar87 >> 0x12) ^ (uVar87 * 0x2000000 | uVar87 >> 7)) +
           uVar128 + uVar139 +
           (uVar160 >> 10 ^
           (uVar160 * 0x2000 | uVar160 >> 0x13) ^ (uVar160 * 0x8000 | uVar160 >> 0x11));
  iVar43 = uVar54 + uVar45 + (uVar23 & uVar22 | ~uVar22 & uVar53) + 0x78a5636f +
           ((uVar22 * 0x80 | uVar22 >> 0x19) ^
           (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
  iVar49 = uVar58 + uVar70 + (uVar34 & uVar19 | ~uVar19 & uVar56) + 0x78a5636f +
           ((uVar19 * 0x80 | uVar19 >> 0x19) ^
           (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
  iVar52 = uVar61 + uVar60 + (uVar44 & uVar8 | ~uVar8 & uVar86) + 0x78a5636f +
           ((uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
  iVar55 = uVar62 + uVar69 + (uVar50 & uVar31 | ~uVar31 & uVar59) + 0x78a5636f +
           ((uVar31 * 0x80 | uVar31 >> 0x19) ^
           (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6));
  uVar57 = uVar57 + iVar43;
  uVar120 = uVar120 + iVar49;
  uVar68 = uVar68 + iVar52;
  uVar99 = uVar99 + iVar55;
  uVar131 = ((uVar2 | uVar100) & uVar91 | uVar2 & uVar100) +
            ((uVar2 * 0x400 | uVar2 >> 0x16) ^
            (uVar2 * 0x80000 | uVar2 >> 0xd) ^ (uVar2 * 0x40000000 | uVar2 >> 2)) + iVar43;
  uVar84 = ((uVar4 | uVar112) & uVar95 | uVar4 & uVar112) +
           ((uVar4 * 0x400 | uVar4 >> 0x16) ^
           (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar49;
  uVar106 = ((uVar5 | uVar148) & uVar114 | uVar5 & uVar148) +
            ((uVar5 * 0x400 | uVar5 >> 0x16) ^
            (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2)) + iVar52;
  uVar128 = ((uVar7 | uVar147) & uVar67 | uVar7 & uVar147) +
            ((uVar7 * 0x400 | uVar7 >> 0x16) ^
            (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar55;
  uVar58 = (uVar80 >> 3 ^ (uVar80 * 0x4000 | uVar80 >> 0x12) ^ (uVar80 * 0x2000000 | uVar80 >> 7)) +
           uVar98 + uVar142 +
           (uVar124 >> 10 ^
           (uVar124 * 0x2000 | uVar124 >> 0x13) ^ (uVar124 * 0x8000 | uVar124 >> 0x11));
  uVar61 = (uVar104 >> 3 ^
           (uVar104 * 0x4000 | uVar104 >> 0x12) ^ (uVar104 * 0x2000000 | uVar104 >> 7)) + uVar51 +
           uVar123 + (uVar126 >> 10 ^
                     (uVar126 * 0x2000 | uVar126 >> 0x13) ^ (uVar126 * 0x8000 | uVar126 >> 0x11));
  uVar62 = (uVar129 >> 3 ^
           (uVar129 * 0x4000 | uVar129 >> 0x12) ^ (uVar129 * 0x2000000 | uVar129 >> 7)) + uVar118 +
           uVar143 + (uVar72 >> 10 ^
                     (uVar72 * 0x2000 | uVar72 >> 0x13) ^ (uVar72 * 0x8000 | uVar72 >> 0x11));
  uVar87 = (uVar136 >> 3 ^
           (uVar136 * 0x4000 | uVar136 >> 0x12) ^ (uVar136 * 0x2000000 | uVar136 >> 7)) + uVar87 +
           uVar146 + (uVar134 >> 10 ^
                     (uVar134 * 0x2000 | uVar134 >> 0x13) ^ (uVar134 * 0x8000 | uVar134 >> 0x11));
  iVar43 = uVar53 + uVar58 + (uVar22 & uVar57 | ~uVar57 & uVar23) + -0x7b3787ec +
           ((uVar57 * 0x80 | uVar57 >> 0x19) ^
           (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6));
  iVar49 = uVar56 + uVar61 + (uVar19 & uVar120 | ~uVar120 & uVar34) + -0x7b3787ec +
           ((uVar120 * 0x80 | uVar120 >> 0x19) ^
           (uVar120 * 0x200000 | uVar120 >> 0xb) ^ (uVar120 * 0x4000000 | uVar120 >> 6));
  iVar52 = uVar86 + uVar62 + (uVar8 & uVar68 | ~uVar68 & uVar44) + -0x7b3787ec +
           ((uVar68 * 0x80 | uVar68 >> 0x19) ^
           (uVar68 * 0x200000 | uVar68 >> 0xb) ^ (uVar68 * 0x4000000 | uVar68 >> 6));
  iVar55 = uVar59 + uVar87 + (uVar31 & uVar99 | ~uVar99 & uVar50) + -0x7b3787ec +
           ((uVar99 * 0x80 | uVar99 >> 0x19) ^
           (uVar99 * 0x200000 | uVar99 >> 0xb) ^ (uVar99 * 0x4000000 | uVar99 >> 6));
  uVar91 = uVar91 + iVar43;
  uVar95 = uVar95 + iVar49;
  uVar114 = uVar114 + iVar52;
  uVar67 = uVar67 + iVar55;
  uVar86 = ((uVar131 | uVar2) & uVar100 | uVar131 & uVar2) +
           ((uVar131 * 0x400 | uVar131 >> 0x16) ^
           (uVar131 * 0x80000 | uVar131 >> 0xd) ^ (uVar131 * 0x40000000 | uVar131 >> 2)) + iVar43;
  uVar59 = ((uVar84 | uVar4) & uVar112 | uVar84 & uVar4) +
           ((uVar84 * 0x400 | uVar84 >> 0x16) ^
           (uVar84 * 0x80000 | uVar84 >> 0xd) ^ (uVar84 * 0x40000000 | uVar84 >> 2)) + iVar49;
  uVar64 = ((uVar106 | uVar5) & uVar148 | uVar106 & uVar5) +
           ((uVar106 * 0x400 | uVar106 >> 0x16) ^
           (uVar106 * 0x80000 | uVar106 >> 0xd) ^ (uVar106 * 0x40000000 | uVar106 >> 2)) + iVar52;
  uVar98 = ((uVar128 | uVar7) & uVar147 | uVar128 & uVar7) +
           ((uVar128 * 0x400 | uVar128 >> 0x16) ^
           (uVar128 * 0x80000 | uVar128 >> 0xd) ^ (uVar128 * 0x40000000 | uVar128 >> 2)) + iVar55;
  uVar45 = (uVar167 >> 3 ^
           (uVar167 * 0x4000 | uVar167 >> 0x12) ^ (uVar167 * 0x2000000 | uVar167 >> 7)) + uVar80 +
           uVar155 + (uVar45 >> 10 ^
                     (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  uVar51 = (uVar170 >> 3 ^
           (uVar170 * 0x4000 | uVar170 >> 0x12) ^ (uVar170 * 0x2000000 | uVar170 >> 7)) + uVar104 +
           uVar82 + (uVar70 >> 10 ^
                    (uVar70 * 0x2000 | uVar70 >> 0x13) ^ (uVar70 * 0x8000 | uVar70 >> 0x11));
  uVar54 = (uVar171 >> 3 ^
           (uVar171 * 0x4000 | uVar171 >> 0x12) ^ (uVar171 * 0x2000000 | uVar171 >> 7)) + uVar129 +
           uVar105 + (uVar60 >> 10 ^
                     (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
  uVar70 = (uVar175 >> 3 ^
           (uVar175 * 0x4000 | uVar175 >> 0x12) ^ (uVar175 * 0x2000000 | uVar175 >> 7)) + uVar136 +
           uVar133 + (uVar69 >> 10 ^
                     (uVar69 * 0x2000 | uVar69 >> 0x13) ^ (uVar69 * 0x8000 | uVar69 >> 0x11));
  iVar43 = uVar23 + uVar45 + (uVar57 & uVar91 | ~uVar91 & uVar22) + -0x7338fdf8 +
           ((uVar91 * 0x80 | uVar91 >> 0x19) ^
           (uVar91 * 0x200000 | uVar91 >> 0xb) ^ (uVar91 * 0x4000000 | uVar91 >> 6));
  iVar49 = uVar34 + uVar51 + (uVar120 & uVar95 | ~uVar95 & uVar19) + -0x7338fdf8 +
           ((uVar95 * 0x80 | uVar95 >> 0x19) ^
           (uVar95 * 0x200000 | uVar95 >> 0xb) ^ (uVar95 * 0x4000000 | uVar95 >> 6));
  iVar52 = uVar44 + uVar54 + (uVar68 & uVar114 | ~uVar114 & uVar8) + -0x7338fdf8 +
           ((uVar114 * 0x80 | uVar114 >> 0x19) ^
           (uVar114 * 0x200000 | uVar114 >> 0xb) ^ (uVar114 * 0x4000000 | uVar114 >> 6));
  iVar55 = uVar50 + uVar70 + (uVar99 & uVar67 | ~uVar67 & uVar31) + -0x7338fdf8 +
           ((uVar67 * 0x80 | uVar67 >> 0x19) ^
           (uVar67 * 0x200000 | uVar67 >> 0xb) ^ (uVar67 * 0x4000000 | uVar67 >> 6));
  uVar100 = uVar100 + iVar43;
  uVar112 = uVar112 + iVar49;
  uVar148 = uVar148 + iVar52;
  uVar147 = uVar147 + iVar55;
  uVar44 = ((uVar86 | uVar131) & uVar2 | uVar86 & uVar131) +
           ((uVar86 * 0x400 | uVar86 >> 0x16) ^
           (uVar86 * 0x80000 | uVar86 >> 0xd) ^ (uVar86 * 0x40000000 | uVar86 >> 2)) + iVar43;
  uVar50 = ((uVar59 | uVar84) & uVar4 | uVar59 & uVar84) +
           ((uVar59 * 0x400 | uVar59 >> 0x16) ^
           (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar49;
  uVar53 = ((uVar64 | uVar106) & uVar5 | uVar64 & uVar106) +
           ((uVar64 * 0x400 | uVar64 >> 0x16) ^
           (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar52;
  uVar56 = ((uVar98 | uVar128) & uVar7 | uVar98 & uVar128) +
           ((uVar98 * 0x400 | uVar98 >> 0x16) ^
           (uVar98 * 0x80000 | uVar98 >> 0xd) ^ (uVar98 * 0x40000000 | uVar98 >> 2)) + iVar55;
  uVar118 = (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
            uVar167 + uVar93 +
            (uVar58 >> 10 ^ (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11))
  ;
  uVar58 = (uVar21 >> 3 ^ (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7)) +
           uVar170 + uVar130 +
           (uVar61 >> 10 ^ (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
  uVar60 = (uVar30 >> 3 ^ (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7)) +
           uVar171 + uVar116 +
           (uVar62 >> 10 ^ (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
  uVar87 = (uVar33 >> 3 ^ (uVar33 * 0x4000 | uVar33 >> 0x12) ^ (uVar33 * 0x2000000 | uVar33 >> 7)) +
           uVar175 + uVar144 +
           (uVar87 >> 10 ^ (uVar87 * 0x2000 | uVar87 >> 0x13) ^ (uVar87 * 0x8000 | uVar87 >> 0x11));
  iVar43 = uVar22 + uVar118 + (uVar91 & uVar100 | ~uVar100 & uVar57) + -0x6f410006 +
           ((uVar100 * 0x80 | uVar100 >> 0x19) ^
           (uVar100 * 0x200000 | uVar100 >> 0xb) ^ (uVar100 * 0x4000000 | uVar100 >> 6));
  iVar49 = uVar19 + uVar58 + (uVar95 & uVar112 | ~uVar112 & uVar120) + -0x6f410006 +
           ((uVar112 * 0x80 | uVar112 >> 0x19) ^
           (uVar112 * 0x200000 | uVar112 >> 0xb) ^ (uVar112 * 0x4000000 | uVar112 >> 6));
  iVar52 = uVar8 + uVar60 + (uVar114 & uVar148 | ~uVar148 & uVar68) + -0x6f410006 +
           ((uVar148 * 0x80 | uVar148 >> 0x19) ^
           (uVar148 * 0x200000 | uVar148 >> 0xb) ^ (uVar148 * 0x4000000 | uVar148 >> 6));
  iVar55 = uVar31 + uVar87 + (uVar67 & uVar147 | ~uVar147 & uVar99) + -0x6f410006 +
           ((uVar147 * 0x80 | uVar147 >> 0x19) ^
           (uVar147 * 0x200000 | uVar147 >> 0xb) ^ (uVar147 * 0x4000000 | uVar147 >> 6));
  uVar2 = uVar2 + iVar43;
  uVar4 = uVar4 + iVar49;
  uVar5 = uVar5 + iVar52;
  uVar7 = uVar7 + iVar55;
  uVar8 = ((uVar44 | uVar86) & uVar131 | uVar44 & uVar86) +
          ((uVar44 * 0x400 | uVar44 >> 0x16) ^
          (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar43;
  uVar31 = ((uVar50 | uVar59) & uVar84 | uVar50 & uVar59) +
           ((uVar50 * 0x400 | uVar50 >> 0x16) ^
           (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar49;
  uVar23 = ((uVar53 | uVar64) & uVar106 | uVar53 & uVar64) +
           ((uVar53 * 0x400 | uVar53 >> 0x16) ^
           (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar52;
  uVar34 = ((uVar56 | uVar98) & uVar128 | uVar56 & uVar98) +
           ((uVar56 * 0x400 | uVar56 >> 0x16) ^
           (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar55;
  uVar45 = (uVar18 >> 3 ^ (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)) +
           uVar9 + uVar132 +
           (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
  uVar51 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7)) +
           uVar21 + uVar119 +
           (uVar51 >> 10 ^ (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
  uVar54 = (uVar10 >> 3 ^ (uVar10 * 0x4000 | uVar10 >> 0x12) ^ (uVar10 * 0x2000000 | uVar10 >> 7)) +
           uVar30 + uVar115 +
           (uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11));
  uVar33 = (uVar20 >> 3 ^ (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7)) +
           uVar33 + uVar138 +
           (uVar70 >> 10 ^ (uVar70 * 0x2000 | uVar70 >> 0x13) ^ (uVar70 * 0x8000 | uVar70 >> 0x11));
  iVar43 = uVar57 + uVar45 + (uVar100 & uVar2 | ~uVar2 & uVar91) + -0x5baf9315 +
           ((uVar2 * 0x80 | uVar2 >> 0x19) ^
           (uVar2 * 0x200000 | uVar2 >> 0xb) ^ (uVar2 * 0x4000000 | uVar2 >> 6));
  iVar49 = uVar120 + uVar51 + (uVar112 & uVar4 | ~uVar4 & uVar95) + -0x5baf9315 +
           ((uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
  iVar52 = uVar68 + uVar54 + (uVar148 & uVar5 | ~uVar5 & uVar114) + -0x5baf9315 +
           ((uVar5 * 0x80 | uVar5 >> 0x19) ^
           (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6));
  iVar55 = uVar99 + uVar33 + (uVar147 & uVar7 | ~uVar7 & uVar67) + -0x5baf9315 +
           ((uVar7 * 0x80 | uVar7 >> 0x19) ^
           (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6));
  uVar131 = uVar131 + iVar43;
  uVar84 = uVar84 + iVar49;
  uVar106 = uVar106 + iVar52;
  uVar128 = uVar128 + iVar55;
  uVar9 = ((uVar8 | uVar44) & uVar86 | uVar8 & uVar44) +
          ((uVar8 * 0x400 | uVar8 >> 0x16) ^
          (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar43;
  uVar22 = ((uVar31 | uVar50) & uVar59 | uVar31 & uVar50) +
           ((uVar31 * 0x400 | uVar31 >> 0x16) ^
           (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar49;
  uVar19 = ((uVar23 | uVar53) & uVar64 | uVar23 & uVar53) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar52;
  uVar21 = ((uVar34 | uVar56) & uVar98 | uVar34 & uVar56) +
           ((uVar34 * 0x400 | uVar34 >> 0x16) ^
           (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar55;
  iVar43 = (uVar158 >> 3 ^
           (uVar158 * 0x4000 | uVar158 >> 0x12) ^ (uVar158 * 0x2000000 | uVar158 >> 7)) + uVar18 +
           uVar122 + (uVar118 >> 10 ^
                     (uVar118 * 0x2000 | uVar118 >> 0x13) ^ (uVar118 * 0x8000 | uVar118 >> 0x11)) +
           uVar91 + (uVar2 & uVar131 | ~uVar131 & uVar100) + -0x41065c09 +
           ((uVar131 * 0x80 | uVar131 >> 0x19) ^
           (uVar131 * 0x200000 | uVar131 >> 0xb) ^ (uVar131 * 0x4000000 | uVar131 >> 6));
  iVar49 = (uVar161 >> 3 ^
           (uVar161 * 0x4000 | uVar161 >> 0x12) ^ (uVar161 * 0x2000000 | uVar161 >> 7)) + uVar29 +
           uVar71 + (uVar58 >> 10 ^
                    (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11)) +
           uVar95 + (uVar4 & uVar84 | ~uVar84 & uVar112) + -0x41065c09 +
           ((uVar84 * 0x80 | uVar84 >> 0x19) ^
           (uVar84 * 0x200000 | uVar84 >> 0xb) ^ (uVar84 * 0x4000000 | uVar84 >> 6));
  iVar52 = (uVar163 >> 3 ^
           (uVar163 * 0x4000 | uVar163 >> 0x12) ^ (uVar163 * 0x2000000 | uVar163 >> 7)) + uVar10 +
           uVar74 + (uVar60 >> 10 ^
                    (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11)) +
           uVar114 + (uVar5 & uVar106 | ~uVar106 & uVar148) + -0x41065c09 +
           ((uVar106 * 0x80 | uVar106 >> 0x19) ^
           (uVar106 * 0x200000 | uVar106 >> 0xb) ^ (uVar106 * 0x4000000 | uVar106 >> 6));
  iVar55 = (uVar165 >> 3 ^
           (uVar165 * 0x4000 | uVar165 >> 0x12) ^ (uVar165 * 0x2000000 | uVar165 >> 7)) + uVar20 +
           uVar160 + (uVar87 >> 10 ^
                     (uVar87 * 0x2000 | uVar87 >> 0x13) ^ (uVar87 * 0x8000 | uVar87 >> 0x11)) +
           uVar67 + (uVar7 & uVar128 | ~uVar128 & uVar147) + -0x41065c09 +
           ((uVar128 * 0x80 | uVar128 >> 0x19) ^
           (uVar128 * 0x200000 | uVar128 >> 0xb) ^ (uVar128 * 0x4000000 | uVar128 >> 6));
  uVar86 = uVar86 + iVar43;
  uVar59 = uVar59 + iVar49;
  uVar64 = uVar64 + iVar52;
  uVar98 = uVar98 + iVar55;
  uVar18 = ((uVar9 | uVar8) & uVar44 | uVar9 & uVar8) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar43;
  uVar29 = ((uVar22 | uVar31) & uVar50 | uVar22 & uVar31) +
           ((uVar22 * 0x400 | uVar22 >> 0x16) ^
           (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar49;
  uVar30 = ((uVar19 | uVar23) & uVar53 | uVar19 & uVar23) +
           ((uVar19 * 0x400 | uVar19 >> 0x16) ^
           (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar52;
  uVar10 = ((uVar21 | uVar34) & uVar56 | uVar21 & uVar34) +
           ((uVar21 * 0x400 | uVar21 >> 0x16) ^
           (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar55;
  iVar43 = (uVar65 >> 3 ^ (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7)) +
           uVar158 + uVar124 +
           (uVar45 >> 10 ^ (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11))
           + uVar100 + (uVar131 & uVar86 | ~uVar86 & uVar2) + -0x398e870e +
           ((uVar86 * 0x80 | uVar86 >> 0x19) ^
           (uVar86 * 0x200000 | uVar86 >> 0xb) ^ (uVar86 * 0x4000000 | uVar86 >> 6));
  iVar49 = (uVar92 >> 3 ^ (uVar92 * 0x4000 | uVar92 >> 0x12) ^ (uVar92 * 0x2000000 | uVar92 >> 7)) +
           uVar161 + uVar126 +
           (uVar51 >> 10 ^ (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11))
           + uVar112 + (uVar84 & uVar59 | ~uVar59 & uVar4) + -0x398e870e +
           ((uVar59 * 0x80 | uVar59 >> 0x19) ^
           (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6));
  iVar52 = (uVar66 >> 3 ^ (uVar66 * 0x4000 | uVar66 >> 0x12) ^ (uVar66 * 0x2000000 | uVar66 >> 7)) +
           uVar163 + uVar72 +
           (uVar54 >> 10 ^ (uVar54 * 0x2000 | uVar54 >> 0x13) ^ (uVar54 * 0x8000 | uVar54 >> 0x11))
           + uVar148 + (uVar106 & uVar64 | ~uVar64 & uVar5) + -0x398e870e +
           ((uVar64 * 0x80 | uVar64 >> 0x19) ^
           (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6));
  iVar55 = (uVar96 >> 3 ^ (uVar96 * 0x4000 | uVar96 >> 0x12) ^ (uVar96 * 0x2000000 | uVar96 >> 7)) +
           uVar165 + uVar134 +
           (uVar33 >> 10 ^ (uVar33 * 0x2000 | uVar33 >> 0x13) ^ (uVar33 * 0x8000 | uVar33 >> 0x11))
           + uVar147 + (uVar128 & uVar98 | ~uVar98 & uVar7) + -0x398e870e +
           ((uVar98 * 0x80 | uVar98 >> 0x19) ^
           (uVar98 * 0x200000 | uVar98 >> 0xb) ^ (uVar98 * 0x4000000 | uVar98 >> 6));
  auVar76._0_4_ =
       ((uVar18 | uVar9) & uVar8 | uVar18 & uVar9) +
       ((uVar18 * 0x400 | uVar18 >> 0x16) ^
       (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar43 +
       0x6a09e667;
  auVar76._4_4_ =
       ((uVar29 | uVar22) & uVar31 | uVar29 & uVar22) +
       ((uVar29 * 0x400 | uVar29 >> 0x16) ^
       (uVar29 * 0x80000 | uVar29 >> 0xd) ^ (uVar29 * 0x40000000 | uVar29 >> 2)) + iVar49 +
       0x6a09e667;
  auVar76._8_4_ =
       ((uVar30 | uVar19) & uVar23 | uVar30 & uVar19) +
       ((uVar30 * 0x400 | uVar30 >> 0x16) ^
       (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar52 +
       0x6a09e667;
  auVar76._12_4_ =
       ((uVar10 | uVar21) & uVar34 | uVar10 & uVar21) +
       ((uVar10 * 0x400 | uVar10 >> 0x16) ^
       (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar55 +
       0x6a09e667;
  auVar47._0_4_ = uVar18 + 0xbb67ae85;
  auVar47._4_4_ = uVar29 + 0xbb67ae85;
  auVar47._8_4_ = uVar30 + 0xbb67ae85;
  auVar47._12_4_ = uVar10 + 0xbb67ae85;
  auVar77 = pshufb(auVar76,_DAT_01158440);
  auVar48 = pshufb(auVar47,_DAT_01158440);
  auVar14._0_4_ = uVar9 + 0x3c6ef372;
  auVar14._4_4_ = uVar22 + 0x3c6ef372;
  auVar14._8_4_ = uVar19 + 0x3c6ef372;
  auVar14._12_4_ = uVar21 + 0x3c6ef372;
  auVar11 = pshufb(auVar14,_DAT_01158440);
  auVar25._0_4_ = uVar8 + 0xa54ff53a;
  auVar25._4_4_ = uVar31 + 0xa54ff53a;
  auVar25._8_4_ = uVar23 + 0xa54ff53a;
  auVar25._12_4_ = uVar34 + 0xa54ff53a;
  auVar26 = pshufb(auVar25,_DAT_01158440);
  auVar88._4_4_ = auVar48._8_4_;
  auVar88._0_4_ = auVar77._8_4_;
  auVar88._8_4_ = auVar77._12_4_;
  auVar88._12_4_ = auVar48._12_4_;
  auVar101._4_4_ = auVar48._12_4_;
  auVar101._0_4_ = auVar77._12_4_;
  auVar101._8_4_ = auVar11._12_4_;
  auVar101._12_4_ = auVar11._12_4_;
  auVar102 = blendps(auVar101,auVar26,8);
  *(undefined1 (*) [16])out = auVar102;
  auVar102 = pblendw(auVar88,auVar11,0xf0);
  uVar6 = auVar26._0_4_;
  uVar32 = auVar26._8_4_;
  auVar103._4_4_ = uVar32;
  auVar103._0_4_ = uVar32;
  auVar103._8_4_ = uVar32;
  auVar103._12_4_ = uVar32;
  auVar102 = pblendw(auVar103,auVar102,0x3f);
  *(undefined1 (*) [16])(out + 0x20) = auVar102;
  uVar32 = auVar77._4_4_;
  auVar89._4_4_ = uVar32;
  auVar89._0_4_ = uVar32;
  auVar89._8_4_ = uVar32;
  auVar89._12_4_ = uVar32;
  auVar102 = pblendw(auVar89,auVar48,0xc);
  auVar102 = insertps(auVar102,auVar11,0x68);
  auVar26 = insertps(auVar102,auVar26,0x70);
  *(undefined1 (*) [16])(out + 0x40) = auVar26;
  auVar78._0_4_ = auVar77._0_4_;
  auVar78._4_4_ = auVar48._0_4_;
  auVar78._8_8_ = auVar11._0_8_;
  auVar15._4_4_ = uVar6;
  auVar15._0_4_ = uVar6;
  auVar15._8_4_ = uVar6;
  auVar15._12_4_ = uVar6;
  auVar11 = pblendw(auVar15,auVar78,0x3f);
  *(undefined1 (*) [16])(out + 0x60) = auVar11;
  auVar38._0_4_ = uVar44 + 0x510e527f + iVar43;
  auVar38._4_4_ = uVar50 + 0x510e527f + iVar49;
  auVar38._8_4_ = uVar53 + 0x510e527f + iVar52;
  auVar38._12_4_ = uVar56 + 0x510e527f + iVar55;
  auVar63._0_4_ = uVar86 + 0x9b05688c;
  auVar63._4_4_ = uVar59 + 0x9b05688c;
  auVar63._8_4_ = uVar64 + 0x9b05688c;
  auVar63._12_4_ = uVar98 + 0x9b05688c;
  auVar173._0_4_ = uVar131 + 0x1f83d9ab;
  auVar173._4_4_ = uVar84 + 0x1f83d9ab;
  auVar173._8_4_ = uVar106 + 0x1f83d9ab;
  auVar173._12_4_ = uVar128 + 0x1f83d9ab;
  auVar26 = pshufb(auVar38,auVar3);
  auVar77 = pshufb(auVar63,auVar3);
  auVar102 = pshufb(auVar173,auVar3);
  auVar48._0_4_ = uVar2 + 0x5be0cd19;
  auVar48._4_4_ = uVar4 + 0x5be0cd19;
  auVar48._8_4_ = uVar5 + 0x5be0cd19;
  auVar48._12_4_ = uVar7 + 0x5be0cd19;
  auVar3 = pshufb(auVar48,auVar3);
  auVar16._4_4_ = auVar77._8_4_;
  auVar16._0_4_ = auVar26._8_4_;
  auVar16._8_4_ = auVar26._12_4_;
  auVar16._12_4_ = auVar77._12_4_;
  auVar27._4_4_ = auVar77._12_4_;
  auVar27._0_4_ = auVar26._12_4_;
  auVar27._8_4_ = auVar102._12_4_;
  auVar27._12_4_ = auVar102._12_4_;
  auVar11 = blendps(auVar27,auVar3,8);
  *(undefined1 (*) [16])(out + 0x10) = auVar11;
  auVar11 = pblendw(auVar16,auVar102,0xf0);
  uVar6 = auVar3._8_4_;
  auVar28._4_4_ = uVar6;
  auVar28._0_4_ = uVar6;
  auVar28._8_4_ = uVar6;
  auVar28._12_4_ = uVar6;
  auVar11 = pblendw(auVar28,auVar11,0x3f);
  *(undefined1 (*) [16])(out + 0x30) = auVar11;
  uVar6 = auVar26._4_4_;
  auVar17._4_4_ = uVar6;
  auVar17._0_4_ = uVar6;
  auVar17._8_4_ = uVar6;
  auVar17._12_4_ = uVar6;
  auVar11 = pblendw(auVar17,auVar77,0xc);
  auVar11 = insertps(auVar11,auVar102,0x68);
  auVar11 = insertps(auVar11,auVar3,0x70);
  *(undefined1 (*) [16])(out + 0x50) = auVar11;
  auVar39._0_4_ = auVar26._0_4_;
  auVar39._4_4_ = auVar77._0_4_;
  auVar39._8_8_ = auVar102._0_8_;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar3 = pblendw(auVar3,auVar39,0x3f);
  *(undefined1 (*) [16])(out + 0x70) = auVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform_4way(unsigned char* out, const unsigned char* in)
{
    // Transform 1
    __m128i a = K(0x6a09e667ul);
    __m128i b = K(0xbb67ae85ul);
    __m128i c = K(0x3c6ef372ul);
    __m128i d = K(0xa54ff53aul);
    __m128i e = K(0x510e527ful);
    __m128i f = K(0x9b05688cul);
    __m128i g = K(0x1f83d9abul);
    __m128i h = K(0x5be0cd19ul);

    __m128i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0 = Read4(in, 0)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1 = Read4(in, 4)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2 = Read4(in, 8)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3 = Read4(in, 12)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4 = Read4(in, 16)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5 = Read4(in, 20)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6 = Read4(in, 24)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7 = Read4(in, 28)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xd807aa98ul), w8 = Read4(in, 32)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x12835b01ul), w9 = Read4(in, 36)));
    Round(g, h, a, b, c, d, e, f, Add(K(0x243185beul), w10 = Read4(in, 40)));
    Round(f, g, h, a, b, c, d, e, Add(K(0x550c7dc3ul), w11 = Read4(in, 44)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x72be5d74ul), w12 = Read4(in, 48)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x80deb1feul), w13 = Read4(in, 52)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x9bdc06a7ul), w14 = Read4(in, 56)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc19bf174ul), w15 = Read4(in, 60)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));

    a = Add(a, K(0x6a09e667ul));
    b = Add(b, K(0xbb67ae85ul));
    c = Add(c, K(0x3c6ef372ul));
    d = Add(d, K(0xa54ff53aul));
    e = Add(e, K(0x510e527ful));
    f = Add(f, K(0x9b05688cul));
    g = Add(g, K(0x1f83d9abul));
    h = Add(h, K(0x5be0cd19ul));

    __m128i t0 = a, t1 = b, t2 = c, t3 = d, t4 = e, t5 = f, t6 = g, t7 = h;

    // Transform 2
    Round(a, b, c, d, e, f, g, h, K(0xc28a2f98ul));
    Round(h, a, b, c, d, e, f, g, K(0x71374491ul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c0fbcful));
    Round(f, g, h, a, b, c, d, e, K(0xe9b5dba5ul));
    Round(e, f, g, h, a, b, c, d, K(0x3956c25bul));
    Round(d, e, f, g, h, a, b, c, K(0x59f111f1ul));
    Round(c, d, e, f, g, h, a, b, K(0x923f82a4ul));
    Round(b, c, d, e, f, g, h, a, K(0xab1c5ed5ul));
    Round(a, b, c, d, e, f, g, h, K(0xd807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf374ul));
    Round(a, b, c, d, e, f, g, h, K(0x649b69c1ul));
    Round(h, a, b, c, d, e, f, g, K(0xf0fe4786ul));
    Round(g, h, a, b, c, d, e, f, K(0x0fe1edc6ul));
    Round(f, g, h, a, b, c, d, e, K(0x240cf254ul));
    Round(e, f, g, h, a, b, c, d, K(0x4fe9346ful));
    Round(d, e, f, g, h, a, b, c, K(0x6cc984beul));
    Round(c, d, e, f, g, h, a, b, K(0x61b9411eul));
    Round(b, c, d, e, f, g, h, a, K(0x16f988faul));
    Round(a, b, c, d, e, f, g, h, K(0xf2c65152ul));
    Round(h, a, b, c, d, e, f, g, K(0xa88e5a6dul));
    Round(g, h, a, b, c, d, e, f, K(0xb019fc65ul));
    Round(f, g, h, a, b, c, d, e, K(0xb9d99ec7ul));
    Round(e, f, g, h, a, b, c, d, K(0x9a1231c3ul));
    Round(d, e, f, g, h, a, b, c, K(0xe70eeaa0ul));
    Round(c, d, e, f, g, h, a, b, K(0xfdb1232bul));
    Round(b, c, d, e, f, g, h, a, K(0xc7353eb0ul));
    Round(a, b, c, d, e, f, g, h, K(0x3069bad5ul));
    Round(h, a, b, c, d, e, f, g, K(0xcb976d5ful));
    Round(g, h, a, b, c, d, e, f, K(0x5a0f118ful));
    Round(f, g, h, a, b, c, d, e, K(0xdc1eeefdul));
    Round(e, f, g, h, a, b, c, d, K(0x0a35b689ul));
    Round(d, e, f, g, h, a, b, c, K(0xde0b7a04ul));
    Round(c, d, e, f, g, h, a, b, K(0x58f4ca9dul));
    Round(b, c, d, e, f, g, h, a, K(0xe15d5b16ul));
    Round(a, b, c, d, e, f, g, h, K(0x007f3e86ul));
    Round(h, a, b, c, d, e, f, g, K(0x37088980ul));
    Round(g, h, a, b, c, d, e, f, K(0xa507ea32ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fab9537ul));
    Round(e, f, g, h, a, b, c, d, K(0x17406110ul));
    Round(d, e, f, g, h, a, b, c, K(0x0d8cd6f1ul));
    Round(c, d, e, f, g, h, a, b, K(0xcdaa3b6dul));
    Round(b, c, d, e, f, g, h, a, K(0xc0bbbe37ul));
    Round(a, b, c, d, e, f, g, h, K(0x83613bdaul));
    Round(h, a, b, c, d, e, f, g, K(0xdb48a363ul));
    Round(g, h, a, b, c, d, e, f, K(0x0b02e931ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fd15ca7ul));
    Round(e, f, g, h, a, b, c, d, K(0x521afacaul));
    Round(d, e, f, g, h, a, b, c, K(0x31338431ul));
    Round(c, d, e, f, g, h, a, b, K(0x6ed41a95ul));
    Round(b, c, d, e, f, g, h, a, K(0x6d437890ul));
    Round(a, b, c, d, e, f, g, h, K(0xc39c91f2ul));
    Round(h, a, b, c, d, e, f, g, K(0x9eccabbdul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c9a0e6ul));
    Round(f, g, h, a, b, c, d, e, K(0x532fb63cul));
    Round(e, f, g, h, a, b, c, d, K(0xd2c741c6ul));
    Round(d, e, f, g, h, a, b, c, K(0x07237ea3ul));
    Round(c, d, e, f, g, h, a, b, K(0xa4954b68ul));
    Round(b, c, d, e, f, g, h, a, K(0x4c191d76ul));

    w0 = Add(t0, a);
    w1 = Add(t1, b);
    w2 = Add(t2, c);
    w3 = Add(t3, d);
    w4 = Add(t4, e);
    w5 = Add(t5, f);
    w6 = Add(t6, g);
    w7 = Add(t7, h);

    // Transform 3
    a = K(0x6a09e667ul);
    b = K(0xbb67ae85ul);
    c = K(0x3c6ef372ul);
    d = K(0xa54ff53aul);
    e = K(0x510e527ful);
    f = K(0x9b05688cul);
    g = K(0x1f83d9abul);
    h = K(0x5be0cd19ul);

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7));
    Round(a, b, c, d, e, f, g, h, K(0x5807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf274ul));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, K(0xa00000ul), sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), K(0x100ul), sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, K(0x11002000ul))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), w8 = Add(K(0x80000000ul), sigma1(w6), w1)));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), w9 = Add(sigma1(w7), w2)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), w10 = Add(sigma1(w8), w3)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), w11 = Add(sigma1(w9), w4)));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), w12 = Add(sigma1(w10), w5)));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), w13 = Add(sigma1(w11), w6)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), w14 = Add(sigma1(w12), w7, K(0x400022ul))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), w15 = Add(K(0x100ul), sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), w14, sigma1(w12), w7, sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), w15, sigma1(w13), w8, sigma0(w0)));

    // Output
    Write4(out, 0, Add(a, K(0x6a09e667ul)));
    Write4(out, 4, Add(b, K(0xbb67ae85ul)));
    Write4(out, 8, Add(c, K(0x3c6ef372ul)));
    Write4(out, 12, Add(d, K(0xa54ff53aul)));
    Write4(out, 16, Add(e, K(0x510e527ful)));
    Write4(out, 20, Add(f, K(0x9b05688cul)));
    Write4(out, 24, Add(g, K(0x1f83d9abul)));
    Write4(out, 28, Add(h, K(0x5be0cd19ul)));
}